

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256_avx2.cpp
# Opt level: O3

void sha256d64_avx2::Transform_8way(uchar *out,uchar *in)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  auVar2 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0xc0)),*(undefined4 *)(in + 0x80),1);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0x40),2);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)in,3);
  auVar3 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0x1c0)),*(undefined4 *)(in + 0x180),1);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x140),2);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x100),3);
  auVar109._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  auVar109._16_16_ = ZEXT116(1) * auVar2;
  auVar100._16_16_ = _DAT_011304d0;
  auVar100._0_16_ = _DAT_011304d0;
  auVar12._8_4_ = 0x98c7e2a2;
  auVar12._0_8_ = 0x98c7e2a298c7e2a2;
  auVar12._12_4_ = 0x98c7e2a2;
  auVar12._16_4_ = 0x98c7e2a2;
  auVar12._20_4_ = 0x98c7e2a2;
  auVar12._24_4_ = 0x98c7e2a2;
  auVar12._28_4_ = 0x98c7e2a2;
  auVar25._8_4_ = 0xfc08884d;
  auVar25._0_8_ = 0xfc08884dfc08884d;
  auVar25._12_4_ = 0xfc08884d;
  auVar25._16_4_ = 0xfc08884d;
  auVar25._20_4_ = 0xfc08884d;
  auVar25._24_4_ = 0xfc08884d;
  auVar25._28_4_ = 0xfc08884d;
  auVar114 = vpshufb_avx2(auVar109,auVar100);
  auVar2 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0xc4)),*(undefined4 *)(in + 0x84),1);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0x44),2);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 4),3);
  auVar109 = vpaddd_avx2(auVar114,auVar12);
  auVar3 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0x1c4)),*(undefined4 *)(in + 0x184),1);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x144),2);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x104),3);
  auVar4 = vpaddd_avx2(auVar114,auVar25);
  auVar10._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  auVar10._16_16_ = ZEXT116(1) * auVar2;
  auVar142 = vpshufb_avx2(auVar10,auVar100);
  auVar10 = vpsrld_avx2(auVar109,6);
  auVar13 = vpslld_avx2(auVar109,0x1a);
  auVar13 = vpor_avx2(auVar13,auVar10);
  auVar10 = vpsrld_avx2(auVar109,0xb);
  auVar20 = vpslld_avx2(auVar109,0x15);
  auVar20 = vpor_avx2(auVar20,auVar10);
  auVar10 = vpsrld_avx2(auVar109,0x19);
  auVar21 = vpslld_avx2(auVar109,7);
  auVar21 = vpor_avx2(auVar21,auVar10);
  auVar14._8_4_ = 0xca0b3af3;
  auVar14._0_8_ = 0xca0b3af3ca0b3af3;
  auVar14._12_4_ = 0xca0b3af3;
  auVar14._16_4_ = 0xca0b3af3;
  auVar14._20_4_ = 0xca0b3af3;
  auVar14._24_4_ = 0xca0b3af3;
  auVar14._28_4_ = 0xca0b3af3;
  auVar10 = vpand_avx2(auVar109,auVar14);
  auVar22._8_4_ = 0x9b05688c;
  auVar22._0_8_ = 0x9b05688c9b05688c;
  auVar22._12_4_ = 0x9b05688c;
  auVar22._16_4_ = 0x9b05688c;
  auVar22._20_4_ = 0x9b05688c;
  auVar22._24_4_ = 0x9b05688c;
  auVar22._28_4_ = 0x9b05688c;
  auVar10 = vpaddd_avx2(auVar10 ^ auVar22,auVar142);
  auVar10 = vpaddd_avx2(auVar10,auVar20 ^ auVar13 ^ auVar21);
  auVar13 = vpsrld_avx2(auVar4,2);
  auVar20 = vpslld_avx2(auVar4,0x1e);
  auVar20 = vpor_avx2(auVar20,auVar13);
  auVar13 = vpsrld_avx2(auVar4,0xd);
  auVar21 = vpslld_avx2(auVar4,0x13);
  auVar21 = vpor_avx2(auVar21,auVar13);
  auVar13 = vpsrld_avx2(auVar4,0x16);
  auVar26 = vpslld_avx2(auVar4,10);
  auVar26 = vpor_avx2(auVar26,auVar13);
  auVar23._8_4_ = 0xd16e48e2;
  auVar23._0_8_ = 0xd16e48e2d16e48e2;
  auVar23._12_4_ = 0xd16e48e2;
  auVar23._16_4_ = 0xd16e48e2;
  auVar23._20_4_ = 0xd16e48e2;
  auVar23._24_4_ = 0xd16e48e2;
  auVar23._28_4_ = 0xd16e48e2;
  auVar13 = vpand_avx2(auVar4,auVar23);
  auVar51._8_4_ = 0x2a01a605;
  auVar51._0_8_ = 0x2a01a6052a01a605;
  auVar51._12_4_ = 0x2a01a605;
  auVar51._16_4_ = 0x2a01a605;
  auVar51._20_4_ = 0x2a01a605;
  auVar51._24_4_ = 0x2a01a605;
  auVar51._28_4_ = 0x2a01a605;
  auVar87._8_4_ = 0xcd2a11ae;
  auVar87._0_8_ = 0xcd2a11aecd2a11ae;
  auVar87._12_4_ = 0xcd2a11ae;
  auVar87._16_4_ = 0xcd2a11ae;
  auVar87._20_4_ = 0xcd2a11ae;
  auVar87._24_4_ = 0xcd2a11ae;
  auVar87._28_4_ = 0xcd2a11ae;
  auVar13 = vpaddd_avx2(auVar21 ^ auVar20 ^ auVar26,auVar13);
  auVar2 = vpinsrd_avx(ZEXT416(*(uint *)(in + 200)),*(undefined4 *)(in + 0x88),1);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0x48),2);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 8),3);
  auVar13 = vpaddd_avx2(auVar13,auVar51);
  auVar3 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0x1c8)),*(undefined4 *)(in + 0x188),1);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x148),2);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x108),3);
  auVar20 = vpaddd_avx2(auVar87,auVar10);
  auVar21._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  auVar21._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  auVar26 = vpsrld_avx2(auVar20,6);
  auVar51 = vpslld_avx2(auVar20,0x1a);
  auVar26 = vpor_avx2(auVar51,auVar26);
  auVar51 = vpsrld_avx2(auVar20,0xb);
  auVar88 = vpslld_avx2(auVar20,0x15);
  auVar51 = vpor_avx2(auVar88,auVar51);
  auVar88 = vpsrld_avx2(auVar20,0x19);
  auVar89 = vpslld_avx2(auVar20,7);
  auVar88 = vpor_avx2(auVar89,auVar88);
  auVar98 = vpshufb_avx2(auVar21,auVar100);
  auVar15._8_8_ = 0x510e527f510e527f;
  auVar15._0_8_ = 0x510e527f510e527f;
  auVar15._16_8_ = 0x510e527f510e527f;
  auVar15._24_8_ = 0x510e527f510e527f;
  auVar21 = vpand_avx2(auVar109 ^ auVar15,auVar20);
  auVar52._8_4_ = 0x510e527f;
  auVar52._0_8_ = 0x510e527f510e527f;
  auVar52._12_4_ = 0x510e527f;
  auVar52._16_4_ = 0x510e527f;
  auVar52._20_4_ = 0x510e527f;
  auVar52._24_4_ = 0x510e527f;
  auVar52._28_4_ = 0x510e527f;
  auVar21 = vpaddd_avx2(auVar98,auVar21 ^ auVar52);
  auVar53._8_4_ = 0x90bb1e3c;
  auVar53._0_8_ = 0x90bb1e3c90bb1e3c;
  auVar53._12_4_ = 0x90bb1e3c;
  auVar53._16_4_ = 0x90bb1e3c;
  auVar53._20_4_ = 0x90bb1e3c;
  auVar53._24_4_ = 0x90bb1e3c;
  auVar53._28_4_ = 0x90bb1e3c;
  auVar21 = vpaddd_avx2(auVar51 ^ auVar26 ^ auVar88,auVar21);
  auVar10 = vpaddd_avx2(auVar10,auVar53);
  auVar13 = vpaddd_avx2(auVar10,auVar13);
  auVar26 = vpsrld_avx2(auVar13,2);
  auVar51 = vpslld_avx2(auVar13,0x1e);
  auVar88 = vpor_avx2(auVar51,auVar26);
  auVar26 = vpsrld_avx2(auVar13,0xd);
  auVar51 = vpslld_avx2(auVar13,0x13);
  auVar89 = vpor_avx2(auVar51,auVar26);
  auVar26 = vpsrld_avx2(auVar13,0x16);
  auVar51 = vpslld_avx2(auVar13,10);
  auVar160 = vpor_avx2(auVar51,auVar26);
  auVar2 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0xcc)),*(undefined4 *)(in + 0x8c),1);
  auVar26 = vpor_avx2(auVar13,auVar4);
  auVar137._8_8_ = 0x6a09e6676a09e667;
  auVar137._0_8_ = 0x6a09e6676a09e667;
  auVar137._16_8_ = 0x6a09e6676a09e667;
  auVar137._24_8_ = 0x6a09e6676a09e667;
  auVar26 = vpand_avx2(auVar137,auVar26);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0x4c),2);
  auVar51 = vpand_avx2(auVar13,auVar4);
  auVar26 = vpor_avx2(auVar51,auVar26);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0xc),3);
  auVar3 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0x1cc)),*(undefined4 *)(in + 0x18c),1);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x14c),2);
  auVar26 = vpaddd_avx2(auVar89 ^ auVar88 ^ auVar160,auVar26);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x10c),3);
  auVar90._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  auVar90._16_16_ = ZEXT116(1) * auVar2;
  auVar54._8_4_ = 0xc2e12e0;
  auVar54._0_8_ = 0xc2e12e00c2e12e0;
  auVar54._12_4_ = 0xc2e12e0;
  auVar54._16_4_ = 0xc2e12e0;
  auVar54._20_4_ = 0xc2e12e0;
  auVar54._24_4_ = 0xc2e12e0;
  auVar54._28_4_ = 0xc2e12e0;
  auVar51 = vpaddd_avx2(auVar21,auVar54);
  auVar88 = vpsrld_avx2(auVar51,6);
  auVar89 = vpslld_avx2(auVar51,0x1a);
  auVar89 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpsrld_avx2(auVar51,0xb);
  auVar160 = vpslld_avx2(auVar51,0x15);
  auVar160 = vpor_avx2(auVar160,auVar88);
  auVar88 = vpsrld_avx2(auVar51,0x19);
  auVar161 = vpslld_avx2(auVar51,7);
  auVar161 = vpor_avx2(auVar161,auVar88);
  auVar88 = vpandn_avx2(auVar51,auVar109);
  auVar109 = vpand_avx2(auVar20,auVar51);
  auVar109 = vpor_avx2(auVar109,auVar88);
  auVar99 = vpshufb_avx2(auVar90,auVar100);
  auVar109 = vpaddd_avx2(auVar99,auVar109);
  auVar109 = vpaddd_avx2(auVar160 ^ auVar89 ^ auVar161,auVar109);
  auVar91._8_4_ = 0x50c6645b;
  auVar91._0_8_ = 0x50c6645b50c6645b;
  auVar91._12_4_ = 0x50c6645b;
  auVar91._16_4_ = 0x50c6645b;
  auVar91._20_4_ = 0x50c6645b;
  auVar91._24_4_ = 0x50c6645b;
  auVar91._28_4_ = 0x50c6645b;
  auVar21 = vpaddd_avx2(auVar91,auVar21);
  auVar26 = vpaddd_avx2(auVar21,auVar26);
  auVar88 = vpsrld_avx2(auVar26,2);
  auVar89 = vpslld_avx2(auVar26,0x1e);
  auVar160 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpsrld_avx2(auVar26,0xd);
  auVar89 = vpslld_avx2(auVar26,0x13);
  auVar161 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpsrld_avx2(auVar26,0x16);
  auVar89 = vpslld_avx2(auVar26,10);
  auVar169 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpor_avx2(auVar26,auVar13);
  auVar88 = vpand_avx2(auVar88,auVar4);
  auVar89 = vpand_avx2(auVar26,auVar13);
  auVar88 = vpor_avx2(auVar88,auVar89);
  auVar2 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0xd0)),*(undefined4 *)(in + 0x90),1);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0x50),2);
  auVar88 = vpaddd_avx2(auVar88,auVar169 ^ auVar161 ^ auVar160);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0x10),3);
  auVar3 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0x1d0)),*(undefined4 *)(in + 400),1);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x150),2);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x110),3);
  auVar92._8_4_ = 0xa4ce148b;
  auVar92._0_8_ = 0xa4ce148ba4ce148b;
  auVar92._12_4_ = 0xa4ce148b;
  auVar92._16_4_ = 0xa4ce148b;
  auVar92._20_4_ = 0xa4ce148b;
  auVar92._24_4_ = 0xa4ce148b;
  auVar92._28_4_ = 0xa4ce148b;
  auVar149._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  auVar149._16_16_ = ZEXT116(1) * auVar2;
  auVar89 = vpaddd_avx2(auVar92,auVar109);
  auVar160 = vpsrld_avx2(auVar89,6);
  auVar161 = vpslld_avx2(auVar89,0x1a);
  auVar161 = vpor_avx2(auVar161,auVar160);
  auVar160 = vpsrld_avx2(auVar89,0xb);
  auVar169 = vpslld_avx2(auVar89,0x15);
  auVar169 = vpor_avx2(auVar169,auVar160);
  auVar160 = vpsrld_avx2(auVar89,0x19);
  auVar170 = vpslld_avx2(auVar89,7);
  auVar170 = vpor_avx2(auVar170,auVar160);
  auVar160 = vpandn_avx2(auVar89,auVar20);
  auVar20 = vpand_avx2(auVar89,auVar51);
  auVar20 = vpor_avx2(auVar20,auVar160);
  auVar100 = vpshufb_avx2(auVar149,auVar100);
  auVar20 = vpaddd_avx2(auVar20,auVar114);
  auVar20 = vpaddd_avx2(auVar100,auVar20);
  auVar20 = vpaddd_avx2(auVar169 ^ auVar161 ^ auVar170,auVar20);
  auVar93._8_4_ = 0x3ac42e24;
  auVar93._0_8_ = 0x3ac42e243ac42e24;
  auVar93._12_4_ = 0x3ac42e24;
  auVar93._16_4_ = 0x3ac42e24;
  auVar93._20_4_ = 0x3ac42e24;
  auVar93._24_4_ = 0x3ac42e24;
  auVar93._28_4_ = 0x3ac42e24;
  auVar150._8_4_ = 0xd21ea4fd;
  auVar150._0_8_ = 0xd21ea4fdd21ea4fd;
  auVar150._12_4_ = 0xd21ea4fd;
  auVar150._16_4_ = 0xd21ea4fd;
  auVar150._20_4_ = 0xd21ea4fd;
  auVar150._24_4_ = 0xd21ea4fd;
  auVar150._28_4_ = 0xd21ea4fd;
  auVar20 = vpaddd_avx2(auVar150,auVar20);
  auVar109 = vpaddd_avx2(auVar93,auVar109);
  auVar88 = vpaddd_avx2(auVar109,auVar88);
  auVar160 = vpsrld_avx2(auVar88,2);
  auVar161 = vpslld_avx2(auVar88,0x1e);
  auVar169 = vpor_avx2(auVar161,auVar160);
  auVar160 = vpsrld_avx2(auVar88,0xd);
  auVar161 = vpslld_avx2(auVar88,0x13);
  auVar170 = vpor_avx2(auVar161,auVar160);
  auVar160 = vpsrld_avx2(auVar88,0x16);
  auVar161 = vpslld_avx2(auVar88,10);
  auVar113 = vpor_avx2(auVar161,auVar160);
  auVar160 = vpor_avx2(auVar88,auVar26);
  auVar160 = vpand_avx2(auVar160,auVar13);
  auVar161 = vpand_avx2(auVar88,auVar26);
  auVar160 = vpor_avx2(auVar161,auVar160);
  auVar160 = vpaddd_avx2(auVar170 ^ auVar169 ^ auVar113,auVar160);
  auVar2 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0xd4)),*(undefined4 *)(in + 0x94),1);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0x54),2);
  auVar4 = vpaddd_avx2(auVar20,auVar4);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0x14),3);
  auVar3 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0x1d4)),*(undefined4 *)(in + 0x194),1);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x154),2);
  auVar20 = vpaddd_avx2(auVar20,auVar160);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x114),3);
  auVar113._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  auVar113._16_16_ = ZEXT116(1) * auVar2;
  auVar160 = vpsrld_avx2(auVar4,6);
  auVar161 = vpslld_avx2(auVar4,0x1a);
  auVar161 = vpor_avx2(auVar161,auVar160);
  auVar160 = vpsrld_avx2(auVar4,0xb);
  auVar169 = vpslld_avx2(auVar4,0x15);
  auVar169 = vpor_avx2(auVar169,auVar160);
  auVar160 = vpsrld_avx2(auVar4,0x19);
  auVar170 = vpslld_avx2(auVar4,7);
  auVar170 = vpor_avx2(auVar170,auVar160);
  auVar160 = vpandn_avx2(auVar4,auVar51);
  auVar51 = vpand_avx2(auVar89,auVar4);
  auVar51 = vpor_avx2(auVar51,auVar160);
  auVar10 = vpaddd_avx2(auVar10,auVar51);
  auVar110._16_16_ = _DAT_011304d0;
  auVar110._0_16_ = _DAT_011304d0;
  auVar115 = vpshufb_avx2(auVar113,auVar110);
  auVar10 = vpaddd_avx2(auVar10,auVar115);
  auVar10 = vpaddd_avx2(auVar169 ^ auVar161 ^ auVar170,auVar10);
  auVar160._8_4_ = 0x96600563;
  auVar160._0_8_ = 0x9660056396600563;
  auVar160._12_4_ = 0x96600563;
  auVar160._16_4_ = 0x96600563;
  auVar160._20_4_ = 0x96600563;
  auVar160._24_4_ = 0x96600563;
  auVar160._28_4_ = 0x96600563;
  auVar10 = vpaddd_avx2(auVar10,auVar160);
  auVar51 = vpsrld_avx2(auVar20,2);
  auVar160 = vpslld_avx2(auVar20,0x1e);
  auVar161 = vpor_avx2(auVar160,auVar51);
  auVar51 = vpsrld_avx2(auVar20,0xd);
  auVar160 = vpslld_avx2(auVar20,0x13);
  auVar169 = vpor_avx2(auVar160,auVar51);
  auVar51 = vpsrld_avx2(auVar20,0x16);
  auVar160 = vpslld_avx2(auVar20,10);
  auVar170 = vpor_avx2(auVar160,auVar51);
  auVar51 = vpor_avx2(auVar20,auVar88);
  auVar51 = vpand_avx2(auVar51,auVar26);
  auVar160 = vpand_avx2(auVar20,auVar88);
  auVar51 = vpor_avx2(auVar160,auVar51);
  auVar51 = vpaddd_avx2(auVar169 ^ auVar161 ^ auVar170,auVar51);
  auVar2 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0xd8)),*(undefined4 *)(in + 0x98),1);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0x58),2);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0x18),3);
  auVar13 = vpaddd_avx2(auVar10,auVar13);
  auVar3 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0x1d8)),*(undefined4 *)(in + 0x198),1);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x158),2);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x118),3);
  auVar10 = vpaddd_avx2(auVar51,auVar10);
  auVar170._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  auVar170._16_16_ = ZEXT116(1) * auVar2;
  auVar51 = vpsrld_avx2(auVar13,6);
  auVar160 = vpslld_avx2(auVar13,0x1a);
  auVar160 = vpor_avx2(auVar160,auVar51);
  auVar51 = vpsrld_avx2(auVar13,0xb);
  auVar161 = vpslld_avx2(auVar13,0x15);
  auVar161 = vpor_avx2(auVar161,auVar51);
  auVar51 = vpsrld_avx2(auVar13,0x19);
  auVar169 = vpslld_avx2(auVar13,7);
  auVar169 = vpor_avx2(auVar169,auVar51);
  auVar89 = vpandn_avx2(auVar13,auVar89);
  auVar51 = vpand_avx2(auVar4,auVar13);
  auVar51 = vpor_avx2(auVar51,auVar89);
  auVar21 = vpaddd_avx2(auVar21,auVar51);
  auVar163 = vpshufb_avx2(auVar170,auVar110);
  auVar21 = vpaddd_avx2(auVar21,auVar163);
  auVar21 = vpaddd_avx2(auVar21,auVar169 ^ auVar161 ^ auVar160);
  auVar89._8_4_ = 0x4da73129;
  auVar89._0_8_ = 0x4da731294da73129;
  auVar89._12_4_ = 0x4da73129;
  auVar89._16_4_ = 0x4da73129;
  auVar89._20_4_ = 0x4da73129;
  auVar89._24_4_ = 0x4da73129;
  auVar89._28_4_ = 0x4da73129;
  auVar21 = vpaddd_avx2(auVar21,auVar89);
  auVar51 = vpsrld_avx2(auVar10,2);
  auVar89 = vpslld_avx2(auVar10,0x1e);
  auVar160 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpsrld_avx2(auVar10,0xd);
  auVar89 = vpslld_avx2(auVar10,0x13);
  auVar161 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpsrld_avx2(auVar10,0x16);
  auVar89 = vpslld_avx2(auVar10,10);
  auVar169 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpor_avx2(auVar10,auVar20);
  auVar51 = vpand_avx2(auVar51,auVar88);
  auVar89 = vpand_avx2(auVar10,auVar20);
  auVar51 = vpor_avx2(auVar51,auVar89);
  auVar51 = vpaddd_avx2(auVar51,auVar169 ^ auVar161 ^ auVar160);
  auVar2 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0xdc)),*(undefined4 *)(in + 0x9c),1);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0x5c),2);
  auVar26 = vpaddd_avx2(auVar21,auVar26);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0x1c),3);
  auVar3 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0x1dc)),*(undefined4 *)(in + 0x19c),1);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x15c),2);
  auVar21 = vpaddd_avx2(auVar51,auVar21);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x11c),3);
  auVar164._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  auVar164._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  auVar51 = vpsrld_avx2(auVar26,6);
  auVar89 = vpslld_avx2(auVar26,0x1a);
  auVar160 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpsrld_avx2(auVar26,0xb);
  auVar89 = vpslld_avx2(auVar26,0x15);
  auVar161 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpsrld_avx2(auVar26,0x19);
  auVar89 = vpslld_avx2(auVar26,7);
  auVar169 = vpor_avx2(auVar89,auVar51);
  auVar89 = vpandn_avx2(auVar26,auVar4);
  auVar51 = vpand_avx2(auVar13,auVar26);
  auVar51 = vpor_avx2(auVar51,auVar89);
  auVar109 = vpaddd_avx2(auVar109,auVar51);
  auVar164 = vpshufb_avx2(auVar164,auVar110);
  auVar109 = vpaddd_avx2(auVar109,auVar164);
  auVar109 = vpaddd_avx2(auVar161 ^ auVar160 ^ auVar169,auVar109);
  auVar138._8_4_ = 0x1526453c;
  auVar138._0_8_ = 0x1526453c1526453c;
  auVar138._12_4_ = 0x1526453c;
  auVar138._16_4_ = 0x1526453c;
  auVar138._20_4_ = 0x1526453c;
  auVar138._24_4_ = 0x1526453c;
  auVar138._28_4_ = 0x1526453c;
  auVar109 = vpaddd_avx2(auVar138,auVar109);
  auVar51 = vpsrld_avx2(auVar21,2);
  auVar89 = vpslld_avx2(auVar21,0x1e);
  auVar160 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpsrld_avx2(auVar21,0xd);
  auVar89 = vpslld_avx2(auVar21,0x13);
  auVar161 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpsrld_avx2(auVar21,0x16);
  auVar89 = vpslld_avx2(auVar21,10);
  auVar169 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpor_avx2(auVar21,auVar10);
  auVar51 = vpand_avx2(auVar51,auVar20);
  auVar89 = vpand_avx2(auVar21,auVar10);
  auVar51 = vpor_avx2(auVar51,auVar89);
  auVar51 = vpaddd_avx2(auVar161 ^ auVar160 ^ auVar169,auVar51);
  auVar2 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0xe0)),*(undefined4 *)(in + 0xa0),1);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0x60),2);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0x20),3);
  auVar88 = vpaddd_avx2(auVar109,auVar88);
  auVar3 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0x1e0)),*(undefined4 *)(in + 0x1a0),1);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x160),2);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x120),3);
  auVar109 = vpaddd_avx2(auVar51,auVar109);
  auVar139._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  auVar139._16_16_ = ZEXT116(1) * auVar2;
  auVar51 = vpsrld_avx2(auVar88,6);
  auVar89 = vpslld_avx2(auVar88,0x1a);
  auVar160 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpsrld_avx2(auVar88,0xb);
  auVar89 = vpslld_avx2(auVar88,0x15);
  auVar161 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpsrld_avx2(auVar88,0x19);
  auVar89 = vpslld_avx2(auVar88,7);
  auVar169 = vpor_avx2(auVar89,auVar51);
  auVar89 = vpandn_avx2(auVar88,auVar13);
  auVar51 = vpand_avx2(auVar26,auVar88);
  auVar51 = vpor_avx2(auVar51,auVar89);
  auVar4 = vpaddd_avx2(auVar51,auVar4);
  auVar165 = vpshufb_avx2(auVar139,auVar110);
  auVar4 = vpaddd_avx2(auVar165,auVar4);
  auVar4 = vpaddd_avx2(auVar161 ^ auVar160 ^ auVar169,auVar4);
  auVar51 = vpsrld_avx2(auVar109,2);
  auVar89 = vpslld_avx2(auVar109,0x1e);
  auVar160 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpsrld_avx2(auVar109,0xd);
  auVar89 = vpslld_avx2(auVar109,0x13);
  auVar161 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpsrld_avx2(auVar109,0x16);
  auVar89 = vpslld_avx2(auVar109,10);
  auVar169 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpor_avx2(auVar109,auVar21);
  auVar51 = vpand_avx2(auVar51,auVar10);
  auVar89 = vpand_avx2(auVar109,auVar21);
  auVar51 = vpor_avx2(auVar51,auVar89);
  auVar51 = vpaddd_avx2(auVar161 ^ auVar160 ^ auVar169,auVar51);
  auVar94._8_4_ = 0xd807aa98;
  auVar94._0_8_ = 0xd807aa98d807aa98;
  auVar94._12_4_ = 0xd807aa98;
  auVar94._16_4_ = 0xd807aa98;
  auVar94._20_4_ = 0xd807aa98;
  auVar94._24_4_ = 0xd807aa98;
  auVar94._28_4_ = 0xd807aa98;
  auVar4 = vpaddd_avx2(auVar94,auVar4);
  auVar2 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0xe4)),*(undefined4 *)(in + 0xa4),1);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 100),2);
  auVar20 = vpaddd_avx2(auVar4,auVar20);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0x24),3);
  auVar3 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0x1e4)),*(undefined4 *)(in + 0x1a4),1);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x164),2);
  auVar4 = vpaddd_avx2(auVar51,auVar4);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x124),3);
  auVar140._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  auVar140._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  auVar51 = vpsrld_avx2(auVar20,6);
  auVar89 = vpslld_avx2(auVar20,0x1a);
  auVar160 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpsrld_avx2(auVar20,0xb);
  auVar89 = vpslld_avx2(auVar20,0x15);
  auVar161 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpsrld_avx2(auVar20,0x19);
  auVar89 = vpslld_avx2(auVar20,7);
  auVar169 = vpor_avx2(auVar89,auVar51);
  auVar89 = vpandn_avx2(auVar20,auVar26);
  auVar51 = vpand_avx2(auVar88,auVar20);
  auVar51 = vpor_avx2(auVar51,auVar89);
  auVar13 = vpaddd_avx2(auVar51,auVar13);
  auVar166 = vpshufb_avx2(auVar140,auVar110);
  auVar13 = vpaddd_avx2(auVar166,auVar13);
  auVar13 = vpaddd_avx2(auVar161 ^ auVar160 ^ auVar169,auVar13);
  auVar51 = vpsrld_avx2(auVar4,2);
  auVar89 = vpslld_avx2(auVar4,0x1e);
  auVar160 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpsrld_avx2(auVar4,0xd);
  auVar89 = vpslld_avx2(auVar4,0x13);
  auVar161 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpsrld_avx2(auVar4,0x16);
  auVar89 = vpslld_avx2(auVar4,10);
  auVar169 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpor_avx2(auVar4,auVar109);
  auVar51 = vpand_avx2(auVar51,auVar21);
  auVar89 = vpand_avx2(auVar4,auVar109);
  auVar51 = vpor_avx2(auVar51,auVar89);
  auVar51 = vpaddd_avx2(auVar161 ^ auVar160 ^ auVar169,auVar51);
  auVar95._8_4_ = 0x12835b01;
  auVar95._0_8_ = 0x12835b0112835b01;
  auVar95._12_4_ = 0x12835b01;
  auVar95._16_4_ = 0x12835b01;
  auVar95._20_4_ = 0x12835b01;
  auVar95._24_4_ = 0x12835b01;
  auVar95._28_4_ = 0x12835b01;
  auVar13 = vpaddd_avx2(auVar95,auVar13);
  auVar2 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0xe8)),*(undefined4 *)(in + 0xa8),1);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0x68),2);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0x28),3);
  auVar10 = vpaddd_avx2(auVar13,auVar10);
  auVar3 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0x1e8)),*(undefined4 *)(in + 0x1a8),1);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x168),2);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x128),3);
  auVar13 = vpaddd_avx2(auVar51,auVar13);
  auVar55._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  auVar55._16_16_ = ZEXT116(1) * auVar2;
  auVar51 = vpsrld_avx2(auVar10,6);
  auVar89 = vpslld_avx2(auVar10,0x1a);
  auVar160 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpsrld_avx2(auVar10,0xb);
  auVar89 = vpslld_avx2(auVar10,0x15);
  auVar161 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpsrld_avx2(auVar10,0x19);
  auVar89 = vpslld_avx2(auVar10,7);
  auVar169 = vpor_avx2(auVar89,auVar51);
  auVar89 = vpandn_avx2(auVar10,auVar88);
  auVar51 = vpand_avx2(auVar10,auVar20);
  auVar51 = vpor_avx2(auVar51,auVar89);
  auVar26 = vpaddd_avx2(auVar51,auVar26);
  auVar167 = vpshufb_avx2(auVar55,auVar110);
  auVar26 = vpaddd_avx2(auVar26,auVar167);
  auVar26 = vpaddd_avx2(auVar161 ^ auVar160 ^ auVar169,auVar26);
  auVar51 = vpsrld_avx2(auVar13,2);
  auVar89 = vpslld_avx2(auVar13,0x1e);
  auVar160 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpsrld_avx2(auVar13,0xd);
  auVar89 = vpslld_avx2(auVar13,0x13);
  auVar161 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpsrld_avx2(auVar13,0x16);
  auVar89 = vpslld_avx2(auVar13,10);
  auVar169 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpor_avx2(auVar13,auVar4);
  auVar51 = vpand_avx2(auVar51,auVar109);
  auVar89 = vpand_avx2(auVar13,auVar4);
  auVar51 = vpor_avx2(auVar51,auVar89);
  auVar51 = vpaddd_avx2(auVar51,auVar169 ^ auVar161 ^ auVar160);
  auVar56._8_4_ = 0x243185be;
  auVar56._0_8_ = 0x243185be243185be;
  auVar56._12_4_ = 0x243185be;
  auVar56._16_4_ = 0x243185be;
  auVar56._20_4_ = 0x243185be;
  auVar56._24_4_ = 0x243185be;
  auVar56._28_4_ = 0x243185be;
  auVar26 = vpaddd_avx2(auVar26,auVar56);
  auVar2 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0xec)),*(undefined4 *)(in + 0xac),1);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0x6c),2);
  auVar21 = vpaddd_avx2(auVar26,auVar21);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0x2c),3);
  auVar3 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0x1ec)),*(undefined4 *)(in + 0x1ac),1);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x16c),2);
  auVar26 = vpaddd_avx2(auVar51,auVar26);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 300),3);
  auVar168._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  auVar168._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  auVar51 = vpsrld_avx2(auVar21,6);
  auVar89 = vpslld_avx2(auVar21,0x1a);
  auVar160 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpsrld_avx2(auVar21,0xb);
  auVar89 = vpslld_avx2(auVar21,0x15);
  auVar161 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpsrld_avx2(auVar21,0x19);
  auVar89 = vpslld_avx2(auVar21,7);
  auVar169 = vpor_avx2(auVar89,auVar51);
  auVar89 = vpandn_avx2(auVar21,auVar20);
  auVar51 = vpand_avx2(auVar10,auVar21);
  auVar51 = vpor_avx2(auVar51,auVar89);
  auVar51 = vpaddd_avx2(auVar51,auVar88);
  auVar168 = vpshufb_avx2(auVar168,auVar110);
  auVar51 = vpaddd_avx2(auVar51,auVar168);
  auVar51 = vpaddd_avx2(auVar161 ^ auVar160 ^ auVar169,auVar51);
  auVar88 = vpsrld_avx2(auVar26,2);
  auVar89 = vpslld_avx2(auVar26,0x1e);
  auVar160 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpsrld_avx2(auVar26,0xd);
  auVar89 = vpslld_avx2(auVar26,0x13);
  auVar161 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpsrld_avx2(auVar26,0x16);
  auVar89 = vpslld_avx2(auVar26,10);
  auVar169 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpor_avx2(auVar26,auVar13);
  auVar88 = vpand_avx2(auVar88,auVar4);
  auVar89 = vpand_avx2(auVar26,auVar13);
  auVar88 = vpor_avx2(auVar88,auVar89);
  auVar88 = vpaddd_avx2(auVar88,auVar169 ^ auVar161 ^ auVar160);
  auVar111._8_4_ = 0x550c7dc3;
  auVar111._0_8_ = 0x550c7dc3550c7dc3;
  auVar111._12_4_ = 0x550c7dc3;
  auVar111._16_4_ = 0x550c7dc3;
  auVar111._20_4_ = 0x550c7dc3;
  auVar111._24_4_ = 0x550c7dc3;
  auVar111._28_4_ = 0x550c7dc3;
  auVar51 = vpaddd_avx2(auVar111,auVar51);
  auVar2 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0xf0)),*(undefined4 *)(in + 0xb0),1);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0x70),2);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0x30),3);
  auVar109 = vpaddd_avx2(auVar51,auVar109);
  auVar3 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0x1f0)),*(undefined4 *)(in + 0x1b0),1);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x170),2);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x130),3);
  auVar51 = vpaddd_avx2(auVar88,auVar51);
  auVar151._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  auVar151._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  auVar88 = vpsrld_avx2(auVar109,6);
  auVar89 = vpslld_avx2(auVar109,0x1a);
  auVar160 = vpor_avx2(auVar89,auVar88);
  auVar89 = vpsrld_avx2(auVar109,0xb);
  auVar88 = vpslld_avx2(auVar109,0x15);
  auVar161 = vpor_avx2(auVar88,auVar89);
  auVar88 = vpsrld_avx2(auVar109,0x19);
  auVar89 = vpslld_avx2(auVar109,7);
  auVar169 = vpor_avx2(auVar89,auVar88);
  auVar89 = vpandn_avx2(auVar109,auVar10);
  auVar88 = vpand_avx2(auVar109,auVar21);
  auVar88 = vpor_avx2(auVar88,auVar89);
  auVar20 = vpaddd_avx2(auVar88,auVar20);
  auVar151 = vpshufb_avx2(auVar151,auVar110);
  auVar20 = vpaddd_avx2(auVar20,auVar151);
  auVar20 = vpaddd_avx2(auVar20,auVar169 ^ auVar161 ^ auVar160);
  auVar88 = vpsrld_avx2(auVar51,2);
  auVar89 = vpslld_avx2(auVar51,0x1e);
  auVar160 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpsrld_avx2(auVar51,0xd);
  auVar89 = vpslld_avx2(auVar51,0x13);
  auVar161 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpsrld_avx2(auVar51,0x16);
  auVar89 = vpslld_avx2(auVar51,10);
  auVar169 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpor_avx2(auVar51,auVar26);
  auVar88 = vpand_avx2(auVar88,auVar13);
  auVar89 = vpand_avx2(auVar51,auVar26);
  auVar88 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpaddd_avx2(auVar161 ^ auVar160 ^ auVar169,auVar88);
  auVar58._8_4_ = 0x72be5d74;
  auVar58._0_8_ = 0x72be5d7472be5d74;
  auVar58._12_4_ = 0x72be5d74;
  auVar58._16_4_ = 0x72be5d74;
  auVar58._20_4_ = 0x72be5d74;
  auVar58._24_4_ = 0x72be5d74;
  auVar58._28_4_ = 0x72be5d74;
  auVar20 = vpaddd_avx2(auVar20,auVar58);
  auVar2 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0xf4)),*(undefined4 *)(in + 0xb4),1);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0x74),2);
  auVar4 = vpaddd_avx2(auVar20,auVar4);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0x34),3);
  auVar3 = vpinsrd_avx(ZEXT416(*(uint *)(in + 500)),*(undefined4 *)(in + 0x1b4),1);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x174),2);
  auVar20 = vpaddd_avx2(auVar88,auVar20);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x134),3);
  auVar152._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  auVar152._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  auVar88 = vpsrld_avx2(auVar4,6);
  auVar89 = vpslld_avx2(auVar4,0x1a);
  auVar160 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpsrld_avx2(auVar4,0xb);
  auVar89 = vpslld_avx2(auVar4,0x15);
  auVar161 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpsrld_avx2(auVar4,0x19);
  auVar89 = vpslld_avx2(auVar4,7);
  auVar169 = vpor_avx2(auVar89,auVar88);
  auVar89 = vpandn_avx2(auVar4,auVar21);
  auVar88 = vpand_avx2(auVar109,auVar4);
  auVar88 = vpor_avx2(auVar88,auVar89);
  auVar10 = vpaddd_avx2(auVar10,auVar88);
  auVar152 = vpshufb_avx2(auVar152,auVar110);
  auVar10 = vpaddd_avx2(auVar10,auVar152);
  auVar10 = vpaddd_avx2(auVar10,auVar169 ^ auVar161 ^ auVar160);
  auVar88 = vpsrld_avx2(auVar20,2);
  auVar89 = vpslld_avx2(auVar20,0x1e);
  auVar160 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpsrld_avx2(auVar20,0xd);
  auVar89 = vpslld_avx2(auVar20,0x13);
  auVar161 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpsrld_avx2(auVar20,0x16);
  auVar89 = vpslld_avx2(auVar20,10);
  auVar169 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpor_avx2(auVar20,auVar51);
  auVar88 = vpand_avx2(auVar88,auVar26);
  auVar89 = vpand_avx2(auVar20,auVar51);
  auVar88 = vpor_avx2(auVar88,auVar89);
  auVar88 = vpaddd_avx2(auVar88,auVar169 ^ auVar161 ^ auVar160);
  auVar112._8_4_ = 0x80deb1fe;
  auVar112._0_8_ = 0x80deb1fe80deb1fe;
  auVar112._12_4_ = 0x80deb1fe;
  auVar112._16_4_ = 0x80deb1fe;
  auVar112._20_4_ = 0x80deb1fe;
  auVar112._24_4_ = 0x80deb1fe;
  auVar112._28_4_ = 0x80deb1fe;
  auVar10 = vpaddd_avx2(auVar112,auVar10);
  auVar2 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0xf8)),*(undefined4 *)(in + 0xb8),1);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0x78),2);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0x38),3);
  auVar13 = vpaddd_avx2(auVar10,auVar13);
  auVar3 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0x1f8)),*(undefined4 *)(in + 0x1b8),1);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x178),2);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x138),3);
  auVar10 = vpaddd_avx2(auVar88,auVar10);
  auVar153._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  auVar153._16_16_ = ZEXT116(1) * auVar2;
  auVar88 = vpsrld_avx2(auVar13,6);
  auVar89 = vpslld_avx2(auVar13,0x1a);
  auVar160 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpsrld_avx2(auVar13,0xb);
  auVar89 = vpslld_avx2(auVar13,0x15);
  auVar161 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpsrld_avx2(auVar13,0x19);
  auVar89 = vpslld_avx2(auVar13,7);
  auVar169 = vpor_avx2(auVar89,auVar88);
  auVar89 = vpandn_avx2(auVar13,auVar109);
  auVar88 = vpand_avx2(auVar13,auVar4);
  auVar88 = vpor_avx2(auVar88,auVar89);
  auVar21 = vpaddd_avx2(auVar88,auVar21);
  auVar153 = vpshufb_avx2(auVar153,auVar110);
  auVar21 = vpaddd_avx2(auVar153,auVar21);
  auVar21 = vpaddd_avx2(auVar21,auVar169 ^ auVar161 ^ auVar160);
  auVar88 = vpsrld_avx2(auVar10,2);
  auVar89 = vpslld_avx2(auVar10,0x1e);
  auVar160 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpsrld_avx2(auVar10,0xd);
  auVar89 = vpslld_avx2(auVar10,0x13);
  auVar161 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpsrld_avx2(auVar10,0x16);
  auVar89 = vpslld_avx2(auVar10,10);
  auVar169 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpor_avx2(auVar10,auVar20);
  auVar88 = vpand_avx2(auVar88,auVar51);
  auVar89 = vpand_avx2(auVar10,auVar20);
  auVar88 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpaddd_avx2(auVar161 ^ auVar160 ^ auVar169,auVar88);
  auVar148._8_4_ = 0x9bdc06a7;
  auVar148._0_8_ = 0x9bdc06a79bdc06a7;
  auVar148._12_4_ = 0x9bdc06a7;
  auVar148._16_4_ = 0x9bdc06a7;
  auVar148._20_4_ = 0x9bdc06a7;
  auVar148._24_4_ = 0x9bdc06a7;
  auVar148._28_4_ = 0x9bdc06a7;
  auVar21 = vpaddd_avx2(auVar21,auVar148);
  auVar2 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0xfc)),*(undefined4 *)(in + 0xbc),1);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0x7c),2);
  auVar26 = vpaddd_avx2(auVar21,auVar26);
  auVar2 = vpinsrd_avx(auVar2,*(undefined4 *)(in + 0x3c),3);
  auVar3 = vpinsrd_avx(ZEXT416(*(uint *)(in + 0x1fc)),*(undefined4 *)(in + 0x1bc),1);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x17c),2);
  auVar21 = vpaddd_avx2(auVar88,auVar21);
  auVar3 = vpinsrd_avx(auVar3,*(undefined4 *)(in + 0x13c),3);
  auVar16._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  auVar16._16_16_ = ZEXT116(1) * auVar2;
  auVar88 = vpsrld_avx2(auVar26,6);
  auVar89 = vpslld_avx2(auVar26,0x1a);
  auVar160 = vpor_avx2(auVar89,auVar88);
  auVar89 = vpsrld_avx2(auVar26,0xb);
  auVar88 = vpslld_avx2(auVar26,0x15);
  auVar161 = vpor_avx2(auVar88,auVar89);
  auVar88 = vpsrld_avx2(auVar26,0x19);
  auVar89 = vpslld_avx2(auVar26,7);
  auVar169 = vpor_avx2(auVar89,auVar88);
  auVar89 = vpandn_avx2(auVar26,auVar4);
  auVar88 = vpand_avx2(auVar13,auVar26);
  auVar88 = vpor_avx2(auVar88,auVar89);
  auVar109 = vpaddd_avx2(auVar109,auVar88);
  auVar6 = vpshufb_avx2(auVar16,auVar110);
  auVar109 = vpaddd_avx2(auVar109,auVar6);
  auVar109 = vpaddd_avx2(auVar109,auVar169 ^ auVar161 ^ auVar160);
  auVar88._8_4_ = 0xc19bf174;
  auVar88._0_8_ = 0xc19bf174c19bf174;
  auVar88._12_4_ = 0xc19bf174;
  auVar88._16_4_ = 0xc19bf174;
  auVar88._20_4_ = 0xc19bf174;
  auVar88._24_4_ = 0xc19bf174;
  auVar88._28_4_ = 0xc19bf174;
  auVar109 = vpaddd_avx2(auVar109,auVar88);
  auVar88 = vpsrld_avx2(auVar21,2);
  auVar89 = vpslld_avx2(auVar21,0x1e);
  auVar160 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpsrld_avx2(auVar21,0xd);
  auVar89 = vpslld_avx2(auVar21,0x13);
  auVar161 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpsrld_avx2(auVar21,0x16);
  auVar89 = vpslld_avx2(auVar21,10);
  auVar169 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpor_avx2(auVar21,auVar10);
  auVar88 = vpand_avx2(auVar88,auVar20);
  auVar89 = vpand_avx2(auVar21,auVar10);
  auVar88 = vpor_avx2(auVar88,auVar89);
  auVar88 = vpaddd_avx2(auVar88,auVar169 ^ auVar161 ^ auVar160);
  auVar51 = vpaddd_avx2(auVar109,auVar51);
  auVar109 = vpaddd_avx2(auVar88,auVar109);
  auVar88 = vpsrld_avx2(auVar153,0x11);
  auVar89 = vpslld_avx2(auVar153,0xf);
  auVar89 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpsrld_avx2(auVar153,0x13);
  auVar160 = vpslld_avx2(auVar153,0xd);
  auVar160 = vpor_avx2(auVar160,auVar88);
  auVar170 = vpsrld_avx2(auVar153,10);
  auVar88 = vpsrld_avx2(auVar142,7);
  auVar161 = vpslld_avx2(auVar142,0x19);
  auVar161 = vpor_avx2(auVar161,auVar88);
  auVar88 = vpsrld_avx2(auVar142,0x12);
  auVar169 = vpslld_avx2(auVar142,0xe);
  auVar169 = vpor_avx2(auVar169,auVar88);
  auVar113 = vpsrld_avx2(auVar142,3);
  auVar88 = vpaddd_avx2(auVar114,auVar166);
  auVar88 = vpaddd_avx2(auVar169 ^ auVar161 ^ auVar113,auVar88);
  auVar88 = vpaddd_avx2(auVar88,auVar170 ^ auVar160 ^ auVar89);
  auVar89 = vpsrld_avx2(auVar51,6);
  auVar160 = vpslld_avx2(auVar51,0x1a);
  auVar161 = vpor_avx2(auVar160,auVar89);
  auVar89 = vpsrld_avx2(auVar51,0xb);
  auVar160 = vpslld_avx2(auVar51,0x15);
  auVar169 = vpor_avx2(auVar160,auVar89);
  auVar89 = vpsrld_avx2(auVar51,0x19);
  auVar160 = vpslld_avx2(auVar51,7);
  auVar170 = vpor_avx2(auVar160,auVar89);
  auVar160 = vpandn_avx2(auVar51,auVar13);
  auVar89 = vpand_avx2(auVar26,auVar51);
  auVar89 = vpor_avx2(auVar89,auVar160);
  auVar4 = vpaddd_avx2(auVar88,auVar4);
  auVar4 = vpaddd_avx2(auVar89,auVar4);
  auVar96._8_4_ = 0xe49b69c1;
  auVar96._0_8_ = 0xe49b69c1e49b69c1;
  auVar96._12_4_ = 0xe49b69c1;
  auVar96._16_4_ = 0xe49b69c1;
  auVar96._20_4_ = 0xe49b69c1;
  auVar96._24_4_ = 0xe49b69c1;
  auVar96._28_4_ = 0xe49b69c1;
  auVar4 = vpaddd_avx2(auVar96,auVar4);
  auVar4 = vpaddd_avx2(auVar4,auVar170 ^ auVar169 ^ auVar161);
  auVar89 = vpsrld_avx2(auVar109,2);
  auVar160 = vpslld_avx2(auVar109,0x1e);
  auVar161 = vpor_avx2(auVar160,auVar89);
  auVar89 = vpsrld_avx2(auVar109,0xd);
  auVar160 = vpslld_avx2(auVar109,0x13);
  auVar169 = vpor_avx2(auVar160,auVar89);
  auVar89 = vpsrld_avx2(auVar109,0x16);
  auVar160 = vpslld_avx2(auVar109,10);
  auVar170 = vpor_avx2(auVar160,auVar89);
  auVar89 = vpor_avx2(auVar109,auVar21);
  auVar89 = vpand_avx2(auVar89,auVar10);
  auVar160 = vpand_avx2(auVar109,auVar21);
  auVar89 = vpor_avx2(auVar89,auVar160);
  auVar89 = vpaddd_avx2(auVar89,auVar170 ^ auVar169 ^ auVar161);
  auVar20 = vpaddd_avx2(auVar4,auVar20);
  auVar4 = vpaddd_avx2(auVar89,auVar4);
  auVar89 = vpsrld_avx2(auVar6,0x11);
  auVar160 = vpslld_avx2(auVar6,0xf);
  auVar160 = vpor_avx2(auVar160,auVar89);
  auVar89 = vpsrld_avx2(auVar6,0x13);
  auVar161 = vpslld_avx2(auVar6,0xd);
  auVar161 = vpor_avx2(auVar161,auVar89);
  auVar113 = vpsrld_avx2(auVar6,10);
  auVar89 = vpsrld_avx2(auVar98,7);
  auVar169 = vpslld_avx2(auVar98,0x19);
  auVar169 = vpor_avx2(auVar169,auVar89);
  auVar89 = vpsrld_avx2(auVar98,0x12);
  auVar170 = vpslld_avx2(auVar98,0xe);
  auVar170 = vpor_avx2(auVar170,auVar89);
  auVar114 = vpsrld_avx2(auVar98,3);
  auVar89 = vpaddd_avx2(auVar142,auVar167);
  auVar89 = vpaddd_avx2(auVar170 ^ auVar169 ^ auVar114,auVar89);
  auVar89 = vpaddd_avx2(auVar89,auVar113 ^ auVar161 ^ auVar160);
  auVar160 = vpsrld_avx2(auVar20,6);
  auVar161 = vpslld_avx2(auVar20,0x1a);
  auVar169 = vpor_avx2(auVar161,auVar160);
  auVar160 = vpsrld_avx2(auVar20,0xb);
  auVar161 = vpslld_avx2(auVar20,0x15);
  auVar170 = vpor_avx2(auVar161,auVar160);
  auVar160 = vpsrld_avx2(auVar20,0x19);
  auVar161 = vpslld_avx2(auVar20,7);
  auVar113 = vpor_avx2(auVar161,auVar160);
  auVar161 = vpandn_avx2(auVar20,auVar26);
  auVar160 = vpand_avx2(auVar51,auVar20);
  auVar160 = vpor_avx2(auVar160,auVar161);
  auVar13 = vpaddd_avx2(auVar13,auVar89);
  auVar141._8_4_ = 0xefbe4786;
  auVar141._0_8_ = 0xefbe4786efbe4786;
  auVar141._12_4_ = 0xefbe4786;
  auVar141._16_4_ = 0xefbe4786;
  auVar141._20_4_ = 0xefbe4786;
  auVar141._24_4_ = 0xefbe4786;
  auVar141._28_4_ = 0xefbe4786;
  auVar13 = vpaddd_avx2(auVar13,auVar160);
  auVar13 = vpaddd_avx2(auVar13,auVar141);
  auVar13 = vpaddd_avx2(auVar13,auVar113 ^ auVar170 ^ auVar169);
  auVar160 = vpsrld_avx2(auVar4,2);
  auVar161 = vpslld_avx2(auVar4,0x1e);
  auVar169 = vpor_avx2(auVar161,auVar160);
  auVar160 = vpsrld_avx2(auVar4,0xd);
  auVar161 = vpslld_avx2(auVar4,0x13);
  auVar170 = vpor_avx2(auVar161,auVar160);
  auVar160 = vpsrld_avx2(auVar4,0x16);
  auVar161 = vpslld_avx2(auVar4,10);
  auVar113 = vpor_avx2(auVar161,auVar160);
  auVar160 = vpor_avx2(auVar4,auVar109);
  auVar160 = vpand_avx2(auVar160,auVar21);
  auVar161 = vpand_avx2(auVar4,auVar109);
  auVar160 = vpor_avx2(auVar160,auVar161);
  auVar160 = vpaddd_avx2(auVar170 ^ auVar169 ^ auVar113,auVar160);
  auVar10 = vpaddd_avx2(auVar13,auVar10);
  auVar13 = vpaddd_avx2(auVar160,auVar13);
  auVar160 = vpsrld_avx2(auVar88,0x11);
  auVar161 = vpslld_avx2(auVar88,0xf);
  auVar161 = vpor_avx2(auVar161,auVar160);
  auVar160 = vpsrld_avx2(auVar88,0x13);
  auVar169 = vpslld_avx2(auVar88,0xd);
  auVar169 = vpor_avx2(auVar169,auVar160);
  auVar114 = vpsrld_avx2(auVar88,10);
  auVar160 = vpsrld_avx2(auVar99,7);
  auVar170 = vpslld_avx2(auVar99,0x19);
  auVar170 = vpor_avx2(auVar170,auVar160);
  auVar160 = vpsrld_avx2(auVar99,0x12);
  auVar113 = vpslld_avx2(auVar99,0xe);
  auVar113 = vpor_avx2(auVar113,auVar160);
  auVar142 = vpsrld_avx2(auVar99,3);
  auVar160 = vpaddd_avx2(auVar98,auVar168);
  auVar160 = vpaddd_avx2(auVar113 ^ auVar170 ^ auVar142,auVar160);
  auVar160 = vpaddd_avx2(auVar160,auVar114 ^ auVar169 ^ auVar161);
  auVar161 = vpsrld_avx2(auVar10,6);
  auVar169 = vpslld_avx2(auVar10,0x1a);
  auVar170 = vpor_avx2(auVar169,auVar161);
  auVar161 = vpsrld_avx2(auVar10,0xb);
  auVar169 = vpslld_avx2(auVar10,0x15);
  auVar113 = vpor_avx2(auVar169,auVar161);
  auVar161 = vpsrld_avx2(auVar10,0x19);
  auVar169 = vpslld_avx2(auVar10,7);
  auVar114 = vpor_avx2(auVar169,auVar161);
  auVar169 = vpandn_avx2(auVar10,auVar51);
  auVar161 = vpand_avx2(auVar20,auVar10);
  auVar161 = vpor_avx2(auVar161,auVar169);
  auVar26 = vpaddd_avx2(auVar160,auVar26);
  auVar26 = vpaddd_avx2(auVar161,auVar26);
  auVar97._8_4_ = 0xfc19dc6;
  auVar97._0_8_ = 0xfc19dc60fc19dc6;
  auVar97._12_4_ = 0xfc19dc6;
  auVar97._16_4_ = 0xfc19dc6;
  auVar97._20_4_ = 0xfc19dc6;
  auVar97._24_4_ = 0xfc19dc6;
  auVar97._28_4_ = 0xfc19dc6;
  auVar26 = vpaddd_avx2(auVar97,auVar26);
  auVar26 = vpaddd_avx2(auVar26,auVar114 ^ auVar113 ^ auVar170);
  auVar161 = vpsrld_avx2(auVar13,2);
  auVar169 = vpslld_avx2(auVar13,0x1e);
  auVar170 = vpor_avx2(auVar169,auVar161);
  auVar161 = vpsrld_avx2(auVar13,0xd);
  auVar169 = vpslld_avx2(auVar13,0x13);
  auVar113 = vpor_avx2(auVar169,auVar161);
  auVar161 = vpsrld_avx2(auVar13,0x16);
  auVar169 = vpslld_avx2(auVar13,10);
  auVar114 = vpor_avx2(auVar169,auVar161);
  auVar161 = vpor_avx2(auVar13,auVar4);
  auVar161 = vpand_avx2(auVar161,auVar109);
  auVar169 = vpand_avx2(auVar13,auVar4);
  auVar161 = vpor_avx2(auVar161,auVar169);
  auVar161 = vpaddd_avx2(auVar161,auVar114 ^ auVar113 ^ auVar170);
  auVar21 = vpaddd_avx2(auVar26,auVar21);
  auVar26 = vpaddd_avx2(auVar161,auVar26);
  auVar161 = vpsrld_avx2(auVar89,0x11);
  auVar169 = vpslld_avx2(auVar89,0xf);
  auVar169 = vpor_avx2(auVar169,auVar161);
  auVar161 = vpsrld_avx2(auVar89,0x13);
  auVar170 = vpslld_avx2(auVar89,0xd);
  auVar170 = vpor_avx2(auVar170,auVar161);
  auVar142 = vpsrld_avx2(auVar89,10);
  auVar161 = vpsrld_avx2(auVar100,7);
  auVar113 = vpslld_avx2(auVar100,0x19);
  auVar113 = vpor_avx2(auVar113,auVar161);
  auVar161 = vpsrld_avx2(auVar100,0x12);
  auVar114 = vpslld_avx2(auVar100,0xe);
  auVar114 = vpor_avx2(auVar114,auVar161);
  auVar98 = vpsrld_avx2(auVar100,3);
  auVar161 = vpaddd_avx2(auVar99,auVar151);
  auVar161 = vpaddd_avx2(auVar161,auVar98 ^ auVar114 ^ auVar113);
  auVar161 = vpaddd_avx2(auVar161,auVar170 ^ auVar169 ^ auVar142);
  auVar169 = vpsrld_avx2(auVar21,6);
  auVar170 = vpslld_avx2(auVar21,0x1a);
  auVar113 = vpor_avx2(auVar170,auVar169);
  auVar169 = vpsrld_avx2(auVar21,0xb);
  auVar170 = vpslld_avx2(auVar21,0x15);
  auVar114 = vpor_avx2(auVar170,auVar169);
  auVar169 = vpsrld_avx2(auVar21,0x19);
  auVar170 = vpslld_avx2(auVar21,7);
  auVar142 = vpor_avx2(auVar170,auVar169);
  auVar170 = vpandn_avx2(auVar21,auVar20);
  auVar169 = vpand_avx2(auVar10,auVar21);
  auVar169 = vpor_avx2(auVar169,auVar170);
  auVar51 = vpaddd_avx2(auVar161,auVar51);
  auVar51 = vpaddd_avx2(auVar51,auVar169);
  auVar27._8_4_ = 0x240ca1cc;
  auVar27._0_8_ = 0x240ca1cc240ca1cc;
  auVar27._12_4_ = 0x240ca1cc;
  auVar27._16_4_ = 0x240ca1cc;
  auVar27._20_4_ = 0x240ca1cc;
  auVar27._24_4_ = 0x240ca1cc;
  auVar27._28_4_ = 0x240ca1cc;
  auVar51 = vpaddd_avx2(auVar51,auVar27);
  auVar51 = vpaddd_avx2(auVar51,auVar114 ^ auVar113 ^ auVar142);
  auVar169 = vpsrld_avx2(auVar26,2);
  auVar170 = vpslld_avx2(auVar26,0x1e);
  auVar113 = vpor_avx2(auVar170,auVar169);
  auVar169 = vpsrld_avx2(auVar26,0xd);
  auVar170 = vpslld_avx2(auVar26,0x13);
  auVar114 = vpor_avx2(auVar170,auVar169);
  auVar169 = vpsrld_avx2(auVar26,0x16);
  auVar170 = vpslld_avx2(auVar26,10);
  auVar142 = vpor_avx2(auVar170,auVar169);
  auVar169 = vpor_avx2(auVar26,auVar13);
  auVar169 = vpand_avx2(auVar169,auVar4);
  auVar170 = vpand_avx2(auVar26,auVar13);
  auVar169 = vpor_avx2(auVar170,auVar169);
  auVar169 = vpaddd_avx2(auVar114 ^ auVar113 ^ auVar142,auVar169);
  auVar109 = vpaddd_avx2(auVar51,auVar109);
  auVar51 = vpaddd_avx2(auVar169,auVar51);
  auVar169 = vpsrld_avx2(auVar160,0x11);
  auVar170 = vpslld_avx2(auVar160,0xf);
  auVar170 = vpor_avx2(auVar170,auVar169);
  auVar169 = vpsrld_avx2(auVar160,0x13);
  auVar113 = vpslld_avx2(auVar160,0xd);
  auVar113 = vpor_avx2(auVar113,auVar169);
  auVar98 = vpsrld_avx2(auVar160,10);
  auVar169 = vpsrld_avx2(auVar115,7);
  auVar114 = vpslld_avx2(auVar115,0x19);
  auVar114 = vpor_avx2(auVar114,auVar169);
  auVar169 = vpsrld_avx2(auVar115,0x12);
  auVar142 = vpslld_avx2(auVar115,0xe);
  auVar142 = vpor_avx2(auVar142,auVar169);
  auVar99 = vpsrld_avx2(auVar115,3);
  auVar169 = vpaddd_avx2(auVar100,auVar152);
  auVar169 = vpaddd_avx2(auVar169,auVar99 ^ auVar142 ^ auVar114);
  auVar169 = vpaddd_avx2(auVar169,auVar113 ^ auVar170 ^ auVar98);
  auVar170 = vpsrld_avx2(auVar109,6);
  auVar113 = vpslld_avx2(auVar109,0x1a);
  auVar114 = vpor_avx2(auVar113,auVar170);
  auVar170 = vpsrld_avx2(auVar109,0xb);
  auVar113 = vpslld_avx2(auVar109,0x15);
  auVar142 = vpor_avx2(auVar113,auVar170);
  auVar170 = vpsrld_avx2(auVar109,0x19);
  auVar113 = vpslld_avx2(auVar109,7);
  auVar98 = vpor_avx2(auVar113,auVar170);
  auVar113 = vpandn_avx2(auVar109,auVar10);
  auVar170 = vpand_avx2(auVar21,auVar109);
  auVar170 = vpor_avx2(auVar170,auVar113);
  auVar20 = vpaddd_avx2(auVar169,auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar170);
  auVar28._8_4_ = 0x2de92c6f;
  auVar28._0_8_ = 0x2de92c6f2de92c6f;
  auVar28._12_4_ = 0x2de92c6f;
  auVar28._16_4_ = 0x2de92c6f;
  auVar28._20_4_ = 0x2de92c6f;
  auVar28._24_4_ = 0x2de92c6f;
  auVar28._28_4_ = 0x2de92c6f;
  auVar20 = vpaddd_avx2(auVar20,auVar28);
  auVar20 = vpaddd_avx2(auVar20,auVar142 ^ auVar114 ^ auVar98);
  auVar170 = vpsrld_avx2(auVar51,2);
  auVar113 = vpslld_avx2(auVar51,0x1e);
  auVar114 = vpor_avx2(auVar113,auVar170);
  auVar170 = vpsrld_avx2(auVar51,0xd);
  auVar113 = vpslld_avx2(auVar51,0x13);
  auVar142 = vpor_avx2(auVar113,auVar170);
  auVar170 = vpsrld_avx2(auVar51,0x16);
  auVar113 = vpslld_avx2(auVar51,10);
  auVar98 = vpor_avx2(auVar113,auVar170);
  auVar170 = vpor_avx2(auVar26,auVar51);
  auVar170 = vpand_avx2(auVar13,auVar170);
  auVar113 = vpand_avx2(auVar26,auVar51);
  auVar170 = vpor_avx2(auVar113,auVar170);
  auVar170 = vpaddd_avx2(auVar142 ^ auVar114 ^ auVar98,auVar170);
  auVar4 = vpaddd_avx2(auVar20,auVar4);
  auVar20 = vpaddd_avx2(auVar170,auVar20);
  auVar170 = vpsrld_avx2(auVar161,0x11);
  auVar113 = vpslld_avx2(auVar161,0xf);
  auVar113 = vpor_avx2(auVar113,auVar170);
  auVar170 = vpsrld_avx2(auVar161,0x13);
  auVar114 = vpslld_avx2(auVar161,0xd);
  auVar114 = vpor_avx2(auVar114,auVar170);
  auVar99 = vpsrld_avx2(auVar161,10);
  auVar170 = vpsrld_avx2(auVar163,7);
  auVar142 = vpslld_avx2(auVar163,0x19);
  auVar142 = vpor_avx2(auVar142,auVar170);
  auVar170 = vpsrld_avx2(auVar163,0x12);
  auVar98 = vpslld_avx2(auVar163,0xe);
  auVar98 = vpor_avx2(auVar98,auVar170);
  auVar100 = vpsrld_avx2(auVar163,3);
  auVar170 = vpaddd_avx2(auVar115,auVar153);
  auVar170 = vpaddd_avx2(auVar170,auVar100 ^ auVar98 ^ auVar142);
  auVar170 = vpaddd_avx2(auVar170,auVar114 ^ auVar113 ^ auVar99);
  auVar113 = vpsrld_avx2(auVar4,6);
  auVar114 = vpslld_avx2(auVar4,0x1a);
  auVar142 = vpor_avx2(auVar114,auVar113);
  auVar113 = vpsrld_avx2(auVar4,0xb);
  auVar114 = vpslld_avx2(auVar4,0x15);
  auVar98 = vpor_avx2(auVar114,auVar113);
  auVar113 = vpsrld_avx2(auVar4,0x19);
  auVar114 = vpslld_avx2(auVar4,7);
  auVar99 = vpor_avx2(auVar114,auVar113);
  auVar114 = vpandn_avx2(auVar4,auVar21);
  auVar113 = vpand_avx2(auVar109,auVar4);
  auVar113 = vpor_avx2(auVar113,auVar114);
  auVar10 = vpaddd_avx2(auVar170,auVar10);
  auVar101._8_4_ = 0x4a7484aa;
  auVar101._0_8_ = 0x4a7484aa4a7484aa;
  auVar101._12_4_ = 0x4a7484aa;
  auVar101._16_4_ = 0x4a7484aa;
  auVar101._20_4_ = 0x4a7484aa;
  auVar101._24_4_ = 0x4a7484aa;
  auVar101._28_4_ = 0x4a7484aa;
  auVar10 = vpaddd_avx2(auVar10,auVar113);
  auVar10 = vpaddd_avx2(auVar101,auVar10);
  auVar10 = vpaddd_avx2(auVar10,auVar98 ^ auVar142 ^ auVar99);
  auVar113 = vpsrld_avx2(auVar20,2);
  auVar114 = vpslld_avx2(auVar20,0x1e);
  auVar142 = vpor_avx2(auVar114,auVar113);
  auVar113 = vpsrld_avx2(auVar20,0xd);
  auVar114 = vpslld_avx2(auVar20,0x13);
  auVar98 = vpor_avx2(auVar114,auVar113);
  auVar113 = vpsrld_avx2(auVar20,0x16);
  auVar114 = vpslld_avx2(auVar20,10);
  auVar99 = vpor_avx2(auVar114,auVar113);
  auVar113 = vpor_avx2(auVar20,auVar51);
  auVar113 = vpand_avx2(auVar26,auVar113);
  auVar114 = vpand_avx2(auVar20,auVar51);
  auVar113 = vpor_avx2(auVar114,auVar113);
  auVar113 = vpaddd_avx2(auVar98 ^ auVar142 ^ auVar99,auVar113);
  auVar13 = vpaddd_avx2(auVar13,auVar10);
  auVar10 = vpaddd_avx2(auVar113,auVar10);
  auVar113 = vpsrld_avx2(auVar169,0x11);
  auVar114 = vpslld_avx2(auVar169,0xf);
  auVar114 = vpor_avx2(auVar114,auVar113);
  auVar113 = vpsrld_avx2(auVar169,0x13);
  auVar142 = vpslld_avx2(auVar169,0xd);
  auVar142 = vpor_avx2(auVar142,auVar113);
  auVar100 = vpsrld_avx2(auVar169,10);
  auVar113 = vpsrld_avx2(auVar164,7);
  auVar98 = vpslld_avx2(auVar164,0x19);
  auVar98 = vpor_avx2(auVar98,auVar113);
  auVar113 = vpsrld_avx2(auVar164,0x12);
  auVar99 = vpslld_avx2(auVar164,0xe);
  auVar99 = vpor_avx2(auVar99,auVar113);
  auVar115 = vpsrld_avx2(auVar164,3);
  auVar113 = vpaddd_avx2(auVar163,auVar6);
  auVar113 = vpaddd_avx2(auVar113,auVar115 ^ auVar99 ^ auVar98);
  auVar113 = vpaddd_avx2(auVar113,auVar142 ^ auVar114 ^ auVar100);
  auVar114 = vpsrld_avx2(auVar13,6);
  auVar142 = vpslld_avx2(auVar13,0x1a);
  auVar98 = vpor_avx2(auVar142,auVar114);
  auVar114 = vpsrld_avx2(auVar13,0xb);
  auVar142 = vpslld_avx2(auVar13,0x15);
  auVar99 = vpor_avx2(auVar142,auVar114);
  auVar114 = vpsrld_avx2(auVar13,0x19);
  auVar142 = vpslld_avx2(auVar13,7);
  auVar100 = vpor_avx2(auVar142,auVar114);
  auVar142 = vpandn_avx2(auVar13,auVar109);
  auVar114 = vpand_avx2(auVar4,auVar13);
  auVar114 = vpor_avx2(auVar114,auVar142);
  auVar21 = vpaddd_avx2(auVar113,auVar21);
  auVar21 = vpaddd_avx2(auVar21,auVar114);
  auVar29._8_4_ = 0x5cb0a9dc;
  auVar29._0_8_ = 0x5cb0a9dc5cb0a9dc;
  auVar29._12_4_ = 0x5cb0a9dc;
  auVar29._16_4_ = 0x5cb0a9dc;
  auVar29._20_4_ = 0x5cb0a9dc;
  auVar29._24_4_ = 0x5cb0a9dc;
  auVar29._28_4_ = 0x5cb0a9dc;
  auVar21 = vpaddd_avx2(auVar21,auVar29);
  auVar21 = vpaddd_avx2(auVar21,auVar99 ^ auVar98 ^ auVar100);
  auVar114 = vpsrld_avx2(auVar10,2);
  auVar142 = vpslld_avx2(auVar10,0x1e);
  auVar98 = vpor_avx2(auVar142,auVar114);
  auVar114 = vpsrld_avx2(auVar10,0xd);
  auVar142 = vpslld_avx2(auVar10,0x13);
  auVar99 = vpor_avx2(auVar142,auVar114);
  auVar114 = vpsrld_avx2(auVar10,0x16);
  auVar142 = vpslld_avx2(auVar10,10);
  auVar100 = vpor_avx2(auVar142,auVar114);
  auVar114 = vpor_avx2(auVar10,auVar20);
  auVar114 = vpand_avx2(auVar114,auVar51);
  auVar142 = vpand_avx2(auVar10,auVar20);
  auVar114 = vpor_avx2(auVar142,auVar114);
  auVar114 = vpaddd_avx2(auVar99 ^ auVar98 ^ auVar100,auVar114);
  auVar26 = vpaddd_avx2(auVar26,auVar21);
  auVar21 = vpaddd_avx2(auVar114,auVar21);
  auVar114 = vpsrld_avx2(auVar170,0x11);
  auVar142 = vpslld_avx2(auVar170,0xf);
  auVar142 = vpor_avx2(auVar142,auVar114);
  auVar114 = vpsrld_avx2(auVar170,0x13);
  auVar98 = vpslld_avx2(auVar170,0xd);
  auVar98 = vpor_avx2(auVar98,auVar114);
  auVar100 = vpsrld_avx2(auVar170,10);
  auVar114 = vpsrld_avx2(auVar165,7);
  auVar99 = vpslld_avx2(auVar165,0x19);
  auVar114 = vpor_avx2(auVar99,auVar114);
  auVar99 = vpsrld_avx2(auVar165,0x12);
  auVar115 = vpslld_avx2(auVar165,0xe);
  auVar99 = vpor_avx2(auVar115,auVar99);
  auVar115 = vpsrld_avx2(auVar165,3);
  auVar114 = vpaddd_avx2(auVar99 ^ auVar114 ^ auVar115,auVar164);
  auVar114 = vpaddd_avx2(auVar114,auVar88);
  auVar114 = vpaddd_avx2(auVar114,auVar100 ^ auVar98 ^ auVar142);
  auVar142 = vpsrld_avx2(auVar26,6);
  auVar98 = vpslld_avx2(auVar26,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0xb);
  auVar98 = vpslld_avx2(auVar26,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0x19);
  auVar98 = vpslld_avx2(auVar26,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar26,auVar4);
  auVar142 = vpand_avx2(auVar13,auVar26);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar109 = vpaddd_avx2(auVar114,auVar109);
  auVar109 = vpaddd_avx2(auVar142,auVar109);
  auVar116._8_4_ = 0x76f988da;
  auVar116._0_8_ = 0x76f988da76f988da;
  auVar116._12_4_ = 0x76f988da;
  auVar116._16_4_ = 0x76f988da;
  auVar116._20_4_ = 0x76f988da;
  auVar116._24_4_ = 0x76f988da;
  auVar116._28_4_ = 0x76f988da;
  auVar109 = vpaddd_avx2(auVar116,auVar109);
  auVar109 = vpaddd_avx2(auVar109,auVar115 ^ auVar100 ^ auVar99);
  auVar142 = vpsrld_avx2(auVar21,2);
  auVar98 = vpslld_avx2(auVar21,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar21,0xd);
  auVar98 = vpslld_avx2(auVar21,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar21,0x16);
  auVar98 = vpslld_avx2(auVar21,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar10,auVar21);
  auVar142 = vpand_avx2(auVar142,auVar20);
  auVar98 = vpand_avx2(auVar10,auVar21);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar142 = vpaddd_avx2(auVar142,auVar115 ^ auVar100 ^ auVar99);
  auVar51 = vpaddd_avx2(auVar109,auVar51);
  auVar109 = vpaddd_avx2(auVar142,auVar109);
  auVar142 = vpsrld_avx2(auVar113,0x11);
  auVar98 = vpslld_avx2(auVar113,0xf);
  auVar98 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0x13);
  auVar99 = vpslld_avx2(auVar113,0xd);
  auVar99 = vpor_avx2(auVar99,auVar142);
  auVar115 = vpsrld_avx2(auVar113,10);
  auVar142 = vpsrld_avx2(auVar166,7);
  auVar100 = vpslld_avx2(auVar166,0x19);
  auVar142 = vpor_avx2(auVar100,auVar142);
  auVar163 = vpsrld_avx2(auVar166,0x12);
  auVar100 = vpslld_avx2(auVar166,0xe);
  auVar100 = vpor_avx2(auVar100,auVar163);
  auVar163 = vpsrld_avx2(auVar166,3);
  auVar142 = vpaddd_avx2(auVar100 ^ auVar142 ^ auVar163,auVar165);
  auVar142 = vpaddd_avx2(auVar142,auVar89);
  auVar142 = vpaddd_avx2(auVar142,auVar115 ^ auVar99 ^ auVar98);
  auVar98 = vpsrld_avx2(auVar51,6);
  auVar99 = vpslld_avx2(auVar51,0x1a);
  auVar100 = vpor_avx2(auVar99,auVar98);
  auVar98 = vpsrld_avx2(auVar51,0xb);
  auVar99 = vpslld_avx2(auVar51,0x15);
  auVar115 = vpor_avx2(auVar99,auVar98);
  auVar98 = vpsrld_avx2(auVar51,0x19);
  auVar99 = vpslld_avx2(auVar51,7);
  auVar163 = vpor_avx2(auVar99,auVar98);
  auVar99 = vpandn_avx2(auVar51,auVar13);
  auVar98 = vpand_avx2(auVar26,auVar51);
  auVar98 = vpor_avx2(auVar98,auVar99);
  auVar4 = vpaddd_avx2(auVar142,auVar4);
  auVar4 = vpaddd_avx2(auVar98,auVar4);
  auVar117._8_4_ = 0x983e5152;
  auVar117._0_8_ = 0x983e5152983e5152;
  auVar117._12_4_ = 0x983e5152;
  auVar117._16_4_ = 0x983e5152;
  auVar117._20_4_ = 0x983e5152;
  auVar117._24_4_ = 0x983e5152;
  auVar117._28_4_ = 0x983e5152;
  auVar4 = vpaddd_avx2(auVar117,auVar4);
  auVar4 = vpaddd_avx2(auVar4,auVar163 ^ auVar115 ^ auVar100);
  auVar98 = vpsrld_avx2(auVar109,2);
  auVar99 = vpslld_avx2(auVar109,0x1e);
  auVar100 = vpor_avx2(auVar99,auVar98);
  auVar98 = vpsrld_avx2(auVar109,0xd);
  auVar99 = vpslld_avx2(auVar109,0x13);
  auVar115 = vpor_avx2(auVar99,auVar98);
  auVar98 = vpsrld_avx2(auVar109,0x16);
  auVar99 = vpslld_avx2(auVar109,10);
  auVar163 = vpor_avx2(auVar99,auVar98);
  auVar98 = vpor_avx2(auVar109,auVar21);
  auVar98 = vpand_avx2(auVar98,auVar10);
  auVar99 = vpand_avx2(auVar109,auVar21);
  auVar98 = vpor_avx2(auVar98,auVar99);
  auVar98 = vpaddd_avx2(auVar98,auVar163 ^ auVar115 ^ auVar100);
  auVar20 = vpaddd_avx2(auVar4,auVar20);
  auVar4 = vpaddd_avx2(auVar98,auVar4);
  auVar98 = vpsrld_avx2(auVar114,0x11);
  auVar99 = vpslld_avx2(auVar114,0xf);
  auVar99 = vpor_avx2(auVar99,auVar98);
  auVar98 = vpsrld_avx2(auVar114,0x13);
  auVar100 = vpslld_avx2(auVar114,0xd);
  auVar100 = vpor_avx2(auVar100,auVar98);
  auVar163 = vpsrld_avx2(auVar114,10);
  auVar98 = vpsrld_avx2(auVar167,7);
  auVar115 = vpslld_avx2(auVar167,0x19);
  auVar98 = vpor_avx2(auVar115,auVar98);
  auVar164 = vpsrld_avx2(auVar167,0x12);
  auVar115 = vpslld_avx2(auVar167,0xe);
  auVar115 = vpor_avx2(auVar115,auVar164);
  auVar164 = vpsrld_avx2(auVar167,3);
  auVar98 = vpaddd_avx2(auVar115 ^ auVar98 ^ auVar164,auVar166);
  auVar98 = vpaddd_avx2(auVar98,auVar160);
  auVar98 = vpaddd_avx2(auVar98,auVar163 ^ auVar100 ^ auVar99);
  auVar99 = vpsrld_avx2(auVar20,6);
  auVar100 = vpslld_avx2(auVar20,0x1a);
  auVar115 = vpor_avx2(auVar100,auVar99);
  auVar99 = vpsrld_avx2(auVar20,0xb);
  auVar100 = vpslld_avx2(auVar20,0x15);
  auVar163 = vpor_avx2(auVar100,auVar99);
  auVar99 = vpsrld_avx2(auVar20,0x19);
  auVar100 = vpslld_avx2(auVar20,7);
  auVar164 = vpor_avx2(auVar100,auVar99);
  auVar100 = vpandn_avx2(auVar20,auVar26);
  auVar99 = vpand_avx2(auVar51,auVar20);
  auVar99 = vpor_avx2(auVar99,auVar100);
  auVar13 = vpaddd_avx2(auVar98,auVar13);
  auVar118._8_4_ = 0xa831c66d;
  auVar118._0_8_ = 0xa831c66da831c66d;
  auVar118._12_4_ = 0xa831c66d;
  auVar118._16_4_ = 0xa831c66d;
  auVar118._20_4_ = 0xa831c66d;
  auVar118._24_4_ = 0xa831c66d;
  auVar118._28_4_ = 0xa831c66d;
  auVar13 = vpaddd_avx2(auVar99,auVar13);
  auVar13 = vpaddd_avx2(auVar118,auVar13);
  auVar13 = vpaddd_avx2(auVar13,auVar164 ^ auVar163 ^ auVar115);
  auVar99 = vpsrld_avx2(auVar4,2);
  auVar100 = vpslld_avx2(auVar4,0x1e);
  auVar115 = vpor_avx2(auVar100,auVar99);
  auVar99 = vpsrld_avx2(auVar4,0xd);
  auVar100 = vpslld_avx2(auVar4,0x13);
  auVar163 = vpor_avx2(auVar100,auVar99);
  auVar99 = vpsrld_avx2(auVar4,0x16);
  auVar100 = vpslld_avx2(auVar4,10);
  auVar164 = vpor_avx2(auVar100,auVar99);
  auVar99 = vpor_avx2(auVar4,auVar109);
  auVar99 = vpand_avx2(auVar99,auVar21);
  auVar100 = vpand_avx2(auVar4,auVar109);
  auVar99 = vpor_avx2(auVar99,auVar100);
  auVar99 = vpaddd_avx2(auVar99,auVar164 ^ auVar163 ^ auVar115);
  auVar10 = vpaddd_avx2(auVar10,auVar13);
  auVar13 = vpaddd_avx2(auVar99,auVar13);
  auVar99 = vpsrld_avx2(auVar142,0x11);
  auVar100 = vpslld_avx2(auVar142,0xf);
  auVar100 = vpor_avx2(auVar100,auVar99);
  auVar99 = vpsrld_avx2(auVar142,0x13);
  auVar115 = vpslld_avx2(auVar142,0xd);
  auVar115 = vpor_avx2(auVar115,auVar99);
  auVar164 = vpsrld_avx2(auVar142,10);
  auVar99 = vpsrld_avx2(auVar168,7);
  auVar163 = vpslld_avx2(auVar168,0x19);
  auVar99 = vpor_avx2(auVar163,auVar99);
  auVar165 = vpsrld_avx2(auVar168,0x12);
  auVar163 = vpslld_avx2(auVar168,0xe);
  auVar163 = vpor_avx2(auVar163,auVar165);
  auVar165 = vpsrld_avx2(auVar168,3);
  auVar99 = vpaddd_avx2(auVar163 ^ auVar99 ^ auVar165,auVar167);
  auVar99 = vpaddd_avx2(auVar99,auVar161);
  auVar99 = vpaddd_avx2(auVar99,auVar164 ^ auVar115 ^ auVar100);
  auVar100 = vpsrld_avx2(auVar10,6);
  auVar115 = vpslld_avx2(auVar10,0x1a);
  auVar163 = vpor_avx2(auVar115,auVar100);
  auVar100 = vpsrld_avx2(auVar10,0xb);
  auVar115 = vpslld_avx2(auVar10,0x15);
  auVar164 = vpor_avx2(auVar115,auVar100);
  auVar100 = vpsrld_avx2(auVar10,0x19);
  auVar115 = vpslld_avx2(auVar10,7);
  auVar165 = vpor_avx2(auVar115,auVar100);
  auVar115 = vpandn_avx2(auVar10,auVar51);
  auVar100 = vpand_avx2(auVar20,auVar10);
  auVar100 = vpor_avx2(auVar100,auVar115);
  auVar26 = vpaddd_avx2(auVar99,auVar26);
  auVar26 = vpaddd_avx2(auVar100,auVar26);
  auVar119._8_4_ = 0xb00327c8;
  auVar119._0_8_ = 0xb00327c8b00327c8;
  auVar119._12_4_ = 0xb00327c8;
  auVar119._16_4_ = 0xb00327c8;
  auVar119._20_4_ = 0xb00327c8;
  auVar119._24_4_ = 0xb00327c8;
  auVar119._28_4_ = 0xb00327c8;
  auVar26 = vpaddd_avx2(auVar119,auVar26);
  auVar26 = vpaddd_avx2(auVar26,auVar165 ^ auVar164 ^ auVar163);
  auVar100 = vpsrld_avx2(auVar13,2);
  auVar115 = vpslld_avx2(auVar13,0x1e);
  auVar163 = vpor_avx2(auVar115,auVar100);
  auVar100 = vpsrld_avx2(auVar13,0xd);
  auVar115 = vpslld_avx2(auVar13,0x13);
  auVar164 = vpor_avx2(auVar115,auVar100);
  auVar100 = vpsrld_avx2(auVar13,0x16);
  auVar115 = vpslld_avx2(auVar13,10);
  auVar165 = vpor_avx2(auVar115,auVar100);
  auVar100 = vpor_avx2(auVar13,auVar4);
  auVar100 = vpand_avx2(auVar100,auVar109);
  auVar115 = vpand_avx2(auVar13,auVar4);
  auVar100 = vpor_avx2(auVar100,auVar115);
  auVar100 = vpaddd_avx2(auVar100,auVar165 ^ auVar164 ^ auVar163);
  auVar21 = vpaddd_avx2(auVar26,auVar21);
  auVar26 = vpaddd_avx2(auVar100,auVar26);
  auVar100 = vpsrld_avx2(auVar98,0x11);
  auVar115 = vpslld_avx2(auVar98,0xf);
  auVar115 = vpor_avx2(auVar115,auVar100);
  auVar100 = vpsrld_avx2(auVar98,0x13);
  auVar163 = vpslld_avx2(auVar98,0xd);
  auVar163 = vpor_avx2(auVar163,auVar100);
  auVar165 = vpsrld_avx2(auVar98,10);
  auVar100 = vpsrld_avx2(auVar151,7);
  auVar164 = vpslld_avx2(auVar151,0x19);
  auVar100 = vpor_avx2(auVar164,auVar100);
  auVar166 = vpsrld_avx2(auVar151,0x12);
  auVar164 = vpslld_avx2(auVar151,0xe);
  auVar164 = vpor_avx2(auVar164,auVar166);
  auVar166 = vpsrld_avx2(auVar151,3);
  auVar100 = vpaddd_avx2(auVar164 ^ auVar100 ^ auVar166,auVar168);
  auVar100 = vpaddd_avx2(auVar100,auVar169);
  auVar100 = vpaddd_avx2(auVar100,auVar165 ^ auVar163 ^ auVar115);
  auVar115 = vpsrld_avx2(auVar21,6);
  auVar163 = vpslld_avx2(auVar21,0x1a);
  auVar164 = vpor_avx2(auVar163,auVar115);
  auVar115 = vpsrld_avx2(auVar21,0xb);
  auVar163 = vpslld_avx2(auVar21,0x15);
  auVar165 = vpor_avx2(auVar163,auVar115);
  auVar115 = vpsrld_avx2(auVar21,0x19);
  auVar163 = vpslld_avx2(auVar21,7);
  auVar166 = vpor_avx2(auVar163,auVar115);
  auVar163 = vpandn_avx2(auVar21,auVar20);
  auVar115 = vpand_avx2(auVar10,auVar21);
  auVar115 = vpor_avx2(auVar115,auVar163);
  auVar51 = vpaddd_avx2(auVar100,auVar51);
  auVar51 = vpaddd_avx2(auVar115,auVar51);
  auVar120._8_4_ = 0xbf597fc7;
  auVar120._0_8_ = 0xbf597fc7bf597fc7;
  auVar120._12_4_ = 0xbf597fc7;
  auVar120._16_4_ = 0xbf597fc7;
  auVar120._20_4_ = 0xbf597fc7;
  auVar120._24_4_ = 0xbf597fc7;
  auVar120._28_4_ = 0xbf597fc7;
  auVar51 = vpaddd_avx2(auVar120,auVar51);
  auVar51 = vpaddd_avx2(auVar51,auVar166 ^ auVar165 ^ auVar164);
  auVar115 = vpsrld_avx2(auVar26,2);
  auVar163 = vpslld_avx2(auVar26,0x1e);
  auVar164 = vpor_avx2(auVar163,auVar115);
  auVar115 = vpsrld_avx2(auVar26,0xd);
  auVar163 = vpslld_avx2(auVar26,0x13);
  auVar165 = vpor_avx2(auVar163,auVar115);
  auVar115 = vpsrld_avx2(auVar26,0x16);
  auVar163 = vpslld_avx2(auVar26,10);
  auVar166 = vpor_avx2(auVar163,auVar115);
  auVar115 = vpor_avx2(auVar13,auVar26);
  auVar115 = vpand_avx2(auVar115,auVar4);
  auVar163 = vpand_avx2(auVar13,auVar26);
  auVar115 = vpor_avx2(auVar115,auVar163);
  auVar115 = vpaddd_avx2(auVar115,auVar166 ^ auVar165 ^ auVar164);
  auVar109 = vpaddd_avx2(auVar51,auVar109);
  auVar51 = vpaddd_avx2(auVar115,auVar51);
  auVar115 = vpsrld_avx2(auVar99,0x11);
  auVar163 = vpslld_avx2(auVar99,0xf);
  auVar163 = vpor_avx2(auVar163,auVar115);
  auVar115 = vpsrld_avx2(auVar99,0x13);
  auVar164 = vpslld_avx2(auVar99,0xd);
  auVar164 = vpor_avx2(auVar164,auVar115);
  auVar166 = vpsrld_avx2(auVar99,10);
  auVar115 = vpsrld_avx2(auVar152,7);
  auVar165 = vpslld_avx2(auVar152,0x19);
  auVar115 = vpor_avx2(auVar165,auVar115);
  auVar165 = vpsrld_avx2(auVar152,0x12);
  auVar167 = vpslld_avx2(auVar152,0xe);
  auVar165 = vpor_avx2(auVar167,auVar165);
  auVar167 = vpsrld_avx2(auVar152,3);
  auVar115 = vpaddd_avx2(auVar165 ^ auVar115 ^ auVar167,auVar151);
  auVar115 = vpaddd_avx2(auVar115,auVar170);
  auVar115 = vpaddd_avx2(auVar115,auVar166 ^ auVar164 ^ auVar163);
  auVar163 = vpsrld_avx2(auVar109,6);
  auVar164 = vpslld_avx2(auVar109,0x1a);
  auVar165 = vpor_avx2(auVar164,auVar163);
  auVar163 = vpsrld_avx2(auVar109,0xb);
  auVar164 = vpslld_avx2(auVar109,0x15);
  auVar166 = vpor_avx2(auVar164,auVar163);
  auVar163 = vpsrld_avx2(auVar109,0x19);
  auVar164 = vpslld_avx2(auVar109,7);
  auVar167 = vpor_avx2(auVar164,auVar163);
  auVar164 = vpandn_avx2(auVar109,auVar10);
  auVar163 = vpand_avx2(auVar21,auVar109);
  auVar163 = vpor_avx2(auVar163,auVar164);
  auVar20 = vpaddd_avx2(auVar115,auVar20);
  auVar20 = vpaddd_avx2(auVar163,auVar20);
  auVar121._8_4_ = 0xc6e00bf3;
  auVar121._0_8_ = 0xc6e00bf3c6e00bf3;
  auVar121._12_4_ = 0xc6e00bf3;
  auVar121._16_4_ = 0xc6e00bf3;
  auVar121._20_4_ = 0xc6e00bf3;
  auVar121._24_4_ = 0xc6e00bf3;
  auVar121._28_4_ = 0xc6e00bf3;
  auVar20 = vpaddd_avx2(auVar121,auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar167 ^ auVar166 ^ auVar165);
  auVar163 = vpsrld_avx2(auVar51,2);
  auVar164 = vpslld_avx2(auVar51,0x1e);
  auVar165 = vpor_avx2(auVar164,auVar163);
  auVar163 = vpsrld_avx2(auVar51,0xd);
  auVar164 = vpslld_avx2(auVar51,0x13);
  auVar166 = vpor_avx2(auVar164,auVar163);
  auVar163 = vpsrld_avx2(auVar51,0x16);
  auVar164 = vpslld_avx2(auVar51,10);
  auVar167 = vpor_avx2(auVar164,auVar163);
  auVar163 = vpor_avx2(auVar51,auVar26);
  auVar163 = vpand_avx2(auVar163,auVar13);
  auVar164 = vpand_avx2(auVar51,auVar26);
  auVar163 = vpor_avx2(auVar163,auVar164);
  auVar163 = vpaddd_avx2(auVar163,auVar167 ^ auVar166 ^ auVar165);
  auVar4 = vpaddd_avx2(auVar20,auVar4);
  auVar20 = vpaddd_avx2(auVar163,auVar20);
  auVar163 = vpsrld_avx2(auVar100,0x11);
  auVar164 = vpslld_avx2(auVar100,0xf);
  auVar164 = vpor_avx2(auVar164,auVar163);
  auVar163 = vpsrld_avx2(auVar100,0x13);
  auVar165 = vpslld_avx2(auVar100,0xd);
  auVar165 = vpor_avx2(auVar165,auVar163);
  auVar167 = vpsrld_avx2(auVar100,10);
  auVar163 = vpsrld_avx2(auVar153,7);
  auVar166 = vpslld_avx2(auVar153,0x19);
  auVar163 = vpor_avx2(auVar166,auVar163);
  auVar166 = vpsrld_avx2(auVar153,0x12);
  auVar168 = vpslld_avx2(auVar153,0xe);
  auVar166 = vpor_avx2(auVar168,auVar166);
  auVar168 = vpsrld_avx2(auVar153,3);
  auVar163 = vpaddd_avx2(auVar166 ^ auVar163 ^ auVar168,auVar152);
  auVar163 = vpaddd_avx2(auVar163,auVar113);
  auVar163 = vpaddd_avx2(auVar163,auVar167 ^ auVar165 ^ auVar164);
  auVar164 = vpsrld_avx2(auVar4,6);
  auVar165 = vpslld_avx2(auVar4,0x1a);
  auVar166 = vpor_avx2(auVar165,auVar164);
  auVar164 = vpsrld_avx2(auVar4,0xb);
  auVar165 = vpslld_avx2(auVar4,0x15);
  auVar167 = vpor_avx2(auVar165,auVar164);
  auVar164 = vpsrld_avx2(auVar4,0x19);
  auVar165 = vpslld_avx2(auVar4,7);
  auVar168 = vpor_avx2(auVar165,auVar164);
  auVar165 = vpandn_avx2(auVar4,auVar21);
  auVar164 = vpand_avx2(auVar109,auVar4);
  auVar164 = vpor_avx2(auVar164,auVar165);
  auVar10 = vpaddd_avx2(auVar163,auVar10);
  auVar143._8_4_ = 0xd5a79147;
  auVar143._0_8_ = 0xd5a79147d5a79147;
  auVar143._12_4_ = 0xd5a79147;
  auVar143._16_4_ = 0xd5a79147;
  auVar143._20_4_ = 0xd5a79147;
  auVar143._24_4_ = 0xd5a79147;
  auVar143._28_4_ = 0xd5a79147;
  auVar10 = vpaddd_avx2(auVar164,auVar10);
  auVar10 = vpaddd_avx2(auVar143,auVar10);
  auVar10 = vpaddd_avx2(auVar10,auVar168 ^ auVar167 ^ auVar166);
  auVar164 = vpsrld_avx2(auVar20,2);
  auVar165 = vpslld_avx2(auVar20,0x1e);
  auVar166 = vpor_avx2(auVar165,auVar164);
  auVar164 = vpsrld_avx2(auVar20,0xd);
  auVar165 = vpslld_avx2(auVar20,0x13);
  auVar167 = vpor_avx2(auVar165,auVar164);
  auVar164 = vpsrld_avx2(auVar20,0x16);
  auVar165 = vpslld_avx2(auVar20,10);
  auVar168 = vpor_avx2(auVar165,auVar164);
  auVar164 = vpor_avx2(auVar20,auVar51);
  auVar164 = vpand_avx2(auVar164,auVar26);
  auVar165 = vpand_avx2(auVar20,auVar51);
  auVar164 = vpor_avx2(auVar164,auVar165);
  auVar164 = vpaddd_avx2(auVar164,auVar168 ^ auVar167 ^ auVar166);
  auVar13 = vpaddd_avx2(auVar13,auVar10);
  auVar10 = vpaddd_avx2(auVar164,auVar10);
  auVar164 = vpsrld_avx2(auVar115,0x11);
  auVar165 = vpslld_avx2(auVar115,0xf);
  auVar165 = vpor_avx2(auVar165,auVar164);
  auVar164 = vpsrld_avx2(auVar115,0x13);
  auVar166 = vpslld_avx2(auVar115,0xd);
  auVar166 = vpor_avx2(auVar166,auVar164);
  auVar168 = vpsrld_avx2(auVar115,10);
  auVar164 = vpsrld_avx2(auVar6,7);
  auVar167 = vpslld_avx2(auVar6,0x19);
  auVar164 = vpor_avx2(auVar167,auVar164);
  auVar167 = vpsrld_avx2(auVar6,0x12);
  auVar151 = vpslld_avx2(auVar6,0xe);
  auVar167 = vpor_avx2(auVar151,auVar167);
  auVar151 = vpsrld_avx2(auVar6,3);
  auVar164 = vpaddd_avx2(auVar167 ^ auVar164 ^ auVar151,auVar153);
  auVar164 = vpaddd_avx2(auVar164,auVar114);
  auVar164 = vpaddd_avx2(auVar164,auVar168 ^ auVar166 ^ auVar165);
  auVar165 = vpsrld_avx2(auVar13,6);
  auVar166 = vpslld_avx2(auVar13,0x1a);
  auVar167 = vpor_avx2(auVar166,auVar165);
  auVar165 = vpsrld_avx2(auVar13,0xb);
  auVar166 = vpslld_avx2(auVar13,0x15);
  auVar168 = vpor_avx2(auVar166,auVar165);
  auVar165 = vpsrld_avx2(auVar13,0x19);
  auVar166 = vpslld_avx2(auVar13,7);
  auVar151 = vpor_avx2(auVar166,auVar165);
  auVar166 = vpandn_avx2(auVar13,auVar109);
  auVar165 = vpand_avx2(auVar4,auVar13);
  auVar165 = vpor_avx2(auVar165,auVar166);
  auVar21 = vpaddd_avx2(auVar164,auVar21);
  auVar21 = vpaddd_avx2(auVar165,auVar21);
  auVar122._8_4_ = 0x6ca6351;
  auVar122._0_8_ = 0x6ca635106ca6351;
  auVar122._12_4_ = 0x6ca6351;
  auVar122._16_4_ = 0x6ca6351;
  auVar122._20_4_ = 0x6ca6351;
  auVar122._24_4_ = 0x6ca6351;
  auVar122._28_4_ = 0x6ca6351;
  auVar21 = vpaddd_avx2(auVar122,auVar21);
  auVar21 = vpaddd_avx2(auVar21,auVar151 ^ auVar168 ^ auVar167);
  auVar165 = vpsrld_avx2(auVar10,2);
  auVar166 = vpslld_avx2(auVar10,0x1e);
  auVar167 = vpor_avx2(auVar166,auVar165);
  auVar165 = vpsrld_avx2(auVar10,0xd);
  auVar166 = vpslld_avx2(auVar10,0x13);
  auVar168 = vpor_avx2(auVar166,auVar165);
  auVar165 = vpsrld_avx2(auVar10,0x16);
  auVar166 = vpslld_avx2(auVar10,10);
  auVar151 = vpor_avx2(auVar166,auVar165);
  auVar165 = vpor_avx2(auVar10,auVar20);
  auVar165 = vpand_avx2(auVar165,auVar51);
  auVar166 = vpand_avx2(auVar10,auVar20);
  auVar165 = vpor_avx2(auVar165,auVar166);
  auVar165 = vpaddd_avx2(auVar165,auVar151 ^ auVar168 ^ auVar167);
  auVar26 = vpaddd_avx2(auVar21,auVar26);
  auVar21 = vpaddd_avx2(auVar165,auVar21);
  auVar165 = vpsrld_avx2(auVar163,0x11);
  auVar166 = vpslld_avx2(auVar163,0xf);
  auVar166 = vpor_avx2(auVar166,auVar165);
  auVar165 = vpsrld_avx2(auVar163,0x13);
  auVar167 = vpslld_avx2(auVar163,0xd);
  auVar167 = vpor_avx2(auVar167,auVar165);
  auVar151 = vpsrld_avx2(auVar163,10);
  auVar165 = vpsrld_avx2(auVar88,7);
  auVar168 = vpslld_avx2(auVar88,0x19);
  auVar165 = vpor_avx2(auVar168,auVar165);
  auVar168 = vpsrld_avx2(auVar88,0x12);
  auVar152 = vpslld_avx2(auVar88,0xe);
  auVar168 = vpor_avx2(auVar152,auVar168);
  auVar152 = vpsrld_avx2(auVar88,3);
  auVar165 = vpaddd_avx2(auVar168 ^ auVar165 ^ auVar152,auVar6);
  auVar165 = vpaddd_avx2(auVar165,auVar142);
  auVar165 = vpaddd_avx2(auVar165,auVar151 ^ auVar167 ^ auVar166);
  auVar166 = vpsrld_avx2(auVar26,6);
  auVar167 = vpslld_avx2(auVar26,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar26,0xb);
  auVar167 = vpslld_avx2(auVar26,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar26,0x19);
  auVar167 = vpslld_avx2(auVar26,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar26,auVar4);
  auVar166 = vpand_avx2(auVar13,auVar26);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar109 = vpaddd_avx2(auVar165,auVar109);
  auVar109 = vpaddd_avx2(auVar166,auVar109);
  auVar123._8_4_ = 0x14292967;
  auVar123._0_8_ = 0x1429296714292967;
  auVar123._12_4_ = 0x14292967;
  auVar123._16_4_ = 0x14292967;
  auVar123._20_4_ = 0x14292967;
  auVar123._24_4_ = 0x14292967;
  auVar123._28_4_ = 0x14292967;
  auVar109 = vpaddd_avx2(auVar123,auVar109);
  auVar109 = vpaddd_avx2(auVar109,auVar152 ^ auVar151 ^ auVar168);
  auVar166 = vpsrld_avx2(auVar21,2);
  auVar167 = vpslld_avx2(auVar21,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar21,0xd);
  auVar167 = vpslld_avx2(auVar21,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar21,0x16);
  auVar167 = vpslld_avx2(auVar21,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar10,auVar21);
  auVar166 = vpand_avx2(auVar166,auVar20);
  auVar167 = vpand_avx2(auVar10,auVar21);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar166 = vpaddd_avx2(auVar166,auVar152 ^ auVar151 ^ auVar168);
  auVar51 = vpaddd_avx2(auVar109,auVar51);
  auVar109 = vpaddd_avx2(auVar166,auVar109);
  auVar166 = vpsrld_avx2(auVar164,0x11);
  auVar167 = vpslld_avx2(auVar164,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar164,0x13);
  auVar168 = vpslld_avx2(auVar164,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar164,10);
  auVar168 = vpsrld_avx2(auVar89,7);
  auVar151 = vpslld_avx2(auVar89,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar89,0x12);
  auVar153 = vpslld_avx2(auVar89,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar89,3);
  auVar88 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar153,auVar88);
  auVar88 = vpaddd_avx2(auVar88,auVar98);
  auVar88 = vpaddd_avx2(auVar88,auVar152 ^ auVar167 ^ auVar166);
  auVar166 = vpsrld_avx2(auVar51,6);
  auVar167 = vpslld_avx2(auVar51,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar51,0xb);
  auVar167 = vpslld_avx2(auVar51,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar51,0x19);
  auVar167 = vpslld_avx2(auVar51,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar51,auVar13);
  auVar166 = vpand_avx2(auVar26,auVar51);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar4 = vpaddd_avx2(auVar88,auVar4);
  auVar4 = vpaddd_avx2(auVar166,auVar4);
  auVar124._8_4_ = 0x27b70a85;
  auVar124._0_8_ = 0x27b70a8527b70a85;
  auVar124._12_4_ = 0x27b70a85;
  auVar124._16_4_ = 0x27b70a85;
  auVar124._20_4_ = 0x27b70a85;
  auVar124._24_4_ = 0x27b70a85;
  auVar124._28_4_ = 0x27b70a85;
  auVar4 = vpaddd_avx2(auVar124,auVar4);
  auVar4 = vpaddd_avx2(auVar4,auVar152 ^ auVar151 ^ auVar168);
  auVar166 = vpsrld_avx2(auVar109,2);
  auVar167 = vpslld_avx2(auVar109,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar109,0xd);
  auVar167 = vpslld_avx2(auVar109,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar109,0x16);
  auVar167 = vpslld_avx2(auVar109,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar109,auVar21);
  auVar166 = vpand_avx2(auVar166,auVar10);
  auVar167 = vpand_avx2(auVar109,auVar21);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar166 = vpaddd_avx2(auVar166,auVar152 ^ auVar151 ^ auVar168);
  auVar20 = vpaddd_avx2(auVar4,auVar20);
  auVar4 = vpaddd_avx2(auVar166,auVar4);
  auVar166 = vpsrld_avx2(auVar165,0x11);
  auVar167 = vpslld_avx2(auVar165,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar165,0x13);
  auVar168 = vpslld_avx2(auVar165,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar165,10);
  auVar168 = vpsrld_avx2(auVar160,7);
  auVar151 = vpslld_avx2(auVar160,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar160,0x12);
  auVar153 = vpslld_avx2(auVar160,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar160,3);
  auVar89 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar153,auVar89);
  auVar89 = vpaddd_avx2(auVar89,auVar99);
  auVar89 = vpaddd_avx2(auVar89,auVar152 ^ auVar167 ^ auVar166);
  auVar166 = vpsrld_avx2(auVar20,6);
  auVar167 = vpslld_avx2(auVar20,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar20,0xb);
  auVar167 = vpslld_avx2(auVar20,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar20,0x19);
  auVar167 = vpslld_avx2(auVar20,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar20,auVar26);
  auVar166 = vpand_avx2(auVar51,auVar20);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar13 = vpaddd_avx2(auVar89,auVar13);
  auVar144._8_4_ = 0x2e1b2138;
  auVar144._0_8_ = 0x2e1b21382e1b2138;
  auVar144._12_4_ = 0x2e1b2138;
  auVar144._16_4_ = 0x2e1b2138;
  auVar144._20_4_ = 0x2e1b2138;
  auVar144._24_4_ = 0x2e1b2138;
  auVar144._28_4_ = 0x2e1b2138;
  auVar13 = vpaddd_avx2(auVar166,auVar13);
  auVar13 = vpaddd_avx2(auVar144,auVar13);
  auVar13 = vpaddd_avx2(auVar13,auVar152 ^ auVar151 ^ auVar168);
  auVar166 = vpsrld_avx2(auVar4,2);
  auVar167 = vpslld_avx2(auVar4,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar4,0xd);
  auVar167 = vpslld_avx2(auVar4,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar4,0x16);
  auVar167 = vpslld_avx2(auVar4,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar4,auVar109);
  auVar166 = vpand_avx2(auVar166,auVar21);
  auVar167 = vpand_avx2(auVar4,auVar109);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar166 = vpaddd_avx2(auVar166,auVar152 ^ auVar151 ^ auVar168);
  auVar10 = vpaddd_avx2(auVar10,auVar13);
  auVar13 = vpaddd_avx2(auVar166,auVar13);
  auVar166 = vpsrld_avx2(auVar88,0x11);
  auVar167 = vpslld_avx2(auVar88,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar88,0x13);
  auVar168 = vpslld_avx2(auVar88,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar88,10);
  auVar168 = vpsrld_avx2(auVar161,7);
  auVar151 = vpslld_avx2(auVar161,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar161,0x12);
  auVar153 = vpslld_avx2(auVar161,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar161,3);
  auVar160 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar153,auVar160);
  auVar160 = vpaddd_avx2(auVar160,auVar100);
  auVar160 = vpaddd_avx2(auVar160,auVar152 ^ auVar167 ^ auVar166);
  auVar166 = vpsrld_avx2(auVar10,6);
  auVar167 = vpslld_avx2(auVar10,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar10,0xb);
  auVar167 = vpslld_avx2(auVar10,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar10,0x19);
  auVar167 = vpslld_avx2(auVar10,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar10,auVar51);
  auVar166 = vpand_avx2(auVar20,auVar10);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar26 = vpaddd_avx2(auVar160,auVar26);
  auVar26 = vpaddd_avx2(auVar166,auVar26);
  auVar125._8_4_ = 0x4d2c6dfc;
  auVar125._0_8_ = 0x4d2c6dfc4d2c6dfc;
  auVar125._12_4_ = 0x4d2c6dfc;
  auVar125._16_4_ = 0x4d2c6dfc;
  auVar125._20_4_ = 0x4d2c6dfc;
  auVar125._24_4_ = 0x4d2c6dfc;
  auVar125._28_4_ = 0x4d2c6dfc;
  auVar26 = vpaddd_avx2(auVar125,auVar26);
  auVar26 = vpaddd_avx2(auVar26,auVar152 ^ auVar151 ^ auVar168);
  auVar166 = vpsrld_avx2(auVar13,2);
  auVar167 = vpslld_avx2(auVar13,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar13,0xd);
  auVar167 = vpslld_avx2(auVar13,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar13,0x16);
  auVar167 = vpslld_avx2(auVar13,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar13,auVar4);
  auVar166 = vpand_avx2(auVar166,auVar109);
  auVar167 = vpand_avx2(auVar13,auVar4);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar166 = vpaddd_avx2(auVar166,auVar152 ^ auVar151 ^ auVar168);
  auVar21 = vpaddd_avx2(auVar26,auVar21);
  auVar26 = vpaddd_avx2(auVar166,auVar26);
  auVar166 = vpsrld_avx2(auVar89,0x11);
  auVar167 = vpslld_avx2(auVar89,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar89,0x13);
  auVar168 = vpslld_avx2(auVar89,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar89,10);
  auVar168 = vpsrld_avx2(auVar169,7);
  auVar151 = vpslld_avx2(auVar169,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar169,0x12);
  auVar153 = vpslld_avx2(auVar169,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar169,3);
  auVar161 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar153,auVar161);
  auVar161 = vpaddd_avx2(auVar161,auVar115);
  auVar161 = vpaddd_avx2(auVar161,auVar152 ^ auVar167 ^ auVar166);
  auVar166 = vpsrld_avx2(auVar21,6);
  auVar167 = vpslld_avx2(auVar21,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar21,0xb);
  auVar167 = vpslld_avx2(auVar21,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar21,0x19);
  auVar167 = vpslld_avx2(auVar21,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar21,auVar20);
  auVar166 = vpand_avx2(auVar10,auVar21);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar51 = vpaddd_avx2(auVar161,auVar51);
  auVar51 = vpaddd_avx2(auVar166,auVar51);
  auVar126._8_4_ = 0x53380d13;
  auVar126._0_8_ = 0x53380d1353380d13;
  auVar126._12_4_ = 0x53380d13;
  auVar126._16_4_ = 0x53380d13;
  auVar126._20_4_ = 0x53380d13;
  auVar126._24_4_ = 0x53380d13;
  auVar126._28_4_ = 0x53380d13;
  auVar51 = vpaddd_avx2(auVar126,auVar51);
  auVar51 = vpaddd_avx2(auVar51,auVar152 ^ auVar151 ^ auVar168);
  auVar166 = vpsrld_avx2(auVar26,2);
  auVar167 = vpslld_avx2(auVar26,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar26,0xd);
  auVar167 = vpslld_avx2(auVar26,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar26,0x16);
  auVar167 = vpslld_avx2(auVar26,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar13,auVar26);
  auVar166 = vpand_avx2(auVar166,auVar4);
  auVar167 = vpand_avx2(auVar13,auVar26);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar166 = vpaddd_avx2(auVar166,auVar152 ^ auVar151 ^ auVar168);
  auVar109 = vpaddd_avx2(auVar51,auVar109);
  auVar51 = vpaddd_avx2(auVar166,auVar51);
  auVar166 = vpsrld_avx2(auVar160,0x11);
  auVar167 = vpslld_avx2(auVar160,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar160,0x13);
  auVar168 = vpslld_avx2(auVar160,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar160,10);
  auVar168 = vpsrld_avx2(auVar170,7);
  auVar151 = vpslld_avx2(auVar170,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar170,0x12);
  auVar153 = vpslld_avx2(auVar170,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar170,3);
  auVar169 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar153,auVar169);
  auVar169 = vpaddd_avx2(auVar169,auVar163);
  auVar169 = vpaddd_avx2(auVar169,auVar152 ^ auVar167 ^ auVar166);
  auVar166 = vpsrld_avx2(auVar109,6);
  auVar167 = vpslld_avx2(auVar109,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar109,0xb);
  auVar167 = vpslld_avx2(auVar109,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar109,0x19);
  auVar167 = vpslld_avx2(auVar109,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar109,auVar10);
  auVar166 = vpand_avx2(auVar21,auVar109);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar20 = vpaddd_avx2(auVar169,auVar20);
  auVar20 = vpaddd_avx2(auVar166,auVar20);
  auVar127._8_4_ = 0x650a7354;
  auVar127._0_8_ = 0x650a7354650a7354;
  auVar127._12_4_ = 0x650a7354;
  auVar127._16_4_ = 0x650a7354;
  auVar127._20_4_ = 0x650a7354;
  auVar127._24_4_ = 0x650a7354;
  auVar127._28_4_ = 0x650a7354;
  auVar20 = vpaddd_avx2(auVar127,auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar152 ^ auVar151 ^ auVar168);
  auVar166 = vpsrld_avx2(auVar51,2);
  auVar167 = vpslld_avx2(auVar51,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar51,0xd);
  auVar167 = vpslld_avx2(auVar51,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar51,0x16);
  auVar167 = vpslld_avx2(auVar51,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar51,auVar26);
  auVar166 = vpand_avx2(auVar166,auVar13);
  auVar167 = vpand_avx2(auVar51,auVar26);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar166 = vpaddd_avx2(auVar166,auVar152 ^ auVar151 ^ auVar168);
  auVar4 = vpaddd_avx2(auVar20,auVar4);
  auVar20 = vpaddd_avx2(auVar166,auVar20);
  auVar166 = vpsrld_avx2(auVar161,0x11);
  auVar167 = vpslld_avx2(auVar161,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar161,0x13);
  auVar168 = vpslld_avx2(auVar161,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar161,10);
  auVar168 = vpsrld_avx2(auVar113,7);
  auVar151 = vpslld_avx2(auVar113,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar113,0x12);
  auVar153 = vpslld_avx2(auVar113,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar113,3);
  auVar170 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar153,auVar170);
  auVar170 = vpaddd_avx2(auVar170,auVar164);
  auVar170 = vpaddd_avx2(auVar170,auVar152 ^ auVar167 ^ auVar166);
  auVar166 = vpsrld_avx2(auVar4,6);
  auVar167 = vpslld_avx2(auVar4,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar4,0xb);
  auVar167 = vpslld_avx2(auVar4,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar4,0x19);
  auVar167 = vpslld_avx2(auVar4,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar4,auVar21);
  auVar166 = vpand_avx2(auVar109,auVar4);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar10 = vpaddd_avx2(auVar170,auVar10);
  auVar145._8_4_ = 0x766a0abb;
  auVar145._0_8_ = 0x766a0abb766a0abb;
  auVar145._12_4_ = 0x766a0abb;
  auVar145._16_4_ = 0x766a0abb;
  auVar145._20_4_ = 0x766a0abb;
  auVar145._24_4_ = 0x766a0abb;
  auVar145._28_4_ = 0x766a0abb;
  auVar10 = vpaddd_avx2(auVar166,auVar10);
  auVar10 = vpaddd_avx2(auVar145,auVar10);
  auVar10 = vpaddd_avx2(auVar10,auVar152 ^ auVar151 ^ auVar168);
  auVar166 = vpsrld_avx2(auVar20,2);
  auVar167 = vpslld_avx2(auVar20,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar20,0xd);
  auVar167 = vpslld_avx2(auVar20,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar20,0x16);
  auVar167 = vpslld_avx2(auVar20,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar20,auVar51);
  auVar166 = vpand_avx2(auVar166,auVar26);
  auVar167 = vpand_avx2(auVar20,auVar51);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar166 = vpaddd_avx2(auVar166,auVar152 ^ auVar151 ^ auVar168);
  auVar13 = vpaddd_avx2(auVar13,auVar10);
  auVar10 = vpaddd_avx2(auVar166,auVar10);
  auVar166 = vpsrld_avx2(auVar169,0x11);
  auVar167 = vpslld_avx2(auVar169,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar169,0x13);
  auVar168 = vpslld_avx2(auVar169,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar169,10);
  auVar168 = vpsrld_avx2(auVar114,7);
  auVar151 = vpslld_avx2(auVar114,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar114,0x12);
  auVar153 = vpslld_avx2(auVar114,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar114,3);
  auVar113 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar153,auVar113);
  auVar113 = vpaddd_avx2(auVar113,auVar165);
  auVar113 = vpaddd_avx2(auVar113,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar13,6);
  auVar167 = vpslld_avx2(auVar13,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar13,0xb);
  auVar167 = vpslld_avx2(auVar13,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar13,0x19);
  auVar167 = vpslld_avx2(auVar13,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar13,auVar109);
  auVar166 = vpand_avx2(auVar4,auVar13);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar21 = vpaddd_avx2(auVar113,auVar21);
  auVar21 = vpaddd_avx2(auVar166,auVar21);
  auVar128._8_4_ = 0x81c2c92e;
  auVar128._0_8_ = 0x81c2c92e81c2c92e;
  auVar128._12_4_ = 0x81c2c92e;
  auVar128._16_4_ = 0x81c2c92e;
  auVar128._20_4_ = 0x81c2c92e;
  auVar128._24_4_ = 0x81c2c92e;
  auVar128._28_4_ = 0x81c2c92e;
  auVar21 = vpaddd_avx2(auVar128,auVar21);
  auVar21 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar21);
  auVar166 = vpsrld_avx2(auVar10,2);
  auVar167 = vpslld_avx2(auVar10,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar10,0xd);
  auVar167 = vpslld_avx2(auVar10,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar10,0x16);
  auVar167 = vpslld_avx2(auVar10,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar10,auVar20);
  auVar166 = vpand_avx2(auVar166,auVar51);
  auVar167 = vpand_avx2(auVar10,auVar20);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar166 = vpaddd_avx2(auVar166,auVar152 ^ auVar151 ^ auVar168);
  auVar26 = vpaddd_avx2(auVar21,auVar26);
  auVar21 = vpaddd_avx2(auVar166,auVar21);
  auVar166 = vpsrld_avx2(auVar170,0x11);
  auVar167 = vpslld_avx2(auVar170,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar170,0x13);
  auVar168 = vpslld_avx2(auVar170,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar170,10);
  auVar168 = vpsrld_avx2(auVar142,7);
  auVar151 = vpslld_avx2(auVar142,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar142,0x12);
  auVar153 = vpslld_avx2(auVar142,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar142,3);
  auVar114 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar153,auVar114);
  auVar114 = vpaddd_avx2(auVar114,auVar88);
  auVar114 = vpaddd_avx2(auVar114,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar26,6);
  auVar167 = vpslld_avx2(auVar26,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar26,0xb);
  auVar167 = vpslld_avx2(auVar26,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar26,0x19);
  auVar167 = vpslld_avx2(auVar26,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar26,auVar4);
  auVar166 = vpand_avx2(auVar13,auVar26);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar109 = vpaddd_avx2(auVar114,auVar109);
  auVar109 = vpaddd_avx2(auVar166,auVar109);
  auVar129._8_4_ = 0x92722c85;
  auVar129._0_8_ = 0x92722c8592722c85;
  auVar129._12_4_ = 0x92722c85;
  auVar129._16_4_ = 0x92722c85;
  auVar129._20_4_ = 0x92722c85;
  auVar129._24_4_ = 0x92722c85;
  auVar129._28_4_ = 0x92722c85;
  auVar109 = vpaddd_avx2(auVar129,auVar109);
  auVar109 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar109);
  auVar166 = vpsrld_avx2(auVar21,2);
  auVar167 = vpslld_avx2(auVar21,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar21,0xd);
  auVar167 = vpslld_avx2(auVar21,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar21,0x16);
  auVar167 = vpslld_avx2(auVar21,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar21,auVar10);
  auVar166 = vpand_avx2(auVar166,auVar20);
  auVar167 = vpand_avx2(auVar21,auVar10);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar166 = vpaddd_avx2(auVar166,auVar152 ^ auVar151 ^ auVar168);
  auVar51 = vpaddd_avx2(auVar109,auVar51);
  auVar109 = vpaddd_avx2(auVar166,auVar109);
  auVar166 = vpsrld_avx2(auVar113,0x11);
  auVar167 = vpslld_avx2(auVar113,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar113,0x13);
  auVar168 = vpslld_avx2(auVar113,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar113,10);
  auVar168 = vpsrld_avx2(auVar98,7);
  auVar151 = vpslld_avx2(auVar98,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar98,0x12);
  auVar153 = vpslld_avx2(auVar98,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar98,3);
  auVar142 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar153,auVar142);
  auVar142 = vpaddd_avx2(auVar142,auVar89);
  auVar142 = vpaddd_avx2(auVar142,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar51,6);
  auVar167 = vpslld_avx2(auVar51,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar51,0xb);
  auVar167 = vpslld_avx2(auVar51,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar51,0x19);
  auVar167 = vpslld_avx2(auVar51,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar51,auVar13);
  auVar166 = vpand_avx2(auVar26,auVar51);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar4 = vpaddd_avx2(auVar142,auVar4);
  auVar4 = vpaddd_avx2(auVar166,auVar4);
  auVar130._8_4_ = 0xa2bfe8a1;
  auVar130._0_8_ = 0xa2bfe8a1a2bfe8a1;
  auVar130._12_4_ = 0xa2bfe8a1;
  auVar130._16_4_ = 0xa2bfe8a1;
  auVar130._20_4_ = 0xa2bfe8a1;
  auVar130._24_4_ = 0xa2bfe8a1;
  auVar130._28_4_ = 0xa2bfe8a1;
  auVar4 = vpaddd_avx2(auVar130,auVar4);
  auVar4 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar4);
  auVar166 = vpsrld_avx2(auVar109,2);
  auVar167 = vpslld_avx2(auVar109,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar109,0xd);
  auVar167 = vpslld_avx2(auVar109,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar109,0x16);
  auVar167 = vpslld_avx2(auVar109,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar109,auVar21);
  auVar166 = vpand_avx2(auVar166,auVar10);
  auVar167 = vpand_avx2(auVar109,auVar21);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar166 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar166);
  auVar20 = vpaddd_avx2(auVar4,auVar20);
  auVar4 = vpaddd_avx2(auVar166,auVar4);
  auVar166 = vpsrld_avx2(auVar114,0x11);
  auVar167 = vpslld_avx2(auVar114,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar114,0x13);
  auVar168 = vpslld_avx2(auVar114,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar114,10);
  auVar168 = vpsrld_avx2(auVar99,7);
  auVar151 = vpslld_avx2(auVar99,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar99,0x12);
  auVar153 = vpslld_avx2(auVar99,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar99,3);
  auVar98 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar153,auVar98);
  auVar98 = vpaddd_avx2(auVar98,auVar160);
  auVar98 = vpaddd_avx2(auVar98,auVar152 ^ auVar167 ^ auVar166);
  auVar166 = vpsrld_avx2(auVar20,6);
  auVar167 = vpslld_avx2(auVar20,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar20,0xb);
  auVar167 = vpslld_avx2(auVar20,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar20,0x19);
  auVar167 = vpslld_avx2(auVar20,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar20,auVar26);
  auVar166 = vpand_avx2(auVar20,auVar51);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar13 = vpaddd_avx2(auVar98,auVar13);
  auVar131._8_4_ = 0xa81a664b;
  auVar131._0_8_ = 0xa81a664ba81a664b;
  auVar131._12_4_ = 0xa81a664b;
  auVar131._16_4_ = 0xa81a664b;
  auVar131._20_4_ = 0xa81a664b;
  auVar131._24_4_ = 0xa81a664b;
  auVar131._28_4_ = 0xa81a664b;
  auVar13 = vpaddd_avx2(auVar166,auVar13);
  auVar13 = vpaddd_avx2(auVar131,auVar13);
  auVar13 = vpaddd_avx2(auVar13,auVar152 ^ auVar151 ^ auVar168);
  auVar166 = vpsrld_avx2(auVar4,2);
  auVar167 = vpslld_avx2(auVar4,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar4,0xd);
  auVar167 = vpslld_avx2(auVar4,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar4,0x16);
  auVar167 = vpslld_avx2(auVar4,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar4,auVar109);
  auVar166 = vpand_avx2(auVar166,auVar21);
  auVar167 = vpand_avx2(auVar4,auVar109);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar166 = vpaddd_avx2(auVar166,auVar152 ^ auVar151 ^ auVar168);
  auVar10 = vpaddd_avx2(auVar13,auVar10);
  auVar13 = vpaddd_avx2(auVar166,auVar13);
  auVar166 = vpsrld_avx2(auVar142,0x11);
  auVar167 = vpslld_avx2(auVar142,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar142,0x13);
  auVar168 = vpslld_avx2(auVar142,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar142,10);
  auVar168 = vpsrld_avx2(auVar100,7);
  auVar151 = vpslld_avx2(auVar100,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar100,0x12);
  auVar153 = vpslld_avx2(auVar100,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar100,3);
  auVar99 = vpaddd_avx2(auVar99,auVar153 ^ auVar151 ^ auVar168);
  auVar99 = vpaddd_avx2(auVar99,auVar161);
  auVar99 = vpaddd_avx2(auVar99,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar10,6);
  auVar167 = vpslld_avx2(auVar10,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar10,0xb);
  auVar167 = vpslld_avx2(auVar10,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar10,0x19);
  auVar167 = vpslld_avx2(auVar10,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar10,auVar51);
  auVar166 = vpand_avx2(auVar20,auVar10);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar26 = vpaddd_avx2(auVar99,auVar26);
  auVar26 = vpaddd_avx2(auVar26,auVar166);
  auVar17._8_4_ = 0xc24b8b70;
  auVar17._0_8_ = 0xc24b8b70c24b8b70;
  auVar17._12_4_ = 0xc24b8b70;
  auVar17._16_4_ = 0xc24b8b70;
  auVar17._20_4_ = 0xc24b8b70;
  auVar17._24_4_ = 0xc24b8b70;
  auVar17._28_4_ = 0xc24b8b70;
  auVar26 = vpaddd_avx2(auVar26,auVar17);
  auVar26 = vpaddd_avx2(auVar26,auVar151 ^ auVar168 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar13,2);
  auVar167 = vpslld_avx2(auVar13,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar13,0xd);
  auVar167 = vpslld_avx2(auVar13,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar13,0x16);
  auVar167 = vpslld_avx2(auVar13,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar13,auVar4);
  auVar166 = vpand_avx2(auVar166,auVar109);
  auVar167 = vpand_avx2(auVar13,auVar4);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar166);
  auVar21 = vpaddd_avx2(auVar26,auVar21);
  auVar26 = vpaddd_avx2(auVar166,auVar26);
  auVar166 = vpsrld_avx2(auVar98,0x11);
  auVar167 = vpslld_avx2(auVar98,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar98,0x13);
  auVar168 = vpslld_avx2(auVar98,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar98,10);
  auVar168 = vpsrld_avx2(auVar115,7);
  auVar151 = vpslld_avx2(auVar115,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar115,0x12);
  auVar153 = vpslld_avx2(auVar115,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar115,3);
  auVar100 = vpaddd_avx2(auVar100,auVar153 ^ auVar151 ^ auVar168);
  auVar100 = vpaddd_avx2(auVar100,auVar169);
  auVar100 = vpaddd_avx2(auVar100,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar21,6);
  auVar167 = vpslld_avx2(auVar21,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar21,0xb);
  auVar167 = vpslld_avx2(auVar21,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar21,0x19);
  auVar167 = vpslld_avx2(auVar21,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar21,auVar20);
  auVar166 = vpand_avx2(auVar10,auVar21);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar51 = vpaddd_avx2(auVar100,auVar51);
  auVar51 = vpaddd_avx2(auVar51,auVar166);
  auVar18._8_4_ = 0xc76c51a3;
  auVar18._0_8_ = 0xc76c51a3c76c51a3;
  auVar18._12_4_ = 0xc76c51a3;
  auVar18._16_4_ = 0xc76c51a3;
  auVar18._20_4_ = 0xc76c51a3;
  auVar18._24_4_ = 0xc76c51a3;
  auVar18._28_4_ = 0xc76c51a3;
  auVar51 = vpaddd_avx2(auVar51,auVar18);
  auVar51 = vpaddd_avx2(auVar51,auVar151 ^ auVar168 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar26,2);
  auVar167 = vpslld_avx2(auVar26,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar26,0xd);
  auVar167 = vpslld_avx2(auVar26,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar26,0x16);
  auVar167 = vpslld_avx2(auVar26,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar26,auVar13);
  auVar166 = vpand_avx2(auVar166,auVar4);
  auVar167 = vpand_avx2(auVar26,auVar13);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar166);
  auVar109 = vpaddd_avx2(auVar109,auVar51);
  auVar51 = vpaddd_avx2(auVar166,auVar51);
  auVar166 = vpsrld_avx2(auVar99,0x11);
  auVar167 = vpslld_avx2(auVar99,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar99,0x13);
  auVar168 = vpslld_avx2(auVar99,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar99,10);
  auVar168 = vpsrld_avx2(auVar163,7);
  auVar151 = vpslld_avx2(auVar163,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar163,0x12);
  auVar153 = vpslld_avx2(auVar163,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar163,3);
  auVar115 = vpaddd_avx2(auVar115,auVar153 ^ auVar151 ^ auVar168);
  auVar115 = vpaddd_avx2(auVar115,auVar170);
  auVar115 = vpaddd_avx2(auVar115,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar109,6);
  auVar167 = vpslld_avx2(auVar109,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar109,0xb);
  auVar167 = vpslld_avx2(auVar109,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar109,0x19);
  auVar167 = vpslld_avx2(auVar109,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar109,auVar10);
  auVar166 = vpand_avx2(auVar21,auVar109);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar20 = vpaddd_avx2(auVar115,auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar166);
  auVar102._8_4_ = 0xd192e819;
  auVar102._0_8_ = 0xd192e819d192e819;
  auVar102._12_4_ = 0xd192e819;
  auVar102._16_4_ = 0xd192e819;
  auVar102._20_4_ = 0xd192e819;
  auVar102._24_4_ = 0xd192e819;
  auVar102._28_4_ = 0xd192e819;
  auVar20 = vpaddd_avx2(auVar102,auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar151 ^ auVar168 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar51,2);
  auVar167 = vpslld_avx2(auVar51,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar51,0xd);
  auVar167 = vpslld_avx2(auVar51,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar51,0x16);
  auVar167 = vpslld_avx2(auVar51,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar51,auVar26);
  auVar166 = vpand_avx2(auVar166,auVar13);
  auVar167 = vpand_avx2(auVar51,auVar26);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar166 = vpaddd_avx2(auVar166,auVar152 ^ auVar151 ^ auVar168);
  auVar4 = vpaddd_avx2(auVar4,auVar20);
  auVar20 = vpaddd_avx2(auVar166,auVar20);
  auVar166 = vpsrld_avx2(auVar100,0x11);
  auVar167 = vpslld_avx2(auVar100,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar100,0x13);
  auVar168 = vpslld_avx2(auVar100,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar100,10);
  auVar168 = vpsrld_avx2(auVar164,7);
  auVar151 = vpslld_avx2(auVar164,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar164,0x12);
  auVar153 = vpslld_avx2(auVar164,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar164,3);
  auVar163 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar153,auVar163);
  auVar163 = vpaddd_avx2(auVar163,auVar113);
  auVar163 = vpaddd_avx2(auVar163,auVar152 ^ auVar167 ^ auVar166);
  auVar166 = vpsrld_avx2(auVar4,6);
  auVar167 = vpslld_avx2(auVar4,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar4,0xb);
  auVar167 = vpslld_avx2(auVar4,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar4,0x19);
  auVar167 = vpslld_avx2(auVar4,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar4,auVar21);
  auVar166 = vpand_avx2(auVar109,auVar4);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar10 = vpaddd_avx2(auVar163,auVar10);
  auVar146._8_4_ = 0xd6990624;
  auVar146._0_8_ = 0xd6990624d6990624;
  auVar146._12_4_ = 0xd6990624;
  auVar146._16_4_ = 0xd6990624;
  auVar146._20_4_ = 0xd6990624;
  auVar146._24_4_ = 0xd6990624;
  auVar146._28_4_ = 0xd6990624;
  auVar10 = vpaddd_avx2(auVar10,auVar166);
  auVar10 = vpaddd_avx2(auVar10,auVar146);
  auVar10 = vpaddd_avx2(auVar10,auVar152 ^ auVar151 ^ auVar168);
  auVar166 = vpsrld_avx2(auVar20,2);
  auVar167 = vpslld_avx2(auVar20,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar20,0xd);
  auVar167 = vpslld_avx2(auVar20,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar20,0x16);
  auVar167 = vpslld_avx2(auVar20,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar20,auVar51);
  auVar166 = vpand_avx2(auVar166,auVar26);
  auVar167 = vpand_avx2(auVar20,auVar51);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar166 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar166);
  auVar13 = vpaddd_avx2(auVar13,auVar10);
  auVar10 = vpaddd_avx2(auVar166,auVar10);
  auVar166 = vpsrld_avx2(auVar115,0x11);
  auVar167 = vpslld_avx2(auVar115,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar115,0x13);
  auVar168 = vpslld_avx2(auVar115,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar115,10);
  auVar168 = vpsrld_avx2(auVar165,7);
  auVar151 = vpslld_avx2(auVar165,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar165,0x12);
  auVar153 = vpslld_avx2(auVar165,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar165,3);
  auVar164 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar153,auVar164);
  auVar164 = vpaddd_avx2(auVar164,auVar114);
  auVar164 = vpaddd_avx2(auVar164,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar13,6);
  auVar167 = vpslld_avx2(auVar13,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar13,0xb);
  auVar167 = vpslld_avx2(auVar13,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar13,0x19);
  auVar167 = vpslld_avx2(auVar13,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar13,auVar109);
  auVar166 = vpand_avx2(auVar4,auVar13);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar21 = vpaddd_avx2(auVar164,auVar21);
  auVar21 = vpaddd_avx2(auVar166,auVar21);
  auVar132._8_4_ = 0xf40e3585;
  auVar132._0_8_ = 0xf40e3585f40e3585;
  auVar132._12_4_ = 0xf40e3585;
  auVar132._16_4_ = 0xf40e3585;
  auVar132._20_4_ = 0xf40e3585;
  auVar132._24_4_ = 0xf40e3585;
  auVar132._28_4_ = 0xf40e3585;
  auVar21 = vpaddd_avx2(auVar132,auVar21);
  auVar21 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar21);
  auVar166 = vpsrld_avx2(auVar10,2);
  auVar167 = vpslld_avx2(auVar10,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar10,0xd);
  auVar167 = vpslld_avx2(auVar10,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar10,0x16);
  auVar167 = vpslld_avx2(auVar10,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar10,auVar20);
  auVar166 = vpand_avx2(auVar166,auVar51);
  auVar167 = vpand_avx2(auVar10,auVar20);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar166 = vpaddd_avx2(auVar166,auVar152 ^ auVar151 ^ auVar168);
  auVar26 = vpaddd_avx2(auVar21,auVar26);
  auVar21 = vpaddd_avx2(auVar166,auVar21);
  auVar166 = vpsrld_avx2(auVar163,0x11);
  auVar167 = vpslld_avx2(auVar163,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar163,0x13);
  auVar168 = vpslld_avx2(auVar163,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar163,10);
  auVar168 = vpsrld_avx2(auVar88,7);
  auVar151 = vpslld_avx2(auVar88,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar88,0x12);
  auVar153 = vpslld_avx2(auVar88,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar88,3);
  auVar165 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar153,auVar165);
  auVar165 = vpaddd_avx2(auVar165,auVar142);
  auVar165 = vpaddd_avx2(auVar165,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar26,6);
  auVar167 = vpslld_avx2(auVar26,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar26,0xb);
  auVar167 = vpslld_avx2(auVar26,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar26,0x19);
  auVar167 = vpslld_avx2(auVar26,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar26,auVar4);
  auVar166 = vpand_avx2(auVar13,auVar26);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar109 = vpaddd_avx2(auVar165,auVar109);
  auVar109 = vpaddd_avx2(auVar166,auVar109);
  auVar133._8_4_ = 0x106aa070;
  auVar133._0_8_ = 0x106aa070106aa070;
  auVar133._12_4_ = 0x106aa070;
  auVar133._16_4_ = 0x106aa070;
  auVar133._20_4_ = 0x106aa070;
  auVar133._24_4_ = 0x106aa070;
  auVar133._28_4_ = 0x106aa070;
  auVar109 = vpaddd_avx2(auVar133,auVar109);
  auVar109 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar109);
  auVar166 = vpsrld_avx2(auVar21,2);
  auVar167 = vpslld_avx2(auVar21,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar21,0xd);
  auVar167 = vpslld_avx2(auVar21,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar21,0x16);
  auVar167 = vpslld_avx2(auVar21,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar21,auVar10);
  auVar166 = vpand_avx2(auVar166,auVar20);
  auVar167 = vpand_avx2(auVar21,auVar10);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar166 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar166);
  auVar51 = vpaddd_avx2(auVar51,auVar109);
  auVar109 = vpaddd_avx2(auVar166,auVar109);
  auVar166 = vpsrld_avx2(auVar164,0x11);
  auVar167 = vpslld_avx2(auVar164,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar164,0x13);
  auVar168 = vpslld_avx2(auVar164,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar164,10);
  auVar168 = vpsrld_avx2(auVar89,7);
  auVar151 = vpslld_avx2(auVar89,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar89,0x12);
  auVar153 = vpslld_avx2(auVar89,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar89,3);
  auVar88 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar153,auVar88);
  auVar88 = vpaddd_avx2(auVar88,auVar98);
  auVar88 = vpaddd_avx2(auVar88,auVar152 ^ auVar167 ^ auVar166);
  auVar166 = vpsrld_avx2(auVar51,6);
  auVar167 = vpslld_avx2(auVar51,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar51,0xb);
  auVar167 = vpslld_avx2(auVar51,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar51,0x19);
  auVar167 = vpslld_avx2(auVar51,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar51,auVar13);
  auVar166 = vpand_avx2(auVar51,auVar26);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar4 = vpaddd_avx2(auVar88,auVar4);
  auVar4 = vpaddd_avx2(auVar166,auVar4);
  auVar103._8_4_ = 0x19a4c116;
  auVar103._0_8_ = 0x19a4c11619a4c116;
  auVar103._12_4_ = 0x19a4c116;
  auVar103._16_4_ = 0x19a4c116;
  auVar103._20_4_ = 0x19a4c116;
  auVar103._24_4_ = 0x19a4c116;
  auVar103._28_4_ = 0x19a4c116;
  auVar4 = vpaddd_avx2(auVar103,auVar4);
  auVar4 = vpaddd_avx2(auVar4,auVar152 ^ auVar151 ^ auVar168);
  auVar166 = vpsrld_avx2(auVar109,2);
  auVar167 = vpslld_avx2(auVar109,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar109,0xd);
  auVar167 = vpslld_avx2(auVar109,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar109,0x16);
  auVar167 = vpslld_avx2(auVar109,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar109,auVar21);
  auVar166 = vpand_avx2(auVar166,auVar10);
  auVar167 = vpand_avx2(auVar109,auVar21);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar166 = vpaddd_avx2(auVar166,auVar152 ^ auVar151 ^ auVar168);
  auVar20 = vpaddd_avx2(auVar20,auVar4);
  auVar4 = vpaddd_avx2(auVar166,auVar4);
  auVar166 = vpsrld_avx2(auVar165,0x11);
  auVar167 = vpslld_avx2(auVar165,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar165,0x13);
  auVar168 = vpslld_avx2(auVar165,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar165,10);
  auVar168 = vpsrld_avx2(auVar160,7);
  auVar151 = vpslld_avx2(auVar160,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar160,0x12);
  auVar153 = vpslld_avx2(auVar160,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar160,3);
  auVar89 = vpaddd_avx2(auVar89,auVar153 ^ auVar151 ^ auVar168);
  auVar89 = vpaddd_avx2(auVar89,auVar99);
  auVar89 = vpaddd_avx2(auVar89,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar20,6);
  auVar167 = vpslld_avx2(auVar20,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar20,0xb);
  auVar167 = vpslld_avx2(auVar20,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar20,0x19);
  auVar167 = vpslld_avx2(auVar20,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar20,auVar26);
  auVar166 = vpand_avx2(auVar51,auVar20);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar13 = vpaddd_avx2(auVar89,auVar13);
  auVar104._8_4_ = 0x1e376c08;
  auVar104._0_8_ = 0x1e376c081e376c08;
  auVar104._12_4_ = 0x1e376c08;
  auVar104._16_4_ = 0x1e376c08;
  auVar104._20_4_ = 0x1e376c08;
  auVar104._24_4_ = 0x1e376c08;
  auVar104._28_4_ = 0x1e376c08;
  auVar13 = vpaddd_avx2(auVar13,auVar166);
  auVar13 = vpaddd_avx2(auVar104,auVar13);
  auVar13 = vpaddd_avx2(auVar13,auVar151 ^ auVar168 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar4,2);
  auVar167 = vpslld_avx2(auVar4,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar4,0xd);
  auVar167 = vpslld_avx2(auVar4,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar4,0x16);
  auVar167 = vpslld_avx2(auVar4,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar4,auVar109);
  auVar166 = vpand_avx2(auVar166,auVar21);
  auVar167 = vpand_avx2(auVar4,auVar109);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar166);
  auVar10 = vpaddd_avx2(auVar10,auVar13);
  auVar13 = vpaddd_avx2(auVar166,auVar13);
  auVar166 = vpsrld_avx2(auVar88,0x11);
  auVar167 = vpslld_avx2(auVar88,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar88,0x13);
  auVar168 = vpslld_avx2(auVar88,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar88,10);
  auVar168 = vpsrld_avx2(auVar161,7);
  auVar151 = vpslld_avx2(auVar161,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar161,0x12);
  auVar153 = vpslld_avx2(auVar161,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar161,3);
  auVar160 = vpaddd_avx2(auVar160,auVar153 ^ auVar151 ^ auVar168);
  auVar160 = vpaddd_avx2(auVar160,auVar100);
  auVar160 = vpaddd_avx2(auVar160,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar10,6);
  auVar167 = vpslld_avx2(auVar10,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar10,0xb);
  auVar167 = vpslld_avx2(auVar10,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar10,0x19);
  auVar167 = vpslld_avx2(auVar10,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar10,auVar51);
  auVar166 = vpand_avx2(auVar20,auVar10);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar26 = vpaddd_avx2(auVar160,auVar26);
  auVar26 = vpaddd_avx2(auVar26,auVar166);
  auVar30._8_4_ = 0x2748774c;
  auVar30._0_8_ = 0x2748774c2748774c;
  auVar30._12_4_ = 0x2748774c;
  auVar30._16_4_ = 0x2748774c;
  auVar30._20_4_ = 0x2748774c;
  auVar30._24_4_ = 0x2748774c;
  auVar30._28_4_ = 0x2748774c;
  auVar26 = vpaddd_avx2(auVar26,auVar30);
  auVar26 = vpaddd_avx2(auVar26,auVar151 ^ auVar168 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar13,2);
  auVar167 = vpslld_avx2(auVar13,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar13,0xd);
  auVar167 = vpslld_avx2(auVar13,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar13,0x16);
  auVar167 = vpslld_avx2(auVar13,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar13,auVar4);
  auVar166 = vpand_avx2(auVar166,auVar109);
  auVar167 = vpand_avx2(auVar13,auVar4);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar166);
  auVar21 = vpaddd_avx2(auVar21,auVar26);
  auVar26 = vpaddd_avx2(auVar166,auVar26);
  auVar166 = vpsrld_avx2(auVar89,0x11);
  auVar167 = vpslld_avx2(auVar89,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar89,0x13);
  auVar168 = vpslld_avx2(auVar89,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar89,10);
  auVar168 = vpsrld_avx2(auVar169,7);
  auVar151 = vpslld_avx2(auVar169,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar169,0x12);
  auVar153 = vpslld_avx2(auVar169,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar169,3);
  auVar161 = vpaddd_avx2(auVar161,auVar153 ^ auVar151 ^ auVar168);
  auVar161 = vpaddd_avx2(auVar161,auVar115);
  auVar161 = vpaddd_avx2(auVar161,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar21,6);
  auVar167 = vpslld_avx2(auVar21,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar21,0xb);
  auVar167 = vpslld_avx2(auVar21,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar21,0x19);
  auVar167 = vpslld_avx2(auVar21,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar21,auVar20);
  auVar166 = vpand_avx2(auVar10,auVar21);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar51 = vpaddd_avx2(auVar161,auVar51);
  auVar51 = vpaddd_avx2(auVar51,auVar166);
  auVar105._8_4_ = 0x34b0bcb5;
  auVar105._0_8_ = 0x34b0bcb534b0bcb5;
  auVar105._12_4_ = 0x34b0bcb5;
  auVar105._16_4_ = 0x34b0bcb5;
  auVar105._20_4_ = 0x34b0bcb5;
  auVar105._24_4_ = 0x34b0bcb5;
  auVar105._28_4_ = 0x34b0bcb5;
  auVar51 = vpaddd_avx2(auVar105,auVar51);
  auVar51 = vpaddd_avx2(auVar51,auVar151 ^ auVar168 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar26,2);
  auVar167 = vpslld_avx2(auVar26,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar26,0xd);
  auVar167 = vpslld_avx2(auVar26,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar26,0x16);
  auVar167 = vpslld_avx2(auVar26,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar26,auVar13);
  auVar166 = vpand_avx2(auVar166,auVar4);
  auVar167 = vpand_avx2(auVar26,auVar13);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar166 = vpaddd_avx2(auVar166,auVar152 ^ auVar151 ^ auVar168);
  auVar109 = vpaddd_avx2(auVar109,auVar51);
  auVar51 = vpaddd_avx2(auVar166,auVar51);
  auVar166 = vpsrld_avx2(auVar160,0x11);
  auVar167 = vpslld_avx2(auVar160,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar160,0x13);
  auVar168 = vpslld_avx2(auVar160,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar160,10);
  auVar168 = vpsrld_avx2(auVar170,7);
  auVar151 = vpslld_avx2(auVar170,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar170,0x12);
  auVar153 = vpslld_avx2(auVar170,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar170,3);
  auVar169 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar153,auVar169);
  auVar169 = vpaddd_avx2(auVar169,auVar163);
  auVar169 = vpaddd_avx2(auVar169,auVar152 ^ auVar167 ^ auVar166);
  auVar166 = vpsrld_avx2(auVar109,6);
  auVar167 = vpslld_avx2(auVar109,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar109,0xb);
  auVar167 = vpslld_avx2(auVar109,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar109,0x19);
  auVar167 = vpslld_avx2(auVar109,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar109,auVar10);
  auVar166 = vpand_avx2(auVar21,auVar109);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar20 = vpaddd_avx2(auVar169,auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar166);
  auVar134._8_4_ = 0x391c0cb3;
  auVar134._0_8_ = 0x391c0cb3391c0cb3;
  auVar134._12_4_ = 0x391c0cb3;
  auVar134._16_4_ = 0x391c0cb3;
  auVar134._20_4_ = 0x391c0cb3;
  auVar134._24_4_ = 0x391c0cb3;
  auVar134._28_4_ = 0x391c0cb3;
  auVar20 = vpaddd_avx2(auVar20,auVar134);
  auVar20 = vpaddd_avx2(auVar20,auVar152 ^ auVar151 ^ auVar168);
  auVar166 = vpsrld_avx2(auVar51,2);
  auVar167 = vpslld_avx2(auVar51,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar51,0xd);
  auVar167 = vpslld_avx2(auVar51,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar51,0x16);
  auVar167 = vpslld_avx2(auVar51,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar51,auVar26);
  auVar166 = vpand_avx2(auVar166,auVar13);
  auVar167 = vpand_avx2(auVar51,auVar26);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar166 = vpaddd_avx2(auVar166,auVar152 ^ auVar151 ^ auVar168);
  auVar4 = vpaddd_avx2(auVar20,auVar4);
  auVar20 = vpaddd_avx2(auVar166,auVar20);
  auVar166 = vpsrld_avx2(auVar161,0x11);
  auVar167 = vpslld_avx2(auVar161,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar161,0x13);
  auVar168 = vpslld_avx2(auVar161,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar161,10);
  auVar168 = vpsrld_avx2(auVar113,7);
  auVar151 = vpslld_avx2(auVar113,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar113,0x12);
  auVar153 = vpslld_avx2(auVar113,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar113,3);
  auVar170 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar153,auVar170);
  auVar170 = vpaddd_avx2(auVar170,auVar164);
  auVar170 = vpaddd_avx2(auVar170,auVar152 ^ auVar167 ^ auVar166);
  auVar166 = vpsrld_avx2(auVar4,6);
  auVar167 = vpslld_avx2(auVar4,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar4,0xb);
  auVar167 = vpslld_avx2(auVar4,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar4,0x19);
  auVar167 = vpslld_avx2(auVar4,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar4,auVar21);
  auVar166 = vpand_avx2(auVar109,auVar4);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar10 = vpaddd_avx2(auVar170,auVar10);
  auVar147._8_4_ = 0x4ed8aa4a;
  auVar147._0_8_ = 0x4ed8aa4a4ed8aa4a;
  auVar147._12_4_ = 0x4ed8aa4a;
  auVar147._16_4_ = 0x4ed8aa4a;
  auVar147._20_4_ = 0x4ed8aa4a;
  auVar147._24_4_ = 0x4ed8aa4a;
  auVar147._28_4_ = 0x4ed8aa4a;
  auVar10 = vpaddd_avx2(auVar166,auVar10);
  auVar10 = vpaddd_avx2(auVar147,auVar10);
  auVar10 = vpaddd_avx2(auVar10,auVar152 ^ auVar151 ^ auVar168);
  auVar166 = vpsrld_avx2(auVar20,2);
  auVar167 = vpslld_avx2(auVar20,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar20,0xd);
  auVar167 = vpslld_avx2(auVar20,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar20,0x16);
  auVar167 = vpslld_avx2(auVar20,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar20,auVar51);
  auVar166 = vpand_avx2(auVar166,auVar26);
  auVar167 = vpand_avx2(auVar20,auVar51);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar166 = vpaddd_avx2(auVar166,auVar152 ^ auVar151 ^ auVar168);
  auVar13 = vpaddd_avx2(auVar13,auVar10);
  auVar10 = vpaddd_avx2(auVar166,auVar10);
  auVar166 = vpsrld_avx2(auVar169,0x11);
  auVar167 = vpslld_avx2(auVar169,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar169,0x13);
  auVar168 = vpslld_avx2(auVar169,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar169,10);
  auVar168 = vpsrld_avx2(auVar114,7);
  auVar151 = vpslld_avx2(auVar114,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar114,0x12);
  auVar153 = vpslld_avx2(auVar114,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar114,3);
  auVar113 = vpaddd_avx2(auVar113,auVar153 ^ auVar151 ^ auVar168);
  auVar113 = vpaddd_avx2(auVar113,auVar165);
  auVar113 = vpaddd_avx2(auVar113,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar13,6);
  auVar167 = vpslld_avx2(auVar13,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar13,0xb);
  auVar167 = vpslld_avx2(auVar13,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar13,0x19);
  auVar167 = vpslld_avx2(auVar13,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar13,auVar109);
  auVar166 = vpand_avx2(auVar4,auVar13);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar21 = vpaddd_avx2(auVar113,auVar21);
  auVar21 = vpaddd_avx2(auVar21,auVar166);
  auVar59._8_4_ = 0x5b9cca4f;
  auVar59._0_8_ = 0x5b9cca4f5b9cca4f;
  auVar59._12_4_ = 0x5b9cca4f;
  auVar59._16_4_ = 0x5b9cca4f;
  auVar59._20_4_ = 0x5b9cca4f;
  auVar59._24_4_ = 0x5b9cca4f;
  auVar59._28_4_ = 0x5b9cca4f;
  auVar21 = vpaddd_avx2(auVar21,auVar59);
  auVar21 = vpaddd_avx2(auVar21,auVar151 ^ auVar168 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar10,2);
  auVar167 = vpslld_avx2(auVar10,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar10,0xd);
  auVar167 = vpslld_avx2(auVar10,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar10,0x16);
  auVar167 = vpslld_avx2(auVar10,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar10,auVar20);
  auVar166 = vpand_avx2(auVar166,auVar51);
  auVar167 = vpand_avx2(auVar10,auVar20);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar166);
  auVar26 = vpaddd_avx2(auVar26,auVar21);
  auVar21 = vpaddd_avx2(auVar166,auVar21);
  auVar166 = vpsrld_avx2(auVar170,0x11);
  auVar167 = vpslld_avx2(auVar170,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar170,0x13);
  auVar168 = vpslld_avx2(auVar170,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar170,10);
  auVar168 = vpsrld_avx2(auVar142,7);
  auVar151 = vpslld_avx2(auVar142,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar142,0x12);
  auVar153 = vpslld_avx2(auVar142,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar142,3);
  auVar114 = vpaddd_avx2(auVar114,auVar153 ^ auVar151 ^ auVar168);
  auVar114 = vpaddd_avx2(auVar114,auVar88);
  auVar114 = vpaddd_avx2(auVar114,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar26,6);
  auVar167 = vpslld_avx2(auVar26,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar26,0xb);
  auVar167 = vpslld_avx2(auVar26,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar26,0x19);
  auVar167 = vpslld_avx2(auVar26,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar26,auVar4);
  auVar166 = vpand_avx2(auVar13,auVar26);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar109 = vpaddd_avx2(auVar114,auVar109);
  auVar109 = vpaddd_avx2(auVar109,auVar166);
  auVar31._8_4_ = 0x682e6ff3;
  auVar31._0_8_ = 0x682e6ff3682e6ff3;
  auVar31._12_4_ = 0x682e6ff3;
  auVar31._16_4_ = 0x682e6ff3;
  auVar31._20_4_ = 0x682e6ff3;
  auVar31._24_4_ = 0x682e6ff3;
  auVar31._28_4_ = 0x682e6ff3;
  auVar109 = vpaddd_avx2(auVar109,auVar31);
  auVar109 = vpaddd_avx2(auVar109,auVar151 ^ auVar168 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar21,2);
  auVar167 = vpslld_avx2(auVar21,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar21,0xd);
  auVar167 = vpslld_avx2(auVar21,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar21,0x16);
  auVar167 = vpslld_avx2(auVar21,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar10,auVar21);
  auVar166 = vpand_avx2(auVar20,auVar166);
  auVar167 = vpand_avx2(auVar10,auVar21);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar166);
  auVar51 = vpaddd_avx2(auVar51,auVar109);
  auVar109 = vpaddd_avx2(auVar166,auVar109);
  auVar166 = vpsrld_avx2(auVar113,0x11);
  auVar167 = vpslld_avx2(auVar113,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar113,0x13);
  auVar168 = vpslld_avx2(auVar113,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar113,10);
  auVar168 = vpsrld_avx2(auVar98,7);
  auVar151 = vpslld_avx2(auVar98,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar98,0x12);
  auVar153 = vpslld_avx2(auVar98,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar98,3);
  auVar142 = vpaddd_avx2(auVar142,auVar153 ^ auVar151 ^ auVar168);
  auVar89 = vpaddd_avx2(auVar142,auVar89);
  auVar89 = vpaddd_avx2(auVar89,auVar167 ^ auVar166 ^ auVar152);
  auVar142 = vpsrld_avx2(auVar51,6);
  auVar166 = vpslld_avx2(auVar51,0x1a);
  auVar167 = vpor_avx2(auVar166,auVar142);
  auVar142 = vpsrld_avx2(auVar51,0xb);
  auVar166 = vpslld_avx2(auVar51,0x15);
  auVar168 = vpor_avx2(auVar166,auVar142);
  auVar142 = vpsrld_avx2(auVar51,0x19);
  auVar166 = vpslld_avx2(auVar51,7);
  auVar151 = vpor_avx2(auVar166,auVar142);
  auVar166 = vpandn_avx2(auVar51,auVar13);
  auVar142 = vpand_avx2(auVar26,auVar51);
  auVar142 = vpor_avx2(auVar142,auVar166);
  auVar4 = vpaddd_avx2(auVar89,auVar4);
  auVar4 = vpaddd_avx2(auVar4,auVar142);
  auVar32._8_4_ = 0x748f82ee;
  auVar32._0_8_ = 0x748f82ee748f82ee;
  auVar32._12_4_ = 0x748f82ee;
  auVar32._16_4_ = 0x748f82ee;
  auVar32._20_4_ = 0x748f82ee;
  auVar32._24_4_ = 0x748f82ee;
  auVar32._28_4_ = 0x748f82ee;
  auVar4 = vpaddd_avx2(auVar4,auVar32);
  auVar4 = vpaddd_avx2(auVar4,auVar168 ^ auVar167 ^ auVar151);
  auVar142 = vpsrld_avx2(auVar109,2);
  auVar166 = vpslld_avx2(auVar109,0x1e);
  auVar167 = vpor_avx2(auVar166,auVar142);
  auVar142 = vpsrld_avx2(auVar109,0xd);
  auVar166 = vpslld_avx2(auVar109,0x13);
  auVar168 = vpor_avx2(auVar166,auVar142);
  auVar142 = vpsrld_avx2(auVar109,0x16);
  auVar166 = vpslld_avx2(auVar109,10);
  auVar151 = vpor_avx2(auVar166,auVar142);
  auVar142 = vpor_avx2(auVar109,auVar21);
  auVar142 = vpand_avx2(auVar10,auVar142);
  auVar166 = vpand_avx2(auVar109,auVar21);
  auVar142 = vpor_avx2(auVar166,auVar142);
  auVar142 = vpaddd_avx2(auVar168 ^ auVar167 ^ auVar151,auVar142);
  auVar20 = vpaddd_avx2(auVar20,auVar4);
  auVar4 = vpaddd_avx2(auVar142,auVar4);
  auVar142 = vpsrld_avx2(auVar114,0x11);
  auVar166 = vpslld_avx2(auVar114,0xf);
  auVar166 = vpor_avx2(auVar166,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0x13);
  auVar167 = vpslld_avx2(auVar114,0xd);
  auVar167 = vpor_avx2(auVar167,auVar142);
  auVar151 = vpsrld_avx2(auVar114,10);
  auVar142 = vpsrld_avx2(auVar99,7);
  auVar168 = vpslld_avx2(auVar99,0x19);
  auVar142 = vpor_avx2(auVar168,auVar142);
  auVar168 = vpsrld_avx2(auVar99,0x12);
  auVar152 = vpslld_avx2(auVar99,0xe);
  auVar168 = vpor_avx2(auVar152,auVar168);
  auVar152 = vpsrld_avx2(auVar99,3);
  auVar142 = vpaddd_avx2(auVar168 ^ auVar142 ^ auVar152,auVar98);
  auVar160 = vpaddd_avx2(auVar142,auVar160);
  auVar160 = vpaddd_avx2(auVar160,auVar151 ^ auVar167 ^ auVar166);
  auVar142 = vpsrld_avx2(auVar20,6);
  auVar98 = vpslld_avx2(auVar20,0x1a);
  auVar166 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0xb);
  auVar98 = vpslld_avx2(auVar20,0x15);
  auVar167 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar20,0x19);
  auVar98 = vpslld_avx2(auVar20,7);
  auVar168 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar20,auVar26);
  auVar142 = vpand_avx2(auVar51,auVar20);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar13 = vpaddd_avx2(auVar160,auVar13);
  auVar162._8_4_ = 0x78a5636f;
  auVar162._0_8_ = 0x78a5636f78a5636f;
  auVar162._12_4_ = 0x78a5636f;
  auVar162._16_4_ = 0x78a5636f;
  auVar162._20_4_ = 0x78a5636f;
  auVar162._24_4_ = 0x78a5636f;
  auVar162._28_4_ = 0x78a5636f;
  auVar13 = vpaddd_avx2(auVar142,auVar13);
  auVar13 = vpaddd_avx2(auVar162,auVar13);
  auVar13 = vpaddd_avx2(auVar167 ^ auVar166 ^ auVar168,auVar13);
  auVar142 = vpsrld_avx2(auVar4,2);
  auVar98 = vpslld_avx2(auVar4,0x1e);
  auVar166 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar4,0xd);
  auVar98 = vpslld_avx2(auVar4,0x13);
  auVar167 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar4,0x16);
  auVar98 = vpslld_avx2(auVar4,10);
  auVar168 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar4,auVar109);
  auVar142 = vpand_avx2(auVar142,auVar21);
  auVar98 = vpand_avx2(auVar4,auVar109);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar142 = vpaddd_avx2(auVar142,auVar168 ^ auVar167 ^ auVar166);
  auVar10 = vpaddd_avx2(auVar10,auVar13);
  auVar13 = vpaddd_avx2(auVar142,auVar13);
  auVar142 = vpsrld_avx2(auVar89,0x11);
  auVar98 = vpslld_avx2(auVar89,0xf);
  auVar98 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar89,0x13);
  auVar166 = vpslld_avx2(auVar89,0xd);
  auVar166 = vpor_avx2(auVar166,auVar142);
  auVar168 = vpsrld_avx2(auVar89,10);
  auVar142 = vpsrld_avx2(auVar100,7);
  auVar167 = vpslld_avx2(auVar100,0x19);
  auVar142 = vpor_avx2(auVar167,auVar142);
  auVar167 = vpsrld_avx2(auVar100,0x12);
  auVar151 = vpslld_avx2(auVar100,0xe);
  auVar167 = vpor_avx2(auVar151,auVar167);
  auVar151 = vpsrld_avx2(auVar100,3);
  auVar142 = vpaddd_avx2(auVar167 ^ auVar142 ^ auVar151,auVar99);
  auVar161 = vpaddd_avx2(auVar142,auVar161);
  auVar161 = vpaddd_avx2(auVar161,auVar166 ^ auVar98 ^ auVar168);
  auVar142 = vpsrld_avx2(auVar10,6);
  auVar98 = vpslld_avx2(auVar10,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar10,0xb);
  auVar98 = vpslld_avx2(auVar10,0x15);
  auVar166 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar10,0x19);
  auVar98 = vpslld_avx2(auVar10,7);
  auVar167 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar10,auVar51);
  auVar142 = vpand_avx2(auVar20,auVar10);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar26 = vpaddd_avx2(auVar161,auVar26);
  auVar26 = vpaddd_avx2(auVar142,auVar26);
  auVar154._8_4_ = 0x84c87814;
  auVar154._0_8_ = 0x84c8781484c87814;
  auVar154._12_4_ = 0x84c87814;
  auVar154._16_4_ = 0x84c87814;
  auVar154._20_4_ = 0x84c87814;
  auVar154._24_4_ = 0x84c87814;
  auVar154._28_4_ = 0x84c87814;
  auVar26 = vpaddd_avx2(auVar154,auVar26);
  auVar26 = vpaddd_avx2(auVar166 ^ auVar99 ^ auVar167,auVar26);
  auVar142 = vpsrld_avx2(auVar13,2);
  auVar98 = vpslld_avx2(auVar13,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0xd);
  auVar98 = vpslld_avx2(auVar13,0x13);
  auVar166 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0x16);
  auVar98 = vpslld_avx2(auVar13,10);
  auVar167 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar13,auVar4);
  auVar142 = vpand_avx2(auVar142,auVar109);
  auVar98 = vpand_avx2(auVar13,auVar4);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar142 = vpaddd_avx2(auVar166 ^ auVar99 ^ auVar167,auVar142);
  auVar21 = vpaddd_avx2(auVar21,auVar26);
  auVar26 = vpaddd_avx2(auVar142,auVar26);
  auVar142 = vpsrld_avx2(auVar160,0x11);
  auVar98 = vpslld_avx2(auVar160,0xf);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpsrld_avx2(auVar160,0x13);
  auVar99 = vpslld_avx2(auVar160,0xd);
  auVar98 = vpor_avx2(auVar99,auVar98);
  auVar166 = vpsrld_avx2(auVar160,10);
  auVar160 = vpsrld_avx2(auVar115,7);
  auVar99 = vpslld_avx2(auVar115,0x19);
  auVar160 = vpor_avx2(auVar99,auVar160);
  auVar99 = vpsrld_avx2(auVar115,0x12);
  auVar167 = vpslld_avx2(auVar115,0xe);
  auVar99 = vpor_avx2(auVar167,auVar99);
  auVar167 = vpsrld_avx2(auVar115,3);
  auVar160 = vpaddd_avx2(auVar100,auVar167 ^ auVar99 ^ auVar160);
  auVar160 = vpaddd_avx2(auVar160,auVar169);
  auVar160 = vpaddd_avx2(auVar160,auVar98 ^ auVar142 ^ auVar166);
  auVar169 = vpsrld_avx2(auVar21,6);
  auVar142 = vpslld_avx2(auVar21,0x1a);
  auVar98 = vpor_avx2(auVar142,auVar169);
  auVar169 = vpsrld_avx2(auVar21,0xb);
  auVar142 = vpslld_avx2(auVar21,0x15);
  auVar99 = vpor_avx2(auVar142,auVar169);
  auVar169 = vpsrld_avx2(auVar21,0x19);
  auVar142 = vpslld_avx2(auVar21,7);
  auVar100 = vpor_avx2(auVar142,auVar169);
  auVar142 = vpandn_avx2(auVar21,auVar20);
  auVar169 = vpand_avx2(auVar10,auVar21);
  auVar169 = vpor_avx2(auVar169,auVar142);
  auVar51 = vpaddd_avx2(auVar160,auVar51);
  auVar51 = vpaddd_avx2(auVar51,auVar169);
  auVar24._8_4_ = 0x8cc70208;
  auVar24._0_8_ = 0x8cc702088cc70208;
  auVar24._12_4_ = 0x8cc70208;
  auVar24._16_4_ = 0x8cc70208;
  auVar24._20_4_ = 0x8cc70208;
  auVar24._24_4_ = 0x8cc70208;
  auVar24._28_4_ = 0x8cc70208;
  auVar51 = vpaddd_avx2(auVar51,auVar24);
  auVar51 = vpaddd_avx2(auVar51,auVar99 ^ auVar98 ^ auVar100);
  auVar169 = vpsrld_avx2(auVar26,2);
  auVar142 = vpslld_avx2(auVar26,0x1e);
  auVar98 = vpor_avx2(auVar142,auVar169);
  auVar169 = vpsrld_avx2(auVar26,0xd);
  auVar142 = vpslld_avx2(auVar26,0x13);
  auVar99 = vpor_avx2(auVar142,auVar169);
  auVar169 = vpsrld_avx2(auVar26,0x16);
  auVar142 = vpslld_avx2(auVar26,10);
  auVar100 = vpor_avx2(auVar142,auVar169);
  auVar169 = vpor_avx2(auVar26,auVar13);
  auVar169 = vpand_avx2(auVar169,auVar4);
  auVar142 = vpand_avx2(auVar26,auVar13);
  auVar169 = vpor_avx2(auVar142,auVar169);
  auVar169 = vpaddd_avx2(auVar99 ^ auVar98 ^ auVar100,auVar169);
  auVar109 = vpaddd_avx2(auVar109,auVar51);
  auVar51 = vpaddd_avx2(auVar169,auVar51);
  auVar169 = vpsrld_avx2(auVar161,0x11);
  auVar142 = vpslld_avx2(auVar161,0xf);
  auVar169 = vpor_avx2(auVar142,auVar169);
  auVar142 = vpsrld_avx2(auVar161,0x13);
  auVar98 = vpslld_avx2(auVar161,0xd);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar99 = vpsrld_avx2(auVar161,10);
  auVar161 = vpsrld_avx2(auVar163,7);
  auVar98 = vpslld_avx2(auVar163,0x19);
  auVar161 = vpor_avx2(auVar98,auVar161);
  auVar98 = vpsrld_avx2(auVar163,0x12);
  auVar100 = vpslld_avx2(auVar163,0xe);
  auVar98 = vpor_avx2(auVar100,auVar98);
  auVar100 = vpsrld_avx2(auVar163,3);
  auVar161 = vpaddd_avx2(auVar115,auVar100 ^ auVar98 ^ auVar161);
  auVar161 = vpaddd_avx2(auVar161,auVar170);
  auVar161 = vpaddd_avx2(auVar161,auVar142 ^ auVar169 ^ auVar99);
  auVar169 = vpsrld_avx2(auVar109,6);
  auVar170 = vpslld_avx2(auVar109,0x1a);
  auVar142 = vpor_avx2(auVar170,auVar169);
  auVar169 = vpsrld_avx2(auVar109,0xb);
  auVar170 = vpslld_avx2(auVar109,0x15);
  auVar98 = vpor_avx2(auVar170,auVar169);
  auVar169 = vpsrld_avx2(auVar109,0x19);
  auVar170 = vpslld_avx2(auVar109,7);
  auVar99 = vpor_avx2(auVar170,auVar169);
  auVar170 = vpandn_avx2(auVar109,auVar10);
  auVar169 = vpand_avx2(auVar21,auVar109);
  auVar169 = vpor_avx2(auVar169,auVar170);
  auVar20 = vpaddd_avx2(auVar161,auVar20);
  auVar20 = vpaddd_avx2(auVar169,auVar20);
  auVar155._8_4_ = 0x90befffa;
  auVar155._0_8_ = 0x90befffa90befffa;
  auVar155._12_4_ = 0x90befffa;
  auVar155._16_4_ = 0x90befffa;
  auVar155._20_4_ = 0x90befffa;
  auVar155._24_4_ = 0x90befffa;
  auVar155._28_4_ = 0x90befffa;
  auVar20 = vpaddd_avx2(auVar155,auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar99 ^ auVar98 ^ auVar142);
  auVar169 = vpsrld_avx2(auVar51,2);
  auVar170 = vpslld_avx2(auVar51,0x1e);
  auVar142 = vpor_avx2(auVar170,auVar169);
  auVar169 = vpsrld_avx2(auVar51,0xd);
  auVar170 = vpslld_avx2(auVar51,0x13);
  auVar98 = vpor_avx2(auVar170,auVar169);
  auVar169 = vpsrld_avx2(auVar51,0x16);
  auVar170 = vpslld_avx2(auVar51,10);
  auVar99 = vpor_avx2(auVar170,auVar169);
  auVar169 = vpor_avx2(auVar26,auVar51);
  auVar169 = vpand_avx2(auVar169,auVar13);
  auVar170 = vpand_avx2(auVar26,auVar51);
  auVar169 = vpor_avx2(auVar169,auVar170);
  auVar169 = vpaddd_avx2(auVar169,auVar99 ^ auVar98 ^ auVar142);
  auVar4 = vpaddd_avx2(auVar4,auVar20);
  auVar20 = vpaddd_avx2(auVar169,auVar20);
  auVar169 = vpsrld_avx2(auVar160,0x11);
  auVar170 = vpslld_avx2(auVar160,0xf);
  auVar169 = vpor_avx2(auVar170,auVar169);
  auVar170 = vpsrld_avx2(auVar160,0x13);
  auVar142 = vpslld_avx2(auVar160,0xd);
  auVar170 = vpor_avx2(auVar142,auVar170);
  auVar98 = vpsrld_avx2(auVar160,10);
  auVar160 = vpsrld_avx2(auVar164,7);
  auVar142 = vpslld_avx2(auVar164,0x19);
  auVar160 = vpor_avx2(auVar142,auVar160);
  auVar142 = vpsrld_avx2(auVar164,0x12);
  auVar99 = vpslld_avx2(auVar164,0xe);
  auVar142 = vpor_avx2(auVar99,auVar142);
  auVar99 = vpsrld_avx2(auVar164,3);
  auVar160 = vpaddd_avx2(auVar163,auVar99 ^ auVar142 ^ auVar160);
  auVar160 = vpaddd_avx2(auVar160,auVar113);
  auVar160 = vpaddd_avx2(auVar160,auVar170 ^ auVar169 ^ auVar98);
  auVar169 = vpsrld_avx2(auVar4,6);
  auVar170 = vpslld_avx2(auVar4,0x1a);
  auVar113 = vpor_avx2(auVar170,auVar169);
  auVar169 = vpsrld_avx2(auVar4,0xb);
  auVar170 = vpslld_avx2(auVar4,0x15);
  auVar142 = vpor_avx2(auVar170,auVar169);
  auVar169 = vpsrld_avx2(auVar4,0x19);
  auVar170 = vpslld_avx2(auVar4,7);
  auVar98 = vpor_avx2(auVar170,auVar169);
  auVar170 = vpandn_avx2(auVar4,auVar21);
  auVar169 = vpand_avx2(auVar4,auVar109);
  auVar169 = vpor_avx2(auVar169,auVar170);
  auVar10 = vpaddd_avx2(auVar160,auVar10);
  auVar156._8_4_ = 0xa4506ceb;
  auVar156._0_8_ = 0xa4506ceba4506ceb;
  auVar156._12_4_ = 0xa4506ceb;
  auVar156._16_4_ = 0xa4506ceb;
  auVar156._20_4_ = 0xa4506ceb;
  auVar156._24_4_ = 0xa4506ceb;
  auVar156._28_4_ = 0xa4506ceb;
  auVar10 = vpaddd_avx2(auVar10,auVar169);
  auVar10 = vpaddd_avx2(auVar156,auVar10);
  auVar10 = vpaddd_avx2(auVar10,auVar142 ^ auVar113 ^ auVar98);
  auVar169 = vpsrld_avx2(auVar20,2);
  auVar170 = vpslld_avx2(auVar20,0x1e);
  auVar113 = vpor_avx2(auVar170,auVar169);
  auVar169 = vpsrld_avx2(auVar20,0xd);
  auVar170 = vpslld_avx2(auVar20,0x13);
  auVar142 = vpor_avx2(auVar170,auVar169);
  auVar169 = vpsrld_avx2(auVar20,0x16);
  auVar170 = vpslld_avx2(auVar20,10);
  auVar98 = vpor_avx2(auVar170,auVar169);
  auVar169 = vpor_avx2(auVar20,auVar51);
  auVar169 = vpand_avx2(auVar26,auVar169);
  auVar170 = vpand_avx2(auVar20,auVar51);
  auVar169 = vpor_avx2(auVar170,auVar169);
  auVar169 = vpaddd_avx2(auVar142 ^ auVar113 ^ auVar98,auVar169);
  auVar13 = vpaddd_avx2(auVar13,auVar10);
  auVar10 = vpaddd_avx2(auVar169,auVar10);
  auVar169 = vpsrld_avx2(auVar161,0x11);
  auVar170 = vpslld_avx2(auVar161,0xf);
  auVar170 = vpor_avx2(auVar170,auVar169);
  auVar169 = vpsrld_avx2(auVar161,0x13);
  auVar113 = vpslld_avx2(auVar161,0xd);
  auVar113 = vpor_avx2(auVar113,auVar169);
  auVar163 = vpsrld_avx2(auVar161,10);
  auVar161 = vpsrld_avx2(auVar165,7);
  auVar169 = vpslld_avx2(auVar165,0x19);
  auVar142 = vpor_avx2(auVar169,auVar161);
  auVar161 = vpsrld_avx2(auVar165,0x12);
  auVar169 = vpslld_avx2(auVar165,0xe);
  auVar98 = vpor_avx2(auVar169,auVar161);
  auVar166 = vpsrld_avx2(auVar165,3);
  auVar161 = vpsrld_avx2(auVar13,6);
  auVar169 = vpslld_avx2(auVar13,0x1a);
  auVar99 = vpor_avx2(auVar169,auVar161);
  auVar161 = vpsrld_avx2(auVar13,0xb);
  auVar169 = vpslld_avx2(auVar13,0x15);
  auVar100 = vpor_avx2(auVar169,auVar161);
  auVar161 = vpsrld_avx2(auVar13,0x19);
  auVar169 = vpslld_avx2(auVar13,7);
  auVar115 = vpor_avx2(auVar169,auVar161);
  auVar169 = vpandn_avx2(auVar13,auVar109);
  auVar161 = vpand_avx2(auVar4,auVar13);
  auVar169 = vpor_avx2(auVar161,auVar169);
  auVar161 = vpaddd_avx2(auVar164,auVar98 ^ auVar142 ^ auVar166);
  auVar161 = vpaddd_avx2(auVar161,auVar114);
  auVar161 = vpaddd_avx2(auVar161,auVar113 ^ auVar170 ^ auVar163);
  auVar21 = vpaddd_avx2(auVar161,auVar21);
  auVar21 = vpaddd_avx2(auVar169,auVar21);
  auVar33._8_4_ = 0xbef9a3f7;
  auVar33._0_8_ = 0xbef9a3f7bef9a3f7;
  auVar33._12_4_ = 0xbef9a3f7;
  auVar33._16_4_ = 0xbef9a3f7;
  auVar33._20_4_ = 0xbef9a3f7;
  auVar33._24_4_ = 0xbef9a3f7;
  auVar33._28_4_ = 0xbef9a3f7;
  auVar21 = vpaddd_avx2(auVar21,auVar33);
  auVar21 = vpaddd_avx2(auVar21,auVar115 ^ auVar100 ^ auVar99);
  auVar161 = vpsrld_avx2(auVar10,2);
  auVar169 = vpslld_avx2(auVar10,0x1e);
  auVar170 = vpor_avx2(auVar169,auVar161);
  auVar161 = vpsrld_avx2(auVar10,0xd);
  auVar169 = vpslld_avx2(auVar10,0x13);
  auVar113 = vpor_avx2(auVar169,auVar161);
  auVar161 = vpsrld_avx2(auVar10,0x16);
  auVar169 = vpslld_avx2(auVar10,10);
  auVar114 = vpor_avx2(auVar169,auVar161);
  auVar161 = vpor_avx2(auVar10,auVar20);
  auVar161 = vpand_avx2(auVar161,auVar51);
  auVar169 = vpand_avx2(auVar10,auVar20);
  auVar161 = vpor_avx2(auVar161,auVar169);
  auVar161 = vpaddd_avx2(auVar113 ^ auVar170 ^ auVar114,auVar161);
  auVar26 = vpaddd_avx2(auVar26,auVar21);
  auVar21 = vpaddd_avx2(auVar161,auVar21);
  auVar161 = vpsrld_avx2(auVar160,0x11);
  auVar169 = vpslld_avx2(auVar160,0xf);
  auVar161 = vpor_avx2(auVar169,auVar161);
  auVar169 = vpsrld_avx2(auVar160,0x13);
  auVar170 = vpslld_avx2(auVar160,0xd);
  auVar169 = vpor_avx2(auVar170,auVar169);
  auVar99 = vpsrld_avx2(auVar160,10);
  auVar160 = vpsrld_avx2(auVar88,7);
  auVar170 = vpslld_avx2(auVar88,0x19);
  auVar170 = vpor_avx2(auVar170,auVar160);
  auVar160 = vpsrld_avx2(auVar88,0x12);
  auVar113 = vpslld_avx2(auVar88,0xe);
  auVar113 = vpor_avx2(auVar113,auVar160);
  auVar100 = vpsrld_avx2(auVar88,3);
  auVar88 = vpsrld_avx2(auVar26,6);
  auVar160 = vpslld_avx2(auVar26,0x1a);
  auVar114 = vpor_avx2(auVar160,auVar88);
  auVar88 = vpsrld_avx2(auVar26,0xb);
  auVar160 = vpslld_avx2(auVar26,0x15);
  auVar142 = vpor_avx2(auVar160,auVar88);
  auVar88 = vpsrld_avx2(auVar26,0x19);
  auVar160 = vpslld_avx2(auVar26,7);
  auVar98 = vpor_avx2(auVar160,auVar88);
  auVar160 = vpandn_avx2(auVar26,auVar4);
  auVar88 = vpand_avx2(auVar13,auVar26);
  auVar160 = vpor_avx2(auVar88,auVar160);
  auVar88 = vpaddd_avx2(auVar165,auVar100 ^ auVar113 ^ auVar170);
  auVar88 = vpaddd_avx2(auVar88,auVar89);
  auVar88 = vpaddd_avx2(auVar88,auVar169 ^ auVar161 ^ auVar99);
  auVar109 = vpaddd_avx2(auVar88,auVar109);
  auVar109 = vpaddd_avx2(auVar160,auVar109);
  auVar34._8_4_ = 0xc67178f2;
  auVar34._0_8_ = 0xc67178f2c67178f2;
  auVar34._12_4_ = 0xc67178f2;
  auVar34._16_4_ = 0xc67178f2;
  auVar34._20_4_ = 0xc67178f2;
  auVar34._24_4_ = 0xc67178f2;
  auVar34._28_4_ = 0xc67178f2;
  auVar109 = vpaddd_avx2(auVar109,auVar34);
  auVar109 = vpaddd_avx2(auVar142 ^ auVar114 ^ auVar98,auVar109);
  auVar88 = vpsrld_avx2(auVar21,2);
  auVar89 = vpslld_avx2(auVar21,0x1e);
  auVar160 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpsrld_avx2(auVar21,0xd);
  auVar89 = vpslld_avx2(auVar21,0x13);
  auVar161 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpsrld_avx2(auVar21,0x16);
  auVar89 = vpslld_avx2(auVar21,10);
  auVar169 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpor_avx2(auVar10,auVar21);
  auVar88 = vpand_avx2(auVar88,auVar20);
  auVar89 = vpand_avx2(auVar10,auVar21);
  auVar88 = vpor_avx2(auVar89,auVar88);
  auVar88 = vpaddd_avx2(auVar161 ^ auVar160 ^ auVar169,auVar88);
  auVar88 = vpaddd_avx2(auVar109,auVar88);
  auVar51 = vpaddd_avx2(auVar51,auVar52);
  auVar109 = vpaddd_avx2(auVar109,auVar51);
  auVar51 = vpsrld_avx2(auVar109,6);
  auVar89 = vpslld_avx2(auVar109,0x1a);
  auVar169 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpsrld_avx2(auVar109,0xb);
  auVar89 = vpslld_avx2(auVar109,0x15);
  auVar170 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpsrld_avx2(auVar109,0x19);
  auVar89 = vpslld_avx2(auVar109,7);
  auVar113 = vpor_avx2(auVar89,auVar51);
  auVar51 = vpaddd_avx2(auVar26,auVar22);
  auVar35._8_4_ = 0x1f83d9ab;
  auVar35._0_8_ = 0x1f83d9ab1f83d9ab;
  auVar35._12_4_ = 0x1f83d9ab;
  auVar35._16_4_ = 0x1f83d9ab;
  auVar35._20_4_ = 0x1f83d9ab;
  auVar35._24_4_ = 0x1f83d9ab;
  auVar35._28_4_ = 0x1f83d9ab;
  auVar89 = vpaddd_avx2(auVar13,auVar35);
  auVar161 = vpandn_avx2(auVar109,auVar89);
  auVar160 = vpand_avx2(auVar51,auVar109);
  auVar160 = vpor_avx2(auVar160,auVar161);
  auVar161._8_4_ = 0x1e6afcb1;
  auVar161._0_8_ = 0x1e6afcb11e6afcb1;
  auVar161._12_4_ = 0x1e6afcb1;
  auVar161._16_4_ = 0x1e6afcb1;
  auVar161._20_4_ = 0x1e6afcb1;
  auVar161._24_4_ = 0x1e6afcb1;
  auVar161._28_4_ = 0x1e6afcb1;
  auVar160 = vpaddd_avx2(auVar4,auVar160);
  auVar160 = vpaddd_avx2(auVar160,auVar161);
  auVar60._8_4_ = 0x6a09e667;
  auVar60._0_8_ = 0x6a09e6676a09e667;
  auVar60._12_4_ = 0x6a09e667;
  auVar60._16_4_ = 0x6a09e667;
  auVar60._20_4_ = 0x6a09e667;
  auVar60._24_4_ = 0x6a09e667;
  auVar60._28_4_ = 0x6a09e667;
  auVar160 = vpaddd_avx2(auVar160,auVar170 ^ auVar169 ^ auVar113);
  auVar88 = vpaddd_avx2(auVar88,auVar60);
  auVar161 = vpsrld_avx2(auVar88,2);
  auVar169 = vpslld_avx2(auVar88,0x1e);
  auVar170 = vpor_avx2(auVar169,auVar161);
  auVar161 = vpsrld_avx2(auVar88,0xd);
  auVar169 = vpslld_avx2(auVar88,0x13);
  auVar113 = vpor_avx2(auVar169,auVar161);
  auVar161 = vpsrld_avx2(auVar88,0x16);
  auVar169 = vpslld_avx2(auVar88,10);
  auVar114 = vpor_avx2(auVar169,auVar161);
  auVar36._8_4_ = 0xbb67ae85;
  auVar36._0_8_ = 0xbb67ae85bb67ae85;
  auVar36._12_4_ = 0xbb67ae85;
  auVar36._16_4_ = 0xbb67ae85;
  auVar36._20_4_ = 0xbb67ae85;
  auVar36._24_4_ = 0xbb67ae85;
  auVar36._28_4_ = 0xbb67ae85;
  auVar21 = vpaddd_avx2(auVar21,auVar36);
  auVar9._8_4_ = 0x3c6ef372;
  auVar9._0_8_ = 0x3c6ef3723c6ef372;
  auVar9._12_4_ = 0x3c6ef372;
  auVar9._16_4_ = 0x3c6ef372;
  auVar9._20_4_ = 0x3c6ef372;
  auVar9._24_4_ = 0x3c6ef372;
  auVar9._28_4_ = 0x3c6ef372;
  auVar10 = vpaddd_avx2(auVar10,auVar9);
  auVar161 = vpor_avx2(auVar88,auVar21);
  auVar161 = vpand_avx2(auVar161,auVar10);
  auVar169 = vpand_avx2(auVar88,auVar21);
  auVar169 = vpor_avx2(auVar161,auVar169);
  auVar161 = vpaddd_avx2(auVar113 ^ auVar170 ^ auVar114,auVar160);
  auVar161 = vpaddd_avx2(auVar161,auVar169);
  auVar6._8_4_ = 0xa54ff53a;
  auVar6._0_8_ = 0xa54ff53aa54ff53a;
  auVar6._12_4_ = 0xa54ff53a;
  auVar6._16_4_ = 0xa54ff53a;
  auVar6._20_4_ = 0xa54ff53a;
  auVar6._24_4_ = 0xa54ff53a;
  auVar6._28_4_ = 0xa54ff53a;
  auVar20 = vpaddd_avx2(auVar20,auVar6);
  auVar160 = vpaddd_avx2(auVar20,auVar160);
  auVar169 = vpsrld_avx2(auVar160,6);
  auVar170 = vpslld_avx2(auVar160,0x1a);
  auVar113 = vpor_avx2(auVar170,auVar169);
  auVar169 = vpsrld_avx2(auVar160,0xb);
  auVar170 = vpslld_avx2(auVar160,0x15);
  auVar114 = vpor_avx2(auVar170,auVar169);
  auVar169 = vpsrld_avx2(auVar160,0x19);
  auVar170 = vpslld_avx2(auVar160,7);
  auVar142 = vpor_avx2(auVar170,auVar169);
  auVar170 = vpandn_avx2(auVar160,auVar51);
  auVar169 = vpand_avx2(auVar109,auVar160);
  auVar169 = vpor_avx2(auVar169,auVar170);
  auVar13 = vpaddd_avx2(auVar13,auVar169);
  auVar13 = vpaddd_avx2(auVar13,auVar53);
  auVar13 = vpaddd_avx2(auVar13,auVar114 ^ auVar113 ^ auVar142);
  auVar169 = vpsrld_avx2(auVar161,2);
  auVar170 = vpslld_avx2(auVar161,0x1e);
  auVar113 = vpor_avx2(auVar170,auVar169);
  auVar169 = vpsrld_avx2(auVar161,0xd);
  auVar170 = vpslld_avx2(auVar161,0x13);
  auVar114 = vpor_avx2(auVar170,auVar169);
  auVar169 = vpsrld_avx2(auVar161,0x16);
  auVar170 = vpslld_avx2(auVar161,10);
  auVar142 = vpor_avx2(auVar170,auVar169);
  auVar169 = vpor_avx2(auVar161,auVar88);
  auVar169 = vpand_avx2(auVar169,auVar21);
  auVar170 = vpand_avx2(auVar161,auVar88);
  auVar170 = vpor_avx2(auVar169,auVar170);
  auVar169 = vpaddd_avx2(auVar114 ^ auVar113 ^ auVar142,auVar13);
  auVar169 = vpaddd_avx2(auVar169,auVar170);
  auVar13 = vpaddd_avx2(auVar10,auVar13);
  auVar170 = vpsrld_avx2(auVar13,6);
  auVar113 = vpslld_avx2(auVar13,0x1a);
  auVar114 = vpor_avx2(auVar113,auVar170);
  auVar170 = vpsrld_avx2(auVar13,0xb);
  auVar113 = vpslld_avx2(auVar13,0x15);
  auVar142 = vpor_avx2(auVar113,auVar170);
  auVar170 = vpsrld_avx2(auVar13,0x19);
  auVar113 = vpslld_avx2(auVar13,7);
  auVar98 = vpor_avx2(auVar113,auVar170);
  auVar113 = vpandn_avx2(auVar13,auVar109);
  auVar170 = vpand_avx2(auVar160,auVar13);
  auVar170 = vpor_avx2(auVar170,auVar113);
  auVar26 = vpaddd_avx2(auVar26,auVar170);
  auVar26 = vpaddd_avx2(auVar26,auVar91);
  auVar26 = vpaddd_avx2(auVar26,auVar142 ^ auVar114 ^ auVar98);
  auVar170 = vpsrld_avx2(auVar169,2);
  auVar113 = vpslld_avx2(auVar169,0x1e);
  auVar114 = vpor_avx2(auVar113,auVar170);
  auVar170 = vpsrld_avx2(auVar169,0xd);
  auVar113 = vpslld_avx2(auVar169,0x13);
  auVar142 = vpor_avx2(auVar113,auVar170);
  auVar170 = vpsrld_avx2(auVar169,0x16);
  auVar113 = vpslld_avx2(auVar169,10);
  auVar98 = vpor_avx2(auVar113,auVar170);
  auVar170 = vpor_avx2(auVar161,auVar169);
  auVar170 = vpand_avx2(auVar88,auVar170);
  auVar113 = vpand_avx2(auVar161,auVar169);
  auVar113 = vpor_avx2(auVar170,auVar113);
  auVar170 = vpaddd_avx2(auVar142 ^ auVar114 ^ auVar98,auVar26);
  auVar170 = vpaddd_avx2(auVar170,auVar113);
  auVar26 = vpaddd_avx2(auVar26,auVar21);
  auVar113 = vpsrld_avx2(auVar26,6);
  auVar114 = vpslld_avx2(auVar26,0x1a);
  auVar142 = vpor_avx2(auVar114,auVar113);
  auVar113 = vpsrld_avx2(auVar26,0xb);
  auVar114 = vpslld_avx2(auVar26,0x15);
  auVar98 = vpor_avx2(auVar114,auVar113);
  auVar113 = vpsrld_avx2(auVar26,0x19);
  auVar114 = vpslld_avx2(auVar26,7);
  auVar99 = vpor_avx2(auVar114,auVar113);
  auVar114 = vpandn_avx2(auVar26,auVar160);
  auVar113 = vpand_avx2(auVar26,auVar13);
  auVar113 = vpor_avx2(auVar113,auVar114);
  auVar113 = vpaddd_avx2(auVar109,auVar113);
  auVar114._8_4_ = 0xe9b5dba5;
  auVar114._0_8_ = 0xe9b5dba5e9b5dba5;
  auVar114._12_4_ = 0xe9b5dba5;
  auVar114._16_4_ = 0xe9b5dba5;
  auVar114._20_4_ = 0xe9b5dba5;
  auVar114._24_4_ = 0xe9b5dba5;
  auVar114._28_4_ = 0xe9b5dba5;
  auVar113 = vpaddd_avx2(auVar113,auVar114);
  auVar113 = vpaddd_avx2(auVar113,auVar98 ^ auVar142 ^ auVar99);
  auVar114 = vpsrld_avx2(auVar170,2);
  auVar142 = vpslld_avx2(auVar170,0x1e);
  auVar98 = vpor_avx2(auVar142,auVar114);
  auVar114 = vpsrld_avx2(auVar170,0xd);
  auVar142 = vpslld_avx2(auVar170,0x13);
  auVar99 = vpor_avx2(auVar142,auVar114);
  auVar114 = vpsrld_avx2(auVar170,0x16);
  auVar142 = vpslld_avx2(auVar170,10);
  auVar100 = vpor_avx2(auVar142,auVar114);
  auVar114 = vpor_avx2(auVar170,auVar169);
  auVar114 = vpand_avx2(auVar161,auVar114);
  auVar142 = vpand_avx2(auVar170,auVar169);
  auVar142 = vpor_avx2(auVar114,auVar142);
  auVar114 = vpaddd_avx2(auVar99 ^ auVar98 ^ auVar100,auVar113);
  auVar114 = vpaddd_avx2(auVar114,auVar142);
  auVar113 = vpaddd_avx2(auVar88,auVar113);
  auVar142 = vpsrld_avx2(auVar113,6);
  auVar98 = vpslld_avx2(auVar113,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0xb);
  auVar98 = vpslld_avx2(auVar113,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0x19);
  auVar98 = vpslld_avx2(auVar113,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar113,auVar13);
  auVar142 = vpand_avx2(auVar26,auVar113);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar61._8_4_ = 0x3956c25b;
  auVar61._0_8_ = 0x3956c25b3956c25b;
  auVar61._12_4_ = 0x3956c25b;
  auVar61._16_4_ = 0x3956c25b;
  auVar61._20_4_ = 0x3956c25b;
  auVar61._24_4_ = 0x3956c25b;
  auVar61._28_4_ = 0x3956c25b;
  auVar160 = vpaddd_avx2(auVar160,auVar142);
  auVar160 = vpaddd_avx2(auVar160,auVar61);
  auVar160 = vpaddd_avx2(auVar160,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar114,2);
  auVar98 = vpslld_avx2(auVar114,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0xd);
  auVar98 = vpslld_avx2(auVar114,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0x16);
  auVar98 = vpslld_avx2(auVar114,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar114,auVar170);
  auVar142 = vpand_avx2(auVar142,auVar169);
  auVar98 = vpand_avx2(auVar114,auVar170);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar161 = vpaddd_avx2(auVar161,auVar160);
  auVar160 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar160);
  auVar160 = vpaddd_avx2(auVar160,auVar142);
  auVar142 = vpsrld_avx2(auVar161,6);
  auVar98 = vpslld_avx2(auVar161,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0xb);
  auVar98 = vpslld_avx2(auVar161,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0x19);
  auVar98 = vpslld_avx2(auVar161,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar161,auVar26);
  auVar142 = vpand_avx2(auVar113,auVar161);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar13 = vpaddd_avx2(auVar13,auVar142);
  auVar165._8_4_ = 0x59f111f1;
  auVar165._0_8_ = 0x59f111f159f111f1;
  auVar165._12_4_ = 0x59f111f1;
  auVar165._16_4_ = 0x59f111f1;
  auVar165._20_4_ = 0x59f111f1;
  auVar165._24_4_ = 0x59f111f1;
  auVar165._28_4_ = 0x59f111f1;
  auVar13 = vpaddd_avx2(auVar13,auVar165);
  auVar13 = vpaddd_avx2(auVar13,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar160,2);
  auVar98 = vpslld_avx2(auVar160,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0xd);
  auVar98 = vpslld_avx2(auVar160,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0x16);
  auVar98 = vpslld_avx2(auVar160,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar160,auVar114);
  auVar142 = vpand_avx2(auVar142,auVar170);
  auVar98 = vpand_avx2(auVar160,auVar114);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar169 = vpaddd_avx2(auVar13,auVar169);
  auVar13 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar13);
  auVar13 = vpaddd_avx2(auVar13,auVar142);
  auVar142 = vpsrld_avx2(auVar169,6);
  auVar98 = vpslld_avx2(auVar169,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0xb);
  auVar98 = vpslld_avx2(auVar169,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0x19);
  auVar98 = vpslld_avx2(auVar169,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar169,auVar113);
  auVar142 = vpand_avx2(auVar161,auVar169);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar26 = vpaddd_avx2(auVar26,auVar142);
  auVar62._8_4_ = 0x923f82a4;
  auVar62._0_8_ = 0x923f82a4923f82a4;
  auVar62._12_4_ = 0x923f82a4;
  auVar62._16_4_ = 0x923f82a4;
  auVar62._20_4_ = 0x923f82a4;
  auVar62._24_4_ = 0x923f82a4;
  auVar62._28_4_ = 0x923f82a4;
  auVar26 = vpaddd_avx2(auVar26,auVar62);
  auVar26 = vpaddd_avx2(auVar26,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar13,2);
  auVar98 = vpslld_avx2(auVar13,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0xd);
  auVar98 = vpslld_avx2(auVar13,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0x16);
  auVar98 = vpslld_avx2(auVar13,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar13,auVar160);
  auVar142 = vpand_avx2(auVar142,auVar114);
  auVar98 = vpand_avx2(auVar13,auVar160);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar170 = vpaddd_avx2(auVar26,auVar170);
  auVar26 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar26);
  auVar26 = vpaddd_avx2(auVar142,auVar26);
  auVar142 = vpsrld_avx2(auVar170,6);
  auVar98 = vpslld_avx2(auVar170,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0xb);
  auVar98 = vpslld_avx2(auVar170,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0x19);
  auVar98 = vpslld_avx2(auVar170,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar170,auVar161);
  auVar142 = vpand_avx2(auVar169,auVar170);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar113 = vpaddd_avx2(auVar113,auVar142);
  auVar63._8_4_ = 0xab1c5ed5;
  auVar63._0_8_ = 0xab1c5ed5ab1c5ed5;
  auVar63._12_4_ = 0xab1c5ed5;
  auVar63._16_4_ = 0xab1c5ed5;
  auVar63._20_4_ = 0xab1c5ed5;
  auVar63._24_4_ = 0xab1c5ed5;
  auVar63._28_4_ = 0xab1c5ed5;
  auVar113 = vpaddd_avx2(auVar113,auVar63);
  auVar113 = vpaddd_avx2(auVar113,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar26,2);
  auVar98 = vpslld_avx2(auVar26,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0xd);
  auVar98 = vpslld_avx2(auVar26,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0x16);
  auVar98 = vpslld_avx2(auVar26,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar26,auVar13);
  auVar142 = vpand_avx2(auVar142,auVar160);
  auVar98 = vpand_avx2(auVar26,auVar13);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar114 = vpaddd_avx2(auVar113,auVar114);
  auVar113 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar113);
  auVar113 = vpaddd_avx2(auVar142,auVar113);
  auVar142 = vpsrld_avx2(auVar114,6);
  auVar98 = vpslld_avx2(auVar114,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0xb);
  auVar98 = vpslld_avx2(auVar114,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0x19);
  auVar98 = vpslld_avx2(auVar114,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar114,auVar169);
  auVar142 = vpand_avx2(auVar170,auVar114);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar161 = vpaddd_avx2(auVar161,auVar142);
  auVar161 = vpaddd_avx2(auVar161,auVar94);
  auVar161 = vpaddd_avx2(auVar161,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar113,2);
  auVar98 = vpslld_avx2(auVar113,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0xd);
  auVar98 = vpslld_avx2(auVar113,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0x16);
  auVar98 = vpslld_avx2(auVar113,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar26,auVar113);
  auVar142 = vpand_avx2(auVar142,auVar13);
  auVar98 = vpand_avx2(auVar26,auVar113);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar160 = vpaddd_avx2(auVar161,auVar160);
  auVar161 = vpaddd_avx2(auVar115 ^ auVar100 ^ auVar99,auVar161);
  auVar161 = vpaddd_avx2(auVar142,auVar161);
  auVar142 = vpsrld_avx2(auVar160,6);
  auVar98 = vpslld_avx2(auVar160,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0xb);
  auVar98 = vpslld_avx2(auVar160,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0x19);
  auVar98 = vpslld_avx2(auVar160,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar160,auVar170);
  auVar142 = vpand_avx2(auVar114,auVar160);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar169 = vpaddd_avx2(auVar142,auVar169);
  auVar169 = vpaddd_avx2(auVar169,auVar95);
  auVar169 = vpaddd_avx2(auVar169,auVar115 ^ auVar100 ^ auVar99);
  auVar142 = vpsrld_avx2(auVar161,2);
  auVar98 = vpslld_avx2(auVar161,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0xd);
  auVar98 = vpslld_avx2(auVar161,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0x16);
  auVar98 = vpslld_avx2(auVar161,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar161,auVar113);
  auVar142 = vpand_avx2(auVar26,auVar142);
  auVar98 = vpand_avx2(auVar161,auVar113);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar13 = vpaddd_avx2(auVar169,auVar13);
  auVar169 = vpaddd_avx2(auVar115 ^ auVar100 ^ auVar99,auVar169);
  auVar169 = vpaddd_avx2(auVar142,auVar169);
  auVar142 = vpsrld_avx2(auVar13,6);
  auVar98 = vpslld_avx2(auVar13,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0xb);
  auVar98 = vpslld_avx2(auVar13,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0x19);
  auVar98 = vpslld_avx2(auVar13,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar13,auVar114);
  auVar142 = vpand_avx2(auVar160,auVar13);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar170 = vpaddd_avx2(auVar170,auVar142);
  auVar170 = vpaddd_avx2(auVar170,auVar56);
  auVar170 = vpaddd_avx2(auVar170,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar169,2);
  auVar98 = vpslld_avx2(auVar169,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0xd);
  auVar98 = vpslld_avx2(auVar169,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0x16);
  auVar98 = vpslld_avx2(auVar169,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar169,auVar161);
  auVar142 = vpand_avx2(auVar142,auVar113);
  auVar98 = vpand_avx2(auVar169,auVar161);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar26 = vpaddd_avx2(auVar26,auVar170);
  auVar170 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar170);
  auVar170 = vpaddd_avx2(auVar142,auVar170);
  auVar142 = vpsrld_avx2(auVar26,6);
  auVar98 = vpslld_avx2(auVar26,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0xb);
  auVar98 = vpslld_avx2(auVar26,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0x19);
  auVar98 = vpslld_avx2(auVar26,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar26,auVar160);
  auVar142 = vpand_avx2(auVar13,auVar26);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar114 = vpaddd_avx2(auVar114,auVar142);
  auVar114 = vpaddd_avx2(auVar114,auVar111);
  auVar114 = vpaddd_avx2(auVar114,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar170,2);
  auVar98 = vpslld_avx2(auVar170,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0xd);
  auVar98 = vpslld_avx2(auVar170,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0x16);
  auVar98 = vpslld_avx2(auVar170,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar170,auVar169);
  auVar142 = vpand_avx2(auVar142,auVar161);
  auVar98 = vpand_avx2(auVar170,auVar169);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar113 = vpaddd_avx2(auVar114,auVar113);
  auVar114 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar114);
  auVar114 = vpaddd_avx2(auVar142,auVar114);
  auVar142 = vpsrld_avx2(auVar113,6);
  auVar98 = vpslld_avx2(auVar113,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0xb);
  auVar98 = vpslld_avx2(auVar113,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0x19);
  auVar98 = vpslld_avx2(auVar113,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar113,auVar13);
  auVar142 = vpand_avx2(auVar26,auVar113);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar160 = vpaddd_avx2(auVar160,auVar142);
  auVar160 = vpaddd_avx2(auVar160,auVar58);
  auVar160 = vpaddd_avx2(auVar160,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar114,2);
  auVar98 = vpslld_avx2(auVar114,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0xd);
  auVar98 = vpslld_avx2(auVar114,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0x16);
  auVar98 = vpslld_avx2(auVar114,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar170,auVar114);
  auVar142 = vpand_avx2(auVar169,auVar142);
  auVar98 = vpand_avx2(auVar170,auVar114);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar161 = vpaddd_avx2(auVar160,auVar161);
  auVar160 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar160);
  auVar160 = vpaddd_avx2(auVar142,auVar160);
  auVar142 = vpsrld_avx2(auVar161,6);
  auVar98 = vpslld_avx2(auVar161,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0xb);
  auVar98 = vpslld_avx2(auVar161,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0x19);
  auVar98 = vpslld_avx2(auVar161,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar161,auVar26);
  auVar142 = vpand_avx2(auVar113,auVar161);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar13 = vpaddd_avx2(auVar13,auVar142);
  auVar13 = vpaddd_avx2(auVar13,auVar112);
  auVar13 = vpaddd_avx2(auVar13,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar160,2);
  auVar98 = vpslld_avx2(auVar160,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0xd);
  auVar98 = vpslld_avx2(auVar160,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0x16);
  auVar98 = vpslld_avx2(auVar160,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar160,auVar114);
  auVar142 = vpand_avx2(auVar170,auVar142);
  auVar98 = vpand_avx2(auVar160,auVar114);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar169 = vpaddd_avx2(auVar169,auVar13);
  auVar13 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar13);
  auVar13 = vpaddd_avx2(auVar142,auVar13);
  auVar142 = vpsrld_avx2(auVar169,6);
  auVar98 = vpslld_avx2(auVar169,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0xb);
  auVar98 = vpslld_avx2(auVar169,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0x19);
  auVar98 = vpslld_avx2(auVar169,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar169,auVar113);
  auVar142 = vpand_avx2(auVar161,auVar169);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar26 = vpaddd_avx2(auVar26,auVar142);
  auVar26 = vpaddd_avx2(auVar26,auVar148);
  auVar26 = vpaddd_avx2(auVar26,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar13,2);
  auVar98 = vpslld_avx2(auVar13,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0xd);
  auVar98 = vpslld_avx2(auVar13,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0x16);
  auVar98 = vpslld_avx2(auVar13,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar13,auVar160);
  auVar142 = vpand_avx2(auVar142,auVar114);
  auVar98 = vpand_avx2(auVar13,auVar160);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar170 = vpaddd_avx2(auVar170,auVar26);
  auVar26 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar26);
  auVar26 = vpaddd_avx2(auVar26,auVar142);
  auVar142 = vpsrld_avx2(auVar170,6);
  auVar98 = vpslld_avx2(auVar170,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0xb);
  auVar98 = vpslld_avx2(auVar170,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0x19);
  auVar98 = vpslld_avx2(auVar170,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar170,auVar161);
  auVar142 = vpand_avx2(auVar170,auVar169);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar113 = vpaddd_avx2(auVar113,auVar142);
  auVar64._8_4_ = 0xc19bf374;
  auVar64._0_8_ = 0xc19bf374c19bf374;
  auVar64._12_4_ = 0xc19bf374;
  auVar64._16_4_ = 0xc19bf374;
  auVar64._20_4_ = 0xc19bf374;
  auVar64._24_4_ = 0xc19bf374;
  auVar64._28_4_ = 0xc19bf374;
  auVar113 = vpaddd_avx2(auVar113,auVar64);
  auVar113 = vpaddd_avx2(auVar113,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar26,2);
  auVar98 = vpslld_avx2(auVar26,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0xd);
  auVar98 = vpslld_avx2(auVar26,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0x16);
  auVar98 = vpslld_avx2(auVar26,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar13,auVar26);
  auVar142 = vpand_avx2(auVar142,auVar160);
  auVar98 = vpand_avx2(auVar13,auVar26);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar114 = vpaddd_avx2(auVar113,auVar114);
  auVar113 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar113);
  auVar113 = vpaddd_avx2(auVar113,auVar142);
  auVar142 = vpsrld_avx2(auVar114,6);
  auVar98 = vpslld_avx2(auVar114,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0xb);
  auVar98 = vpslld_avx2(auVar114,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0x19);
  auVar98 = vpslld_avx2(auVar114,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar114,auVar169);
  auVar142 = vpand_avx2(auVar170,auVar114);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar161 = vpaddd_avx2(auVar161,auVar142);
  auVar163._8_4_ = 0x649b69c1;
  auVar163._0_8_ = 0x649b69c1649b69c1;
  auVar163._12_4_ = 0x649b69c1;
  auVar163._16_4_ = 0x649b69c1;
  auVar163._20_4_ = 0x649b69c1;
  auVar163._24_4_ = 0x649b69c1;
  auVar163._28_4_ = 0x649b69c1;
  auVar161 = vpaddd_avx2(auVar161,auVar163);
  auVar161 = vpaddd_avx2(auVar161,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar113,2);
  auVar98 = vpslld_avx2(auVar113,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0xd);
  auVar98 = vpslld_avx2(auVar113,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0x16);
  auVar98 = vpslld_avx2(auVar113,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar113,auVar26);
  auVar142 = vpand_avx2(auVar13,auVar142);
  auVar98 = vpand_avx2(auVar113,auVar26);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar160 = vpaddd_avx2(auVar161,auVar160);
  auVar161 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar161);
  auVar161 = vpaddd_avx2(auVar161,auVar142);
  auVar142 = vpsrld_avx2(auVar160,6);
  auVar98 = vpslld_avx2(auVar160,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0xb);
  auVar98 = vpslld_avx2(auVar160,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0x19);
  auVar98 = vpslld_avx2(auVar160,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar160,auVar170);
  auVar142 = vpand_avx2(auVar114,auVar160);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar169 = vpaddd_avx2(auVar169,auVar142);
  auVar166._8_4_ = 0xf0fe4786;
  auVar166._0_8_ = 0xf0fe4786f0fe4786;
  auVar166._12_4_ = 0xf0fe4786;
  auVar166._16_4_ = 0xf0fe4786;
  auVar166._20_4_ = 0xf0fe4786;
  auVar166._24_4_ = 0xf0fe4786;
  auVar166._28_4_ = 0xf0fe4786;
  auVar169 = vpaddd_avx2(auVar169,auVar166);
  auVar169 = vpaddd_avx2(auVar169,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar161,2);
  auVar98 = vpslld_avx2(auVar161,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0xd);
  auVar98 = vpslld_avx2(auVar161,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0x16);
  auVar98 = vpslld_avx2(auVar161,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar161,auVar113);
  auVar142 = vpand_avx2(auVar142,auVar26);
  auVar98 = vpand_avx2(auVar161,auVar113);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar13 = vpaddd_avx2(auVar13,auVar169);
  auVar169 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar169);
  auVar169 = vpaddd_avx2(auVar169,auVar142);
  auVar142 = vpsrld_avx2(auVar13,6);
  auVar98 = vpslld_avx2(auVar13,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0xb);
  auVar98 = vpslld_avx2(auVar13,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0x19);
  auVar98 = vpslld_avx2(auVar13,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar13,auVar114);
  auVar142 = vpand_avx2(auVar160,auVar13);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar65._8_4_ = 0xfe1edc6;
  auVar65._0_8_ = 0xfe1edc60fe1edc6;
  auVar65._12_4_ = 0xfe1edc6;
  auVar65._16_4_ = 0xfe1edc6;
  auVar65._20_4_ = 0xfe1edc6;
  auVar65._24_4_ = 0xfe1edc6;
  auVar65._28_4_ = 0xfe1edc6;
  auVar170 = vpaddd_avx2(auVar170,auVar142);
  auVar170 = vpaddd_avx2(auVar170,auVar65);
  auVar170 = vpaddd_avx2(auVar170,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar169,2);
  auVar98 = vpslld_avx2(auVar169,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0xd);
  auVar98 = vpslld_avx2(auVar169,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0x16);
  auVar98 = vpslld_avx2(auVar169,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar169,auVar161);
  auVar142 = vpand_avx2(auVar142,auVar113);
  auVar98 = vpand_avx2(auVar169,auVar161);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar26 = vpaddd_avx2(auVar170,auVar26);
  auVar170 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar170);
  auVar170 = vpaddd_avx2(auVar170,auVar142);
  auVar142 = vpsrld_avx2(auVar26,6);
  auVar98 = vpslld_avx2(auVar26,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0xb);
  auVar98 = vpslld_avx2(auVar26,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0x19);
  auVar98 = vpslld_avx2(auVar26,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar26,auVar160);
  auVar142 = vpand_avx2(auVar26,auVar13);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar114 = vpaddd_avx2(auVar114,auVar142);
  auVar66._8_4_ = 0x240cf254;
  auVar66._0_8_ = 0x240cf254240cf254;
  auVar66._12_4_ = 0x240cf254;
  auVar66._16_4_ = 0x240cf254;
  auVar66._20_4_ = 0x240cf254;
  auVar66._24_4_ = 0x240cf254;
  auVar66._28_4_ = 0x240cf254;
  auVar114 = vpaddd_avx2(auVar114,auVar66);
  auVar114 = vpaddd_avx2(auVar114,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar170,2);
  auVar98 = vpslld_avx2(auVar170,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0xd);
  auVar98 = vpslld_avx2(auVar170,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0x16);
  auVar98 = vpslld_avx2(auVar170,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar169,auVar170);
  auVar142 = vpand_avx2(auVar142,auVar161);
  auVar98 = vpand_avx2(auVar169,auVar170);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar113 = vpaddd_avx2(auVar114,auVar113);
  auVar114 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar114);
  auVar114 = vpaddd_avx2(auVar114,auVar142);
  auVar142 = vpsrld_avx2(auVar113,6);
  auVar98 = vpslld_avx2(auVar113,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0xb);
  auVar98 = vpslld_avx2(auVar113,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0x19);
  auVar98 = vpslld_avx2(auVar113,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar113,auVar13);
  auVar142 = vpand_avx2(auVar26,auVar113);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar160 = vpaddd_avx2(auVar160,auVar142);
  auVar167._8_4_ = 0x4fe9346f;
  auVar167._0_8_ = 0x4fe9346f4fe9346f;
  auVar167._12_4_ = 0x4fe9346f;
  auVar167._16_4_ = 0x4fe9346f;
  auVar167._20_4_ = 0x4fe9346f;
  auVar167._24_4_ = 0x4fe9346f;
  auVar167._28_4_ = 0x4fe9346f;
  auVar160 = vpaddd_avx2(auVar160,auVar167);
  auVar160 = vpaddd_avx2(auVar160,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar114,2);
  auVar98 = vpslld_avx2(auVar114,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0xd);
  auVar98 = vpslld_avx2(auVar114,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0x16);
  auVar98 = vpslld_avx2(auVar114,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar114,auVar170);
  auVar142 = vpand_avx2(auVar169,auVar142);
  auVar98 = vpand_avx2(auVar114,auVar170);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar161 = vpaddd_avx2(auVar160,auVar161);
  auVar160 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar160);
  auVar160 = vpaddd_avx2(auVar160,auVar142);
  auVar142 = vpsrld_avx2(auVar161,6);
  auVar98 = vpslld_avx2(auVar161,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0xb);
  auVar98 = vpslld_avx2(auVar161,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0x19);
  auVar98 = vpslld_avx2(auVar161,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar161,auVar26);
  auVar142 = vpand_avx2(auVar113,auVar161);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar13 = vpaddd_avx2(auVar13,auVar142);
  auVar37._8_4_ = 0x6cc984be;
  auVar37._0_8_ = 0x6cc984be6cc984be;
  auVar37._12_4_ = 0x6cc984be;
  auVar37._16_4_ = 0x6cc984be;
  auVar37._20_4_ = 0x6cc984be;
  auVar37._24_4_ = 0x6cc984be;
  auVar37._28_4_ = 0x6cc984be;
  auVar13 = vpaddd_avx2(auVar13,auVar37);
  auVar13 = vpaddd_avx2(auVar13,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar160,2);
  auVar98 = vpslld_avx2(auVar160,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0xd);
  auVar98 = vpslld_avx2(auVar160,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0x16);
  auVar98 = vpslld_avx2(auVar160,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar160,auVar114);
  auVar142 = vpand_avx2(auVar142,auVar170);
  auVar98 = vpand_avx2(auVar160,auVar114);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar169 = vpaddd_avx2(auVar169,auVar13);
  auVar13 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar13);
  auVar13 = vpaddd_avx2(auVar13,auVar142);
  auVar142 = vpsrld_avx2(auVar169,6);
  auVar98 = vpslld_avx2(auVar169,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0xb);
  auVar98 = vpslld_avx2(auVar169,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0x19);
  auVar98 = vpslld_avx2(auVar169,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar169,auVar113);
  auVar142 = vpand_avx2(auVar161,auVar169);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar67._8_4_ = 0x61b9411e;
  auVar67._0_8_ = 0x61b9411e61b9411e;
  auVar67._12_4_ = 0x61b9411e;
  auVar67._16_4_ = 0x61b9411e;
  auVar67._20_4_ = 0x61b9411e;
  auVar67._24_4_ = 0x61b9411e;
  auVar67._28_4_ = 0x61b9411e;
  auVar26 = vpaddd_avx2(auVar26,auVar142);
  auVar26 = vpaddd_avx2(auVar26,auVar67);
  auVar26 = vpaddd_avx2(auVar26,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar13,2);
  auVar98 = vpslld_avx2(auVar13,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0xd);
  auVar98 = vpslld_avx2(auVar13,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0x16);
  auVar98 = vpslld_avx2(auVar13,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar13,auVar160);
  auVar142 = vpand_avx2(auVar142,auVar114);
  auVar98 = vpand_avx2(auVar13,auVar160);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar170 = vpaddd_avx2(auVar26,auVar170);
  auVar26 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar26);
  auVar26 = vpaddd_avx2(auVar26,auVar142);
  auVar142 = vpsrld_avx2(auVar170,6);
  auVar98 = vpslld_avx2(auVar170,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0xb);
  auVar98 = vpslld_avx2(auVar170,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0x19);
  auVar98 = vpslld_avx2(auVar170,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar170,auVar161);
  auVar142 = vpand_avx2(auVar170,auVar169);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar113 = vpaddd_avx2(auVar113,auVar142);
  auVar68._8_4_ = 0x16f988fa;
  auVar68._0_8_ = 0x16f988fa16f988fa;
  auVar68._12_4_ = 0x16f988fa;
  auVar68._16_4_ = 0x16f988fa;
  auVar68._20_4_ = 0x16f988fa;
  auVar68._24_4_ = 0x16f988fa;
  auVar68._28_4_ = 0x16f988fa;
  auVar113 = vpaddd_avx2(auVar113,auVar68);
  auVar113 = vpaddd_avx2(auVar113,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar26,2);
  auVar98 = vpslld_avx2(auVar26,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0xd);
  auVar98 = vpslld_avx2(auVar26,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0x16);
  auVar98 = vpslld_avx2(auVar26,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar13,auVar26);
  auVar142 = vpand_avx2(auVar142,auVar160);
  auVar98 = vpand_avx2(auVar13,auVar26);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar114 = vpaddd_avx2(auVar113,auVar114);
  auVar113 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar113);
  auVar113 = vpaddd_avx2(auVar113,auVar142);
  auVar142 = vpsrld_avx2(auVar114,6);
  auVar98 = vpslld_avx2(auVar114,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0xb);
  auVar98 = vpslld_avx2(auVar114,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0x19);
  auVar98 = vpslld_avx2(auVar114,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar114,auVar169);
  auVar142 = vpand_avx2(auVar170,auVar114);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar161 = vpaddd_avx2(auVar161,auVar142);
  auVar38._8_4_ = 0xf2c65152;
  auVar38._0_8_ = 0xf2c65152f2c65152;
  auVar38._12_4_ = 0xf2c65152;
  auVar38._16_4_ = 0xf2c65152;
  auVar38._20_4_ = 0xf2c65152;
  auVar38._24_4_ = 0xf2c65152;
  auVar38._28_4_ = 0xf2c65152;
  auVar161 = vpaddd_avx2(auVar161,auVar38);
  auVar161 = vpaddd_avx2(auVar161,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar113,2);
  auVar98 = vpslld_avx2(auVar113,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0xd);
  auVar98 = vpslld_avx2(auVar113,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0x16);
  auVar98 = vpslld_avx2(auVar113,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar113,auVar26);
  auVar142 = vpand_avx2(auVar13,auVar142);
  auVar98 = vpand_avx2(auVar113,auVar26);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar160 = vpaddd_avx2(auVar161,auVar160);
  auVar161 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar161);
  auVar161 = vpaddd_avx2(auVar161,auVar142);
  auVar142 = vpsrld_avx2(auVar160,6);
  auVar98 = vpslld_avx2(auVar160,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0xb);
  auVar98 = vpslld_avx2(auVar160,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0x19);
  auVar98 = vpslld_avx2(auVar160,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar160,auVar170);
  auVar142 = vpand_avx2(auVar114,auVar160);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar169 = vpaddd_avx2(auVar169,auVar142);
  auVar39._8_4_ = 0xa88e5a6d;
  auVar39._0_8_ = 0xa88e5a6da88e5a6d;
  auVar39._12_4_ = 0xa88e5a6d;
  auVar39._16_4_ = 0xa88e5a6d;
  auVar39._20_4_ = 0xa88e5a6d;
  auVar39._24_4_ = 0xa88e5a6d;
  auVar39._28_4_ = 0xa88e5a6d;
  auVar169 = vpaddd_avx2(auVar169,auVar39);
  auVar169 = vpaddd_avx2(auVar169,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar161,2);
  auVar98 = vpslld_avx2(auVar161,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0xd);
  auVar98 = vpslld_avx2(auVar161,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0x16);
  auVar98 = vpslld_avx2(auVar161,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar161,auVar113);
  auVar142 = vpand_avx2(auVar142,auVar26);
  auVar98 = vpand_avx2(auVar161,auVar113);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar13 = vpaddd_avx2(auVar13,auVar169);
  auVar169 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar169);
  auVar169 = vpaddd_avx2(auVar169,auVar142);
  auVar142 = vpsrld_avx2(auVar13,6);
  auVar98 = vpslld_avx2(auVar13,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0xb);
  auVar98 = vpslld_avx2(auVar13,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0x19);
  auVar98 = vpslld_avx2(auVar13,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar13,auVar114);
  auVar142 = vpand_avx2(auVar160,auVar13);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar69._8_4_ = 0xb019fc65;
  auVar69._0_8_ = 0xb019fc65b019fc65;
  auVar69._12_4_ = 0xb019fc65;
  auVar69._16_4_ = 0xb019fc65;
  auVar69._20_4_ = 0xb019fc65;
  auVar69._24_4_ = 0xb019fc65;
  auVar69._28_4_ = 0xb019fc65;
  auVar170 = vpaddd_avx2(auVar170,auVar142);
  auVar170 = vpaddd_avx2(auVar170,auVar69);
  auVar170 = vpaddd_avx2(auVar170,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar169,2);
  auVar98 = vpslld_avx2(auVar169,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0xd);
  auVar98 = vpslld_avx2(auVar169,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0x16);
  auVar98 = vpslld_avx2(auVar169,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar169,auVar161);
  auVar142 = vpand_avx2(auVar142,auVar113);
  auVar98 = vpand_avx2(auVar169,auVar161);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar26 = vpaddd_avx2(auVar170,auVar26);
  auVar170 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar170);
  auVar170 = vpaddd_avx2(auVar170,auVar142);
  auVar142 = vpsrld_avx2(auVar26,6);
  auVar98 = vpslld_avx2(auVar26,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0xb);
  auVar98 = vpslld_avx2(auVar26,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0x19);
  auVar98 = vpslld_avx2(auVar26,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar26,auVar160);
  auVar142 = vpand_avx2(auVar26,auVar13);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar114 = vpaddd_avx2(auVar114,auVar142);
  auVar70._8_4_ = 0xb9d99ec7;
  auVar70._0_8_ = 0xb9d99ec7b9d99ec7;
  auVar70._12_4_ = 0xb9d99ec7;
  auVar70._16_4_ = 0xb9d99ec7;
  auVar70._20_4_ = 0xb9d99ec7;
  auVar70._24_4_ = 0xb9d99ec7;
  auVar70._28_4_ = 0xb9d99ec7;
  auVar114 = vpaddd_avx2(auVar114,auVar70);
  auVar114 = vpaddd_avx2(auVar114,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar170,2);
  auVar98 = vpslld_avx2(auVar170,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0xd);
  auVar98 = vpslld_avx2(auVar170,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0x16);
  auVar98 = vpslld_avx2(auVar170,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar169,auVar170);
  auVar142 = vpand_avx2(auVar142,auVar161);
  auVar98 = vpand_avx2(auVar169,auVar170);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar113 = vpaddd_avx2(auVar114,auVar113);
  auVar114 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar114);
  auVar114 = vpaddd_avx2(auVar114,auVar142);
  auVar142 = vpsrld_avx2(auVar113,6);
  auVar98 = vpslld_avx2(auVar113,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0xb);
  auVar98 = vpslld_avx2(auVar113,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0x19);
  auVar98 = vpslld_avx2(auVar113,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar113,auVar13);
  auVar142 = vpand_avx2(auVar26,auVar113);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar160 = vpaddd_avx2(auVar160,auVar142);
  auVar40._8_4_ = 0x9a1231c3;
  auVar40._0_8_ = 0x9a1231c39a1231c3;
  auVar40._12_4_ = 0x9a1231c3;
  auVar40._16_4_ = 0x9a1231c3;
  auVar40._20_4_ = 0x9a1231c3;
  auVar40._24_4_ = 0x9a1231c3;
  auVar40._28_4_ = 0x9a1231c3;
  auVar160 = vpaddd_avx2(auVar160,auVar40);
  auVar160 = vpaddd_avx2(auVar160,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar114,2);
  auVar98 = vpslld_avx2(auVar114,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0xd);
  auVar98 = vpslld_avx2(auVar114,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0x16);
  auVar98 = vpslld_avx2(auVar114,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar114,auVar170);
  auVar142 = vpand_avx2(auVar169,auVar142);
  auVar98 = vpand_avx2(auVar114,auVar170);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar161 = vpaddd_avx2(auVar160,auVar161);
  auVar160 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar160);
  auVar160 = vpaddd_avx2(auVar160,auVar142);
  auVar142 = vpsrld_avx2(auVar161,6);
  auVar98 = vpslld_avx2(auVar161,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0xb);
  auVar98 = vpslld_avx2(auVar161,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0x19);
  auVar98 = vpslld_avx2(auVar161,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar161,auVar26);
  auVar142 = vpand_avx2(auVar113,auVar161);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar13 = vpaddd_avx2(auVar13,auVar142);
  auVar41._8_4_ = 0xe70eeaa0;
  auVar41._0_8_ = 0xe70eeaa0e70eeaa0;
  auVar41._12_4_ = 0xe70eeaa0;
  auVar41._16_4_ = 0xe70eeaa0;
  auVar41._20_4_ = 0xe70eeaa0;
  auVar41._24_4_ = 0xe70eeaa0;
  auVar41._28_4_ = 0xe70eeaa0;
  auVar13 = vpaddd_avx2(auVar13,auVar41);
  auVar13 = vpaddd_avx2(auVar13,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar160,2);
  auVar98 = vpslld_avx2(auVar160,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0xd);
  auVar98 = vpslld_avx2(auVar160,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0x16);
  auVar98 = vpslld_avx2(auVar160,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar160,auVar114);
  auVar142 = vpand_avx2(auVar142,auVar170);
  auVar98 = vpand_avx2(auVar160,auVar114);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar169 = vpaddd_avx2(auVar169,auVar13);
  auVar13 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar13);
  auVar13 = vpaddd_avx2(auVar13,auVar142);
  auVar142 = vpsrld_avx2(auVar169,6);
  auVar98 = vpslld_avx2(auVar169,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0xb);
  auVar98 = vpslld_avx2(auVar169,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0x19);
  auVar98 = vpslld_avx2(auVar169,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar169,auVar113);
  auVar142 = vpand_avx2(auVar161,auVar169);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar71._8_4_ = 0xfdb1232b;
  auVar71._0_8_ = 0xfdb1232bfdb1232b;
  auVar71._12_4_ = 0xfdb1232b;
  auVar71._16_4_ = 0xfdb1232b;
  auVar71._20_4_ = 0xfdb1232b;
  auVar71._24_4_ = 0xfdb1232b;
  auVar71._28_4_ = 0xfdb1232b;
  auVar26 = vpaddd_avx2(auVar26,auVar142);
  auVar26 = vpaddd_avx2(auVar26,auVar71);
  auVar26 = vpaddd_avx2(auVar26,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar13,2);
  auVar98 = vpslld_avx2(auVar13,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0xd);
  auVar98 = vpslld_avx2(auVar13,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0x16);
  auVar98 = vpslld_avx2(auVar13,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar13,auVar160);
  auVar142 = vpand_avx2(auVar142,auVar114);
  auVar98 = vpand_avx2(auVar13,auVar160);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar170 = vpaddd_avx2(auVar26,auVar170);
  auVar26 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar26);
  auVar26 = vpaddd_avx2(auVar26,auVar142);
  auVar142 = vpsrld_avx2(auVar170,6);
  auVar98 = vpslld_avx2(auVar170,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0xb);
  auVar98 = vpslld_avx2(auVar170,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0x19);
  auVar98 = vpslld_avx2(auVar170,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar170,auVar161);
  auVar142 = vpand_avx2(auVar170,auVar169);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar113 = vpaddd_avx2(auVar113,auVar142);
  auVar72._8_4_ = 0xc7353eb0;
  auVar72._0_8_ = 0xc7353eb0c7353eb0;
  auVar72._12_4_ = 0xc7353eb0;
  auVar72._16_4_ = 0xc7353eb0;
  auVar72._20_4_ = 0xc7353eb0;
  auVar72._24_4_ = 0xc7353eb0;
  auVar72._28_4_ = 0xc7353eb0;
  auVar113 = vpaddd_avx2(auVar113,auVar72);
  auVar113 = vpaddd_avx2(auVar113,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar26,2);
  auVar98 = vpslld_avx2(auVar26,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0xd);
  auVar98 = vpslld_avx2(auVar26,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0x16);
  auVar98 = vpslld_avx2(auVar26,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar13,auVar26);
  auVar142 = vpand_avx2(auVar142,auVar160);
  auVar98 = vpand_avx2(auVar13,auVar26);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar114 = vpaddd_avx2(auVar113,auVar114);
  auVar113 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar113);
  auVar113 = vpaddd_avx2(auVar113,auVar142);
  auVar142 = vpsrld_avx2(auVar114,6);
  auVar98 = vpslld_avx2(auVar114,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0xb);
  auVar98 = vpslld_avx2(auVar114,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0x19);
  auVar98 = vpslld_avx2(auVar114,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar114,auVar169);
  auVar142 = vpand_avx2(auVar170,auVar114);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar161 = vpaddd_avx2(auVar161,auVar142);
  auVar42._8_4_ = 0x3069bad5;
  auVar42._0_8_ = 0x3069bad53069bad5;
  auVar42._12_4_ = 0x3069bad5;
  auVar42._16_4_ = 0x3069bad5;
  auVar42._20_4_ = 0x3069bad5;
  auVar42._24_4_ = 0x3069bad5;
  auVar42._28_4_ = 0x3069bad5;
  auVar161 = vpaddd_avx2(auVar161,auVar42);
  auVar161 = vpaddd_avx2(auVar161,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar113,2);
  auVar98 = vpslld_avx2(auVar113,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0xd);
  auVar98 = vpslld_avx2(auVar113,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0x16);
  auVar98 = vpslld_avx2(auVar113,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar113,auVar26);
  auVar142 = vpand_avx2(auVar13,auVar142);
  auVar98 = vpand_avx2(auVar113,auVar26);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar160 = vpaddd_avx2(auVar161,auVar160);
  auVar161 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar161);
  auVar161 = vpaddd_avx2(auVar161,auVar142);
  auVar142 = vpsrld_avx2(auVar160,6);
  auVar98 = vpslld_avx2(auVar160,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0xb);
  auVar98 = vpslld_avx2(auVar160,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0x19);
  auVar98 = vpslld_avx2(auVar160,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar160,auVar170);
  auVar142 = vpand_avx2(auVar114,auVar160);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar169 = vpaddd_avx2(auVar169,auVar142);
  auVar43._8_4_ = 0xcb976d5f;
  auVar43._0_8_ = 0xcb976d5fcb976d5f;
  auVar43._12_4_ = 0xcb976d5f;
  auVar43._16_4_ = 0xcb976d5f;
  auVar43._20_4_ = 0xcb976d5f;
  auVar43._24_4_ = 0xcb976d5f;
  auVar43._28_4_ = 0xcb976d5f;
  auVar169 = vpaddd_avx2(auVar169,auVar43);
  auVar169 = vpaddd_avx2(auVar169,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar161,2);
  auVar98 = vpslld_avx2(auVar161,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0xd);
  auVar98 = vpslld_avx2(auVar161,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0x16);
  auVar98 = vpslld_avx2(auVar161,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar161,auVar113);
  auVar142 = vpand_avx2(auVar142,auVar26);
  auVar98 = vpand_avx2(auVar161,auVar113);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar13 = vpaddd_avx2(auVar13,auVar169);
  auVar169 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar169);
  auVar169 = vpaddd_avx2(auVar169,auVar142);
  auVar142 = vpsrld_avx2(auVar13,6);
  auVar98 = vpslld_avx2(auVar13,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0xb);
  auVar98 = vpslld_avx2(auVar13,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0x19);
  auVar98 = vpslld_avx2(auVar13,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar13,auVar114);
  auVar142 = vpand_avx2(auVar160,auVar13);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar73._8_4_ = 0x5a0f118f;
  auVar73._0_8_ = 0x5a0f118f5a0f118f;
  auVar73._12_4_ = 0x5a0f118f;
  auVar73._16_4_ = 0x5a0f118f;
  auVar73._20_4_ = 0x5a0f118f;
  auVar73._24_4_ = 0x5a0f118f;
  auVar73._28_4_ = 0x5a0f118f;
  auVar170 = vpaddd_avx2(auVar170,auVar142);
  auVar170 = vpaddd_avx2(auVar170,auVar73);
  auVar170 = vpaddd_avx2(auVar170,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar169,2);
  auVar98 = vpslld_avx2(auVar169,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0xd);
  auVar98 = vpslld_avx2(auVar169,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0x16);
  auVar98 = vpslld_avx2(auVar169,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar169,auVar161);
  auVar142 = vpand_avx2(auVar142,auVar113);
  auVar98 = vpand_avx2(auVar169,auVar161);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar26 = vpaddd_avx2(auVar170,auVar26);
  auVar170 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar170);
  auVar170 = vpaddd_avx2(auVar170,auVar142);
  auVar142 = vpsrld_avx2(auVar26,6);
  auVar98 = vpslld_avx2(auVar26,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0xb);
  auVar98 = vpslld_avx2(auVar26,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0x19);
  auVar98 = vpslld_avx2(auVar26,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar26,auVar160);
  auVar142 = vpand_avx2(auVar26,auVar13);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar114 = vpaddd_avx2(auVar114,auVar142);
  auVar74._8_4_ = 0xdc1eeefd;
  auVar74._0_8_ = 0xdc1eeefddc1eeefd;
  auVar74._12_4_ = 0xdc1eeefd;
  auVar74._16_4_ = 0xdc1eeefd;
  auVar74._20_4_ = 0xdc1eeefd;
  auVar74._24_4_ = 0xdc1eeefd;
  auVar74._28_4_ = 0xdc1eeefd;
  auVar114 = vpaddd_avx2(auVar114,auVar74);
  auVar114 = vpaddd_avx2(auVar114,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar170,2);
  auVar98 = vpslld_avx2(auVar170,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0xd);
  auVar98 = vpslld_avx2(auVar170,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0x16);
  auVar98 = vpslld_avx2(auVar170,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar169,auVar170);
  auVar142 = vpand_avx2(auVar142,auVar161);
  auVar98 = vpand_avx2(auVar169,auVar170);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar113 = vpaddd_avx2(auVar114,auVar113);
  auVar114 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar114);
  auVar114 = vpaddd_avx2(auVar114,auVar142);
  auVar142 = vpsrld_avx2(auVar113,6);
  auVar98 = vpslld_avx2(auVar113,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0xb);
  auVar98 = vpslld_avx2(auVar113,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0x19);
  auVar98 = vpslld_avx2(auVar113,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar113,auVar13);
  auVar142 = vpand_avx2(auVar26,auVar113);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar160 = vpaddd_avx2(auVar160,auVar142);
  auVar44._8_4_ = 0xa35b689;
  auVar44._0_8_ = 0xa35b6890a35b689;
  auVar44._12_4_ = 0xa35b689;
  auVar44._16_4_ = 0xa35b689;
  auVar44._20_4_ = 0xa35b689;
  auVar44._24_4_ = 0xa35b689;
  auVar44._28_4_ = 0xa35b689;
  auVar160 = vpaddd_avx2(auVar160,auVar44);
  auVar160 = vpaddd_avx2(auVar160,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar114,2);
  auVar98 = vpslld_avx2(auVar114,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0xd);
  auVar98 = vpslld_avx2(auVar114,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0x16);
  auVar98 = vpslld_avx2(auVar114,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar114,auVar170);
  auVar142 = vpand_avx2(auVar169,auVar142);
  auVar98 = vpand_avx2(auVar114,auVar170);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar161 = vpaddd_avx2(auVar160,auVar161);
  auVar160 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar160);
  auVar160 = vpaddd_avx2(auVar160,auVar142);
  auVar142 = vpsrld_avx2(auVar161,6);
  auVar98 = vpslld_avx2(auVar161,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0xb);
  auVar98 = vpslld_avx2(auVar161,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0x19);
  auVar98 = vpslld_avx2(auVar161,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar161,auVar26);
  auVar142 = vpand_avx2(auVar113,auVar161);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar13 = vpaddd_avx2(auVar13,auVar142);
  auVar45._8_4_ = 0xde0b7a04;
  auVar45._0_8_ = 0xde0b7a04de0b7a04;
  auVar45._12_4_ = 0xde0b7a04;
  auVar45._16_4_ = 0xde0b7a04;
  auVar45._20_4_ = 0xde0b7a04;
  auVar45._24_4_ = 0xde0b7a04;
  auVar45._28_4_ = 0xde0b7a04;
  auVar13 = vpaddd_avx2(auVar13,auVar45);
  auVar13 = vpaddd_avx2(auVar13,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar160,2);
  auVar98 = vpslld_avx2(auVar160,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0xd);
  auVar98 = vpslld_avx2(auVar160,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0x16);
  auVar98 = vpslld_avx2(auVar160,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar160,auVar114);
  auVar142 = vpand_avx2(auVar142,auVar170);
  auVar98 = vpand_avx2(auVar160,auVar114);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar169 = vpaddd_avx2(auVar169,auVar13);
  auVar13 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar13);
  auVar13 = vpaddd_avx2(auVar13,auVar142);
  auVar142 = vpsrld_avx2(auVar169,6);
  auVar98 = vpslld_avx2(auVar169,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0xb);
  auVar98 = vpslld_avx2(auVar169,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0x19);
  auVar98 = vpslld_avx2(auVar169,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar169,auVar113);
  auVar142 = vpand_avx2(auVar161,auVar169);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar75._8_4_ = 0x58f4ca9d;
  auVar75._0_8_ = 0x58f4ca9d58f4ca9d;
  auVar75._12_4_ = 0x58f4ca9d;
  auVar75._16_4_ = 0x58f4ca9d;
  auVar75._20_4_ = 0x58f4ca9d;
  auVar75._24_4_ = 0x58f4ca9d;
  auVar75._28_4_ = 0x58f4ca9d;
  auVar26 = vpaddd_avx2(auVar26,auVar142);
  auVar26 = vpaddd_avx2(auVar26,auVar75);
  auVar26 = vpaddd_avx2(auVar26,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar13,2);
  auVar98 = vpslld_avx2(auVar13,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0xd);
  auVar98 = vpslld_avx2(auVar13,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0x16);
  auVar98 = vpslld_avx2(auVar13,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar13,auVar160);
  auVar142 = vpand_avx2(auVar142,auVar114);
  auVar98 = vpand_avx2(auVar13,auVar160);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar170 = vpaddd_avx2(auVar26,auVar170);
  auVar26 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar26);
  auVar26 = vpaddd_avx2(auVar26,auVar142);
  auVar142 = vpsrld_avx2(auVar170,6);
  auVar98 = vpslld_avx2(auVar170,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0xb);
  auVar98 = vpslld_avx2(auVar170,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0x19);
  auVar98 = vpslld_avx2(auVar170,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar170,auVar161);
  auVar142 = vpand_avx2(auVar170,auVar169);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar113 = vpaddd_avx2(auVar113,auVar142);
  auVar76._8_4_ = 0xe15d5b16;
  auVar76._0_8_ = 0xe15d5b16e15d5b16;
  auVar76._12_4_ = 0xe15d5b16;
  auVar76._16_4_ = 0xe15d5b16;
  auVar76._20_4_ = 0xe15d5b16;
  auVar76._24_4_ = 0xe15d5b16;
  auVar76._28_4_ = 0xe15d5b16;
  auVar113 = vpaddd_avx2(auVar113,auVar76);
  auVar113 = vpaddd_avx2(auVar113,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar26,2);
  auVar98 = vpslld_avx2(auVar26,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0xd);
  auVar98 = vpslld_avx2(auVar26,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0x16);
  auVar98 = vpslld_avx2(auVar26,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar13,auVar26);
  auVar142 = vpand_avx2(auVar142,auVar160);
  auVar98 = vpand_avx2(auVar13,auVar26);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar114 = vpaddd_avx2(auVar113,auVar114);
  auVar113 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar113);
  auVar113 = vpaddd_avx2(auVar113,auVar142);
  auVar142 = vpsrld_avx2(auVar114,6);
  auVar98 = vpslld_avx2(auVar114,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0xb);
  auVar98 = vpslld_avx2(auVar114,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0x19);
  auVar98 = vpslld_avx2(auVar114,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar114,auVar169);
  auVar142 = vpand_avx2(auVar170,auVar114);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar161 = vpaddd_avx2(auVar161,auVar142);
  auVar46._8_4_ = 0x7f3e86;
  auVar46._0_8_ = 0x7f3e86007f3e86;
  auVar46._12_4_ = 0x7f3e86;
  auVar46._16_4_ = 0x7f3e86;
  auVar46._20_4_ = 0x7f3e86;
  auVar46._24_4_ = 0x7f3e86;
  auVar46._28_4_ = 0x7f3e86;
  auVar161 = vpaddd_avx2(auVar161,auVar46);
  auVar161 = vpaddd_avx2(auVar161,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar113,2);
  auVar98 = vpslld_avx2(auVar113,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0xd);
  auVar98 = vpslld_avx2(auVar113,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0x16);
  auVar98 = vpslld_avx2(auVar113,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar113,auVar26);
  auVar142 = vpand_avx2(auVar13,auVar142);
  auVar98 = vpand_avx2(auVar113,auVar26);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar160 = vpaddd_avx2(auVar161,auVar160);
  auVar161 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar161);
  auVar161 = vpaddd_avx2(auVar161,auVar142);
  auVar142 = vpsrld_avx2(auVar160,6);
  auVar98 = vpslld_avx2(auVar160,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0xb);
  auVar98 = vpslld_avx2(auVar160,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0x19);
  auVar98 = vpslld_avx2(auVar160,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar160,auVar170);
  auVar142 = vpand_avx2(auVar114,auVar160);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar169 = vpaddd_avx2(auVar169,auVar142);
  auVar47._8_4_ = 0x37088980;
  auVar47._0_8_ = 0x3708898037088980;
  auVar47._12_4_ = 0x37088980;
  auVar47._16_4_ = 0x37088980;
  auVar47._20_4_ = 0x37088980;
  auVar47._24_4_ = 0x37088980;
  auVar47._28_4_ = 0x37088980;
  auVar169 = vpaddd_avx2(auVar169,auVar47);
  auVar169 = vpaddd_avx2(auVar169,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar161,2);
  auVar98 = vpslld_avx2(auVar161,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0xd);
  auVar98 = vpslld_avx2(auVar161,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0x16);
  auVar98 = vpslld_avx2(auVar161,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar161,auVar113);
  auVar142 = vpand_avx2(auVar142,auVar26);
  auVar98 = vpand_avx2(auVar161,auVar113);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar13 = vpaddd_avx2(auVar13,auVar169);
  auVar169 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar169);
  auVar169 = vpaddd_avx2(auVar169,auVar142);
  auVar142 = vpsrld_avx2(auVar13,6);
  auVar98 = vpslld_avx2(auVar13,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0xb);
  auVar98 = vpslld_avx2(auVar13,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0x19);
  auVar98 = vpslld_avx2(auVar13,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar13,auVar114);
  auVar142 = vpand_avx2(auVar160,auVar13);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar77._8_4_ = 0xa507ea32;
  auVar77._0_8_ = 0xa507ea32a507ea32;
  auVar77._12_4_ = 0xa507ea32;
  auVar77._16_4_ = 0xa507ea32;
  auVar77._20_4_ = 0xa507ea32;
  auVar77._24_4_ = 0xa507ea32;
  auVar77._28_4_ = 0xa507ea32;
  auVar170 = vpaddd_avx2(auVar170,auVar142);
  auVar170 = vpaddd_avx2(auVar170,auVar77);
  auVar170 = vpaddd_avx2(auVar170,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar169,2);
  auVar98 = vpslld_avx2(auVar169,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0xd);
  auVar98 = vpslld_avx2(auVar169,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0x16);
  auVar98 = vpslld_avx2(auVar169,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar169,auVar161);
  auVar142 = vpand_avx2(auVar142,auVar113);
  auVar98 = vpand_avx2(auVar169,auVar161);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar26 = vpaddd_avx2(auVar170,auVar26);
  auVar170 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar170);
  auVar170 = vpaddd_avx2(auVar170,auVar142);
  auVar142 = vpsrld_avx2(auVar26,6);
  auVar98 = vpslld_avx2(auVar26,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0xb);
  auVar98 = vpslld_avx2(auVar26,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0x19);
  auVar98 = vpslld_avx2(auVar26,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar26,auVar160);
  auVar142 = vpand_avx2(auVar26,auVar13);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar114 = vpaddd_avx2(auVar114,auVar142);
  auVar78._8_4_ = 0x6fab9537;
  auVar78._0_8_ = 0x6fab95376fab9537;
  auVar78._12_4_ = 0x6fab9537;
  auVar78._16_4_ = 0x6fab9537;
  auVar78._20_4_ = 0x6fab9537;
  auVar78._24_4_ = 0x6fab9537;
  auVar78._28_4_ = 0x6fab9537;
  auVar114 = vpaddd_avx2(auVar114,auVar78);
  auVar114 = vpaddd_avx2(auVar114,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar170,2);
  auVar98 = vpslld_avx2(auVar170,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0xd);
  auVar98 = vpslld_avx2(auVar170,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0x16);
  auVar98 = vpslld_avx2(auVar170,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar169,auVar170);
  auVar142 = vpand_avx2(auVar142,auVar161);
  auVar98 = vpand_avx2(auVar169,auVar170);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar113 = vpaddd_avx2(auVar114,auVar113);
  auVar114 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar114);
  auVar114 = vpaddd_avx2(auVar114,auVar142);
  auVar142 = vpsrld_avx2(auVar113,6);
  auVar98 = vpslld_avx2(auVar113,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0xb);
  auVar98 = vpslld_avx2(auVar113,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0x19);
  auVar98 = vpslld_avx2(auVar113,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar113,auVar13);
  auVar142 = vpand_avx2(auVar26,auVar113);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar160 = vpaddd_avx2(auVar160,auVar142);
  auVar48._8_4_ = 0x17406110;
  auVar48._0_8_ = 0x1740611017406110;
  auVar48._12_4_ = 0x17406110;
  auVar48._16_4_ = 0x17406110;
  auVar48._20_4_ = 0x17406110;
  auVar48._24_4_ = 0x17406110;
  auVar48._28_4_ = 0x17406110;
  auVar160 = vpaddd_avx2(auVar160,auVar48);
  auVar160 = vpaddd_avx2(auVar160,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar114,2);
  auVar98 = vpslld_avx2(auVar114,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0xd);
  auVar98 = vpslld_avx2(auVar114,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0x16);
  auVar98 = vpslld_avx2(auVar114,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar114,auVar170);
  auVar142 = vpand_avx2(auVar169,auVar142);
  auVar98 = vpand_avx2(auVar114,auVar170);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar161 = vpaddd_avx2(auVar160,auVar161);
  auVar160 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar160);
  auVar160 = vpaddd_avx2(auVar160,auVar142);
  auVar142 = vpsrld_avx2(auVar161,6);
  auVar98 = vpslld_avx2(auVar161,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0xb);
  auVar98 = vpslld_avx2(auVar161,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0x19);
  auVar98 = vpslld_avx2(auVar161,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar161,auVar26);
  auVar142 = vpand_avx2(auVar113,auVar161);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar13 = vpaddd_avx2(auVar13,auVar142);
  auVar49._8_4_ = 0xd8cd6f1;
  auVar49._0_8_ = 0xd8cd6f10d8cd6f1;
  auVar49._12_4_ = 0xd8cd6f1;
  auVar49._16_4_ = 0xd8cd6f1;
  auVar49._20_4_ = 0xd8cd6f1;
  auVar49._24_4_ = 0xd8cd6f1;
  auVar49._28_4_ = 0xd8cd6f1;
  auVar13 = vpaddd_avx2(auVar13,auVar49);
  auVar13 = vpaddd_avx2(auVar13,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar160,2);
  auVar98 = vpslld_avx2(auVar160,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0xd);
  auVar98 = vpslld_avx2(auVar160,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0x16);
  auVar98 = vpslld_avx2(auVar160,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar160,auVar114);
  auVar142 = vpand_avx2(auVar142,auVar170);
  auVar98 = vpand_avx2(auVar160,auVar114);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar169 = vpaddd_avx2(auVar169,auVar13);
  auVar13 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar13);
  auVar13 = vpaddd_avx2(auVar13,auVar142);
  auVar142 = vpsrld_avx2(auVar169,6);
  auVar98 = vpslld_avx2(auVar169,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0xb);
  auVar98 = vpslld_avx2(auVar169,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0x19);
  auVar98 = vpslld_avx2(auVar169,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar169,auVar113);
  auVar142 = vpand_avx2(auVar161,auVar169);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar79._8_4_ = 0xcdaa3b6d;
  auVar79._0_8_ = 0xcdaa3b6dcdaa3b6d;
  auVar79._12_4_ = 0xcdaa3b6d;
  auVar79._16_4_ = 0xcdaa3b6d;
  auVar79._20_4_ = 0xcdaa3b6d;
  auVar79._24_4_ = 0xcdaa3b6d;
  auVar79._28_4_ = 0xcdaa3b6d;
  auVar26 = vpaddd_avx2(auVar26,auVar142);
  auVar26 = vpaddd_avx2(auVar26,auVar79);
  auVar26 = vpaddd_avx2(auVar26,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar13,2);
  auVar98 = vpslld_avx2(auVar13,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0xd);
  auVar98 = vpslld_avx2(auVar13,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0x16);
  auVar98 = vpslld_avx2(auVar13,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar13,auVar160);
  auVar142 = vpand_avx2(auVar142,auVar114);
  auVar98 = vpand_avx2(auVar13,auVar160);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar170 = vpaddd_avx2(auVar26,auVar170);
  auVar26 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar26);
  auVar26 = vpaddd_avx2(auVar26,auVar142);
  auVar142 = vpsrld_avx2(auVar170,6);
  auVar98 = vpslld_avx2(auVar170,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0xb);
  auVar98 = vpslld_avx2(auVar170,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0x19);
  auVar98 = vpslld_avx2(auVar170,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar170,auVar161);
  auVar142 = vpand_avx2(auVar170,auVar169);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar113 = vpaddd_avx2(auVar113,auVar142);
  auVar80._8_4_ = 0xc0bbbe37;
  auVar80._0_8_ = 0xc0bbbe37c0bbbe37;
  auVar80._12_4_ = 0xc0bbbe37;
  auVar80._16_4_ = 0xc0bbbe37;
  auVar80._20_4_ = 0xc0bbbe37;
  auVar80._24_4_ = 0xc0bbbe37;
  auVar80._28_4_ = 0xc0bbbe37;
  auVar113 = vpaddd_avx2(auVar113,auVar80);
  auVar113 = vpaddd_avx2(auVar113,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar26,2);
  auVar98 = vpslld_avx2(auVar26,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0xd);
  auVar98 = vpslld_avx2(auVar26,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0x16);
  auVar98 = vpslld_avx2(auVar26,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar13,auVar26);
  auVar142 = vpand_avx2(auVar142,auVar160);
  auVar98 = vpand_avx2(auVar13,auVar26);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar114 = vpaddd_avx2(auVar113,auVar114);
  auVar113 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar113);
  auVar113 = vpaddd_avx2(auVar142,auVar113);
  auVar142 = vpsrld_avx2(auVar114,6);
  auVar98 = vpslld_avx2(auVar114,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0xb);
  auVar98 = vpslld_avx2(auVar114,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0x19);
  auVar98 = vpslld_avx2(auVar114,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar114,auVar169);
  auVar142 = vpand_avx2(auVar170,auVar114);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar161 = vpaddd_avx2(auVar161,auVar142);
  auVar81._8_4_ = 0x83613bda;
  auVar81._0_8_ = 0x83613bda83613bda;
  auVar81._12_4_ = 0x83613bda;
  auVar81._16_4_ = 0x83613bda;
  auVar81._20_4_ = 0x83613bda;
  auVar81._24_4_ = 0x83613bda;
  auVar81._28_4_ = 0x83613bda;
  auVar161 = vpaddd_avx2(auVar161,auVar81);
  auVar161 = vpaddd_avx2(auVar161,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar113,2);
  auVar98 = vpslld_avx2(auVar113,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0xd);
  auVar98 = vpslld_avx2(auVar113,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0x16);
  auVar98 = vpslld_avx2(auVar113,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar113,auVar26);
  auVar142 = vpand_avx2(auVar13,auVar142);
  auVar98 = vpand_avx2(auVar113,auVar26);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar160 = vpaddd_avx2(auVar161,auVar160);
  auVar161 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar161);
  auVar161 = vpaddd_avx2(auVar142,auVar161);
  auVar142 = vpsrld_avx2(auVar160,6);
  auVar98 = vpslld_avx2(auVar160,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0xb);
  auVar98 = vpslld_avx2(auVar160,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0x19);
  auVar98 = vpslld_avx2(auVar160,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar160,auVar170);
  auVar142 = vpand_avx2(auVar114,auVar160);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar169 = vpaddd_avx2(auVar169,auVar142);
  auVar82._8_4_ = 0xdb48a363;
  auVar82._0_8_ = 0xdb48a363db48a363;
  auVar82._12_4_ = 0xdb48a363;
  auVar82._16_4_ = 0xdb48a363;
  auVar82._20_4_ = 0xdb48a363;
  auVar82._24_4_ = 0xdb48a363;
  auVar82._28_4_ = 0xdb48a363;
  auVar169 = vpaddd_avx2(auVar169,auVar82);
  auVar169 = vpaddd_avx2(auVar169,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar161,2);
  auVar98 = vpslld_avx2(auVar161,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0xd);
  auVar98 = vpslld_avx2(auVar161,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0x16);
  auVar98 = vpslld_avx2(auVar161,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar161,auVar113);
  auVar142 = vpand_avx2(auVar142,auVar26);
  auVar98 = vpand_avx2(auVar161,auVar113);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar13 = vpaddd_avx2(auVar13,auVar169);
  auVar169 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar169);
  auVar169 = vpaddd_avx2(auVar142,auVar169);
  auVar142 = vpsrld_avx2(auVar13,6);
  auVar98 = vpslld_avx2(auVar13,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0xb);
  auVar98 = vpslld_avx2(auVar13,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0x19);
  auVar98 = vpslld_avx2(auVar13,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar13,auVar114);
  auVar142 = vpand_avx2(auVar160,auVar13);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar171._8_4_ = 0xb02e931;
  auVar171._0_8_ = 0xb02e9310b02e931;
  auVar171._12_4_ = 0xb02e931;
  auVar171._16_4_ = 0xb02e931;
  auVar171._20_4_ = 0xb02e931;
  auVar171._24_4_ = 0xb02e931;
  auVar171._28_4_ = 0xb02e931;
  auVar170 = vpaddd_avx2(auVar170,auVar142);
  auVar170 = vpaddd_avx2(auVar171,auVar170);
  auVar170 = vpaddd_avx2(auVar170,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar169,2);
  auVar98 = vpslld_avx2(auVar169,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0xd);
  auVar98 = vpslld_avx2(auVar169,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0x16);
  auVar98 = vpslld_avx2(auVar169,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar169,auVar161);
  auVar142 = vpand_avx2(auVar142,auVar113);
  auVar98 = vpand_avx2(auVar169,auVar161);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar26 = vpaddd_avx2(auVar170,auVar26);
  auVar170 = vpaddd_avx2(auVar115 ^ auVar100 ^ auVar99,auVar170);
  auVar170 = vpaddd_avx2(auVar142,auVar170);
  auVar142 = vpsrld_avx2(auVar26,6);
  auVar98 = vpslld_avx2(auVar26,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0xb);
  auVar98 = vpslld_avx2(auVar26,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0x19);
  auVar98 = vpslld_avx2(auVar26,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar26,auVar160);
  auVar142 = vpand_avx2(auVar26,auVar13);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar114 = vpaddd_avx2(auVar114,auVar142);
  auVar83._8_4_ = 0x6fd15ca7;
  auVar83._0_8_ = 0x6fd15ca76fd15ca7;
  auVar83._12_4_ = 0x6fd15ca7;
  auVar83._16_4_ = 0x6fd15ca7;
  auVar83._20_4_ = 0x6fd15ca7;
  auVar83._24_4_ = 0x6fd15ca7;
  auVar83._28_4_ = 0x6fd15ca7;
  auVar114 = vpaddd_avx2(auVar114,auVar83);
  auVar114 = vpaddd_avx2(auVar114,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar170,2);
  auVar98 = vpslld_avx2(auVar170,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0xd);
  auVar98 = vpslld_avx2(auVar170,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0x16);
  auVar98 = vpslld_avx2(auVar170,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar169,auVar170);
  auVar142 = vpand_avx2(auVar142,auVar161);
  auVar98 = vpand_avx2(auVar169,auVar170);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar113 = vpaddd_avx2(auVar114,auVar113);
  auVar114 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar114);
  auVar114 = vpaddd_avx2(auVar142,auVar114);
  auVar142 = vpsrld_avx2(auVar113,6);
  auVar98 = vpslld_avx2(auVar113,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0xb);
  auVar98 = vpslld_avx2(auVar113,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0x19);
  auVar98 = vpslld_avx2(auVar113,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar113,auVar13);
  auVar142 = vpand_avx2(auVar26,auVar113);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar160 = vpaddd_avx2(auVar160,auVar142);
  auVar84._8_4_ = 0x521afaca;
  auVar84._0_8_ = 0x521afaca521afaca;
  auVar84._12_4_ = 0x521afaca;
  auVar84._16_4_ = 0x521afaca;
  auVar84._20_4_ = 0x521afaca;
  auVar84._24_4_ = 0x521afaca;
  auVar84._28_4_ = 0x521afaca;
  auVar160 = vpaddd_avx2(auVar160,auVar84);
  auVar160 = vpaddd_avx2(auVar160,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar114,2);
  auVar98 = vpslld_avx2(auVar114,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0xd);
  auVar98 = vpslld_avx2(auVar114,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0x16);
  auVar98 = vpslld_avx2(auVar114,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar114,auVar170);
  auVar142 = vpand_avx2(auVar169,auVar142);
  auVar98 = vpand_avx2(auVar114,auVar170);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar161 = vpaddd_avx2(auVar160,auVar161);
  auVar160 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar160);
  auVar160 = vpaddd_avx2(auVar142,auVar160);
  auVar142 = vpsrld_avx2(auVar161,6);
  auVar98 = vpslld_avx2(auVar161,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0xb);
  auVar98 = vpslld_avx2(auVar161,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0x19);
  auVar98 = vpslld_avx2(auVar161,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar161,auVar26);
  auVar142 = vpand_avx2(auVar113,auVar161);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar13 = vpaddd_avx2(auVar13,auVar142);
  auVar57._8_4_ = 0x31338431;
  auVar57._0_8_ = 0x3133843131338431;
  auVar57._12_4_ = 0x31338431;
  auVar57._16_4_ = 0x31338431;
  auVar57._20_4_ = 0x31338431;
  auVar57._24_4_ = 0x31338431;
  auVar57._28_4_ = 0x31338431;
  auVar13 = vpaddd_avx2(auVar13,auVar57);
  auVar13 = vpaddd_avx2(auVar13,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar160,2);
  auVar98 = vpslld_avx2(auVar160,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0xd);
  auVar98 = vpslld_avx2(auVar160,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0x16);
  auVar98 = vpslld_avx2(auVar160,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar160,auVar114);
  auVar142 = vpand_avx2(auVar142,auVar170);
  auVar98 = vpand_avx2(auVar160,auVar114);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar169 = vpaddd_avx2(auVar169,auVar13);
  auVar13 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar13);
  auVar13 = vpaddd_avx2(auVar13,auVar142);
  auVar142 = vpsrld_avx2(auVar169,6);
  auVar98 = vpslld_avx2(auVar169,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0xb);
  auVar98 = vpslld_avx2(auVar169,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0x19);
  auVar98 = vpslld_avx2(auVar169,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar169,auVar113);
  auVar142 = vpand_avx2(auVar161,auVar169);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar85._8_4_ = 0x6ed41a95;
  auVar85._0_8_ = 0x6ed41a956ed41a95;
  auVar85._12_4_ = 0x6ed41a95;
  auVar85._16_4_ = 0x6ed41a95;
  auVar85._20_4_ = 0x6ed41a95;
  auVar85._24_4_ = 0x6ed41a95;
  auVar85._28_4_ = 0x6ed41a95;
  auVar26 = vpaddd_avx2(auVar26,auVar142);
  auVar26 = vpaddd_avx2(auVar26,auVar85);
  auVar26 = vpaddd_avx2(auVar26,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar13,2);
  auVar98 = vpslld_avx2(auVar13,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0xd);
  auVar98 = vpslld_avx2(auVar13,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0x16);
  auVar98 = vpslld_avx2(auVar13,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar13,auVar160);
  auVar142 = vpand_avx2(auVar142,auVar114);
  auVar98 = vpand_avx2(auVar13,auVar160);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar170 = vpaddd_avx2(auVar26,auVar170);
  auVar26 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar26);
  auVar26 = vpaddd_avx2(auVar26,auVar142);
  auVar142 = vpsrld_avx2(auVar170,6);
  auVar98 = vpslld_avx2(auVar170,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0xb);
  auVar98 = vpslld_avx2(auVar170,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0x19);
  auVar98 = vpslld_avx2(auVar170,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar170,auVar161);
  auVar142 = vpand_avx2(auVar169,auVar170);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar113 = vpaddd_avx2(auVar113,auVar142);
  auVar86._8_4_ = 0x6d437890;
  auVar86._0_8_ = 0x6d4378906d437890;
  auVar86._12_4_ = 0x6d437890;
  auVar86._16_4_ = 0x6d437890;
  auVar86._20_4_ = 0x6d437890;
  auVar86._24_4_ = 0x6d437890;
  auVar86._28_4_ = 0x6d437890;
  auVar113 = vpaddd_avx2(auVar113,auVar86);
  auVar113 = vpaddd_avx2(auVar113,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar26,2);
  auVar98 = vpslld_avx2(auVar26,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0xd);
  auVar98 = vpslld_avx2(auVar26,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0x16);
  auVar98 = vpslld_avx2(auVar26,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar13,auVar26);
  auVar142 = vpand_avx2(auVar160,auVar142);
  auVar98 = vpand_avx2(auVar13,auVar26);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar114 = vpaddd_avx2(auVar113,auVar114);
  auVar113 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar113);
  auVar113 = vpaddd_avx2(auVar142,auVar113);
  auVar142 = vpsrld_avx2(auVar114,6);
  auVar98 = vpslld_avx2(auVar114,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0xb);
  auVar98 = vpslld_avx2(auVar114,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0x19);
  auVar98 = vpslld_avx2(auVar114,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar114,auVar169);
  auVar142 = vpand_avx2(auVar170,auVar114);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar161 = vpaddd_avx2(auVar161,auVar142);
  auVar50._8_4_ = 0xc39c91f2;
  auVar50._0_8_ = 0xc39c91f2c39c91f2;
  auVar50._12_4_ = 0xc39c91f2;
  auVar50._16_4_ = 0xc39c91f2;
  auVar50._20_4_ = 0xc39c91f2;
  auVar50._24_4_ = 0xc39c91f2;
  auVar50._28_4_ = 0xc39c91f2;
  auVar161 = vpaddd_avx2(auVar161,auVar50);
  auVar161 = vpaddd_avx2(auVar161,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar113,2);
  auVar98 = vpslld_avx2(auVar113,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0xd);
  auVar98 = vpslld_avx2(auVar113,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0x16);
  auVar98 = vpslld_avx2(auVar113,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar113,auVar26);
  auVar142 = vpand_avx2(auVar13,auVar142);
  auVar98 = vpand_avx2(auVar113,auVar26);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar160 = vpaddd_avx2(auVar160,auVar161);
  auVar161 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar161);
  auVar161 = vpaddd_avx2(auVar161,auVar142);
  auVar142 = vpsrld_avx2(auVar160,6);
  auVar98 = vpslld_avx2(auVar160,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0xb);
  auVar98 = vpslld_avx2(auVar160,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0x19);
  auVar98 = vpslld_avx2(auVar160,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar160,auVar170);
  auVar142 = vpand_avx2(auVar114,auVar160);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar169 = vpaddd_avx2(auVar169,auVar142);
  auVar142._8_4_ = 0x9eccabbd;
  auVar142._0_8_ = 0x9eccabbd9eccabbd;
  auVar142._12_4_ = 0x9eccabbd;
  auVar142._16_4_ = 0x9eccabbd;
  auVar142._20_4_ = 0x9eccabbd;
  auVar142._24_4_ = 0x9eccabbd;
  auVar142._28_4_ = 0x9eccabbd;
  auVar169 = vpaddd_avx2(auVar169,auVar142);
  auVar169 = vpaddd_avx2(auVar169,auVar100 ^ auVar99 ^ auVar115);
  auVar13 = vpaddd_avx2(auVar13,auVar169);
  auVar142 = vpsrld_avx2(auVar13,6);
  auVar98 = vpslld_avx2(auVar13,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0xb);
  auVar98 = vpslld_avx2(auVar13,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0x19);
  auVar98 = vpslld_avx2(auVar13,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar13,auVar114);
  auVar142 = vpand_avx2(auVar160,auVar13);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar170 = vpaddd_avx2(auVar170,auVar142);
  auVar98._8_4_ = 0xb5c9a0e6;
  auVar98._0_8_ = 0xb5c9a0e6b5c9a0e6;
  auVar98._12_4_ = 0xb5c9a0e6;
  auVar98._16_4_ = 0xb5c9a0e6;
  auVar98._20_4_ = 0xb5c9a0e6;
  auVar98._24_4_ = 0xb5c9a0e6;
  auVar98._28_4_ = 0xb5c9a0e6;
  auVar170 = vpaddd_avx2(auVar170,auVar98);
  auVar170 = vpaddd_avx2(auVar170,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpaddd_avx2(auVar170,auVar26);
  auVar98 = vpsrld_avx2(auVar142,6);
  auVar99 = vpslld_avx2(auVar142,0x1a);
  auVar100 = vpor_avx2(auVar99,auVar98);
  auVar98 = vpsrld_avx2(auVar142,0xb);
  auVar99 = vpslld_avx2(auVar142,0x15);
  auVar115 = vpor_avx2(auVar99,auVar98);
  auVar98 = vpsrld_avx2(auVar142,0x19);
  auVar99 = vpslld_avx2(auVar142,7);
  auVar163 = vpor_avx2(auVar99,auVar98);
  auVar99 = vpandn_avx2(auVar142,auVar160);
  auVar98 = vpand_avx2(auVar142,auVar13);
  auVar98 = vpor_avx2(auVar98,auVar99);
  auVar114 = vpaddd_avx2(auVar114,auVar98);
  auVar99._8_4_ = 0x532fb63c;
  auVar99._0_8_ = 0x532fb63c532fb63c;
  auVar99._12_4_ = 0x532fb63c;
  auVar99._16_4_ = 0x532fb63c;
  auVar99._20_4_ = 0x532fb63c;
  auVar99._24_4_ = 0x532fb63c;
  auVar99._28_4_ = 0x532fb63c;
  auVar114 = vpaddd_avx2(auVar114,auVar99);
  auVar114 = vpaddd_avx2(auVar114,auVar115 ^ auVar100 ^ auVar163);
  auVar98 = vpaddd_avx2(auVar113,auVar114);
  auVar99 = vpsrld_avx2(auVar98,6);
  auVar100 = vpslld_avx2(auVar98,0x1a);
  auVar115 = vpor_avx2(auVar100,auVar99);
  auVar99 = vpsrld_avx2(auVar98,0xb);
  auVar100 = vpslld_avx2(auVar98,0x15);
  auVar163 = vpor_avx2(auVar100,auVar99);
  auVar99 = vpsrld_avx2(auVar98,0x19);
  auVar100 = vpslld_avx2(auVar98,7);
  auVar164 = vpor_avx2(auVar100,auVar99);
  auVar100 = vpandn_avx2(auVar98,auVar13);
  auVar99 = vpand_avx2(auVar142,auVar98);
  auVar99 = vpor_avx2(auVar99,auVar100);
  auVar160 = vpaddd_avx2(auVar99,auVar160);
  auVar106._8_4_ = 0xd2c741c6;
  auVar106._0_8_ = 0xd2c741c6d2c741c6;
  auVar106._12_4_ = 0xd2c741c6;
  auVar106._16_4_ = 0xd2c741c6;
  auVar106._20_4_ = 0xd2c741c6;
  auVar106._24_4_ = 0xd2c741c6;
  auVar106._28_4_ = 0xd2c741c6;
  auVar160 = vpaddd_avx2(auVar106,auVar160);
  auVar160 = vpaddd_avx2(auVar160,auVar164 ^ auVar163 ^ auVar115);
  auVar99 = vpsrld_avx2(auVar161,2);
  auVar100 = vpslld_avx2(auVar161,0x1e);
  auVar100 = vpor_avx2(auVar100,auVar99);
  auVar99 = vpsrld_avx2(auVar161,0xd);
  auVar115 = vpslld_avx2(auVar161,0x13);
  auVar115 = vpor_avx2(auVar115,auVar99);
  auVar99 = vpsrld_avx2(auVar161,0x16);
  auVar163 = vpslld_avx2(auVar161,10);
  auVar163 = vpor_avx2(auVar163,auVar99);
  auVar99 = vpor_avx2(auVar161,auVar113);
  auVar26 = vpand_avx2(auVar99,auVar26);
  auVar99 = vpand_avx2(auVar161,auVar113);
  auVar99 = vpor_avx2(auVar99,auVar26);
  auVar26 = vpaddd_avx2(auVar163 ^ auVar115 ^ auVar100,auVar169);
  auVar26 = vpaddd_avx2(auVar26,auVar99);
  auVar169 = vpsrld_avx2(auVar26,2);
  auVar99 = vpslld_avx2(auVar26,0x1e);
  auVar99 = vpor_avx2(auVar99,auVar169);
  auVar169 = vpsrld_avx2(auVar26,0xd);
  auVar100 = vpslld_avx2(auVar26,0x13);
  auVar100 = vpor_avx2(auVar100,auVar169);
  auVar169 = vpsrld_avx2(auVar26,0x16);
  auVar115 = vpslld_avx2(auVar26,10);
  auVar115 = vpor_avx2(auVar115,auVar169);
  auVar169 = vpor_avx2(auVar161,auVar26);
  auVar169 = vpand_avx2(auVar113,auVar169);
  auVar113 = vpand_avx2(auVar161,auVar26);
  auVar113 = vpor_avx2(auVar113,auVar169);
  auVar169 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar170);
  auVar169 = vpaddd_avx2(auVar169,auVar113);
  auVar170 = vpsrld_avx2(auVar169,2);
  auVar113 = vpslld_avx2(auVar169,0x1e);
  auVar99 = vpor_avx2(auVar113,auVar170);
  auVar170 = vpsrld_avx2(auVar169,0xd);
  auVar113 = vpslld_avx2(auVar169,0x13);
  auVar100 = vpor_avx2(auVar113,auVar170);
  auVar170 = vpsrld_avx2(auVar169,0x16);
  auVar113 = vpslld_avx2(auVar169,10);
  auVar115 = vpor_avx2(auVar113,auVar170);
  auVar170 = vpor_avx2(auVar169,auVar26);
  auVar170 = vpand_avx2(auVar161,auVar170);
  auVar113 = vpand_avx2(auVar169,auVar26);
  auVar113 = vpor_avx2(auVar113,auVar170);
  auVar170 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar114);
  auVar170 = vpaddd_avx2(auVar170,auVar113);
  auVar113 = vpsrld_avx2(auVar170,2);
  auVar114 = vpslld_avx2(auVar170,0x1e);
  auVar99 = vpor_avx2(auVar114,auVar113);
  auVar113 = vpsrld_avx2(auVar170,0xd);
  auVar114 = vpslld_avx2(auVar170,0x13);
  auVar100 = vpor_avx2(auVar114,auVar113);
  auVar113 = vpsrld_avx2(auVar170,0x16);
  auVar114 = vpslld_avx2(auVar170,10);
  auVar115 = vpor_avx2(auVar114,auVar113);
  auVar113 = vpor_avx2(auVar170,auVar169);
  auVar113 = vpand_avx2(auVar113,auVar26);
  auVar114 = vpand_avx2(auVar170,auVar169);
  auVar113 = vpor_avx2(auVar114,auVar113);
  auVar161 = vpaddd_avx2(auVar161,auVar160);
  auVar160 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar160);
  auVar160 = vpaddd_avx2(auVar113,auVar160);
  auVar113 = vpsrld_avx2(auVar161,6);
  auVar114 = vpslld_avx2(auVar161,0x1a);
  auVar99 = vpor_avx2(auVar114,auVar113);
  auVar113 = vpsrld_avx2(auVar161,0xb);
  auVar114 = vpslld_avx2(auVar161,0x15);
  auVar100 = vpor_avx2(auVar114,auVar113);
  auVar113 = vpsrld_avx2(auVar161,0x19);
  auVar114 = vpslld_avx2(auVar161,7);
  auVar115 = vpor_avx2(auVar114,auVar113);
  auVar114 = vpandn_avx2(auVar161,auVar142);
  auVar113 = vpand_avx2(auVar98,auVar161);
  auVar113 = vpor_avx2(auVar113,auVar114);
  auVar13 = vpaddd_avx2(auVar113,auVar13);
  auVar107._8_4_ = 0x7237ea3;
  auVar107._0_8_ = 0x7237ea307237ea3;
  auVar107._12_4_ = 0x7237ea3;
  auVar107._16_4_ = 0x7237ea3;
  auVar107._20_4_ = 0x7237ea3;
  auVar107._24_4_ = 0x7237ea3;
  auVar107._28_4_ = 0x7237ea3;
  auVar13 = vpaddd_avx2(auVar107,auVar13);
  auVar13 = vpaddd_avx2(auVar13,auVar115 ^ auVar100 ^ auVar99);
  auVar113 = vpsrld_avx2(auVar160,2);
  auVar114 = vpslld_avx2(auVar160,0x1e);
  auVar99 = vpor_avx2(auVar114,auVar113);
  auVar113 = vpsrld_avx2(auVar160,0xd);
  auVar114 = vpslld_avx2(auVar160,0x13);
  auVar100 = vpor_avx2(auVar114,auVar113);
  auVar113 = vpsrld_avx2(auVar160,0x16);
  auVar114 = vpslld_avx2(auVar160,10);
  auVar115 = vpor_avx2(auVar114,auVar113);
  auVar113 = vpor_avx2(auVar160,auVar170);
  auVar113 = vpand_avx2(auVar113,auVar169);
  auVar114 = vpand_avx2(auVar160,auVar170);
  auVar113 = vpor_avx2(auVar114,auVar113);
  auVar26 = vpaddd_avx2(auVar13,auVar26);
  auVar13 = vpaddd_avx2(auVar115 ^ auVar100 ^ auVar99,auVar13);
  auVar13 = vpaddd_avx2(auVar113,auVar13);
  auVar113 = vpsrld_avx2(auVar26,6);
  auVar114 = vpslld_avx2(auVar26,0x1a);
  auVar99 = vpor_avx2(auVar114,auVar113);
  auVar113 = vpsrld_avx2(auVar26,0xb);
  auVar114 = vpslld_avx2(auVar26,0x15);
  auVar100 = vpor_avx2(auVar114,auVar113);
  auVar113 = vpsrld_avx2(auVar26,0x19);
  auVar114 = vpslld_avx2(auVar26,7);
  auVar115 = vpor_avx2(auVar114,auVar113);
  auVar114 = vpandn_avx2(auVar26,auVar98);
  auVar113 = vpand_avx2(auVar161,auVar26);
  auVar113 = vpor_avx2(auVar113,auVar114);
  auVar157._8_4_ = 0xa4954b68;
  auVar157._0_8_ = 0xa4954b68a4954b68;
  auVar157._12_4_ = 0xa4954b68;
  auVar157._16_4_ = 0xa4954b68;
  auVar157._20_4_ = 0xa4954b68;
  auVar157._24_4_ = 0xa4954b68;
  auVar157._28_4_ = 0xa4954b68;
  auVar113 = vpaddd_avx2(auVar142,auVar113);
  auVar113 = vpaddd_avx2(auVar113,auVar157);
  auVar113 = vpaddd_avx2(auVar113,auVar115 ^ auVar100 ^ auVar99);
  auVar114 = vpsrld_avx2(auVar13,2);
  auVar142 = vpslld_avx2(auVar13,0x1e);
  auVar99 = vpor_avx2(auVar142,auVar114);
  auVar114 = vpsrld_avx2(auVar13,0xd);
  auVar142 = vpslld_avx2(auVar13,0x13);
  auVar100 = vpor_avx2(auVar142,auVar114);
  auVar114 = vpsrld_avx2(auVar13,0x16);
  auVar142 = vpslld_avx2(auVar13,10);
  auVar115 = vpor_avx2(auVar142,auVar114);
  auVar114 = vpor_avx2(auVar13,auVar160);
  auVar114 = vpand_avx2(auVar114,auVar170);
  auVar142 = vpand_avx2(auVar13,auVar160);
  auVar114 = vpor_avx2(auVar114,auVar142);
  auVar169 = vpaddd_avx2(auVar113,auVar169);
  auVar113 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar113);
  auVar113 = vpaddd_avx2(auVar114,auVar113);
  auVar114 = vpsrld_avx2(auVar169,6);
  auVar142 = vpslld_avx2(auVar169,0x1a);
  auVar99 = vpor_avx2(auVar142,auVar114);
  auVar114 = vpsrld_avx2(auVar169,0xb);
  auVar142 = vpslld_avx2(auVar169,0x15);
  auVar100 = vpor_avx2(auVar142,auVar114);
  auVar114 = vpsrld_avx2(auVar169,0x19);
  auVar142 = vpslld_avx2(auVar169,7);
  auVar115 = vpor_avx2(auVar142,auVar114);
  auVar142 = vpandn_avx2(auVar169,auVar161);
  auVar114 = vpand_avx2(auVar26,auVar169);
  auVar114 = vpor_avx2(auVar114,auVar142);
  auVar114 = vpaddd_avx2(auVar114,auVar98);
  auVar158._8_4_ = 0x4c191d76;
  auVar158._0_8_ = 0x4c191d764c191d76;
  auVar158._12_4_ = 0x4c191d76;
  auVar158._16_4_ = 0x4c191d76;
  auVar158._20_4_ = 0x4c191d76;
  auVar158._24_4_ = 0x4c191d76;
  auVar158._28_4_ = 0x4c191d76;
  auVar114 = vpaddd_avx2(auVar158,auVar114);
  auVar114 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar114);
  auVar142 = vpsrld_avx2(auVar113,2);
  auVar98 = vpslld_avx2(auVar113,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0xd);
  auVar98 = vpslld_avx2(auVar113,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0x16);
  auVar98 = vpslld_avx2(auVar113,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar113,auVar13);
  auVar142 = vpand_avx2(auVar142,auVar160);
  auVar98 = vpand_avx2(auVar113,auVar13);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar142 = vpaddd_avx2(auVar142,auVar115 ^ auVar100 ^ auVar99);
  auVar88 = vpaddd_avx2(auVar114,auVar88);
  auVar88 = vpaddd_avx2(auVar88,auVar142);
  auVar21 = vpaddd_avx2(auVar113,auVar21);
  auVar10 = vpaddd_avx2(auVar13,auVar10);
  auVar13 = vpaddd_avx2(auVar160,auVar20);
  auVar109 = vpaddd_avx2(auVar109,auVar170);
  auVar109 = vpaddd_avx2(auVar114,auVar109);
  auVar20 = vpaddd_avx2(auVar169,auVar51);
  auVar26 = vpaddd_avx2(auVar26,auVar89);
  auVar7._8_4_ = 0x5be0cd19;
  auVar7._0_8_ = 0x5be0cd195be0cd19;
  auVar7._12_4_ = 0x5be0cd19;
  auVar7._16_4_ = 0x5be0cd19;
  auVar7._20_4_ = 0x5be0cd19;
  auVar7._24_4_ = 0x5be0cd19;
  auVar7._28_4_ = 0x5be0cd19;
  auVar4 = vpaddd_avx2(auVar4,auVar7);
  auVar4 = vpaddd_avx2(auVar4,auVar161);
  auVar51 = vpaddd_avx2(auVar88,auVar12);
  auVar89 = vpsrld_avx2(auVar51,6);
  auVar160 = vpslld_avx2(auVar51,0x1a);
  auVar160 = vpor_avx2(auVar160,auVar89);
  auVar89 = vpsrld_avx2(auVar51,0xb);
  auVar161 = vpslld_avx2(auVar51,0x15);
  auVar161 = vpor_avx2(auVar161,auVar89);
  auVar89 = vpsrld_avx2(auVar51,0x19);
  auVar169 = vpslld_avx2(auVar51,7);
  auVar169 = vpor_avx2(auVar169,auVar89);
  auVar89 = vpand_avx2(auVar51,auVar14);
  auVar89 = vpaddd_avx2(auVar21,auVar89 ^ auVar22);
  auVar89 = vpaddd_avx2(auVar89,auVar161 ^ auVar160 ^ auVar169);
  auVar160 = vpaddd_avx2(auVar88,auVar25);
  auVar161 = vpsrld_avx2(auVar160,2);
  auVar169 = vpslld_avx2(auVar160,0x1e);
  auVar169 = vpor_avx2(auVar169,auVar161);
  auVar161 = vpsrld_avx2(auVar160,0xd);
  auVar170 = vpslld_avx2(auVar160,0x13);
  auVar170 = vpor_avx2(auVar170,auVar161);
  auVar161 = vpsrld_avx2(auVar160,0x16);
  auVar113 = vpslld_avx2(auVar160,10);
  auVar113 = vpor_avx2(auVar113,auVar161);
  auVar161 = vpand_avx2(auVar160,auVar23);
  auVar161 = vpaddd_avx2(auVar170 ^ auVar169 ^ auVar113,auVar161);
  auVar161 = vpaddd_avx2(auVar89,auVar161);
  auVar89 = vpaddd_avx2(auVar89,auVar87);
  auVar169._8_4_ = 0xbabcc441;
  auVar169._0_8_ = 0xbabcc441babcc441;
  auVar169._12_4_ = 0xbabcc441;
  auVar169._16_4_ = 0xbabcc441;
  auVar169._20_4_ = 0xbabcc441;
  auVar169._24_4_ = 0xbabcc441;
  auVar169._28_4_ = 0xbabcc441;
  auVar161 = vpaddd_avx2(auVar161,auVar169);
  auVar169 = vpsrld_avx2(auVar89,6);
  auVar170 = vpslld_avx2(auVar89,0x1a);
  auVar170 = vpor_avx2(auVar170,auVar169);
  auVar169 = vpsrld_avx2(auVar89,0xb);
  auVar113 = vpslld_avx2(auVar89,0x15);
  auVar113 = vpor_avx2(auVar113,auVar169);
  auVar169 = vpsrld_avx2(auVar89,0x19);
  auVar114 = vpslld_avx2(auVar89,7);
  auVar114 = vpor_avx2(auVar114,auVar169);
  auVar169 = vpand_avx2(auVar89,auVar51 ^ auVar15);
  auVar169 = vpaddd_avx2(auVar10,auVar169 ^ auVar52);
  auVar169 = vpaddd_avx2(auVar169,auVar113 ^ auVar170 ^ auVar114);
  auVar170 = vpsrld_avx2(auVar161,2);
  auVar113 = vpslld_avx2(auVar161,0x1e);
  auVar114 = vpor_avx2(auVar113,auVar170);
  auVar170 = vpsrld_avx2(auVar161,0xd);
  auVar113 = vpslld_avx2(auVar161,0x13);
  auVar142 = vpor_avx2(auVar113,auVar170);
  auVar170 = vpsrld_avx2(auVar161,0x16);
  auVar113 = vpslld_avx2(auVar161,10);
  auVar98 = vpor_avx2(auVar113,auVar170);
  auVar170 = vpor_avx2(auVar161,auVar160);
  auVar170 = vpand_avx2(auVar170,auVar137);
  auVar113 = vpand_avx2(auVar161,auVar160);
  auVar170 = vpor_avx2(auVar113,auVar170);
  auVar170 = vpaddd_avx2(auVar142 ^ auVar114 ^ auVar98,auVar170);
  auVar113 = vpaddd_avx2(auVar169,auVar54);
  auVar169 = vpaddd_avx2(auVar169,auVar91);
  auVar169 = vpaddd_avx2(auVar169,auVar170);
  auVar170 = vpsrld_avx2(auVar113,6);
  auVar114 = vpslld_avx2(auVar113,0x1a);
  auVar142 = vpor_avx2(auVar114,auVar170);
  auVar170 = vpsrld_avx2(auVar113,0xb);
  auVar114 = vpslld_avx2(auVar113,0x15);
  auVar98 = vpor_avx2(auVar114,auVar170);
  auVar170 = vpsrld_avx2(auVar113,0x19);
  auVar114 = vpslld_avx2(auVar113,7);
  auVar99 = vpor_avx2(auVar114,auVar170);
  auVar114 = vpandn_avx2(auVar113,auVar51);
  auVar170 = vpand_avx2(auVar89,auVar113);
  auVar170 = vpor_avx2(auVar170,auVar114);
  auVar170 = vpaddd_avx2(auVar13,auVar170);
  auVar170 = vpaddd_avx2(auVar170,auVar99 ^ auVar98 ^ auVar142);
  auVar114 = vpsrld_avx2(auVar169,2);
  auVar142 = vpslld_avx2(auVar169,0x1e);
  auVar98 = vpor_avx2(auVar142,auVar114);
  auVar114 = vpsrld_avx2(auVar169,0xd);
  auVar142 = vpslld_avx2(auVar169,0x13);
  auVar99 = vpor_avx2(auVar142,auVar114);
  auVar114 = vpsrld_avx2(auVar169,0x16);
  auVar142 = vpslld_avx2(auVar169,10);
  auVar100 = vpor_avx2(auVar142,auVar114);
  auVar114 = vpor_avx2(auVar161,auVar169);
  auVar114 = vpand_avx2(auVar114,auVar160);
  auVar142 = vpand_avx2(auVar161,auVar169);
  auVar142 = vpor_avx2(auVar114,auVar142);
  auVar114 = vpaddd_avx2(auVar99 ^ auVar98 ^ auVar100,auVar170);
  auVar170 = vpaddd_avx2(auVar170,auVar92);
  auVar142 = vpaddd_avx2(auVar142,auVar93);
  auVar114 = vpaddd_avx2(auVar114,auVar142);
  auVar142 = vpsrld_avx2(auVar170,6);
  auVar98 = vpslld_avx2(auVar170,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0xb);
  auVar98 = vpslld_avx2(auVar170,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0x19);
  auVar98 = vpslld_avx2(auVar170,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar170,auVar89);
  auVar142 = vpand_avx2(auVar170,auVar113);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar51 = vpaddd_avx2(auVar109,auVar51);
  auVar51 = vpaddd_avx2(auVar142,auVar51);
  auVar51 = vpaddd_avx2(auVar51,auVar61);
  auVar51 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar51);
  auVar142 = vpsrld_avx2(auVar114,2);
  auVar98 = vpslld_avx2(auVar114,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0xd);
  auVar98 = vpslld_avx2(auVar114,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0x16);
  auVar98 = vpslld_avx2(auVar114,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar114,auVar169);
  auVar142 = vpand_avx2(auVar142,auVar161);
  auVar98 = vpand_avx2(auVar114,auVar169);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar160 = vpaddd_avx2(auVar51,auVar160);
  auVar51 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar51);
  auVar51 = vpaddd_avx2(auVar142,auVar51);
  auVar142 = vpsrld_avx2(auVar160,6);
  auVar98 = vpslld_avx2(auVar160,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0xb);
  auVar98 = vpslld_avx2(auVar160,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0x19);
  auVar98 = vpslld_avx2(auVar160,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar160,auVar113);
  auVar142 = vpand_avx2(auVar170,auVar160);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar89 = vpaddd_avx2(auVar89,auVar20);
  auVar89 = vpaddd_avx2(auVar89,auVar142);
  auVar89 = vpaddd_avx2(auVar89,auVar165);
  auVar89 = vpaddd_avx2(auVar89,auVar115 ^ auVar100 ^ auVar99);
  auVar142 = vpsrld_avx2(auVar51,2);
  auVar98 = vpslld_avx2(auVar51,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar51,0xd);
  auVar98 = vpslld_avx2(auVar51,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar51,0x16);
  auVar98 = vpslld_avx2(auVar51,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar51,auVar114);
  auVar142 = vpand_avx2(auVar142,auVar169);
  auVar98 = vpand_avx2(auVar51,auVar114);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar161 = vpaddd_avx2(auVar161,auVar89);
  auVar89 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar89);
  auVar89 = vpaddd_avx2(auVar142,auVar89);
  auVar142 = vpsrld_avx2(auVar161,6);
  auVar98 = vpslld_avx2(auVar161,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0xb);
  auVar98 = vpslld_avx2(auVar161,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0x19);
  auVar98 = vpslld_avx2(auVar161,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar161,auVar170);
  auVar142 = vpand_avx2(auVar160,auVar161);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar113 = vpaddd_avx2(auVar26,auVar113);
  auVar113 = vpaddd_avx2(auVar142,auVar113);
  auVar113 = vpaddd_avx2(auVar113,auVar62);
  auVar113 = vpaddd_avx2(auVar113,auVar115 ^ auVar100 ^ auVar99);
  auVar142 = vpsrld_avx2(auVar89,2);
  auVar98 = vpslld_avx2(auVar89,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar89,0xd);
  auVar98 = vpslld_avx2(auVar89,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar89,0x16);
  auVar98 = vpslld_avx2(auVar89,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar89,auVar51);
  auVar142 = vpand_avx2(auVar142,auVar114);
  auVar98 = vpand_avx2(auVar89,auVar51);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar169 = vpaddd_avx2(auVar113,auVar169);
  auVar113 = vpaddd_avx2(auVar115 ^ auVar100 ^ auVar99,auVar113);
  auVar113 = vpaddd_avx2(auVar142,auVar113);
  auVar142 = vpsrld_avx2(auVar169,6);
  auVar98 = vpslld_avx2(auVar169,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0xb);
  auVar98 = vpslld_avx2(auVar169,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0x19);
  auVar98 = vpslld_avx2(auVar169,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar169,auVar160);
  auVar142 = vpand_avx2(auVar161,auVar169);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar170 = vpaddd_avx2(auVar170,auVar4);
  auVar170 = vpaddd_avx2(auVar170,auVar142);
  auVar170 = vpaddd_avx2(auVar170,auVar63);
  auVar170 = vpaddd_avx2(auVar170,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar113,2);
  auVar98 = vpslld_avx2(auVar113,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0xd);
  auVar98 = vpslld_avx2(auVar113,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0x16);
  auVar98 = vpslld_avx2(auVar113,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar89,auVar113);
  auVar142 = vpand_avx2(auVar142,auVar51);
  auVar98 = vpand_avx2(auVar89,auVar113);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar114 = vpaddd_avx2(auVar170,auVar114);
  auVar170 = vpaddd_avx2(auVar115 ^ auVar100 ^ auVar99,auVar170);
  auVar170 = vpaddd_avx2(auVar142,auVar170);
  auVar142 = vpsrld_avx2(auVar114,6);
  auVar98 = vpslld_avx2(auVar114,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0xb);
  auVar98 = vpslld_avx2(auVar114,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0x19);
  auVar98 = vpslld_avx2(auVar114,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar114,auVar161);
  auVar142 = vpand_avx2(auVar169,auVar114);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar160 = vpaddd_avx2(auVar160,auVar142);
  auVar108._8_4_ = 0x5807aa98;
  auVar108._0_8_ = 0x5807aa985807aa98;
  auVar108._12_4_ = 0x5807aa98;
  auVar108._16_4_ = 0x5807aa98;
  auVar108._20_4_ = 0x5807aa98;
  auVar108._24_4_ = 0x5807aa98;
  auVar108._28_4_ = 0x5807aa98;
  auVar160 = vpaddd_avx2(auVar108,auVar160);
  auVar160 = vpaddd_avx2(auVar160,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar170,2);
  auVar98 = vpslld_avx2(auVar170,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0xd);
  auVar98 = vpslld_avx2(auVar170,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0x16);
  auVar98 = vpslld_avx2(auVar170,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar170,auVar113);
  auVar142 = vpand_avx2(auVar142,auVar89);
  auVar98 = vpand_avx2(auVar170,auVar113);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar51 = vpaddd_avx2(auVar160,auVar51);
  auVar160 = vpaddd_avx2(auVar115 ^ auVar100 ^ auVar99,auVar160);
  auVar160 = vpaddd_avx2(auVar142,auVar160);
  auVar142 = vpsrld_avx2(auVar51,6);
  auVar98 = vpslld_avx2(auVar51,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar51,0xb);
  auVar98 = vpslld_avx2(auVar51,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar51,0x19);
  auVar98 = vpslld_avx2(auVar51,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar51,auVar169);
  auVar142 = vpand_avx2(auVar114,auVar51);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar161 = vpaddd_avx2(auVar161,auVar142);
  auVar161 = vpaddd_avx2(auVar161,auVar95);
  auVar161 = vpaddd_avx2(auVar161,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar160,2);
  auVar98 = vpslld_avx2(auVar160,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0xd);
  auVar98 = vpslld_avx2(auVar160,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0x16);
  auVar98 = vpslld_avx2(auVar160,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar160,auVar170);
  auVar142 = vpand_avx2(auVar142,auVar113);
  auVar98 = vpand_avx2(auVar160,auVar170);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar89 = vpaddd_avx2(auVar89,auVar161);
  auVar161 = vpaddd_avx2(auVar115 ^ auVar100 ^ auVar99,auVar161);
  auVar161 = vpaddd_avx2(auVar142,auVar161);
  auVar142 = vpsrld_avx2(auVar89,6);
  auVar98 = vpslld_avx2(auVar89,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar89,0xb);
  auVar98 = vpslld_avx2(auVar89,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar89,0x19);
  auVar98 = vpslld_avx2(auVar89,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar89,auVar114);
  auVar142 = vpand_avx2(auVar51,auVar89);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar169 = vpaddd_avx2(auVar169,auVar142);
  auVar169 = vpaddd_avx2(auVar169,auVar56);
  auVar169 = vpaddd_avx2(auVar169,auVar115 ^ auVar100 ^ auVar99);
  auVar142 = vpsrld_avx2(auVar161,2);
  auVar98 = vpslld_avx2(auVar161,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0xd);
  auVar98 = vpslld_avx2(auVar161,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0x16);
  auVar98 = vpslld_avx2(auVar161,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar161,auVar160);
  auVar142 = vpand_avx2(auVar142,auVar170);
  auVar98 = vpand_avx2(auVar161,auVar160);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar113 = vpaddd_avx2(auVar169,auVar113);
  auVar169 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar169);
  auVar169 = vpaddd_avx2(auVar142,auVar169);
  auVar142 = vpsrld_avx2(auVar113,6);
  auVar98 = vpslld_avx2(auVar113,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0xb);
  auVar98 = vpslld_avx2(auVar113,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0x19);
  auVar98 = vpslld_avx2(auVar113,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar113,auVar51);
  auVar142 = vpand_avx2(auVar89,auVar113);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar114 = vpaddd_avx2(auVar114,auVar142);
  auVar114 = vpaddd_avx2(auVar114,auVar111);
  auVar114 = vpaddd_avx2(auVar114,auVar115 ^ auVar100 ^ auVar99);
  auVar142 = vpsrld_avx2(auVar169,2);
  auVar98 = vpslld_avx2(auVar169,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0xd);
  auVar98 = vpslld_avx2(auVar169,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0x16);
  auVar98 = vpslld_avx2(auVar169,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar169,auVar161);
  auVar142 = vpand_avx2(auVar142,auVar160);
  auVar98 = vpand_avx2(auVar169,auVar161);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar170 = vpaddd_avx2(auVar114,auVar170);
  auVar114 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar114);
  auVar114 = vpaddd_avx2(auVar142,auVar114);
  auVar142 = vpsrld_avx2(auVar170,6);
  auVar98 = vpslld_avx2(auVar170,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0xb);
  auVar98 = vpslld_avx2(auVar170,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0x19);
  auVar98 = vpslld_avx2(auVar170,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar170,auVar89);
  auVar142 = vpand_avx2(auVar170,auVar113);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar51 = vpaddd_avx2(auVar51,auVar142);
  auVar51 = vpaddd_avx2(auVar51,auVar58);
  auVar51 = vpaddd_avx2(auVar51,auVar115 ^ auVar100 ^ auVar99);
  auVar142 = vpsrld_avx2(auVar114,2);
  auVar98 = vpslld_avx2(auVar114,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0xd);
  auVar98 = vpslld_avx2(auVar114,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0x16);
  auVar98 = vpslld_avx2(auVar114,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar169,auVar114);
  auVar142 = vpand_avx2(auVar142,auVar161);
  auVar98 = vpand_avx2(auVar169,auVar114);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar160 = vpaddd_avx2(auVar51,auVar160);
  auVar51 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar51);
  auVar51 = vpaddd_avx2(auVar142,auVar51);
  auVar142 = vpsrld_avx2(auVar160,6);
  auVar98 = vpslld_avx2(auVar160,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0xb);
  auVar98 = vpslld_avx2(auVar160,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0x19);
  auVar98 = vpslld_avx2(auVar160,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar160,auVar113);
  auVar142 = vpand_avx2(auVar170,auVar160);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar89 = vpaddd_avx2(auVar142,auVar89);
  auVar89 = vpaddd_avx2(auVar89,auVar112);
  auVar89 = vpaddd_avx2(auVar89,auVar115 ^ auVar100 ^ auVar99);
  auVar142 = vpsrld_avx2(auVar51,2);
  auVar98 = vpslld_avx2(auVar51,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar51,0xd);
  auVar98 = vpslld_avx2(auVar51,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar51,0x16);
  auVar98 = vpslld_avx2(auVar51,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar51,auVar114);
  auVar142 = vpand_avx2(auVar142,auVar169);
  auVar98 = vpand_avx2(auVar51,auVar114);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar161 = vpaddd_avx2(auVar161,auVar89);
  auVar89 = vpaddd_avx2(auVar115 ^ auVar100 ^ auVar99,auVar89);
  auVar89 = vpaddd_avx2(auVar142,auVar89);
  auVar142 = vpsrld_avx2(auVar161,6);
  auVar98 = vpslld_avx2(auVar161,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0xb);
  auVar98 = vpslld_avx2(auVar161,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0x19);
  auVar98 = vpslld_avx2(auVar161,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar161,auVar170);
  auVar142 = vpand_avx2(auVar160,auVar161);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar113 = vpaddd_avx2(auVar113,auVar142);
  auVar113 = vpaddd_avx2(auVar113,auVar148);
  auVar113 = vpaddd_avx2(auVar113,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar89,2);
  auVar98 = vpslld_avx2(auVar89,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar89,0xd);
  auVar98 = vpslld_avx2(auVar89,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar89,0x16);
  auVar98 = vpslld_avx2(auVar89,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar89,auVar51);
  auVar142 = vpand_avx2(auVar142,auVar114);
  auVar98 = vpand_avx2(auVar89,auVar51);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar169 = vpaddd_avx2(auVar169,auVar113);
  auVar113 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar113);
  auVar113 = vpaddd_avx2(auVar142,auVar113);
  auVar142 = vpsrld_avx2(auVar169,6);
  auVar98 = vpslld_avx2(auVar169,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0xb);
  auVar98 = vpslld_avx2(auVar169,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0x19);
  auVar98 = vpslld_avx2(auVar169,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar169,auVar160);
  auVar142 = vpand_avx2(auVar161,auVar169);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar170 = vpaddd_avx2(auVar170,auVar142);
  auVar135._8_4_ = 0xc19bf274;
  auVar135._0_8_ = 0xc19bf274c19bf274;
  auVar135._12_4_ = 0xc19bf274;
  auVar135._16_4_ = 0xc19bf274;
  auVar135._20_4_ = 0xc19bf274;
  auVar135._24_4_ = 0xc19bf274;
  auVar135._28_4_ = 0xc19bf274;
  auVar170 = vpaddd_avx2(auVar170,auVar135);
  auVar170 = vpaddd_avx2(auVar170,auVar115 ^ auVar100 ^ auVar99);
  auVar142 = vpsrld_avx2(auVar113,2);
  auVar98 = vpslld_avx2(auVar113,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0xd);
  auVar98 = vpslld_avx2(auVar113,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0x16);
  auVar98 = vpslld_avx2(auVar113,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar89,auVar113);
  auVar142 = vpand_avx2(auVar142,auVar51);
  auVar98 = vpand_avx2(auVar89,auVar113);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar114 = vpaddd_avx2(auVar170,auVar114);
  auVar170 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar170);
  auVar170 = vpaddd_avx2(auVar142,auVar170);
  auVar142 = vpsrld_avx2(auVar21,7);
  auVar98 = vpslld_avx2(auVar21,0x19);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpsrld_avx2(auVar21,0x12);
  auVar99 = vpslld_avx2(auVar21,0xe);
  auVar98 = vpor_avx2(auVar99,auVar98);
  auVar99 = vpsrld_avx2(auVar21,3);
  auVar88 = vpaddd_avx2(auVar99 ^ auVar98 ^ auVar142,auVar88);
  auVar142 = vpsrld_avx2(auVar114,6);
  auVar98 = vpslld_avx2(auVar114,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpsrld_avx2(auVar114,0xb);
  auVar142 = vpslld_avx2(auVar114,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0x19);
  auVar98 = vpslld_avx2(auVar114,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar114,auVar161);
  auVar142 = vpand_avx2(auVar114,auVar169);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar160 = vpaddd_avx2(auVar160,auVar88);
  auVar160 = vpaddd_avx2(auVar160,auVar142);
  auVar160 = vpaddd_avx2(auVar160,auVar96);
  auVar160 = vpaddd_avx2(auVar160,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar170,2);
  auVar98 = vpslld_avx2(auVar170,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0xd);
  auVar98 = vpslld_avx2(auVar170,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0x16);
  auVar98 = vpslld_avx2(auVar170,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar170,auVar113);
  auVar142 = vpand_avx2(auVar89,auVar142);
  auVar98 = vpand_avx2(auVar170,auVar113);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar51 = vpaddd_avx2(auVar160,auVar51);
  auVar160 = vpaddd_avx2(auVar115 ^ auVar100 ^ auVar99,auVar160);
  auVar160 = vpaddd_avx2(auVar142,auVar160);
  auVar142 = vpsrld_avx2(auVar10,7);
  auVar98 = vpslld_avx2(auVar10,0x19);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpsrld_avx2(auVar10,0x12);
  auVar99 = vpslld_avx2(auVar10,0xe);
  auVar98 = vpor_avx2(auVar99,auVar98);
  auVar99 = vpsrld_avx2(auVar10,3);
  auVar115._8_4_ = 0xa00000;
  auVar115._0_8_ = 0xa0000000a00000;
  auVar115._12_4_ = 0xa00000;
  auVar115._16_4_ = 0xa00000;
  auVar115._20_4_ = 0xa00000;
  auVar115._24_4_ = 0xa00000;
  auVar115._28_4_ = 0xa00000;
  auVar142 = vpaddd_avx2(auVar98 ^ auVar142 ^ auVar99,auVar115);
  auVar21 = vpaddd_avx2(auVar21,auVar142);
  auVar142 = vpsrld_avx2(auVar51,6);
  auVar98 = vpslld_avx2(auVar51,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar51,0xb);
  auVar98 = vpslld_avx2(auVar51,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar51,0x19);
  auVar98 = vpslld_avx2(auVar51,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar51,auVar169);
  auVar142 = vpand_avx2(auVar114,auVar51);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar161 = vpaddd_avx2(auVar21,auVar161);
  auVar161 = vpaddd_avx2(auVar161,auVar142);
  auVar161 = vpaddd_avx2(auVar161,auVar141);
  auVar161 = vpaddd_avx2(auVar161,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar160,2);
  auVar98 = vpslld_avx2(auVar160,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0xd);
  auVar98 = vpslld_avx2(auVar160,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0x16);
  auVar98 = vpslld_avx2(auVar160,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar160,auVar170);
  auVar142 = vpand_avx2(auVar142,auVar113);
  auVar98 = vpand_avx2(auVar160,auVar170);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar89 = vpaddd_avx2(auVar89,auVar161);
  auVar161 = vpaddd_avx2(auVar115 ^ auVar100 ^ auVar99,auVar161);
  auVar161 = vpaddd_avx2(auVar142,auVar161);
  auVar142 = vpsrld_avx2(auVar88,0x11);
  auVar98 = vpslld_avx2(auVar88,0xf);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpsrld_avx2(auVar88,0x13);
  auVar99 = vpslld_avx2(auVar88,0xd);
  auVar98 = vpor_avx2(auVar99,auVar98);
  auVar115 = vpsrld_avx2(auVar88,10);
  auVar99 = vpsrld_avx2(auVar13,7);
  auVar100 = vpslld_avx2(auVar13,0x19);
  auVar99 = vpor_avx2(auVar100,auVar99);
  auVar163 = vpsrld_avx2(auVar13,0x12);
  auVar100 = vpslld_avx2(auVar13,0xe);
  auVar100 = vpor_avx2(auVar163,auVar100);
  auVar163 = vpsrld_avx2(auVar13,3);
  auVar10 = vpaddd_avx2(auVar10,auVar100 ^ auVar99 ^ auVar163);
  auVar10 = vpaddd_avx2(auVar10,auVar98 ^ auVar142 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar89,6);
  auVar98 = vpslld_avx2(auVar89,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar89,0xb);
  auVar98 = vpslld_avx2(auVar89,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar89,0x19);
  auVar98 = vpslld_avx2(auVar89,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar89,auVar114);
  auVar142 = vpand_avx2(auVar89,auVar51);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar169 = vpaddd_avx2(auVar10,auVar169);
  auVar169 = vpaddd_avx2(auVar169,auVar142);
  auVar169 = vpaddd_avx2(auVar169,auVar97);
  auVar169 = vpaddd_avx2(auVar169,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar161,2);
  auVar98 = vpslld_avx2(auVar161,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0xd);
  auVar98 = vpslld_avx2(auVar161,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0x16);
  auVar98 = vpslld_avx2(auVar161,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar161,auVar160);
  auVar142 = vpand_avx2(auVar142,auVar170);
  auVar98 = vpand_avx2(auVar161,auVar160);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar113 = vpaddd_avx2(auVar169,auVar113);
  auVar169 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar169);
  auVar169 = vpaddd_avx2(auVar169,auVar142);
  auVar142 = vpsrld_avx2(auVar21,0x11);
  auVar98 = vpslld_avx2(auVar21,0xf);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpsrld_avx2(auVar21,0x13);
  auVar99 = vpslld_avx2(auVar21,0xd);
  auVar98 = vpor_avx2(auVar99,auVar98);
  auVar115 = vpsrld_avx2(auVar21,10);
  auVar99 = vpsrld_avx2(auVar109,7);
  auVar100 = vpslld_avx2(auVar109,0x19);
  auVar99 = vpor_avx2(auVar100,auVar99);
  auVar100 = vpsrld_avx2(auVar109,0x12);
  auVar163 = vpslld_avx2(auVar109,0xe);
  auVar100 = vpor_avx2(auVar163,auVar100);
  auVar163 = vpsrld_avx2(auVar109,3);
  auVar13 = vpaddd_avx2(auVar13,auVar98 ^ auVar142 ^ auVar115);
  auVar13 = vpaddd_avx2(auVar13,auVar100 ^ auVar99 ^ auVar163);
  auVar142 = vpsrld_avx2(auVar113,6);
  auVar98 = vpslld_avx2(auVar113,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0xb);
  auVar98 = vpslld_avx2(auVar113,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0x19);
  auVar98 = vpslld_avx2(auVar113,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar113,auVar51);
  auVar142 = vpand_avx2(auVar89,auVar113);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar114 = vpaddd_avx2(auVar13,auVar114);
  auVar114 = vpaddd_avx2(auVar114,auVar142);
  auVar114 = vpaddd_avx2(auVar114,auVar27);
  auVar114 = vpaddd_avx2(auVar114,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar169,2);
  auVar98 = vpslld_avx2(auVar169,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0xd);
  auVar98 = vpslld_avx2(auVar169,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0x16);
  auVar98 = vpslld_avx2(auVar169,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar161,auVar169);
  auVar142 = vpand_avx2(auVar160,auVar142);
  auVar98 = vpand_avx2(auVar161,auVar169);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar170 = vpaddd_avx2(auVar114,auVar170);
  auVar114 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar114);
  auVar114 = vpaddd_avx2(auVar114,auVar142);
  auVar142 = vpsrld_avx2(auVar10,0x11);
  auVar98 = vpslld_avx2(auVar10,0xf);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpsrld_avx2(auVar10,0x13);
  auVar99 = vpslld_avx2(auVar10,0xd);
  auVar98 = vpor_avx2(auVar99,auVar98);
  auVar115 = vpsrld_avx2(auVar10,10);
  auVar99 = vpsrld_avx2(auVar20,7);
  auVar100 = vpslld_avx2(auVar20,0x19);
  auVar99 = vpor_avx2(auVar100,auVar99);
  auVar100 = vpsrld_avx2(auVar20,0x12);
  auVar163 = vpslld_avx2(auVar20,0xe);
  auVar100 = vpor_avx2(auVar163,auVar100);
  auVar163 = vpsrld_avx2(auVar20,3);
  auVar109 = vpaddd_avx2(auVar109,auVar100 ^ auVar99 ^ auVar163);
  auVar109 = vpaddd_avx2(auVar109,auVar98 ^ auVar142 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar170,6);
  auVar98 = vpslld_avx2(auVar170,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0xb);
  auVar98 = vpslld_avx2(auVar170,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0x19);
  auVar98 = vpslld_avx2(auVar170,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar170,auVar89);
  auVar142 = vpand_avx2(auVar170,auVar113);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar51 = vpaddd_avx2(auVar109,auVar51);
  auVar51 = vpaddd_avx2(auVar51,auVar142);
  auVar51 = vpaddd_avx2(auVar51,auVar28);
  auVar51 = vpaddd_avx2(auVar51,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar114,2);
  auVar98 = vpslld_avx2(auVar114,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0xd);
  auVar98 = vpslld_avx2(auVar114,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0x16);
  auVar98 = vpslld_avx2(auVar114,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar114,auVar169);
  auVar142 = vpand_avx2(auVar161,auVar142);
  auVar98 = vpand_avx2(auVar114,auVar169);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar160 = vpaddd_avx2(auVar160,auVar51);
  auVar51 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar51);
  auVar51 = vpaddd_avx2(auVar51,auVar142);
  auVar142 = vpsrld_avx2(auVar13,0x11);
  auVar98 = vpslld_avx2(auVar13,0xf);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpsrld_avx2(auVar13,0x13);
  auVar99 = vpslld_avx2(auVar13,0xd);
  auVar98 = vpor_avx2(auVar99,auVar98);
  auVar115 = vpsrld_avx2(auVar13,10);
  auVar99 = vpsrld_avx2(auVar26,7);
  auVar100 = vpslld_avx2(auVar26,0x19);
  auVar99 = vpor_avx2(auVar100,auVar99);
  auVar100 = vpsrld_avx2(auVar26,0x12);
  auVar163 = vpslld_avx2(auVar26,0xe);
  auVar100 = vpor_avx2(auVar163,auVar100);
  auVar163 = vpsrld_avx2(auVar26,3);
  auVar20 = vpaddd_avx2(auVar20,auVar100 ^ auVar99 ^ auVar163);
  auVar20 = vpaddd_avx2(auVar20,auVar98 ^ auVar142 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar160,6);
  auVar98 = vpslld_avx2(auVar160,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0xb);
  auVar98 = vpslld_avx2(auVar160,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0x19);
  auVar98 = vpslld_avx2(auVar160,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar160,auVar113);
  auVar142 = vpand_avx2(auVar170,auVar160);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar89 = vpaddd_avx2(auVar20,auVar89);
  auVar89 = vpaddd_avx2(auVar89,auVar142);
  auVar89 = vpaddd_avx2(auVar89,auVar101);
  auVar89 = vpaddd_avx2(auVar89,auVar100 ^ auVar99 ^ auVar115);
  auVar142 = vpsrld_avx2(auVar51,2);
  auVar98 = vpslld_avx2(auVar51,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar51,0xd);
  auVar98 = vpslld_avx2(auVar51,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar51,0x16);
  auVar98 = vpslld_avx2(auVar51,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar51,auVar114);
  auVar142 = vpand_avx2(auVar142,auVar169);
  auVar98 = vpand_avx2(auVar51,auVar114);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar161 = vpaddd_avx2(auVar161,auVar89);
  auVar89 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar89);
  auVar89 = vpaddd_avx2(auVar142,auVar89);
  auVar142 = vpsrld_avx2(auVar109,0x11);
  auVar98 = vpslld_avx2(auVar109,0xf);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpsrld_avx2(auVar109,0x13);
  auVar99 = vpslld_avx2(auVar109,0xd);
  auVar98 = vpor_avx2(auVar99,auVar98);
  auVar115 = vpsrld_avx2(auVar109,10);
  auVar99 = vpsrld_avx2(auVar4,7);
  auVar100 = vpslld_avx2(auVar4,0x19);
  auVar99 = vpor_avx2(auVar100,auVar99);
  auVar100 = vpsrld_avx2(auVar4,0x12);
  auVar163 = vpslld_avx2(auVar4,0xe);
  auVar100 = vpor_avx2(auVar163,auVar100);
  auVar163 = vpsrld_avx2(auVar4,3);
  auVar26 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar163,auVar26);
  auVar159._8_4_ = 0x100;
  auVar159._0_8_ = 0x10000000100;
  auVar159._12_4_ = 0x100;
  auVar159._16_4_ = 0x100;
  auVar159._20_4_ = 0x100;
  auVar159._24_4_ = 0x100;
  auVar159._28_4_ = 0x100;
  auVar26 = vpaddd_avx2(auVar26,auVar159);
  auVar26 = vpaddd_avx2(auVar26,auVar115 ^ auVar98 ^ auVar142);
  auVar142 = vpsrld_avx2(auVar161,6);
  auVar98 = vpslld_avx2(auVar161,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0xb);
  auVar98 = vpslld_avx2(auVar161,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0x19);
  auVar98 = vpslld_avx2(auVar161,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar161,auVar170);
  auVar142 = vpand_avx2(auVar160,auVar161);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar113 = vpaddd_avx2(auVar26,auVar113);
  auVar113 = vpaddd_avx2(auVar142,auVar113);
  auVar113 = vpaddd_avx2(auVar113,auVar29);
  auVar113 = vpaddd_avx2(auVar113,auVar115 ^ auVar100 ^ auVar99);
  auVar142 = vpsrld_avx2(auVar89,2);
  auVar98 = vpslld_avx2(auVar89,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar89,0xd);
  auVar98 = vpslld_avx2(auVar89,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar89,0x16);
  auVar98 = vpslld_avx2(auVar89,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar89,auVar51);
  auVar142 = vpand_avx2(auVar142,auVar114);
  auVar98 = vpand_avx2(auVar89,auVar51);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar169 = vpaddd_avx2(auVar113,auVar169);
  auVar113 = vpaddd_avx2(auVar115 ^ auVar100 ^ auVar99,auVar113);
  auVar113 = vpaddd_avx2(auVar142,auVar113);
  auVar142 = vpsrld_avx2(auVar20,0x11);
  auVar98 = vpslld_avx2(auVar20,0xf);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpsrld_avx2(auVar20,0x13);
  auVar99 = vpslld_avx2(auVar20,0xd);
  auVar98 = vpor_avx2(auVar99,auVar98);
  auVar99 = vpsrld_avx2(auVar20,10);
  auVar4 = vpaddd_avx2(auVar4,auVar88);
  auVar172._8_4_ = 0x11002000;
  auVar172._0_8_ = 0x1100200011002000;
  auVar172._12_4_ = 0x11002000;
  auVar172._16_4_ = 0x11002000;
  auVar172._20_4_ = 0x11002000;
  auVar172._24_4_ = 0x11002000;
  auVar172._28_4_ = 0x11002000;
  auVar4 = vpaddd_avx2(auVar4,auVar172);
  auVar4 = vpaddd_avx2(auVar4,auVar99 ^ auVar98 ^ auVar142);
  auVar142 = vpsrld_avx2(auVar169,6);
  auVar98 = vpslld_avx2(auVar169,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0xb);
  auVar98 = vpslld_avx2(auVar169,0x15);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar169,0x19);
  auVar98 = vpslld_avx2(auVar169,7);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar169,auVar160);
  auVar142 = vpand_avx2(auVar161,auVar169);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar170 = vpaddd_avx2(auVar4,auVar170);
  auVar170 = vpaddd_avx2(auVar170,auVar142);
  auVar170 = vpaddd_avx2(auVar170,auVar116);
  auVar170 = vpaddd_avx2(auVar170,auVar115 ^ auVar100 ^ auVar99);
  auVar142 = vpsrld_avx2(auVar113,2);
  auVar98 = vpslld_avx2(auVar113,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0xd);
  auVar98 = vpslld_avx2(auVar113,0x13);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar113,0x16);
  auVar98 = vpslld_avx2(auVar113,10);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar113,auVar89);
  auVar142 = vpand_avx2(auVar142,auVar51);
  auVar98 = vpand_avx2(auVar113,auVar89);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar114 = vpaddd_avx2(auVar170,auVar114);
  auVar170 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar170);
  auVar170 = vpaddd_avx2(auVar142,auVar170);
  auVar142 = vpsrld_avx2(auVar26,0x11);
  auVar98 = vpslld_avx2(auVar26,0xf);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar26,0x13);
  auVar98 = vpslld_avx2(auVar26,0xd);
  auVar100 = vpor_avx2(auVar98,auVar142);
  auVar165 = vpsrld_avx2(auVar26,10);
  auVar173._8_4_ = 0x80000000;
  auVar173._0_8_ = 0x8000000080000000;
  auVar173._12_4_ = 0x80000000;
  auVar173._16_4_ = 0x80000000;
  auVar173._20_4_ = 0x80000000;
  auVar173._24_4_ = 0x80000000;
  auVar173._28_4_ = 0x80000000;
  auVar142 = vpsrld_avx2(auVar114,6);
  auVar98 = vpslld_avx2(auVar114,0x1a);
  auVar115 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpsrld_avx2(auVar114,0xb);
  auVar142 = vpslld_avx2(auVar114,0x15);
  auVar163 = vpor_avx2(auVar142,auVar98);
  auVar142 = vpsrld_avx2(auVar114,0x19);
  auVar98 = vpslld_avx2(auVar114,7);
  auVar164 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar114,auVar161);
  auVar142 = vpand_avx2(auVar114,auVar169);
  auVar98 = vpor_avx2(auVar142,auVar98);
  auVar142 = vpaddd_avx2(auVar165 ^ auVar173 ^ auVar100 ^ auVar99,auVar21);
  auVar160 = vpaddd_avx2(auVar142,auVar160);
  auVar160 = vpaddd_avx2(auVar98,auVar160);
  auVar160 = vpaddd_avx2(auVar160,auVar117);
  auVar160 = vpaddd_avx2(auVar163 ^ auVar115 ^ auVar164,auVar160);
  auVar98 = vpsrld_avx2(auVar170,2);
  auVar99 = vpslld_avx2(auVar170,0x1e);
  auVar100 = vpor_avx2(auVar99,auVar98);
  auVar98 = vpsrld_avx2(auVar170,0xd);
  auVar99 = vpslld_avx2(auVar170,0x13);
  auVar115 = vpor_avx2(auVar99,auVar98);
  auVar98 = vpsrld_avx2(auVar170,0x16);
  auVar99 = vpslld_avx2(auVar170,10);
  auVar163 = vpor_avx2(auVar99,auVar98);
  auVar98 = vpor_avx2(auVar170,auVar113);
  auVar98 = vpand_avx2(auVar98,auVar89);
  auVar99 = vpand_avx2(auVar170,auVar113);
  auVar98 = vpor_avx2(auVar99,auVar98);
  auVar51 = vpaddd_avx2(auVar160,auVar51);
  auVar160 = vpaddd_avx2(auVar163 ^ auVar115 ^ auVar100,auVar160);
  auVar160 = vpaddd_avx2(auVar98,auVar160);
  auVar98 = vpsrld_avx2(auVar4,0x11);
  auVar99 = vpslld_avx2(auVar4,0xf);
  auVar100 = vpor_avx2(auVar99,auVar98);
  auVar98 = vpsrld_avx2(auVar4,0x13);
  auVar99 = vpslld_avx2(auVar4,0xd);
  auVar115 = vpor_avx2(auVar99,auVar98);
  auVar166 = vpsrld_avx2(auVar4,10);
  auVar98 = vpsrld_avx2(auVar51,6);
  auVar99 = vpslld_avx2(auVar51,0x1a);
  auVar163 = vpor_avx2(auVar99,auVar98);
  auVar98 = vpsrld_avx2(auVar51,0xb);
  auVar99 = vpslld_avx2(auVar51,0x15);
  auVar164 = vpor_avx2(auVar99,auVar98);
  auVar98 = vpsrld_avx2(auVar51,0x19);
  auVar99 = vpslld_avx2(auVar51,7);
  auVar165 = vpor_avx2(auVar99,auVar98);
  auVar99 = vpandn_avx2(auVar51,auVar169);
  auVar98 = vpand_avx2(auVar114,auVar51);
  auVar99 = vpor_avx2(auVar98,auVar99);
  auVar98 = vpaddd_avx2(auVar166 ^ auVar115 ^ auVar100,auVar10);
  auVar161 = vpaddd_avx2(auVar98,auVar161);
  auVar161 = vpaddd_avx2(auVar99,auVar161);
  auVar161 = vpaddd_avx2(auVar161,auVar118);
  auVar161 = vpaddd_avx2(auVar164 ^ auVar163 ^ auVar165,auVar161);
  auVar99 = vpsrld_avx2(auVar160,2);
  auVar100 = vpslld_avx2(auVar160,0x1e);
  auVar115 = vpor_avx2(auVar100,auVar99);
  auVar99 = vpsrld_avx2(auVar160,0xd);
  auVar100 = vpslld_avx2(auVar160,0x13);
  auVar163 = vpor_avx2(auVar100,auVar99);
  auVar99 = vpsrld_avx2(auVar160,0x16);
  auVar100 = vpslld_avx2(auVar160,10);
  auVar164 = vpor_avx2(auVar100,auVar99);
  auVar99 = vpor_avx2(auVar160,auVar170);
  auVar99 = vpand_avx2(auVar99,auVar113);
  auVar100 = vpand_avx2(auVar160,auVar170);
  auVar99 = vpor_avx2(auVar99,auVar100);
  auVar89 = vpaddd_avx2(auVar161,auVar89);
  auVar161 = vpaddd_avx2(auVar164 ^ auVar163 ^ auVar115,auVar161);
  auVar161 = vpaddd_avx2(auVar99,auVar161);
  auVar99 = vpsrld_avx2(auVar142,0x11);
  auVar100 = vpslld_avx2(auVar142,0xf);
  auVar115 = vpor_avx2(auVar100,auVar99);
  auVar99 = vpsrld_avx2(auVar142,0x13);
  auVar100 = vpslld_avx2(auVar142,0xd);
  auVar163 = vpor_avx2(auVar100,auVar99);
  auVar167 = vpsrld_avx2(auVar142,10);
  auVar99 = vpsrld_avx2(auVar89,6);
  auVar100 = vpslld_avx2(auVar89,0x1a);
  auVar164 = vpor_avx2(auVar100,auVar99);
  auVar99 = vpsrld_avx2(auVar89,0xb);
  auVar100 = vpslld_avx2(auVar89,0x15);
  auVar165 = vpor_avx2(auVar100,auVar99);
  auVar99 = vpsrld_avx2(auVar89,0x19);
  auVar100 = vpslld_avx2(auVar89,7);
  auVar166 = vpor_avx2(auVar100,auVar99);
  auVar100 = vpandn_avx2(auVar89,auVar114);
  auVar99 = vpand_avx2(auVar51,auVar89);
  auVar100 = vpor_avx2(auVar99,auVar100);
  auVar99 = vpaddd_avx2(auVar167 ^ auVar163 ^ auVar115,auVar13);
  auVar169 = vpaddd_avx2(auVar99,auVar169);
  auVar169 = vpaddd_avx2(auVar100,auVar169);
  auVar169 = vpaddd_avx2(auVar169,auVar119);
  auVar169 = vpaddd_avx2(auVar165 ^ auVar164 ^ auVar166,auVar169);
  auVar100 = vpsrld_avx2(auVar161,2);
  auVar115 = vpslld_avx2(auVar161,0x1e);
  auVar163 = vpor_avx2(auVar115,auVar100);
  auVar100 = vpsrld_avx2(auVar161,0xd);
  auVar115 = vpslld_avx2(auVar161,0x13);
  auVar164 = vpor_avx2(auVar115,auVar100);
  auVar100 = vpsrld_avx2(auVar161,0x16);
  auVar115 = vpslld_avx2(auVar161,10);
  auVar165 = vpor_avx2(auVar115,auVar100);
  auVar100 = vpor_avx2(auVar161,auVar160);
  auVar100 = vpand_avx2(auVar100,auVar170);
  auVar115 = vpand_avx2(auVar161,auVar160);
  auVar100 = vpor_avx2(auVar100,auVar115);
  auVar113 = vpaddd_avx2(auVar169,auVar113);
  auVar169 = vpaddd_avx2(auVar165 ^ auVar164 ^ auVar163,auVar169);
  auVar169 = vpaddd_avx2(auVar100,auVar169);
  auVar100 = vpsrld_avx2(auVar98,0x11);
  auVar115 = vpslld_avx2(auVar98,0xf);
  auVar163 = vpor_avx2(auVar115,auVar100);
  auVar100 = vpsrld_avx2(auVar98,0x13);
  auVar115 = vpslld_avx2(auVar98,0xd);
  auVar164 = vpor_avx2(auVar115,auVar100);
  auVar168 = vpsrld_avx2(auVar98,10);
  auVar100 = vpsrld_avx2(auVar113,6);
  auVar115 = vpslld_avx2(auVar113,0x1a);
  auVar165 = vpor_avx2(auVar115,auVar100);
  auVar100 = vpsrld_avx2(auVar113,0xb);
  auVar115 = vpslld_avx2(auVar113,0x15);
  auVar166 = vpor_avx2(auVar115,auVar100);
  auVar100 = vpsrld_avx2(auVar113,0x19);
  auVar115 = vpslld_avx2(auVar113,7);
  auVar167 = vpor_avx2(auVar115,auVar100);
  auVar115 = vpandn_avx2(auVar113,auVar51);
  auVar100 = vpand_avx2(auVar113,auVar89);
  auVar115 = vpor_avx2(auVar100,auVar115);
  auVar100 = vpaddd_avx2(auVar164 ^ auVar163 ^ auVar168,auVar109);
  auVar114 = vpaddd_avx2(auVar100,auVar114);
  auVar114 = vpaddd_avx2(auVar115,auVar114);
  auVar114 = vpaddd_avx2(auVar114,auVar120);
  auVar114 = vpaddd_avx2(auVar114,auVar167 ^ auVar166 ^ auVar165);
  auVar115 = vpsrld_avx2(auVar169,2);
  auVar163 = vpslld_avx2(auVar169,0x1e);
  auVar164 = vpor_avx2(auVar163,auVar115);
  auVar115 = vpsrld_avx2(auVar169,0xd);
  auVar163 = vpslld_avx2(auVar169,0x13);
  auVar165 = vpor_avx2(auVar163,auVar115);
  auVar115 = vpsrld_avx2(auVar169,0x16);
  auVar163 = vpslld_avx2(auVar169,10);
  auVar166 = vpor_avx2(auVar163,auVar115);
  auVar115 = vpor_avx2(auVar169,auVar161);
  auVar115 = vpand_avx2(auVar115,auVar160);
  auVar163 = vpand_avx2(auVar169,auVar161);
  auVar115 = vpor_avx2(auVar163,auVar115);
  auVar170 = vpaddd_avx2(auVar114,auVar170);
  auVar114 = vpaddd_avx2(auVar166 ^ auVar165 ^ auVar164,auVar114);
  auVar114 = vpaddd_avx2(auVar115,auVar114);
  auVar115 = vpsrld_avx2(auVar99,0x11);
  auVar163 = vpslld_avx2(auVar99,0xf);
  auVar164 = vpor_avx2(auVar163,auVar115);
  auVar115 = vpsrld_avx2(auVar99,0x13);
  auVar163 = vpslld_avx2(auVar99,0xd);
  auVar165 = vpor_avx2(auVar163,auVar115);
  auVar151 = vpsrld_avx2(auVar99,10);
  auVar115 = vpsrld_avx2(auVar170,6);
  auVar163 = vpslld_avx2(auVar170,0x1a);
  auVar166 = vpor_avx2(auVar163,auVar115);
  auVar115 = vpsrld_avx2(auVar170,0xb);
  auVar163 = vpslld_avx2(auVar170,0x15);
  auVar167 = vpor_avx2(auVar163,auVar115);
  auVar115 = vpsrld_avx2(auVar170,0x19);
  auVar163 = vpslld_avx2(auVar170,7);
  auVar168 = vpor_avx2(auVar163,auVar115);
  auVar163 = vpandn_avx2(auVar170,auVar89);
  auVar115 = vpand_avx2(auVar113,auVar170);
  auVar163 = vpor_avx2(auVar115,auVar163);
  auVar115 = vpaddd_avx2(auVar151 ^ auVar165 ^ auVar164,auVar20);
  auVar51 = vpaddd_avx2(auVar115,auVar51);
  auVar51 = vpaddd_avx2(auVar163,auVar51);
  auVar51 = vpaddd_avx2(auVar51,auVar121);
  auVar51 = vpaddd_avx2(auVar167 ^ auVar166 ^ auVar168,auVar51);
  auVar163 = vpsrld_avx2(auVar114,2);
  auVar164 = vpslld_avx2(auVar114,0x1e);
  auVar165 = vpor_avx2(auVar164,auVar163);
  auVar163 = vpsrld_avx2(auVar114,0xd);
  auVar164 = vpslld_avx2(auVar114,0x13);
  auVar166 = vpor_avx2(auVar164,auVar163);
  auVar163 = vpsrld_avx2(auVar114,0x16);
  auVar164 = vpslld_avx2(auVar114,10);
  auVar167 = vpor_avx2(auVar164,auVar163);
  auVar163 = vpor_avx2(auVar114,auVar169);
  auVar163 = vpand_avx2(auVar163,auVar161);
  auVar164 = vpand_avx2(auVar114,auVar169);
  auVar163 = vpor_avx2(auVar164,auVar163);
  auVar160 = vpaddd_avx2(auVar51,auVar160);
  auVar51 = vpaddd_avx2(auVar167 ^ auVar166 ^ auVar165,auVar51);
  auVar51 = vpaddd_avx2(auVar163,auVar51);
  auVar163 = vpsrld_avx2(auVar100,0x11);
  auVar164 = vpslld_avx2(auVar100,0xf);
  auVar165 = vpor_avx2(auVar164,auVar163);
  auVar163 = vpsrld_avx2(auVar100,0x13);
  auVar164 = vpslld_avx2(auVar100,0xd);
  auVar166 = vpor_avx2(auVar164,auVar163);
  auVar152 = vpsrld_avx2(auVar100,10);
  auVar163 = vpsrld_avx2(auVar160,6);
  auVar164 = vpslld_avx2(auVar160,0x1a);
  auVar167 = vpor_avx2(auVar164,auVar163);
  auVar163 = vpsrld_avx2(auVar160,0xb);
  auVar164 = vpslld_avx2(auVar160,0x15);
  auVar168 = vpor_avx2(auVar164,auVar163);
  auVar163 = vpsrld_avx2(auVar160,0x19);
  auVar164 = vpslld_avx2(auVar160,7);
  auVar151 = vpor_avx2(auVar164,auVar163);
  auVar164 = vpandn_avx2(auVar160,auVar113);
  auVar163 = vpand_avx2(auVar170,auVar160);
  auVar164 = vpor_avx2(auVar163,auVar164);
  auVar163 = vpaddd_avx2(auVar152 ^ auVar166 ^ auVar165,auVar26);
  auVar89 = vpaddd_avx2(auVar163,auVar89);
  auVar89 = vpaddd_avx2(auVar164,auVar89);
  auVar89 = vpaddd_avx2(auVar89,auVar143);
  auVar89 = vpaddd_avx2(auVar168 ^ auVar167 ^ auVar151,auVar89);
  auVar164 = vpsrld_avx2(auVar51,2);
  auVar165 = vpslld_avx2(auVar51,0x1e);
  auVar166 = vpor_avx2(auVar165,auVar164);
  auVar164 = vpsrld_avx2(auVar51,0xd);
  auVar165 = vpslld_avx2(auVar51,0x13);
  auVar167 = vpor_avx2(auVar165,auVar164);
  auVar164 = vpsrld_avx2(auVar51,0x16);
  auVar165 = vpslld_avx2(auVar51,10);
  auVar168 = vpor_avx2(auVar165,auVar164);
  auVar164 = vpor_avx2(auVar51,auVar114);
  auVar164 = vpand_avx2(auVar164,auVar169);
  auVar165 = vpand_avx2(auVar51,auVar114);
  auVar164 = vpor_avx2(auVar164,auVar165);
  auVar161 = vpaddd_avx2(auVar89,auVar161);
  auVar89 = vpaddd_avx2(auVar168 ^ auVar167 ^ auVar166,auVar89);
  auVar89 = vpaddd_avx2(auVar164,auVar89);
  auVar164 = vpsrld_avx2(auVar115,0x11);
  auVar165 = vpslld_avx2(auVar115,0xf);
  auVar166 = vpor_avx2(auVar165,auVar164);
  auVar164 = vpsrld_avx2(auVar115,0x13);
  auVar165 = vpslld_avx2(auVar115,0xd);
  auVar167 = vpor_avx2(auVar165,auVar164);
  auVar148 = vpsrld_avx2(auVar115,10);
  auVar164 = vpsrld_avx2(auVar161,6);
  auVar165 = vpslld_avx2(auVar161,0x1a);
  auVar168 = vpor_avx2(auVar165,auVar164);
  auVar164 = vpsrld_avx2(auVar161,0xb);
  auVar165 = vpslld_avx2(auVar161,0x15);
  auVar151 = vpor_avx2(auVar165,auVar164);
  auVar164 = vpsrld_avx2(auVar161,0x19);
  auVar165 = vpslld_avx2(auVar161,7);
  auVar152 = vpor_avx2(auVar165,auVar164);
  auVar165 = vpandn_avx2(auVar161,auVar170);
  auVar164 = vpand_avx2(auVar160,auVar161);
  auVar153 = vpor_avx2(auVar164,auVar165);
  auVar164 = vpaddd_avx2(auVar148 ^ auVar167 ^ auVar166,auVar4);
  auVar174._8_4_ = 0x400022;
  auVar174._0_8_ = 0x40002200400022;
  auVar174._12_4_ = 0x400022;
  auVar174._16_4_ = 0x400022;
  auVar174._20_4_ = 0x400022;
  auVar174._24_4_ = 0x400022;
  auVar174._28_4_ = 0x400022;
  auVar165 = vpaddd_avx2(auVar174,auVar164);
  auVar113 = vpaddd_avx2(auVar113,auVar164);
  auVar113 = vpaddd_avx2(auVar153,auVar113);
  auVar136._8_4_ = 0x70a6373;
  auVar136._0_8_ = 0x70a6373070a6373;
  auVar136._12_4_ = 0x70a6373;
  auVar136._16_4_ = 0x70a6373;
  auVar136._20_4_ = 0x70a6373;
  auVar136._24_4_ = 0x70a6373;
  auVar136._28_4_ = 0x70a6373;
  auVar113 = vpaddd_avx2(auVar136,auVar113);
  auVar113 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar113);
  auVar164 = vpsrld_avx2(auVar89,2);
  auVar166 = vpslld_avx2(auVar89,0x1e);
  auVar167 = vpor_avx2(auVar166,auVar164);
  auVar164 = vpsrld_avx2(auVar89,0xd);
  auVar166 = vpslld_avx2(auVar89,0x13);
  auVar168 = vpor_avx2(auVar166,auVar164);
  auVar164 = vpsrld_avx2(auVar89,0x16);
  auVar166 = vpslld_avx2(auVar89,10);
  auVar151 = vpor_avx2(auVar166,auVar164);
  auVar164 = vpor_avx2(auVar89,auVar51);
  auVar164 = vpand_avx2(auVar164,auVar114);
  auVar166 = vpand_avx2(auVar89,auVar51);
  auVar164 = vpor_avx2(auVar164,auVar166);
  auVar169 = vpaddd_avx2(auVar113,auVar169);
  auVar113 = vpaddd_avx2(auVar168 ^ auVar167 ^ auVar151,auVar113);
  auVar113 = vpaddd_avx2(auVar164,auVar113);
  auVar164 = vpsrld_avx2(auVar163,0x11);
  auVar166 = vpslld_avx2(auVar163,0xf);
  auVar166 = vpor_avx2(auVar166,auVar164);
  auVar164 = vpsrld_avx2(auVar163,0x13);
  auVar167 = vpslld_avx2(auVar163,0xd);
  auVar167 = vpor_avx2(auVar167,auVar164);
  auVar151 = vpsrld_avx2(auVar163,10);
  auVar164 = vpsrld_avx2(auVar88,7);
  auVar168 = vpslld_avx2(auVar88,0x19);
  auVar164 = vpor_avx2(auVar168,auVar164);
  auVar168 = vpsrld_avx2(auVar88,0x12);
  auVar152 = vpslld_avx2(auVar88,0xe);
  auVar168 = vpor_avx2(auVar152,auVar168);
  auVar152 = vpsrld_avx2(auVar88,3);
  auVar164 = vpaddd_avx2(auVar168 ^ auVar164 ^ auVar152,auVar142);
  auVar164 = vpaddd_avx2(auVar164,auVar159);
  auVar164 = vpaddd_avx2(auVar164,auVar151 ^ auVar167 ^ auVar166);
  auVar166 = vpsrld_avx2(auVar169,6);
  auVar167 = vpslld_avx2(auVar169,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar169,0xb);
  auVar167 = vpslld_avx2(auVar169,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar169,0x19);
  auVar167 = vpslld_avx2(auVar169,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar169,auVar160);
  auVar166 = vpand_avx2(auVar169,auVar161);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar170 = vpaddd_avx2(auVar164,auVar170);
  auVar170 = vpaddd_avx2(auVar166,auVar170);
  auVar170 = vpaddd_avx2(auVar170,auVar123);
  auVar170 = vpaddd_avx2(auVar170,auVar152 ^ auVar151 ^ auVar168);
  auVar166 = vpsrld_avx2(auVar113,2);
  auVar167 = vpslld_avx2(auVar113,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar113,0xd);
  auVar167 = vpslld_avx2(auVar113,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar113,0x16);
  auVar167 = vpslld_avx2(auVar113,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar113,auVar89);
  auVar166 = vpand_avx2(auVar166,auVar51);
  auVar167 = vpand_avx2(auVar113,auVar89);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar114 = vpaddd_avx2(auVar170,auVar114);
  auVar170 = vpaddd_avx2(auVar152 ^ auVar151 ^ auVar168,auVar170);
  auVar170 = vpaddd_avx2(auVar166,auVar170);
  auVar166 = vpsrld_avx2(auVar165,0x11);
  auVar167 = vpslld_avx2(auVar165,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar165,0x13);
  auVar168 = vpslld_avx2(auVar165,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar165,10);
  auVar168 = vpsrld_avx2(auVar21,7);
  auVar151 = vpslld_avx2(auVar21,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar21,0x12);
  auVar153 = vpslld_avx2(auVar21,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar21,3);
  auVar88 = vpaddd_avx2(auVar88,auVar153 ^ auVar151 ^ auVar168);
  auVar88 = vpaddd_avx2(auVar88,auVar98);
  auVar88 = vpaddd_avx2(auVar88,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar114,6);
  auVar167 = vpslld_avx2(auVar114,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar114,0xb);
  auVar167 = vpslld_avx2(auVar114,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar114,0x19);
  auVar167 = vpslld_avx2(auVar114,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar114,auVar161);
  auVar166 = vpand_avx2(auVar169,auVar114);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar160 = vpaddd_avx2(auVar88,auVar160);
  auVar160 = vpaddd_avx2(auVar160,auVar166);
  auVar160 = vpaddd_avx2(auVar160,auVar124);
  auVar160 = vpaddd_avx2(auVar160,auVar151 ^ auVar168 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar170,2);
  auVar167 = vpslld_avx2(auVar170,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar170,0xd);
  auVar167 = vpslld_avx2(auVar170,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar170,0x16);
  auVar167 = vpslld_avx2(auVar170,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar170,auVar113);
  auVar166 = vpand_avx2(auVar166,auVar89);
  auVar167 = vpand_avx2(auVar170,auVar113);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar51 = vpaddd_avx2(auVar160,auVar51);
  auVar160 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar160);
  auVar160 = vpaddd_avx2(auVar166,auVar160);
  auVar166 = vpsrld_avx2(auVar164,0x11);
  auVar167 = vpslld_avx2(auVar164,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar164,0x13);
  auVar168 = vpslld_avx2(auVar164,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar164,10);
  auVar168 = vpsrld_avx2(auVar10,7);
  auVar151 = vpslld_avx2(auVar10,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar10,0x12);
  auVar153 = vpslld_avx2(auVar10,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar10,3);
  auVar21 = vpaddd_avx2(auVar21,auVar153 ^ auVar151 ^ auVar168);
  auVar21 = vpaddd_avx2(auVar21,auVar99);
  auVar21 = vpaddd_avx2(auVar21,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar51,6);
  auVar167 = vpslld_avx2(auVar51,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar51,0xb);
  auVar167 = vpslld_avx2(auVar51,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar51,0x19);
  auVar167 = vpslld_avx2(auVar51,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar51,auVar169);
  auVar166 = vpand_avx2(auVar114,auVar51);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar161 = vpaddd_avx2(auVar21,auVar161);
  auVar161 = vpaddd_avx2(auVar161,auVar166);
  auVar161 = vpaddd_avx2(auVar161,auVar144);
  auVar161 = vpaddd_avx2(auVar161,auVar151 ^ auVar168 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar160,2);
  auVar167 = vpslld_avx2(auVar160,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar160,0xd);
  auVar167 = vpslld_avx2(auVar160,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar160,0x16);
  auVar167 = vpslld_avx2(auVar160,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar160,auVar170);
  auVar166 = vpand_avx2(auVar166,auVar113);
  auVar167 = vpand_avx2(auVar160,auVar170);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar89 = vpaddd_avx2(auVar161,auVar89);
  auVar161 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar161);
  auVar161 = vpaddd_avx2(auVar161,auVar166);
  auVar166 = vpsrld_avx2(auVar88,0x11);
  auVar167 = vpslld_avx2(auVar88,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar88,0x13);
  auVar168 = vpslld_avx2(auVar88,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar88,10);
  auVar168 = vpsrld_avx2(auVar13,7);
  auVar151 = vpslld_avx2(auVar13,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar13,0x12);
  auVar153 = vpslld_avx2(auVar13,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar13,3);
  auVar10 = vpaddd_avx2(auVar10,auVar151 ^ auVar168 ^ auVar153);
  auVar10 = vpaddd_avx2(auVar10,auVar100);
  auVar10 = vpaddd_avx2(auVar10,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar89,6);
  auVar167 = vpslld_avx2(auVar89,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar89,0xb);
  auVar167 = vpslld_avx2(auVar89,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar89,0x19);
  auVar167 = vpslld_avx2(auVar89,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar89,auVar114);
  auVar166 = vpand_avx2(auVar89,auVar51);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar169 = vpaddd_avx2(auVar10,auVar169);
  auVar169 = vpaddd_avx2(auVar169,auVar166);
  auVar169 = vpaddd_avx2(auVar169,auVar125);
  auVar169 = vpaddd_avx2(auVar169,auVar151 ^ auVar168 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar161,2);
  auVar167 = vpslld_avx2(auVar161,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar161,0xd);
  auVar167 = vpslld_avx2(auVar161,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar161,0x16);
  auVar167 = vpslld_avx2(auVar161,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar161,auVar160);
  auVar166 = vpand_avx2(auVar166,auVar170);
  auVar167 = vpand_avx2(auVar161,auVar160);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar113 = vpaddd_avx2(auVar169,auVar113);
  auVar169 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar169);
  auVar169 = vpaddd_avx2(auVar169,auVar166);
  auVar166 = vpsrld_avx2(auVar21,0x11);
  auVar167 = vpslld_avx2(auVar21,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar21,0x13);
  auVar168 = vpslld_avx2(auVar21,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar21,10);
  auVar168 = vpsrld_avx2(auVar109,7);
  auVar151 = vpslld_avx2(auVar109,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar109,0x12);
  auVar153 = vpslld_avx2(auVar109,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar109,3);
  auVar13 = vpaddd_avx2(auVar13,auVar153 ^ auVar151 ^ auVar168);
  auVar13 = vpaddd_avx2(auVar13,auVar115);
  auVar13 = vpaddd_avx2(auVar13,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar113,6);
  auVar167 = vpslld_avx2(auVar113,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar113,0xb);
  auVar167 = vpslld_avx2(auVar113,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar113,0x19);
  auVar167 = vpslld_avx2(auVar113,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar113,auVar51);
  auVar166 = vpand_avx2(auVar89,auVar113);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar114 = vpaddd_avx2(auVar13,auVar114);
  auVar114 = vpaddd_avx2(auVar114,auVar166);
  auVar114 = vpaddd_avx2(auVar114,auVar126);
  auVar114 = vpaddd_avx2(auVar114,auVar151 ^ auVar168 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar169,2);
  auVar167 = vpslld_avx2(auVar169,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar169,0xd);
  auVar167 = vpslld_avx2(auVar169,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar169,0x16);
  auVar167 = vpslld_avx2(auVar169,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar169,auVar161);
  auVar166 = vpand_avx2(auVar166,auVar160);
  auVar167 = vpand_avx2(auVar169,auVar161);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar170 = vpaddd_avx2(auVar114,auVar170);
  auVar114 = vpaddd_avx2(auVar152 ^ auVar151 ^ auVar168,auVar114);
  auVar114 = vpaddd_avx2(auVar166,auVar114);
  auVar166 = vpsrld_avx2(auVar10,0x11);
  auVar167 = vpslld_avx2(auVar10,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar10,0x13);
  auVar168 = vpslld_avx2(auVar10,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar10,10);
  auVar168 = vpsrld_avx2(auVar20,7);
  auVar151 = vpslld_avx2(auVar20,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar20,0x12);
  auVar153 = vpslld_avx2(auVar20,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar20,3);
  auVar109 = vpaddd_avx2(auVar109,auVar151 ^ auVar168 ^ auVar153);
  auVar109 = vpaddd_avx2(auVar109,auVar163);
  auVar109 = vpaddd_avx2(auVar109,auVar152 ^ auVar167 ^ auVar166);
  auVar166 = vpsrld_avx2(auVar170,6);
  auVar167 = vpslld_avx2(auVar170,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar170,0xb);
  auVar167 = vpslld_avx2(auVar170,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar170,0x19);
  auVar167 = vpslld_avx2(auVar170,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar170,auVar89);
  auVar166 = vpand_avx2(auVar113,auVar170);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar51 = vpaddd_avx2(auVar109,auVar51);
  auVar51 = vpaddd_avx2(auVar166,auVar51);
  auVar51 = vpaddd_avx2(auVar51,auVar127);
  auVar51 = vpaddd_avx2(auVar51,auVar152 ^ auVar151 ^ auVar168);
  auVar166 = vpsrld_avx2(auVar114,2);
  auVar167 = vpslld_avx2(auVar114,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar114,0xd);
  auVar167 = vpslld_avx2(auVar114,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar114,0x16);
  auVar167 = vpslld_avx2(auVar114,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar114,auVar169);
  auVar166 = vpand_avx2(auVar166,auVar161);
  auVar167 = vpand_avx2(auVar114,auVar169);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar160 = vpaddd_avx2(auVar51,auVar160);
  auVar51 = vpaddd_avx2(auVar152 ^ auVar151 ^ auVar168,auVar51);
  auVar51 = vpaddd_avx2(auVar166,auVar51);
  auVar166 = vpsrld_avx2(auVar13,0x11);
  auVar167 = vpslld_avx2(auVar13,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar13,0x13);
  auVar168 = vpslld_avx2(auVar13,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar13,10);
  auVar168 = vpsrld_avx2(auVar26,7);
  auVar151 = vpslld_avx2(auVar26,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar26,0x12);
  auVar153 = vpslld_avx2(auVar26,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar26,3);
  auVar20 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar153,auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar165);
  auVar20 = vpaddd_avx2(auVar20,auVar152 ^ auVar167 ^ auVar166);
  auVar166 = vpsrld_avx2(auVar160,6);
  auVar167 = vpslld_avx2(auVar160,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar160,0xb);
  auVar167 = vpslld_avx2(auVar160,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar160,0x19);
  auVar167 = vpslld_avx2(auVar160,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar160,auVar113);
  auVar166 = vpand_avx2(auVar170,auVar160);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar89 = vpaddd_avx2(auVar20,auVar89);
  auVar89 = vpaddd_avx2(auVar89,auVar166);
  auVar89 = vpaddd_avx2(auVar89,auVar145);
  auVar89 = vpaddd_avx2(auVar89,auVar152 ^ auVar151 ^ auVar168);
  auVar166 = vpsrld_avx2(auVar51,2);
  auVar167 = vpslld_avx2(auVar51,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar51,0xd);
  auVar167 = vpslld_avx2(auVar51,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar51,0x16);
  auVar167 = vpslld_avx2(auVar51,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar51,auVar114);
  auVar166 = vpand_avx2(auVar166,auVar169);
  auVar167 = vpand_avx2(auVar51,auVar114);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar161 = vpaddd_avx2(auVar89,auVar161);
  auVar89 = vpaddd_avx2(auVar152 ^ auVar151 ^ auVar168,auVar89);
  auVar89 = vpaddd_avx2(auVar166,auVar89);
  auVar166 = vpsrld_avx2(auVar109,0x11);
  auVar167 = vpslld_avx2(auVar109,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar109,0x13);
  auVar168 = vpslld_avx2(auVar109,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar109,10);
  auVar168 = vpsrld_avx2(auVar4,7);
  auVar151 = vpslld_avx2(auVar4,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar4,0x12);
  auVar153 = vpslld_avx2(auVar4,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar4,3);
  auVar26 = vpaddd_avx2(auVar26,auVar151 ^ auVar168 ^ auVar153);
  auVar26 = vpaddd_avx2(auVar26,auVar164);
  auVar26 = vpaddd_avx2(auVar26,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar161,6);
  auVar167 = vpslld_avx2(auVar161,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar161,0xb);
  auVar167 = vpslld_avx2(auVar161,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar161,0x19);
  auVar167 = vpslld_avx2(auVar161,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar161,auVar170);
  auVar166 = vpand_avx2(auVar160,auVar161);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar113 = vpaddd_avx2(auVar26,auVar113);
  auVar113 = vpaddd_avx2(auVar166,auVar113);
  auVar113 = vpaddd_avx2(auVar113,auVar128);
  auVar113 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar113);
  auVar166 = vpsrld_avx2(auVar89,2);
  auVar167 = vpslld_avx2(auVar89,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar89,0xd);
  auVar167 = vpslld_avx2(auVar89,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar89,0x16);
  auVar167 = vpslld_avx2(auVar89,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar89,auVar51);
  auVar166 = vpand_avx2(auVar166,auVar114);
  auVar167 = vpand_avx2(auVar89,auVar51);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar169 = vpaddd_avx2(auVar113,auVar169);
  auVar113 = vpaddd_avx2(auVar152 ^ auVar151 ^ auVar168,auVar113);
  auVar113 = vpaddd_avx2(auVar166,auVar113);
  auVar166 = vpsrld_avx2(auVar20,0x11);
  auVar167 = vpslld_avx2(auVar20,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar20,0x13);
  auVar168 = vpslld_avx2(auVar20,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar20,10);
  auVar168 = vpsrld_avx2(auVar142,7);
  auVar151 = vpslld_avx2(auVar142,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar142,0x12);
  auVar153 = vpslld_avx2(auVar142,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar142,3);
  auVar4 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar153,auVar4);
  auVar4 = vpaddd_avx2(auVar4,auVar88);
  auVar4 = vpaddd_avx2(auVar4,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar169,6);
  auVar167 = vpslld_avx2(auVar169,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar169,0xb);
  auVar167 = vpslld_avx2(auVar169,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar169,0x19);
  auVar167 = vpslld_avx2(auVar169,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar169,auVar160);
  auVar166 = vpand_avx2(auVar161,auVar169);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar170 = vpaddd_avx2(auVar4,auVar170);
  auVar170 = vpaddd_avx2(auVar166,auVar170);
  auVar170 = vpaddd_avx2(auVar170,auVar129);
  auVar170 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar170);
  auVar166 = vpsrld_avx2(auVar113,2);
  auVar167 = vpslld_avx2(auVar113,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar113,0xd);
  auVar167 = vpslld_avx2(auVar113,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar113,0x16);
  auVar167 = vpslld_avx2(auVar113,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar113,auVar89);
  auVar166 = vpand_avx2(auVar166,auVar51);
  auVar167 = vpand_avx2(auVar113,auVar89);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar114 = vpaddd_avx2(auVar170,auVar114);
  auVar170 = vpaddd_avx2(auVar152 ^ auVar151 ^ auVar168,auVar170);
  auVar170 = vpaddd_avx2(auVar166,auVar170);
  auVar166 = vpsrld_avx2(auVar26,0x11);
  auVar167 = vpslld_avx2(auVar26,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar26,0x13);
  auVar168 = vpslld_avx2(auVar26,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar26,10);
  auVar168 = vpsrld_avx2(auVar98,7);
  auVar151 = vpslld_avx2(auVar98,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar98,0x12);
  auVar153 = vpslld_avx2(auVar98,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar98,3);
  auVar142 = vpaddd_avx2(auVar142,auVar151 ^ auVar168 ^ auVar153);
  auVar142 = vpaddd_avx2(auVar142,auVar21);
  auVar142 = vpaddd_avx2(auVar142,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar114,6);
  auVar167 = vpslld_avx2(auVar114,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar114,0xb);
  auVar167 = vpslld_avx2(auVar114,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar114,0x19);
  auVar167 = vpslld_avx2(auVar114,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar114,auVar161);
  auVar166 = vpand_avx2(auVar169,auVar114);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar160 = vpaddd_avx2(auVar142,auVar160);
  auVar160 = vpaddd_avx2(auVar166,auVar160);
  auVar160 = vpaddd_avx2(auVar160,auVar130);
  auVar160 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar160);
  auVar166 = vpsrld_avx2(auVar170,2);
  auVar167 = vpslld_avx2(auVar170,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar170,0xd);
  auVar167 = vpslld_avx2(auVar170,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar170,0x16);
  auVar167 = vpslld_avx2(auVar170,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar170,auVar113);
  auVar166 = vpand_avx2(auVar166,auVar89);
  auVar167 = vpand_avx2(auVar170,auVar113);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar51 = vpaddd_avx2(auVar160,auVar51);
  auVar160 = vpaddd_avx2(auVar152 ^ auVar151 ^ auVar168,auVar160);
  auVar160 = vpaddd_avx2(auVar166,auVar160);
  auVar166 = vpsrld_avx2(auVar4,0x11);
  auVar167 = vpslld_avx2(auVar4,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar4,0x13);
  auVar168 = vpslld_avx2(auVar4,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar4,10);
  auVar168 = vpsrld_avx2(auVar99,7);
  auVar151 = vpslld_avx2(auVar99,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar99,0x12);
  auVar153 = vpslld_avx2(auVar99,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar99,3);
  auVar98 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar153,auVar98);
  auVar98 = vpaddd_avx2(auVar98,auVar10);
  auVar98 = vpaddd_avx2(auVar98,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar51,6);
  auVar167 = vpslld_avx2(auVar51,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar51,0xb);
  auVar167 = vpslld_avx2(auVar51,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar51,0x19);
  auVar167 = vpslld_avx2(auVar51,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar51,auVar169);
  auVar166 = vpand_avx2(auVar114,auVar51);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar161 = vpaddd_avx2(auVar98,auVar161);
  auVar161 = vpaddd_avx2(auVar166,auVar161);
  auVar161 = vpaddd_avx2(auVar161,auVar131);
  auVar161 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar161);
  auVar166 = vpsrld_avx2(auVar160,2);
  auVar167 = vpslld_avx2(auVar160,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar160,0xd);
  auVar167 = vpslld_avx2(auVar160,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar160,0x16);
  auVar167 = vpslld_avx2(auVar160,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar160,auVar170);
  auVar166 = vpand_avx2(auVar166,auVar113);
  auVar167 = vpand_avx2(auVar160,auVar170);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar89 = vpaddd_avx2(auVar161,auVar89);
  auVar161 = vpaddd_avx2(auVar152 ^ auVar151 ^ auVar168,auVar161);
  auVar161 = vpaddd_avx2(auVar166,auVar161);
  auVar166 = vpsrld_avx2(auVar142,0x11);
  auVar167 = vpslld_avx2(auVar142,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar142,0x13);
  auVar168 = vpslld_avx2(auVar142,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar142,10);
  auVar168 = vpsrld_avx2(auVar100,7);
  auVar151 = vpslld_avx2(auVar100,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar100,0x12);
  auVar153 = vpslld_avx2(auVar100,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar100,3);
  auVar99 = vpaddd_avx2(auVar99,auVar151 ^ auVar168 ^ auVar153);
  auVar99 = vpaddd_avx2(auVar99,auVar13);
  auVar99 = vpaddd_avx2(auVar99,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar89,6);
  auVar167 = vpslld_avx2(auVar89,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar89,0xb);
  auVar167 = vpslld_avx2(auVar89,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar89,0x19);
  auVar167 = vpslld_avx2(auVar89,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar89,auVar114);
  auVar166 = vpand_avx2(auVar51,auVar89);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar169 = vpaddd_avx2(auVar99,auVar169);
  auVar169 = vpaddd_avx2(auVar166,auVar169);
  auVar169 = vpaddd_avx2(auVar169,auVar17);
  auVar169 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar169);
  auVar166 = vpsrld_avx2(auVar161,2);
  auVar167 = vpslld_avx2(auVar161,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar161,0xd);
  auVar167 = vpslld_avx2(auVar161,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar161,0x16);
  auVar167 = vpslld_avx2(auVar161,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar161,auVar160);
  auVar166 = vpand_avx2(auVar166,auVar170);
  auVar167 = vpand_avx2(auVar161,auVar160);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar113 = vpaddd_avx2(auVar169,auVar113);
  auVar169 = vpaddd_avx2(auVar152 ^ auVar151 ^ auVar168,auVar169);
  auVar169 = vpaddd_avx2(auVar166,auVar169);
  auVar166 = vpsrld_avx2(auVar98,0x11);
  auVar167 = vpslld_avx2(auVar98,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar98,0x13);
  auVar168 = vpslld_avx2(auVar98,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar98,10);
  auVar168 = vpsrld_avx2(auVar115,7);
  auVar151 = vpslld_avx2(auVar115,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar115,0x12);
  auVar153 = vpslld_avx2(auVar115,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar115,3);
  auVar100 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar153,auVar100);
  auVar100 = vpaddd_avx2(auVar100,auVar109);
  auVar100 = vpaddd_avx2(auVar100,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar113,6);
  auVar167 = vpslld_avx2(auVar113,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar113,0xb);
  auVar167 = vpslld_avx2(auVar113,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar113,0x19);
  auVar167 = vpslld_avx2(auVar113,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar113,auVar51);
  auVar166 = vpand_avx2(auVar89,auVar113);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar114 = vpaddd_avx2(auVar100,auVar114);
  auVar114 = vpaddd_avx2(auVar166,auVar114);
  auVar114 = vpaddd_avx2(auVar114,auVar18);
  auVar114 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar114);
  auVar166 = vpsrld_avx2(auVar169,2);
  auVar167 = vpslld_avx2(auVar169,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar169,0xd);
  auVar167 = vpslld_avx2(auVar169,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar169,0x16);
  auVar167 = vpslld_avx2(auVar169,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar169,auVar161);
  auVar166 = vpand_avx2(auVar166,auVar160);
  auVar167 = vpand_avx2(auVar169,auVar161);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar170 = vpaddd_avx2(auVar114,auVar170);
  auVar114 = vpaddd_avx2(auVar152 ^ auVar151 ^ auVar168,auVar114);
  auVar114 = vpaddd_avx2(auVar166,auVar114);
  auVar166 = vpsrld_avx2(auVar99,0x11);
  auVar167 = vpslld_avx2(auVar99,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar99,0x13);
  auVar168 = vpslld_avx2(auVar99,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar99,10);
  auVar168 = vpsrld_avx2(auVar163,7);
  auVar151 = vpslld_avx2(auVar163,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar163,0x12);
  auVar153 = vpslld_avx2(auVar163,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar163,3);
  auVar115 = vpaddd_avx2(auVar115,auVar151 ^ auVar168 ^ auVar153);
  auVar115 = vpaddd_avx2(auVar115,auVar20);
  auVar115 = vpaddd_avx2(auVar115,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar170,6);
  auVar167 = vpslld_avx2(auVar170,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar170,0xb);
  auVar167 = vpslld_avx2(auVar170,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar170,0x19);
  auVar167 = vpslld_avx2(auVar170,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar170,auVar89);
  auVar166 = vpand_avx2(auVar113,auVar170);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar51 = vpaddd_avx2(auVar115,auVar51);
  auVar51 = vpaddd_avx2(auVar166,auVar51);
  auVar51 = vpaddd_avx2(auVar51,auVar102);
  auVar51 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar51);
  auVar166 = vpsrld_avx2(auVar114,2);
  auVar167 = vpslld_avx2(auVar114,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar114,0xd);
  auVar167 = vpslld_avx2(auVar114,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar114,0x16);
  auVar167 = vpslld_avx2(auVar114,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar114,auVar169);
  auVar166 = vpand_avx2(auVar166,auVar161);
  auVar167 = vpand_avx2(auVar114,auVar169);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar160 = vpaddd_avx2(auVar51,auVar160);
  auVar51 = vpaddd_avx2(auVar152 ^ auVar151 ^ auVar168,auVar51);
  auVar51 = vpaddd_avx2(auVar166,auVar51);
  auVar166 = vpsrld_avx2(auVar100,0x11);
  auVar167 = vpslld_avx2(auVar100,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar100,0x13);
  auVar168 = vpslld_avx2(auVar100,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar100,10);
  auVar168 = vpsrld_avx2(auVar165,7);
  auVar151 = vpslld_avx2(auVar165,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar165,0x12);
  auVar153 = vpslld_avx2(auVar165,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar165,3);
  auVar163 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar153,auVar163);
  auVar163 = vpaddd_avx2(auVar163,auVar26);
  auVar163 = vpaddd_avx2(auVar163,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar160,6);
  auVar167 = vpslld_avx2(auVar160,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar160,0xb);
  auVar167 = vpslld_avx2(auVar160,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar160,0x19);
  auVar167 = vpslld_avx2(auVar160,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar160,auVar113);
  auVar166 = vpand_avx2(auVar170,auVar160);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar89 = vpaddd_avx2(auVar163,auVar89);
  auVar89 = vpaddd_avx2(auVar166,auVar89);
  auVar89 = vpaddd_avx2(auVar89,auVar146);
  auVar89 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar89);
  auVar166 = vpsrld_avx2(auVar51,2);
  auVar167 = vpslld_avx2(auVar51,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar51,0xd);
  auVar167 = vpslld_avx2(auVar51,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar51,0x16);
  auVar167 = vpslld_avx2(auVar51,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar51,auVar114);
  auVar166 = vpand_avx2(auVar166,auVar169);
  auVar167 = vpand_avx2(auVar51,auVar114);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar161 = vpaddd_avx2(auVar89,auVar161);
  auVar89 = vpaddd_avx2(auVar152 ^ auVar151 ^ auVar168,auVar89);
  auVar89 = vpaddd_avx2(auVar166,auVar89);
  auVar166 = vpsrld_avx2(auVar115,0x11);
  auVar167 = vpslld_avx2(auVar115,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar115,0x13);
  auVar168 = vpslld_avx2(auVar115,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar115,10);
  auVar168 = vpsrld_avx2(auVar164,7);
  auVar151 = vpslld_avx2(auVar164,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar164,0x12);
  auVar153 = vpslld_avx2(auVar164,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar164,3);
  auVar165 = vpaddd_avx2(auVar165,auVar151 ^ auVar168 ^ auVar153);
  auVar165 = vpaddd_avx2(auVar165,auVar4);
  auVar165 = vpaddd_avx2(auVar165,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar161,6);
  auVar167 = vpslld_avx2(auVar161,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar161,0xb);
  auVar167 = vpslld_avx2(auVar161,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar161,0x19);
  auVar167 = vpslld_avx2(auVar161,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar161,auVar170);
  auVar166 = vpand_avx2(auVar160,auVar161);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar113 = vpaddd_avx2(auVar165,auVar113);
  auVar113 = vpaddd_avx2(auVar166,auVar113);
  auVar113 = vpaddd_avx2(auVar113,auVar132);
  auVar113 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar113);
  auVar166 = vpsrld_avx2(auVar89,2);
  auVar167 = vpslld_avx2(auVar89,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar89,0xd);
  auVar167 = vpslld_avx2(auVar89,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar89,0x16);
  auVar167 = vpslld_avx2(auVar89,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar89,auVar51);
  auVar166 = vpand_avx2(auVar166,auVar114);
  auVar167 = vpand_avx2(auVar89,auVar51);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar169 = vpaddd_avx2(auVar169,auVar113);
  auVar113 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar113);
  auVar113 = vpaddd_avx2(auVar166,auVar113);
  auVar166 = vpsrld_avx2(auVar163,0x11);
  auVar167 = vpslld_avx2(auVar163,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar163,0x13);
  auVar168 = vpslld_avx2(auVar163,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar163,10);
  auVar168 = vpsrld_avx2(auVar88,7);
  auVar151 = vpslld_avx2(auVar88,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar88,0x12);
  auVar153 = vpslld_avx2(auVar88,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar88,3);
  auVar164 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar153,auVar164);
  auVar164 = vpaddd_avx2(auVar164,auVar142);
  auVar164 = vpaddd_avx2(auVar164,auVar152 ^ auVar167 ^ auVar166);
  auVar166 = vpsrld_avx2(auVar169,6);
  auVar167 = vpslld_avx2(auVar169,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar169,0xb);
  auVar167 = vpslld_avx2(auVar169,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar169,0x19);
  auVar167 = vpslld_avx2(auVar169,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar169,auVar160);
  auVar166 = vpand_avx2(auVar169,auVar161);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar170 = vpaddd_avx2(auVar164,auVar170);
  auVar170 = vpaddd_avx2(auVar166,auVar170);
  auVar170 = vpaddd_avx2(auVar170,auVar133);
  auVar170 = vpaddd_avx2(auVar170,auVar152 ^ auVar151 ^ auVar168);
  auVar166 = vpsrld_avx2(auVar113,2);
  auVar167 = vpslld_avx2(auVar113,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar113,0xd);
  auVar167 = vpslld_avx2(auVar113,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar113,0x16);
  auVar167 = vpslld_avx2(auVar113,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar113,auVar89);
  auVar166 = vpand_avx2(auVar166,auVar51);
  auVar167 = vpand_avx2(auVar113,auVar89);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar114 = vpaddd_avx2(auVar114,auVar170);
  auVar170 = vpaddd_avx2(auVar152 ^ auVar151 ^ auVar168,auVar170);
  auVar170 = vpaddd_avx2(auVar166,auVar170);
  auVar166 = vpsrld_avx2(auVar165,0x11);
  auVar167 = vpslld_avx2(auVar165,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar165,0x13);
  auVar168 = vpslld_avx2(auVar165,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar165,10);
  auVar168 = vpsrld_avx2(auVar21,7);
  auVar151 = vpslld_avx2(auVar21,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar21,0x12);
  auVar153 = vpslld_avx2(auVar21,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar21,3);
  auVar88 = vpaddd_avx2(auVar88,auVar153 ^ auVar151 ^ auVar168);
  auVar88 = vpaddd_avx2(auVar88,auVar98);
  auVar88 = vpaddd_avx2(auVar88,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar114,6);
  auVar167 = vpslld_avx2(auVar114,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar114,0xb);
  auVar167 = vpslld_avx2(auVar114,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar114,0x19);
  auVar167 = vpslld_avx2(auVar114,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar114,auVar161);
  auVar166 = vpand_avx2(auVar169,auVar114);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar160 = vpaddd_avx2(auVar88,auVar160);
  auVar160 = vpaddd_avx2(auVar160,auVar166);
  auVar160 = vpaddd_avx2(auVar160,auVar103);
  auVar160 = vpaddd_avx2(auVar160,auVar151 ^ auVar168 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar170,2);
  auVar167 = vpslld_avx2(auVar170,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar170,0xd);
  auVar167 = vpslld_avx2(auVar170,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar170,0x16);
  auVar167 = vpslld_avx2(auVar170,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar170,auVar113);
  auVar166 = vpand_avx2(auVar166,auVar89);
  auVar167 = vpand_avx2(auVar170,auVar113);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar51 = vpaddd_avx2(auVar51,auVar160);
  auVar160 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar160);
  auVar160 = vpaddd_avx2(auVar166,auVar160);
  auVar166 = vpsrld_avx2(auVar164,0x11);
  auVar167 = vpslld_avx2(auVar164,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar164,0x13);
  auVar168 = vpslld_avx2(auVar164,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar164,10);
  auVar168 = vpsrld_avx2(auVar10,7);
  auVar151 = vpslld_avx2(auVar10,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar10,0x12);
  auVar153 = vpslld_avx2(auVar10,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar10,3);
  auVar21 = vpaddd_avx2(auVar21,auVar153 ^ auVar151 ^ auVar168);
  auVar21 = vpaddd_avx2(auVar21,auVar99);
  auVar21 = vpaddd_avx2(auVar21,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar51,6);
  auVar167 = vpslld_avx2(auVar51,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar51,0xb);
  auVar167 = vpslld_avx2(auVar51,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar51,0x19);
  auVar167 = vpslld_avx2(auVar51,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar51,auVar169);
  auVar166 = vpand_avx2(auVar114,auVar51);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar161 = vpaddd_avx2(auVar21,auVar161);
  auVar161 = vpaddd_avx2(auVar161,auVar166);
  auVar161 = vpaddd_avx2(auVar161,auVar104);
  auVar161 = vpaddd_avx2(auVar161,auVar151 ^ auVar168 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar160,2);
  auVar167 = vpslld_avx2(auVar160,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar160,0xd);
  auVar167 = vpslld_avx2(auVar160,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar160,0x16);
  auVar167 = vpslld_avx2(auVar160,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar160,auVar170);
  auVar166 = vpand_avx2(auVar166,auVar113);
  auVar167 = vpand_avx2(auVar160,auVar170);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar89 = vpaddd_avx2(auVar89,auVar161);
  auVar161 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar161);
  auVar161 = vpaddd_avx2(auVar166,auVar161);
  auVar166 = vpsrld_avx2(auVar88,0x11);
  auVar167 = vpslld_avx2(auVar88,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar88,0x13);
  auVar168 = vpslld_avx2(auVar88,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar88,10);
  auVar168 = vpsrld_avx2(auVar13,7);
  auVar151 = vpslld_avx2(auVar13,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar13,0x12);
  auVar153 = vpslld_avx2(auVar13,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar13,3);
  auVar10 = vpaddd_avx2(auVar10,auVar153 ^ auVar151 ^ auVar168);
  auVar10 = vpaddd_avx2(auVar10,auVar100);
  auVar10 = vpaddd_avx2(auVar10,auVar167 ^ auVar166 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar89,6);
  auVar167 = vpslld_avx2(auVar89,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar89,0xb);
  auVar167 = vpslld_avx2(auVar89,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar89,0x19);
  auVar167 = vpslld_avx2(auVar89,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar89,auVar114);
  auVar166 = vpand_avx2(auVar51,auVar89);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar169 = vpaddd_avx2(auVar10,auVar169);
  auVar169 = vpaddd_avx2(auVar169,auVar166);
  auVar169 = vpaddd_avx2(auVar169,auVar30);
  auVar169 = vpaddd_avx2(auVar169,auVar151 ^ auVar168 ^ auVar152);
  auVar166 = vpsrld_avx2(auVar161,2);
  auVar167 = vpslld_avx2(auVar161,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar161,0xd);
  auVar167 = vpslld_avx2(auVar161,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar161,0x16);
  auVar167 = vpslld_avx2(auVar161,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar161,auVar160);
  auVar166 = vpand_avx2(auVar166,auVar170);
  auVar167 = vpand_avx2(auVar161,auVar160);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar113 = vpaddd_avx2(auVar113,auVar169);
  auVar169 = vpaddd_avx2(auVar152 ^ auVar151 ^ auVar168,auVar169);
  auVar169 = vpaddd_avx2(auVar166,auVar169);
  auVar166 = vpsrld_avx2(auVar21,0x11);
  auVar167 = vpslld_avx2(auVar21,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar21,0x13);
  auVar168 = vpslld_avx2(auVar21,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar21,10);
  auVar168 = vpsrld_avx2(auVar109,7);
  auVar151 = vpslld_avx2(auVar109,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar109,0x12);
  auVar153 = vpslld_avx2(auVar109,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar109,3);
  auVar13 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar153,auVar13);
  auVar13 = vpaddd_avx2(auVar13,auVar115);
  auVar13 = vpaddd_avx2(auVar13,auVar152 ^ auVar167 ^ auVar166);
  auVar166 = vpsrld_avx2(auVar113,6);
  auVar167 = vpslld_avx2(auVar113,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar113,0xb);
  auVar167 = vpslld_avx2(auVar113,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar113,0x19);
  auVar167 = vpslld_avx2(auVar113,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar113,auVar51);
  auVar166 = vpand_avx2(auVar89,auVar113);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar114 = vpaddd_avx2(auVar13,auVar114);
  auVar114 = vpaddd_avx2(auVar114,auVar166);
  auVar114 = vpaddd_avx2(auVar114,auVar105);
  auVar114 = vpaddd_avx2(auVar114,auVar152 ^ auVar151 ^ auVar168);
  auVar166 = vpsrld_avx2(auVar169,2);
  auVar167 = vpslld_avx2(auVar169,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar169,0xd);
  auVar167 = vpslld_avx2(auVar169,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar169,0x16);
  auVar167 = vpslld_avx2(auVar169,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar169,auVar161);
  auVar166 = vpand_avx2(auVar166,auVar160);
  auVar167 = vpand_avx2(auVar169,auVar161);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar170 = vpaddd_avx2(auVar170,auVar114);
  auVar114 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar114);
  auVar114 = vpaddd_avx2(auVar166,auVar114);
  auVar166 = vpsrld_avx2(auVar10,0x11);
  auVar167 = vpslld_avx2(auVar10,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar10,0x13);
  auVar168 = vpslld_avx2(auVar10,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar10,10);
  auVar168 = vpsrld_avx2(auVar20,7);
  auVar151 = vpslld_avx2(auVar20,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar20,0x12);
  auVar153 = vpslld_avx2(auVar20,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar20,3);
  auVar109 = vpaddd_avx2(auVar109,auVar151 ^ auVar168 ^ auVar153);
  auVar109 = vpaddd_avx2(auVar109,auVar163);
  auVar109 = vpaddd_avx2(auVar109,auVar152 ^ auVar167 ^ auVar166);
  auVar166 = vpsrld_avx2(auVar170,6);
  auVar167 = vpslld_avx2(auVar170,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar170,0xb);
  auVar167 = vpslld_avx2(auVar170,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar170,0x19);
  auVar167 = vpslld_avx2(auVar170,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar170,auVar89);
  auVar166 = vpand_avx2(auVar170,auVar113);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar51 = vpaddd_avx2(auVar109,auVar51);
  auVar51 = vpaddd_avx2(auVar166,auVar51);
  auVar51 = vpaddd_avx2(auVar51,auVar134);
  auVar51 = vpaddd_avx2(auVar51,auVar152 ^ auVar151 ^ auVar168);
  auVar166 = vpsrld_avx2(auVar114,2);
  auVar167 = vpslld_avx2(auVar114,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar114,0xd);
  auVar167 = vpslld_avx2(auVar114,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar114,0x16);
  auVar167 = vpslld_avx2(auVar114,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar114,auVar169);
  auVar166 = vpand_avx2(auVar166,auVar161);
  auVar167 = vpand_avx2(auVar114,auVar169);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar160 = vpaddd_avx2(auVar160,auVar51);
  auVar51 = vpaddd_avx2(auVar152 ^ auVar151 ^ auVar168,auVar51);
  auVar51 = vpaddd_avx2(auVar166,auVar51);
  auVar166 = vpsrld_avx2(auVar13,0x11);
  auVar167 = vpslld_avx2(auVar13,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar13,0x13);
  auVar168 = vpslld_avx2(auVar13,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar13,10);
  auVar168 = vpsrld_avx2(auVar26,7);
  auVar151 = vpslld_avx2(auVar26,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar153 = vpsrld_avx2(auVar26,0x12);
  auVar151 = vpslld_avx2(auVar26,0xe);
  auVar151 = vpor_avx2(auVar151,auVar153);
  auVar153 = vpsrld_avx2(auVar26,3);
  auVar20 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar153,auVar20);
  auVar20 = vpaddd_avx2(auVar20,auVar165);
  auVar20 = vpaddd_avx2(auVar20,auVar152 ^ auVar167 ^ auVar166);
  auVar166 = vpsrld_avx2(auVar160,6);
  auVar167 = vpslld_avx2(auVar160,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar160,0xb);
  auVar167 = vpslld_avx2(auVar160,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar160,0x19);
  auVar167 = vpslld_avx2(auVar160,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar160,auVar113);
  auVar166 = vpand_avx2(auVar170,auVar160);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar89 = vpaddd_avx2(auVar20,auVar89);
  auVar89 = vpaddd_avx2(auVar166,auVar89);
  auVar89 = vpaddd_avx2(auVar89,auVar147);
  auVar89 = vpaddd_avx2(auVar89,auVar152 ^ auVar151 ^ auVar168);
  auVar166 = vpsrld_avx2(auVar51,2);
  auVar167 = vpslld_avx2(auVar51,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar51,0xd);
  auVar167 = vpslld_avx2(auVar51,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar51,0x16);
  auVar167 = vpslld_avx2(auVar51,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar51,auVar114);
  auVar166 = vpand_avx2(auVar166,auVar169);
  auVar167 = vpand_avx2(auVar51,auVar114);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar161 = vpaddd_avx2(auVar161,auVar89);
  auVar89 = vpaddd_avx2(auVar152 ^ auVar151 ^ auVar168,auVar89);
  auVar89 = vpaddd_avx2(auVar166,auVar89);
  auVar166 = vpsrld_avx2(auVar109,0x11);
  auVar167 = vpslld_avx2(auVar109,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar109,0x13);
  auVar168 = vpslld_avx2(auVar109,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar109,10);
  auVar168 = vpsrld_avx2(auVar4,7);
  auVar151 = vpslld_avx2(auVar4,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar4,0x12);
  auVar153 = vpslld_avx2(auVar4,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar4,3);
  auVar26 = vpaddd_avx2(auVar26,auVar151 ^ auVar168 ^ auVar153);
  auVar26 = vpaddd_avx2(auVar26,auVar164);
  auVar26 = vpaddd_avx2(auVar26,auVar152 ^ auVar167 ^ auVar166);
  auVar166 = vpsrld_avx2(auVar161,6);
  auVar167 = vpslld_avx2(auVar161,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar161,0xb);
  auVar167 = vpslld_avx2(auVar161,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar161,0x19);
  auVar167 = vpslld_avx2(auVar161,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar161,auVar170);
  auVar166 = vpand_avx2(auVar160,auVar161);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar113 = vpaddd_avx2(auVar26,auVar113);
  auVar113 = vpaddd_avx2(auVar166,auVar113);
  auVar113 = vpaddd_avx2(auVar113,auVar59);
  auVar113 = vpaddd_avx2(auVar113,auVar152 ^ auVar151 ^ auVar168);
  auVar166 = vpsrld_avx2(auVar89,2);
  auVar167 = vpslld_avx2(auVar89,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar89,0xd);
  auVar167 = vpslld_avx2(auVar89,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar89,0x16);
  auVar167 = vpslld_avx2(auVar89,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar89,auVar51);
  auVar166 = vpand_avx2(auVar166,auVar114);
  auVar167 = vpand_avx2(auVar89,auVar51);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar169 = vpaddd_avx2(auVar169,auVar113);
  auVar113 = vpaddd_avx2(auVar152 ^ auVar151 ^ auVar168,auVar113);
  auVar113 = vpaddd_avx2(auVar166,auVar113);
  auVar166 = vpsrld_avx2(auVar20,0x11);
  auVar167 = vpslld_avx2(auVar20,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar20,0x13);
  auVar168 = vpslld_avx2(auVar20,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar20,10);
  auVar168 = vpsrld_avx2(auVar142,7);
  auVar151 = vpslld_avx2(auVar142,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar153 = vpsrld_avx2(auVar142,0x12);
  auVar151 = vpslld_avx2(auVar142,0xe);
  auVar151 = vpor_avx2(auVar151,auVar153);
  auVar153 = vpsrld_avx2(auVar142,3);
  auVar4 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar153,auVar4);
  auVar4 = vpaddd_avx2(auVar4,auVar88);
  auVar4 = vpaddd_avx2(auVar4,auVar152 ^ auVar167 ^ auVar166);
  auVar166 = vpsrld_avx2(auVar169,6);
  auVar167 = vpslld_avx2(auVar169,0x1a);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar169,0xb);
  auVar167 = vpslld_avx2(auVar169,0x15);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar169,0x19);
  auVar167 = vpslld_avx2(auVar169,7);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpandn_avx2(auVar169,auVar160);
  auVar166 = vpand_avx2(auVar161,auVar169);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar170 = vpaddd_avx2(auVar4,auVar170);
  auVar170 = vpaddd_avx2(auVar170,auVar166);
  auVar170 = vpaddd_avx2(auVar170,auVar31);
  auVar170 = vpaddd_avx2(auVar170,auVar152 ^ auVar151 ^ auVar168);
  auVar166 = vpsrld_avx2(auVar113,2);
  auVar167 = vpslld_avx2(auVar113,0x1e);
  auVar168 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar113,0xd);
  auVar167 = vpslld_avx2(auVar113,0x13);
  auVar151 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpsrld_avx2(auVar113,0x16);
  auVar167 = vpslld_avx2(auVar113,10);
  auVar152 = vpor_avx2(auVar167,auVar166);
  auVar166 = vpor_avx2(auVar113,auVar89);
  auVar166 = vpand_avx2(auVar166,auVar51);
  auVar167 = vpand_avx2(auVar113,auVar89);
  auVar166 = vpor_avx2(auVar166,auVar167);
  auVar114 = vpaddd_avx2(auVar114,auVar170);
  auVar170 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar152,auVar170);
  auVar170 = vpaddd_avx2(auVar166,auVar170);
  auVar166 = vpsrld_avx2(auVar26,0x11);
  auVar167 = vpslld_avx2(auVar26,0xf);
  auVar166 = vpor_avx2(auVar167,auVar166);
  auVar167 = vpsrld_avx2(auVar26,0x13);
  auVar168 = vpslld_avx2(auVar26,0xd);
  auVar167 = vpor_avx2(auVar168,auVar167);
  auVar152 = vpsrld_avx2(auVar26,10);
  auVar168 = vpsrld_avx2(auVar98,7);
  auVar151 = vpslld_avx2(auVar98,0x19);
  auVar168 = vpor_avx2(auVar151,auVar168);
  auVar151 = vpsrld_avx2(auVar98,0x12);
  auVar153 = vpslld_avx2(auVar98,0xe);
  auVar151 = vpor_avx2(auVar153,auVar151);
  auVar153 = vpsrld_avx2(auVar98,3);
  auVar142 = vpaddd_avx2(auVar142,auVar151 ^ auVar168 ^ auVar153);
  auVar21 = vpaddd_avx2(auVar142,auVar21);
  auVar21 = vpaddd_avx2(auVar21,auVar152 ^ auVar167 ^ auVar166);
  auVar142 = vpsrld_avx2(auVar114,6);
  auVar166 = vpslld_avx2(auVar114,0x1a);
  auVar167 = vpor_avx2(auVar166,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0xb);
  auVar166 = vpslld_avx2(auVar114,0x15);
  auVar168 = vpor_avx2(auVar166,auVar142);
  auVar142 = vpsrld_avx2(auVar114,0x19);
  auVar166 = vpslld_avx2(auVar114,7);
  auVar151 = vpor_avx2(auVar166,auVar142);
  auVar166 = vpandn_avx2(auVar114,auVar161);
  auVar142 = vpand_avx2(auVar114,auVar169);
  auVar142 = vpor_avx2(auVar142,auVar166);
  auVar160 = vpaddd_avx2(auVar21,auVar160);
  auVar160 = vpaddd_avx2(auVar142,auVar160);
  auVar160 = vpaddd_avx2(auVar160,auVar32);
  auVar160 = vpaddd_avx2(auVar160,auVar151 ^ auVar168 ^ auVar167);
  auVar142 = vpsrld_avx2(auVar170,2);
  auVar166 = vpslld_avx2(auVar170,0x1e);
  auVar167 = vpor_avx2(auVar166,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0xd);
  auVar166 = vpslld_avx2(auVar170,0x13);
  auVar168 = vpor_avx2(auVar166,auVar142);
  auVar142 = vpsrld_avx2(auVar170,0x16);
  auVar166 = vpslld_avx2(auVar170,10);
  auVar151 = vpor_avx2(auVar166,auVar142);
  auVar142 = vpor_avx2(auVar170,auVar113);
  auVar142 = vpand_avx2(auVar142,auVar89);
  auVar166 = vpand_avx2(auVar170,auVar113);
  auVar142 = vpor_avx2(auVar142,auVar166);
  auVar51 = vpaddd_avx2(auVar51,auVar160);
  auVar160 = vpaddd_avx2(auVar151 ^ auVar168 ^ auVar167,auVar160);
  auVar160 = vpaddd_avx2(auVar142,auVar160);
  auVar142 = vpsrld_avx2(auVar4,0x11);
  auVar166 = vpslld_avx2(auVar4,0xf);
  auVar166 = vpor_avx2(auVar166,auVar142);
  auVar142 = vpsrld_avx2(auVar4,0x13);
  auVar167 = vpslld_avx2(auVar4,0xd);
  auVar167 = vpor_avx2(auVar167,auVar142);
  auVar151 = vpsrld_avx2(auVar4,10);
  auVar142 = vpsrld_avx2(auVar99,7);
  auVar168 = vpslld_avx2(auVar99,0x19);
  auVar142 = vpor_avx2(auVar168,auVar142);
  auVar168 = vpsrld_avx2(auVar99,0x12);
  auVar152 = vpslld_avx2(auVar99,0xe);
  auVar168 = vpor_avx2(auVar152,auVar168);
  auVar152 = vpsrld_avx2(auVar99,3);
  auVar142 = vpaddd_avx2(auVar98,auVar152 ^ auVar168 ^ auVar142);
  auVar10 = vpaddd_avx2(auVar142,auVar10);
  auVar10 = vpaddd_avx2(auVar10,auVar167 ^ auVar166 ^ auVar151);
  auVar142 = vpsrld_avx2(auVar51,6);
  auVar98 = vpslld_avx2(auVar51,0x1a);
  auVar166 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar51,0xb);
  auVar98 = vpslld_avx2(auVar51,0x15);
  auVar167 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar51,0x19);
  auVar98 = vpslld_avx2(auVar51,7);
  auVar168 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar51,auVar169);
  auVar142 = vpand_avx2(auVar114,auVar51);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar161 = vpaddd_avx2(auVar10,auVar161);
  auVar161 = vpaddd_avx2(auVar142,auVar161);
  auVar161 = vpaddd_avx2(auVar161,auVar162);
  auVar161 = vpaddd_avx2(auVar161,auVar168 ^ auVar167 ^ auVar166);
  auVar142 = vpsrld_avx2(auVar160,2);
  auVar98 = vpslld_avx2(auVar160,0x1e);
  auVar166 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0xd);
  auVar98 = vpslld_avx2(auVar160,0x13);
  auVar167 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar160,0x16);
  auVar98 = vpslld_avx2(auVar160,10);
  auVar168 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar160,auVar170);
  auVar142 = vpand_avx2(auVar142,auVar113);
  auVar98 = vpand_avx2(auVar160,auVar170);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar89 = vpaddd_avx2(auVar89,auVar161);
  auVar161 = vpaddd_avx2(auVar168 ^ auVar167 ^ auVar166,auVar161);
  auVar161 = vpaddd_avx2(auVar142,auVar161);
  auVar142 = vpsrld_avx2(auVar21,0x11);
  auVar98 = vpslld_avx2(auVar21,0xf);
  auVar98 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar21,0x13);
  auVar166 = vpslld_avx2(auVar21,0xd);
  auVar166 = vpor_avx2(auVar166,auVar142);
  auVar168 = vpsrld_avx2(auVar21,10);
  auVar142 = vpsrld_avx2(auVar100,7);
  auVar167 = vpslld_avx2(auVar100,0x19);
  auVar142 = vpor_avx2(auVar167,auVar142);
  auVar167 = vpsrld_avx2(auVar100,0x12);
  auVar151 = vpslld_avx2(auVar100,0xe);
  auVar167 = vpor_avx2(auVar151,auVar167);
  auVar151 = vpsrld_avx2(auVar100,3);
  auVar142 = vpaddd_avx2(auVar99,auVar151 ^ auVar167 ^ auVar142);
  auVar13 = vpaddd_avx2(auVar142,auVar13);
  auVar13 = vpaddd_avx2(auVar13,auVar166 ^ auVar98 ^ auVar168);
  auVar142 = vpsrld_avx2(auVar89,6);
  auVar98 = vpslld_avx2(auVar89,0x1a);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar89,0xb);
  auVar98 = vpslld_avx2(auVar89,0x15);
  auVar166 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar89,0x19);
  auVar98 = vpslld_avx2(auVar89,7);
  auVar167 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpandn_avx2(auVar89,auVar114);
  auVar142 = vpand_avx2(auVar51,auVar89);
  auVar142 = vpor_avx2(auVar142,auVar98);
  auVar169 = vpaddd_avx2(auVar13,auVar169);
  auVar169 = vpaddd_avx2(auVar169,auVar142);
  auVar169 = vpaddd_avx2(auVar169,auVar154);
  auVar169 = vpaddd_avx2(auVar169,auVar166 ^ auVar99 ^ auVar167);
  auVar142 = vpsrld_avx2(auVar161,2);
  auVar98 = vpslld_avx2(auVar161,0x1e);
  auVar99 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0xd);
  auVar98 = vpslld_avx2(auVar161,0x13);
  auVar166 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpsrld_avx2(auVar161,0x16);
  auVar98 = vpslld_avx2(auVar161,10);
  auVar167 = vpor_avx2(auVar98,auVar142);
  auVar142 = vpor_avx2(auVar160,auVar161);
  auVar142 = vpand_avx2(auVar142,auVar170);
  auVar98 = vpand_avx2(auVar160,auVar161);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar113 = vpaddd_avx2(auVar113,auVar169);
  auVar169 = vpaddd_avx2(auVar166 ^ auVar99 ^ auVar167,auVar169);
  auVar169 = vpaddd_avx2(auVar142,auVar169);
  auVar142 = vpsrld_avx2(auVar10,0x11);
  auVar98 = vpslld_avx2(auVar10,0xf);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar98 = vpsrld_avx2(auVar10,0x13);
  auVar99 = vpslld_avx2(auVar10,0xd);
  auVar98 = vpor_avx2(auVar99,auVar98);
  auVar166 = vpsrld_avx2(auVar10,10);
  auVar10 = vpsrld_avx2(auVar115,7);
  auVar99 = vpslld_avx2(auVar115,0x19);
  auVar10 = vpor_avx2(auVar99,auVar10);
  auVar99 = vpsrld_avx2(auVar115,0x12);
  auVar167 = vpslld_avx2(auVar115,0xe);
  auVar99 = vpor_avx2(auVar167,auVar99);
  auVar167 = vpsrld_avx2(auVar115,3);
  auVar10 = vpaddd_avx2(auVar99 ^ auVar10 ^ auVar167,auVar100);
  auVar109 = vpaddd_avx2(auVar10,auVar109);
  auVar109 = vpaddd_avx2(auVar109,auVar98 ^ auVar142 ^ auVar166);
  auVar10 = vpsrld_avx2(auVar113,6);
  auVar142 = vpslld_avx2(auVar113,0x1a);
  auVar98 = vpor_avx2(auVar142,auVar10);
  auVar10 = vpsrld_avx2(auVar113,0xb);
  auVar142 = vpslld_avx2(auVar113,0x15);
  auVar99 = vpor_avx2(auVar142,auVar10);
  auVar10 = vpsrld_avx2(auVar113,0x19);
  auVar142 = vpslld_avx2(auVar113,7);
  auVar100 = vpor_avx2(auVar142,auVar10);
  auVar142 = vpandn_avx2(auVar113,auVar51);
  auVar10 = vpand_avx2(auVar89,auVar113);
  auVar142 = vpor_avx2(auVar10,auVar142);
  auVar10 = vpaddd_avx2(auVar109,auVar114);
  auVar10 = vpaddd_avx2(auVar10,auVar142);
  auVar10 = vpaddd_avx2(auVar10,auVar24);
  auVar10 = vpaddd_avx2(auVar10,auVar99 ^ auVar98 ^ auVar100);
  auVar114 = vpsrld_avx2(auVar169,2);
  auVar142 = vpslld_avx2(auVar169,0x1e);
  auVar98 = vpor_avx2(auVar142,auVar114);
  auVar114 = vpsrld_avx2(auVar169,0xd);
  auVar142 = vpslld_avx2(auVar169,0x13);
  auVar99 = vpor_avx2(auVar142,auVar114);
  auVar114 = vpsrld_avx2(auVar169,0x16);
  auVar142 = vpslld_avx2(auVar169,10);
  auVar100 = vpor_avx2(auVar142,auVar114);
  auVar114 = vpor_avx2(auVar169,auVar161);
  auVar114 = vpand_avx2(auVar160,auVar114);
  auVar142 = vpand_avx2(auVar169,auVar161);
  auVar114 = vpor_avx2(auVar142,auVar114);
  auVar170 = vpaddd_avx2(auVar170,auVar10);
  auVar10 = vpaddd_avx2(auVar99 ^ auVar98 ^ auVar100,auVar10);
  auVar10 = vpaddd_avx2(auVar114,auVar10);
  auVar114 = vpsrld_avx2(auVar13,0x11);
  auVar142 = vpslld_avx2(auVar13,0xf);
  auVar114 = vpor_avx2(auVar142,auVar114);
  auVar142 = vpsrld_avx2(auVar13,0x13);
  auVar98 = vpslld_avx2(auVar13,0xd);
  auVar142 = vpor_avx2(auVar98,auVar142);
  auVar99 = vpsrld_avx2(auVar13,10);
  auVar13 = vpsrld_avx2(auVar163,7);
  auVar98 = vpslld_avx2(auVar163,0x19);
  auVar13 = vpor_avx2(auVar98,auVar13);
  auVar98 = vpsrld_avx2(auVar163,0x12);
  auVar100 = vpslld_avx2(auVar163,0xe);
  auVar98 = vpor_avx2(auVar100,auVar98);
  auVar100 = vpsrld_avx2(auVar163,3);
  auVar13 = vpaddd_avx2(auVar115,auVar100 ^ auVar98 ^ auVar13);
  auVar13 = vpaddd_avx2(auVar13,auVar20);
  auVar13 = vpaddd_avx2(auVar13,auVar142 ^ auVar114 ^ auVar99);
  auVar20 = vpsrld_avx2(auVar170,6);
  auVar114 = vpslld_avx2(auVar170,0x1a);
  auVar142 = vpor_avx2(auVar114,auVar20);
  auVar20 = vpsrld_avx2(auVar170,0xb);
  auVar114 = vpslld_avx2(auVar170,0x15);
  auVar98 = vpor_avx2(auVar114,auVar20);
  auVar20 = vpsrld_avx2(auVar170,0x19);
  auVar114 = vpslld_avx2(auVar170,7);
  auVar99 = vpor_avx2(auVar114,auVar20);
  auVar114 = vpandn_avx2(auVar170,auVar89);
  auVar20 = vpand_avx2(auVar113,auVar170);
  auVar114 = vpor_avx2(auVar20,auVar114);
  auVar20 = vpaddd_avx2(auVar13,auVar51);
  auVar20 = vpaddd_avx2(auVar20,auVar114);
  auVar20 = vpaddd_avx2(auVar20,auVar155);
  auVar20 = vpaddd_avx2(auVar20,auVar98 ^ auVar142 ^ auVar99);
  auVar51 = vpsrld_avx2(auVar10,2);
  auVar114 = vpslld_avx2(auVar10,0x1e);
  auVar142 = vpor_avx2(auVar114,auVar51);
  auVar51 = vpsrld_avx2(auVar10,0xd);
  auVar114 = vpslld_avx2(auVar10,0x13);
  auVar98 = vpor_avx2(auVar114,auVar51);
  auVar51 = vpsrld_avx2(auVar10,0x16);
  auVar114 = vpslld_avx2(auVar10,10);
  auVar99 = vpor_avx2(auVar114,auVar51);
  auVar51 = vpor_avx2(auVar10,auVar169);
  auVar51 = vpand_avx2(auVar51,auVar161);
  auVar114 = vpand_avx2(auVar10,auVar169);
  auVar114 = vpor_avx2(auVar114,auVar51);
  auVar51 = vpaddd_avx2(auVar160,auVar20);
  auVar20 = vpaddd_avx2(auVar99 ^ auVar98 ^ auVar142,auVar20);
  auVar20 = vpaddd_avx2(auVar114,auVar20);
  auVar160 = vpsrld_avx2(auVar109,0x11);
  auVar114 = vpslld_avx2(auVar109,0xf);
  auVar160 = vpor_avx2(auVar114,auVar160);
  auVar114 = vpsrld_avx2(auVar109,0x13);
  auVar142 = vpslld_avx2(auVar109,0xd);
  auVar114 = vpor_avx2(auVar142,auVar114);
  auVar98 = vpsrld_avx2(auVar109,10);
  auVar109 = vpsrld_avx2(auVar165,7);
  auVar142 = vpslld_avx2(auVar165,0x19);
  auVar109 = vpor_avx2(auVar142,auVar109);
  auVar142 = vpsrld_avx2(auVar165,0x12);
  auVar99 = vpslld_avx2(auVar165,0xe);
  auVar142 = vpor_avx2(auVar99,auVar142);
  auVar99 = vpsrld_avx2(auVar165,3);
  auVar109 = vpaddd_avx2(auVar142 ^ auVar109 ^ auVar99,auVar163);
  auVar109 = vpaddd_avx2(auVar109,auVar26);
  auVar109 = vpaddd_avx2(auVar109,auVar98 ^ auVar114 ^ auVar160);
  auVar26 = vpsrld_avx2(auVar51,6);
  auVar160 = vpslld_avx2(auVar51,0x1a);
  auVar114 = vpor_avx2(auVar160,auVar26);
  auVar26 = vpsrld_avx2(auVar51,0xb);
  auVar160 = vpslld_avx2(auVar51,0x15);
  auVar142 = vpor_avx2(auVar160,auVar26);
  auVar26 = vpsrld_avx2(auVar51,0x19);
  auVar160 = vpslld_avx2(auVar51,7);
  auVar98 = vpor_avx2(auVar160,auVar26);
  auVar160 = vpandn_avx2(auVar51,auVar113);
  auVar26 = vpand_avx2(auVar170,auVar51);
  auVar160 = vpor_avx2(auVar26,auVar160);
  auVar26 = vpaddd_avx2(auVar109,auVar89);
  auVar26 = vpaddd_avx2(auVar26,auVar160);
  auVar26 = vpaddd_avx2(auVar26,auVar156);
  auVar26 = vpaddd_avx2(auVar26,auVar98 ^ auVar142 ^ auVar114);
  auVar89 = vpsrld_avx2(auVar20,2);
  auVar160 = vpslld_avx2(auVar20,0x1e);
  auVar114 = vpor_avx2(auVar160,auVar89);
  auVar89 = vpsrld_avx2(auVar20,0xd);
  auVar160 = vpslld_avx2(auVar20,0x13);
  auVar142 = vpor_avx2(auVar160,auVar89);
  auVar89 = vpsrld_avx2(auVar20,0x16);
  auVar160 = vpslld_avx2(auVar20,10);
  auVar98 = vpor_avx2(auVar160,auVar89);
  auVar89 = vpor_avx2(auVar20,auVar10);
  auVar89 = vpand_avx2(auVar89,auVar169);
  auVar160 = vpand_avx2(auVar20,auVar10);
  auVar160 = vpor_avx2(auVar160,auVar89);
  auVar89 = vpaddd_avx2(auVar26,auVar161);
  auVar26 = vpaddd_avx2(auVar98 ^ auVar142 ^ auVar114,auVar26);
  auVar26 = vpaddd_avx2(auVar160,auVar26);
  auVar160 = vpsrld_avx2(auVar13,0x11);
  auVar161 = vpslld_avx2(auVar13,0xf);
  auVar161 = vpor_avx2(auVar161,auVar160);
  auVar160 = vpsrld_avx2(auVar13,0x13);
  auVar114 = vpslld_avx2(auVar13,0xd);
  auVar114 = vpor_avx2(auVar114,auVar160);
  auVar163 = vpsrld_avx2(auVar13,10);
  auVar13 = vpsrld_avx2(auVar164,7);
  auVar160 = vpslld_avx2(auVar164,0x19);
  auVar142 = vpor_avx2(auVar160,auVar13);
  auVar13 = vpsrld_avx2(auVar164,0x12);
  auVar160 = vpslld_avx2(auVar164,0xe);
  auVar98 = vpor_avx2(auVar160,auVar13);
  auVar166 = vpsrld_avx2(auVar164,3);
  auVar13 = vpsrld_avx2(auVar89,6);
  auVar160 = vpslld_avx2(auVar89,0x1a);
  auVar99 = vpor_avx2(auVar160,auVar13);
  auVar13 = vpsrld_avx2(auVar89,0xb);
  auVar160 = vpslld_avx2(auVar89,0x15);
  auVar100 = vpor_avx2(auVar160,auVar13);
  auVar13 = vpsrld_avx2(auVar89,0x19);
  auVar160 = vpslld_avx2(auVar89,7);
  auVar115 = vpor_avx2(auVar160,auVar13);
  auVar160 = vpandn_avx2(auVar89,auVar170);
  auVar13 = vpand_avx2(auVar51,auVar89);
  auVar160 = vpor_avx2(auVar13,auVar160);
  auVar13 = vpaddd_avx2(auVar98 ^ auVar142 ^ auVar166,auVar165);
  auVar4 = vpaddd_avx2(auVar13,auVar4);
  auVar4 = vpaddd_avx2(auVar4,auVar163 ^ auVar114 ^ auVar161);
  auVar4 = vpaddd_avx2(auVar4,auVar113);
  auVar4 = vpaddd_avx2(auVar160,auVar4);
  auVar4 = vpaddd_avx2(auVar4,auVar33);
  auVar4 = vpaddd_avx2(auVar100 ^ auVar99 ^ auVar115,auVar4);
  auVar13 = vpsrld_avx2(auVar26,2);
  auVar160 = vpslld_avx2(auVar26,0x1e);
  auVar161 = vpor_avx2(auVar160,auVar13);
  auVar13 = vpsrld_avx2(auVar26,0xd);
  auVar160 = vpslld_avx2(auVar26,0x13);
  auVar113 = vpor_avx2(auVar160,auVar13);
  auVar13 = vpsrld_avx2(auVar26,0x16);
  auVar160 = vpslld_avx2(auVar26,10);
  auVar114 = vpor_avx2(auVar160,auVar13);
  auVar13 = vpor_avx2(auVar26,auVar20);
  auVar13 = vpand_avx2(auVar13,auVar10);
  auVar160 = vpand_avx2(auVar26,auVar20);
  auVar160 = vpor_avx2(auVar160,auVar13);
  auVar13 = vpaddd_avx2(auVar169,auVar4);
  auVar4 = vpaddd_avx2(auVar114 ^ auVar113 ^ auVar161,auVar4);
  auVar4 = vpaddd_avx2(auVar160,auVar4);
  auVar160 = vpsrld_avx2(auVar109,0x11);
  auVar161 = vpslld_avx2(auVar109,0xf);
  auVar160 = vpor_avx2(auVar161,auVar160);
  auVar161 = vpsrld_avx2(auVar109,0x13);
  auVar169 = vpslld_avx2(auVar109,0xd);
  auVar161 = vpor_avx2(auVar169,auVar161);
  auVar99 = vpsrld_avx2(auVar109,10);
  auVar109 = vpsrld_avx2(auVar88,7);
  auVar169 = vpslld_avx2(auVar88,0x19);
  auVar169 = vpor_avx2(auVar169,auVar109);
  auVar109 = vpsrld_avx2(auVar88,0x12);
  auVar113 = vpslld_avx2(auVar88,0xe);
  auVar113 = vpor_avx2(auVar113,auVar109);
  auVar100 = vpsrld_avx2(auVar88,3);
  auVar109 = vpsrld_avx2(auVar13,6);
  auVar88 = vpslld_avx2(auVar13,0x1a);
  auVar114 = vpor_avx2(auVar88,auVar109);
  auVar109 = vpsrld_avx2(auVar13,0xb);
  auVar88 = vpslld_avx2(auVar13,0x15);
  auVar142 = vpor_avx2(auVar88,auVar109);
  auVar109 = vpsrld_avx2(auVar13,0x19);
  auVar88 = vpslld_avx2(auVar13,7);
  auVar98 = vpor_avx2(auVar88,auVar109);
  auVar88 = vpandn_avx2(auVar13,auVar51);
  auVar109 = vpand_avx2(auVar89,auVar13);
  auVar88 = vpor_avx2(auVar109,auVar88);
  auVar109 = vpaddd_avx2(auVar164,auVar113 ^ auVar169 ^ auVar100);
  auVar109 = vpaddd_avx2(auVar109,auVar21);
  auVar109 = vpaddd_avx2(auVar109,auVar99 ^ auVar161 ^ auVar160);
  auVar109 = vpaddd_avx2(auVar109,auVar170);
  auVar109 = vpaddd_avx2(auVar88,auVar109);
  auVar109 = vpaddd_avx2(auVar109,auVar34);
  auVar109 = vpaddd_avx2(auVar142 ^ auVar114 ^ auVar98,auVar109);
  auVar21 = vpsrld_avx2(auVar4,2);
  auVar88 = vpslld_avx2(auVar4,0x1e);
  auVar160 = vpor_avx2(auVar88,auVar21);
  auVar21 = vpsrld_avx2(auVar4,0xd);
  auVar88 = vpslld_avx2(auVar4,0x13);
  auVar161 = vpor_avx2(auVar88,auVar21);
  auVar21 = vpsrld_avx2(auVar4,0x16);
  auVar88 = vpslld_avx2(auVar4,10);
  auVar169 = vpor_avx2(auVar88,auVar21);
  auVar21 = vpor_avx2(auVar26,auVar4);
  auVar21 = vpand_avx2(auVar21,auVar20);
  auVar88 = vpand_avx2(auVar26,auVar4);
  auVar21 = vpor_avx2(auVar21,auVar88);
  auVar21 = vpaddd_avx2(auVar21,auVar60);
  auVar88 = vpaddd_avx2(auVar109,auVar169 ^ auVar161 ^ auVar160);
  auVar21 = vpaddd_avx2(auVar21,auVar88);
  auVar4 = vpaddd_avx2(auVar4,auVar36);
  auVar175._16_16_ = _DAT_011304d0;
  auVar175._0_16_ = _DAT_011304d0;
  auVar88 = vpshufb_avx2(auVar21,auVar175);
  auVar21 = vpaddd_avx2(auVar26,auVar9);
  auVar21 = vpshufb_avx2(auVar21,auVar175);
  auVar26 = vpshufb_avx2(auVar4,auVar175);
  auVar4 = vpaddd_avx2(auVar20,auVar6);
  auVar8 = auVar88._0_16_;
  auVar5 = auVar88._16_16_;
  auVar11 = auVar26._0_16_;
  auVar19 = auVar26._16_16_;
  auVar3 = vpunpckhdq_avx(auVar5,auVar19);
  auVar2 = vpshufd_avx(auVar3,0xee);
  auVar2 = vpinsrd_avx(auVar2,auVar21._28_4_,2);
  auVar4 = vpshufb_avx2(auVar4,auVar175);
  auVar2 = vpblendd_avx2(auVar2,auVar4._16_16_,8);
  *(undefined1 (*) [16])out = auVar2;
  auVar2 = vpblendd_avx2(auVar3,auVar21._16_16_,4);
  auVar2 = vpinsrd_avx(auVar2,auVar4._24_4_,3);
  auVar3 = vpshufd_avx(auVar5,0x55);
  auVar3 = vpblendd_avx2(auVar3,auVar19,2);
  auVar3 = vpinsrd_avx(auVar3,auVar21._20_4_,2);
  auVar3 = vpinsrd_avx(auVar3,auVar4._20_4_,3);
  *(undefined1 (*) [16])(out + 0x20) = auVar2;
  *(undefined1 (*) [16])(out + 0x40) = auVar3;
  auVar2 = vpunpckldq_avx(auVar5,auVar19);
  auVar2 = vpinsrd_avx(auVar2,auVar21._16_4_,2);
  auVar2 = vpinsrd_avx(auVar2,auVar4._16_4_,3);
  *(undefined1 (*) [16])(out + 0x60) = auVar2;
  auVar2 = vpunpckhdq_avx(auVar8,auVar11);
  auVar3 = vpblendd_avx2(auVar2,auVar21._0_16_,4);
  auVar2 = vpshufd_avx(auVar2,0xee);
  auVar2 = vpinsrd_avx(auVar2,auVar21._12_4_,2);
  auVar5 = vpblendd_avx2(auVar2,auVar4._0_16_,8);
  auVar2 = vpinsrd_avx(auVar3,auVar4._8_4_,3);
  *(undefined1 (*) [16])(out + 0x80) = auVar5;
  *(undefined1 (*) [16])(out + 0xa0) = auVar2;
  auVar2 = vpshufd_avx(auVar8,0x55);
  auVar2 = vpblendd_avx2(auVar2,auVar11,2);
  auVar3 = vpunpckldq_avx(auVar8,auVar11);
  auVar2 = vpinsrd_avx(auVar2,auVar21._4_4_,2);
  auVar2 = vpinsrd_avx(auVar2,auVar4._4_4_,3);
  auVar3 = vpinsrd_avx(auVar3,auVar21._0_4_,2);
  auVar3 = vpinsrd_avx(auVar3,auVar4._0_4_,3);
  *(undefined1 (*) [16])(out + 0xc0) = auVar2;
  *(undefined1 (*) [16])(out + 0xe0) = auVar3;
  auVar4 = vpaddd_avx2(auVar10,auVar52);
  auVar109 = vpaddd_avx2(auVar109,auVar4);
  auVar4 = vpshufb_avx2(auVar109,auVar175);
  auVar109 = vpaddd_avx2(auVar13,auVar22);
  auVar10 = vpshufb_avx2(auVar109,auVar175);
  auVar109 = vpaddd_avx2(auVar89,auVar35);
  auVar13 = vpshufb_avx2(auVar109,auVar175);
  auVar109 = vpaddd_avx2(auVar51,auVar7);
  auVar109 = vpshufb_avx2(auVar109,auVar175);
  auVar5 = auVar4._0_16_;
  auVar8 = auVar4._16_16_;
  auVar11 = auVar10._0_16_;
  auVar19 = auVar10._16_16_;
  auVar3 = vpunpckhdq_avx(auVar8,auVar19);
  auVar2 = vpshufd_avx(auVar3,0xee);
  auVar2 = vpinsrd_avx(auVar2,auVar13._28_4_,2);
  auVar2 = vpblendd_avx2(auVar2,auVar109._16_16_,8);
  *(undefined1 (*) [16])(out + 0x10) = auVar2;
  auVar2 = vpblendd_avx2(auVar3,auVar13._16_16_,4);
  auVar2 = vpinsrd_avx(auVar2,auVar109._24_4_,3);
  *(undefined1 (*) [16])(out + 0x30) = auVar2;
  auVar2 = vpshufd_avx(auVar8,0x55);
  auVar2 = vpblendd_avx2(auVar2,auVar19,2);
  auVar3 = vpunpckldq_avx(auVar8,auVar19);
  auVar2 = vpinsrd_avx(auVar2,auVar13._20_4_,2);
  auVar2 = vpinsrd_avx(auVar2,auVar109._20_4_,3);
  auVar3 = vpinsrd_avx(auVar3,auVar13._16_4_,2);
  auVar3 = vpinsrd_avx(auVar3,auVar109._16_4_,3);
  *(undefined1 (*) [16])(out + 0x50) = auVar2;
  *(undefined1 (*) [16])(out + 0x70) = auVar3;
  auVar3 = vpunpckhdq_avx(auVar5,auVar11);
  auVar2 = vpshufd_avx(auVar3,0xee);
  auVar2 = vpinsrd_avx(auVar2,auVar13._12_4_,2);
  auVar2 = vpblendd_avx2(auVar2,auVar109._0_16_,8);
  *(undefined1 (*) [16])(out + 0x90) = auVar2;
  auVar2 = vpblendd_avx2(auVar3,auVar13._0_16_,4);
  auVar2 = vpinsrd_avx(auVar2,auVar109._8_4_,3);
  auVar3 = vpshufd_avx(auVar5,0x55);
  auVar3 = vpblendd_avx2(auVar3,auVar11,2);
  auVar3 = vpinsrd_avx(auVar3,auVar13._4_4_,2);
  auVar3 = vpinsrd_avx(auVar3,auVar109._4_4_,3);
  *(undefined1 (*) [16])(out + 0xb0) = auVar2;
  *(undefined1 (*) [16])(out + 0xd0) = auVar3;
  auVar2 = vpunpckldq_avx(auVar5,auVar11);
  auVar2 = vpinsrd_avx(auVar2,auVar13._0_4_,2);
  auVar2 = vpinsrd_avx(auVar2,auVar109._0_4_,3);
  *(undefined1 (*) [16])(out + 0xf0) = auVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Transform_8way(unsigned char* out, const unsigned char* in)
{
    // Transform 1
    __m256i a = K(0x6a09e667ul);
    __m256i b = K(0xbb67ae85ul);
    __m256i c = K(0x3c6ef372ul);
    __m256i d = K(0xa54ff53aul);
    __m256i e = K(0x510e527ful);
    __m256i f = K(0x9b05688cul);
    __m256i g = K(0x1f83d9abul);
    __m256i h = K(0x5be0cd19ul);

    __m256i w0, w1, w2, w3, w4, w5, w6, w7, w8, w9, w10, w11, w12, w13, w14, w15;

    Round(a, b, c, d, e, f, g, h, Add(K(0x428a2f98ul), w0 = Read8(in, 0)));
    Round(h, a, b, c, d, e, f, g, Add(K(0x71374491ul), w1 = Read8(in, 4)));
    Round(g, h, a, b, c, d, e, f, Add(K(0xb5c0fbcful), w2 = Read8(in, 8)));
    Round(f, g, h, a, b, c, d, e, Add(K(0xe9b5dba5ul), w3 = Read8(in, 12)));
    Round(e, f, g, h, a, b, c, d, Add(K(0x3956c25bul), w4 = Read8(in, 16)));
    Round(d, e, f, g, h, a, b, c, Add(K(0x59f111f1ul), w5 = Read8(in, 20)));
    Round(c, d, e, f, g, h, a, b, Add(K(0x923f82a4ul), w6 = Read8(in, 24)));
    Round(b, c, d, e, f, g, h, a, Add(K(0xab1c5ed5ul), w7 = Read8(in, 28)));
    Round(a, b, c, d, e, f, g, h, Add(K(0xd807aa98ul), w8 = Read8(in, 32)));
    Round(h, a, b, c, d, e, f, g, Add(K(0x12835b01ul), w9 = Read8(in, 36)));
    Round(g, h, a, b, c, d, e, f, Add(K(0x243185beul), w10 = Read8(in, 40)));
    Round(f, g, h, a, b, c, d, e, Add(K(0x550c7dc3ul), w11 = Read8(in, 44)));
    Round(e, f, g, h, a, b, c, d, Add(K(0x72be5d74ul), w12 = Read8(in, 48)));
    Round(d, e, f, g, h, a, b, c, Add(K(0x80deb1feul), w13 = Read8(in, 52)));
    Round(c, d, e, f, g, h, a, b, Add(K(0x9bdc06a7ul), w14 = Read8(in, 56)));
    Round(b, c, d, e, f, g, h, a, Add(K(0xc19bf174ul), w15 = Read8(in, 60)));
    Round(a, b, c, d, e, f, g, h, Add(K(0xe49b69c1ul), Inc(w0, sigma1(w14), w9, sigma0(w1))));
    Round(h, a, b, c, d, e, f, g, Add(K(0xefbe4786ul), Inc(w1, sigma1(w15), w10, sigma0(w2))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x0fc19dc6ul), Inc(w2, sigma1(w0), w11, sigma0(w3))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x240ca1ccul), Inc(w3, sigma1(w1), w12, sigma0(w4))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x2de92c6ful), Inc(w4, sigma1(w2), w13, sigma0(w5))));
    Round(d, e, f, g, h, a, b, c, Add(K(0x4a7484aaul), Inc(w5, sigma1(w3), w14, sigma0(w6))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x5cb0a9dcul), Inc(w6, sigma1(w4), w15, sigma0(w7))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x76f988daul), Inc(w7, sigma1(w5), w0, sigma0(w8))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x983e5152ul), Inc(w8, sigma1(w6), w1, sigma0(w9))));
    Round(h, a, b, c, d, e, f, g, Add(K(0xa831c66dul), Inc(w9, sigma1(w7), w2, sigma0(w10))));
    Round(g, h, a, b, c, d, e, f, Add(K(0xb00327c8ul), Inc(w10, sigma1(w8), w3, sigma0(w11))));
    Round(f, g, h, a, b, c, d, e, Add(K(0xbf597fc7ul), Inc(w11, sigma1(w9), w4, sigma0(w12))));
    Round(e, f, g, h, a, b, c, d, Add(K(0xc6e00bf3ul), Inc(w12, sigma1(w10), w5, sigma0(w13))));
    Round(d, e, f, g, h, a, b, c, Add(K(0xd5a79147ul), Inc(w13, sigma1(w11), w6, sigma0(w14))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x06ca6351ul), Inc(w14, sigma1(w12), w7, sigma0(w15))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x14292967ul), Inc(w15, sigma1(w13), w8, sigma0(w0))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x27b70a85ul), Inc(w0, sigma1(w14), w9, sigma0(w1))));
    Round(h, a, b, c, d, e, f, g, Add(K(0x2e1b2138ul), Inc(w1, sigma1(w15), w10, sigma0(w2))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x4d2c6dfcul), Inc(w2, sigma1(w0), w11, sigma0(w3))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x53380d13ul), Inc(w3, sigma1(w1), w12, sigma0(w4))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x650a7354ul), Inc(w4, sigma1(w2), w13, sigma0(w5))));
    Round(d, e, f, g, h, a, b, c, Add(K(0x766a0abbul), Inc(w5, sigma1(w3), w14, sigma0(w6))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x81c2c92eul), Inc(w6, sigma1(w4), w15, sigma0(w7))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x92722c85ul), Inc(w7, sigma1(w5), w0, sigma0(w8))));
    Round(a, b, c, d, e, f, g, h, Add(K(0xa2bfe8a1ul), Inc(w8, sigma1(w6), w1, sigma0(w9))));
    Round(h, a, b, c, d, e, f, g, Add(K(0xa81a664bul), Inc(w9, sigma1(w7), w2, sigma0(w10))));
    Round(g, h, a, b, c, d, e, f, Add(K(0xc24b8b70ul), Inc(w10, sigma1(w8), w3, sigma0(w11))));
    Round(f, g, h, a, b, c, d, e, Add(K(0xc76c51a3ul), Inc(w11, sigma1(w9), w4, sigma0(w12))));
    Round(e, f, g, h, a, b, c, d, Add(K(0xd192e819ul), Inc(w12, sigma1(w10), w5, sigma0(w13))));
    Round(d, e, f, g, h, a, b, c, Add(K(0xd6990624ul), Inc(w13, sigma1(w11), w6, sigma0(w14))));
    Round(c, d, e, f, g, h, a, b, Add(K(0xf40e3585ul), Inc(w14, sigma1(w12), w7, sigma0(w15))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x106aa070ul), Inc(w15, sigma1(w13), w8, sigma0(w0))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x19a4c116ul), Inc(w0, sigma1(w14), w9, sigma0(w1))));
    Round(h, a, b, c, d, e, f, g, Add(K(0x1e376c08ul), Inc(w1, sigma1(w15), w10, sigma0(w2))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x2748774cul), Inc(w2, sigma1(w0), w11, sigma0(w3))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x34b0bcb5ul), Inc(w3, sigma1(w1), w12, sigma0(w4))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x391c0cb3ul), Inc(w4, sigma1(w2), w13, sigma0(w5))));
    Round(d, e, f, g, h, a, b, c, Add(K(0x4ed8aa4aul), Inc(w5, sigma1(w3), w14, sigma0(w6))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x5b9cca4ful), Inc(w6, sigma1(w4), w15, sigma0(w7))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x682e6ff3ul), Inc(w7, sigma1(w5), w0, sigma0(w8))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x748f82eeul), Inc(w8, sigma1(w6), w1, sigma0(w9))));
    Round(h, a, b, c, d, e, f, g, Add(K(0x78a5636ful), Inc(w9, sigma1(w7), w2, sigma0(w10))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x84c87814ul), Inc(w10, sigma1(w8), w3, sigma0(w11))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x8cc70208ul), Inc(w11, sigma1(w9), w4, sigma0(w12))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x90befffaul), Inc(w12, sigma1(w10), w5, sigma0(w13))));
    Round(d, e, f, g, h, a, b, c, Add(K(0xa4506cebul), Inc(w13, sigma1(w11), w6, sigma0(w14))));
    Round(c, d, e, f, g, h, a, b, Add(K(0xbef9a3f7ul), Inc(w14, sigma1(w12), w7, sigma0(w15))));
    Round(b, c, d, e, f, g, h, a, Add(K(0xc67178f2ul), Inc(w15, sigma1(w13), w8, sigma0(w0))));

    a = Add(a, K(0x6a09e667ul));
    b = Add(b, K(0xbb67ae85ul));
    c = Add(c, K(0x3c6ef372ul));
    d = Add(d, K(0xa54ff53aul));
    e = Add(e, K(0x510e527ful));
    f = Add(f, K(0x9b05688cul));
    g = Add(g, K(0x1f83d9abul));
    h = Add(h, K(0x5be0cd19ul));

    __m256i t0 = a, t1 = b, t2 = c, t3 = d, t4 = e, t5 = f, t6 = g, t7 = h;

    // Transform 2
    Round(a, b, c, d, e, f, g, h, K(0xc28a2f98ul));
    Round(h, a, b, c, d, e, f, g, K(0x71374491ul));
    Round(g, h, a, b, c, d, e, f, K(0xb5c0fbcful));
    Round(f, g, h, a, b, c, d, e, K(0xe9b5dba5ul));
    Round(e, f, g, h, a, b, c, d, K(0x3956c25bul));
    Round(d, e, f, g, h, a, b, c, K(0x59f111f1ul));
    Round(c, d, e, f, g, h, a, b, K(0x923f82a4ul));
    Round(b, c, d, e, f, g, h, a, K(0xab1c5ed5ul));
    Round(a, b, c, d, e, f, g, h, K(0xd807aa98ul));
    Round(h, a, b, c, d, e, f, g, K(0x12835b01ul));
    Round(g, h, a, b, c, d, e, f, K(0x243185beul));
    Round(f, g, h, a, b, c, d, e, K(0x550c7dc3ul));
    Round(e, f, g, h, a, b, c, d, K(0x72be5d74ul));
    Round(d, e, f, g, h, a, b, c, K(0x80deb1feul));
    Round(c, d, e, f, g, h, a, b, K(0x9bdc06a7ul));
    Round(b, c, d, e, f, g, h, a, K(0xc19bf374ul));
    Round(a, b, c, d, e, f, g, h, K(0x649b69c1ul));
    Round(h, a, b, c, d, e, f, g, K(0xf0fe4786ul));
    Round(g, h, a, b, c, d, e, f, K(0x0fe1edc6ul));
    Round(f, g, h, a, b, c, d, e, K(0x240cf254ul));
    Round(e, f, g, h, a, b, c, d, K(0x4fe9346ful));
    Round(d, e, f, g, h, a, b, c, K(0x6cc984beul));
    Round(c, d, e, f, g, h, a, b, K(0x61b9411eul));
    Round(b, c, d, e, f, g, h, a, K(0x16f988faul));
    Round(a, b, c, d, e, f, g, h, K(0xf2c65152ul));
    Round(h, a, b, c, d, e, f, g, K(0xa88e5a6dul));
    Round(g, h, a, b, c, d, e, f, K(0xb019fc65ul));
    Round(f, g, h, a, b, c, d, e, K(0xb9d99ec7ul));
    Round(e, f, g, h, a, b, c, d, K(0x9a1231c3ul));
    Round(d, e, f, g, h, a, b, c, K(0xe70eeaa0ul));
    Round(c, d, e, f, g, h, a, b, K(0xfdb1232bul));
    Round(b, c, d, e, f, g, h, a, K(0xc7353eb0ul));
    Round(a, b, c, d, e, f, g, h, K(0x3069bad5ul));
    Round(h, a, b, c, d, e, f, g, K(0xcb976d5ful));
    Round(g, h, a, b, c, d, e, f, K(0x5a0f118ful));
    Round(f, g, h, a, b, c, d, e, K(0xdc1eeefdul));
    Round(e, f, g, h, a, b, c, d, K(0x0a35b689ul));
    Round(d, e, f, g, h, a, b, c, K(0xde0b7a04ul));
    Round(c, d, e, f, g, h, a, b, K(0x58f4ca9dul));
    Round(b, c, d, e, f, g, h, a, K(0xe15d5b16ul));
    Round(a, b, c, d, e, f, g, h, K(0x007f3e86ul));
    Round(h, a, b, c, d, e, f, g, K(0x37088980ul));
    Round(g, h, a, b, c, d, e, f, K(0xa507ea32ul));
    Round(f, g, h, a, b, c, d, e, K(0x6fab9537ul));
    Round(e, f, g, h, a, b, c, d, K(0x17406110ul));
    Round(d, e, f, g, h, a, b, c, K(0x0d8cd6f1ul));
    Round(c, d, e, f, g, h, a, b, K(0xcdaa3b6dul));
    Round(b, c, d, e, f, g, h, a, K(0xc0bbbe37ul));
    Round(a, b, c, d, e, f, g, h, K(0x83613bdaul));
    Round(h, a, b, c, d, e, f, g, K(0xdb48a363ul));
    Round(g, h, a, b, c, d, e, f, K(0x0b02e931ul));
    Round(f, g, h, a, b, c, d, e, K(0x6fd15ca7ul));
    Round(e, f, g, h, a, b, c, d, K(0x521afacaul));
    Round(d, e, f, g, h, a, b, c, K(0x31338431ul));
    Round(c, d, e, f, g, h, a, b, K(0x6ed41a95ul));
    Round(b, c, d, e, f, g, h, a, K(0x6d437890ul));
    Round(a, b, c, d, e, f, g, h, K(0xc39c91f2ul));
    Round(h, a, b, c, d, e, f, g, K(0x9eccabbdul));
    Round(g, h, a, b, c, d, e, f, K(0xb5c9a0e6ul));
    Round(f, g, h, a, b, c, d, e, K(0x532fb63cul));
    Round(e, f, g, h, a, b, c, d, K(0xd2c741c6ul));
    Round(d, e, f, g, h, a, b, c, K(0x07237ea3ul));
    Round(c, d, e, f, g, h, a, b, K(0xa4954b68ul));
    Round(b, c, d, e, f, g, h, a, K(0x4c191d76ul));

    w0 = Add(t0, a);
    w1 = Add(t1, b);
    w2 = Add(t2, c);
    w3 = Add(t3, d);
    w4 = Add(t4, e);
    w5 = Add(t5, f);
    w6 = Add(t6, g);
    w7 = Add(t7, h);

    // Transform 3
    a = K(0x6a09e667ul);
    b = K(0xbb67ae85ul);
    c = K(0x3c6ef372ul);
    d = K(0xa54ff53aul);
    e = K(0x510e527ful);
    f = K(0x9b05688cul);
    g = K(0x1f83d9abul);
    h = K(0x5be0cd19ul);

    Round(a, b, c, d, e, f, g, h, Add(K(0x428a2f98ul), w0));
    Round(h, a, b, c, d, e, f, g, Add(K(0x71374491ul), w1));
    Round(g, h, a, b, c, d, e, f, Add(K(0xb5c0fbcful), w2));
    Round(f, g, h, a, b, c, d, e, Add(K(0xe9b5dba5ul), w3));
    Round(e, f, g, h, a, b, c, d, Add(K(0x3956c25bul), w4));
    Round(d, e, f, g, h, a, b, c, Add(K(0x59f111f1ul), w5));
    Round(c, d, e, f, g, h, a, b, Add(K(0x923f82a4ul), w6));
    Round(b, c, d, e, f, g, h, a, Add(K(0xab1c5ed5ul), w7));
    Round(a, b, c, d, e, f, g, h, K(0x5807aa98ul));
    Round(h, a, b, c, d, e, f, g, K(0x12835b01ul));
    Round(g, h, a, b, c, d, e, f, K(0x243185beul));
    Round(f, g, h, a, b, c, d, e, K(0x550c7dc3ul));
    Round(e, f, g, h, a, b, c, d, K(0x72be5d74ul));
    Round(d, e, f, g, h, a, b, c, K(0x80deb1feul));
    Round(c, d, e, f, g, h, a, b, K(0x9bdc06a7ul));
    Round(b, c, d, e, f, g, h, a, K(0xc19bf274ul));
    Round(a, b, c, d, e, f, g, h, Add(K(0xe49b69c1ul), Inc(w0, sigma0(w1))));
    Round(h, a, b, c, d, e, f, g, Add(K(0xefbe4786ul), Inc(w1, K(0xa00000ul), sigma0(w2))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x0fc19dc6ul), Inc(w2, sigma1(w0), sigma0(w3))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x240ca1ccul), Inc(w3, sigma1(w1), sigma0(w4))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x2de92c6ful), Inc(w4, sigma1(w2), sigma0(w5))));
    Round(d, e, f, g, h, a, b, c, Add(K(0x4a7484aaul), Inc(w5, sigma1(w3), sigma0(w6))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x5cb0a9dcul), Inc(w6, sigma1(w4), K(0x100ul), sigma0(w7))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x76f988daul), Inc(w7, sigma1(w5), w0, K(0x11002000ul))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x983e5152ul), w8 = Add(K(0x80000000ul), sigma1(w6), w1)));
    Round(h, a, b, c, d, e, f, g, Add(K(0xa831c66dul), w9 = Add(sigma1(w7), w2)));
    Round(g, h, a, b, c, d, e, f, Add(K(0xb00327c8ul), w10 = Add(sigma1(w8), w3)));
    Round(f, g, h, a, b, c, d, e, Add(K(0xbf597fc7ul), w11 = Add(sigma1(w9), w4)));
    Round(e, f, g, h, a, b, c, d, Add(K(0xc6e00bf3ul), w12 = Add(sigma1(w10), w5)));
    Round(d, e, f, g, h, a, b, c, Add(K(0xd5a79147ul), w13 = Add(sigma1(w11), w6)));
    Round(c, d, e, f, g, h, a, b, Add(K(0x06ca6351ul), w14 = Add(sigma1(w12), w7, K(0x400022ul))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x14292967ul), w15 = Add(K(0x100ul), sigma1(w13), w8, sigma0(w0))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x27b70a85ul), Inc(w0, sigma1(w14), w9, sigma0(w1))));
    Round(h, a, b, c, d, e, f, g, Add(K(0x2e1b2138ul), Inc(w1, sigma1(w15), w10, sigma0(w2))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x4d2c6dfcul), Inc(w2, sigma1(w0), w11, sigma0(w3))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x53380d13ul), Inc(w3, sigma1(w1), w12, sigma0(w4))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x650a7354ul), Inc(w4, sigma1(w2), w13, sigma0(w5))));
    Round(d, e, f, g, h, a, b, c, Add(K(0x766a0abbul), Inc(w5, sigma1(w3), w14, sigma0(w6))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x81c2c92eul), Inc(w6, sigma1(w4), w15, sigma0(w7))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x92722c85ul), Inc(w7, sigma1(w5), w0, sigma0(w8))));
    Round(a, b, c, d, e, f, g, h, Add(K(0xa2bfe8a1ul), Inc(w8, sigma1(w6), w1, sigma0(w9))));
    Round(h, a, b, c, d, e, f, g, Add(K(0xa81a664bul), Inc(w9, sigma1(w7), w2, sigma0(w10))));
    Round(g, h, a, b, c, d, e, f, Add(K(0xc24b8b70ul), Inc(w10, sigma1(w8), w3, sigma0(w11))));
    Round(f, g, h, a, b, c, d, e, Add(K(0xc76c51a3ul), Inc(w11, sigma1(w9), w4, sigma0(w12))));
    Round(e, f, g, h, a, b, c, d, Add(K(0xd192e819ul), Inc(w12, sigma1(w10), w5, sigma0(w13))));
    Round(d, e, f, g, h, a, b, c, Add(K(0xd6990624ul), Inc(w13, sigma1(w11), w6, sigma0(w14))));
    Round(c, d, e, f, g, h, a, b, Add(K(0xf40e3585ul), Inc(w14, sigma1(w12), w7, sigma0(w15))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x106aa070ul), Inc(w15, sigma1(w13), w8, sigma0(w0))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x19a4c116ul), Inc(w0, sigma1(w14), w9, sigma0(w1))));
    Round(h, a, b, c, d, e, f, g, Add(K(0x1e376c08ul), Inc(w1, sigma1(w15), w10, sigma0(w2))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x2748774cul), Inc(w2, sigma1(w0), w11, sigma0(w3))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x34b0bcb5ul), Inc(w3, sigma1(w1), w12, sigma0(w4))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x391c0cb3ul), Inc(w4, sigma1(w2), w13, sigma0(w5))));
    Round(d, e, f, g, h, a, b, c, Add(K(0x4ed8aa4aul), Inc(w5, sigma1(w3), w14, sigma0(w6))));
    Round(c, d, e, f, g, h, a, b, Add(K(0x5b9cca4ful), Inc(w6, sigma1(w4), w15, sigma0(w7))));
    Round(b, c, d, e, f, g, h, a, Add(K(0x682e6ff3ul), Inc(w7, sigma1(w5), w0, sigma0(w8))));
    Round(a, b, c, d, e, f, g, h, Add(K(0x748f82eeul), Inc(w8, sigma1(w6), w1, sigma0(w9))));
    Round(h, a, b, c, d, e, f, g, Add(K(0x78a5636ful), Inc(w9, sigma1(w7), w2, sigma0(w10))));
    Round(g, h, a, b, c, d, e, f, Add(K(0x84c87814ul), Inc(w10, sigma1(w8), w3, sigma0(w11))));
    Round(f, g, h, a, b, c, d, e, Add(K(0x8cc70208ul), Inc(w11, sigma1(w9), w4, sigma0(w12))));
    Round(e, f, g, h, a, b, c, d, Add(K(0x90befffaul), Inc(w12, sigma1(w10), w5, sigma0(w13))));
    Round(d, e, f, g, h, a, b, c, Add(K(0xa4506cebul), Inc(w13, sigma1(w11), w6, sigma0(w14))));
    Round(c, d, e, f, g, h, a, b, Add(K(0xbef9a3f7ul), w14, sigma1(w12), w7, sigma0(w15)));
    Round(b, c, d, e, f, g, h, a, Add(K(0xc67178f2ul), w15, sigma1(w13), w8, sigma0(w0)));

    // Output
    Write8(out, 0, Add(a, K(0x6a09e667ul)));
    Write8(out, 4, Add(b, K(0xbb67ae85ul)));
    Write8(out, 8, Add(c, K(0x3c6ef372ul)));
    Write8(out, 12, Add(d, K(0xa54ff53aul)));
    Write8(out, 16, Add(e, K(0x510e527ful)));
    Write8(out, 20, Add(f, K(0x9b05688cul)));
    Write8(out, 24, Add(g, K(0x1f83d9abul)));
    Write8(out, 28, Add(h, K(0x5be0cd19ul)));
}